

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 *puVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 post_process;
  size_t sVar5;
  undefined3 uVar6;
  int *piVar7;
  undefined4 uVar8;
  bool reduce_c;
  int size;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined8 in_RAX;
  long lVar13;
  undefined7 uVar19;
  ulong uVar14;
  Mat *pMVar15;
  Mat *pMVar16;
  size_t sVar17;
  size_t sVar18;
  undefined4 uVar20;
  uint uVar21;
  Mat *pMVar22;
  long lVar23;
  byte bVar24;
  uint uVar25;
  Mat *pMVar26;
  Mat *pMVar27;
  byte bVar28;
  long lVar29;
  uint *puVar30;
  ulong uVar31;
  void *pvVar32;
  byte bVar33;
  uint uVar34;
  uint uVar35;
  byte bVar36;
  byte bVar37;
  Mat *pMVar38;
  size_t sVar39;
  byte bVar40;
  long lVar41;
  void **ppvVar42;
  float *mins_ptr;
  Mat *pMVar43;
  void *pvVar44;
  float *mins_ptr_3;
  int j;
  void *pvVar45;
  Mat *pMVar46;
  Mat *pMVar47;
  void *pvVar48;
  bool reduce_d;
  bool bVar49;
  float extraout_XMM0_Da;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 extraout_XMM0_05 [16];
  undefined1 extraout_XMM0_06 [16];
  undefined1 extraout_XMM0_07 [16];
  undefined1 extraout_XMM0_08 [16];
  undefined1 extraout_XMM0_09 [16];
  undefined1 extraout_XMM0_10 [16];
  undefined1 extraout_XMM0_11 [16];
  undefined1 extraout_XMM0_12 [16];
  undefined1 extraout_XMM0_13 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 extraout_XMM0_14 [16];
  undefined1 extraout_XMM0_15 [16];
  undefined1 extraout_XMM0_16 [16];
  undefined1 extraout_XMM0_17 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 extraout_XMM0_18 [16];
  undefined1 extraout_XMM0_19 [16];
  undefined1 extraout_XMM0_20 [16];
  undefined1 extraout_XMM0_21 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 extraout_XMM0_22 [16];
  undefined1 extraout_XMM0_23 [16];
  undefined1 extraout_var [12];
  undefined1 extraout_XMM0_24 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 extraout_XMM0_25 [16];
  undefined1 extraout_XMM0_26 [16];
  undefined1 extraout_var_00 [12];
  undefined1 extraout_XMM0_27 [16];
  undefined1 extraout_XMM0_28 [16];
  undefined1 extraout_XMM0_29 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 extraout_XMM0_30 [16];
  undefined1 extraout_XMM0_31 [16];
  undefined1 extraout_XMM0_32 [16];
  undefined1 extraout_XMM0_33 [16];
  undefined1 extraout_XMM0_34 [16];
  undefined1 extraout_XMM0_35 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 extraout_XMM0_36 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 extraout_XMM0_37 [16];
  undefined1 extraout_XMM0_38 [16];
  undefined1 extraout_var_01 [12];
  undefined1 extraout_XMM0_39 [16];
  undefined1 extraout_XMM0_40 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 extraout_XMM0_41 [16];
  undefined1 extraout_XMM0_42 [16];
  undefined1 extraout_var_02 [12];
  undefined1 extraout_XMM0_43 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 extraout_XMM0_44 [16];
  undefined1 extraout_XMM0_45 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 extraout_XMM0_46 [16];
  undefined1 extraout_XMM0_47 [16];
  undefined1 extraout_XMM0_48 [16];
  undefined1 extraout_XMM0_49 [16];
  undefined1 extraout_var_03 [12];
  undefined1 extraout_XMM0_50 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 extraout_XMM0_51 [16];
  undefined1 extraout_XMM0_52 [16];
  undefined1 extraout_var_04 [12];
  undefined1 extraout_XMM0_53 [16];
  undefined1 extraout_XMM0_54 [16];
  undefined1 extraout_XMM0_55 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 extraout_XMM0_56 [16];
  undefined1 extraout_XMM0_57 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 extraout_XMM0_58 [16];
  undefined1 extraout_XMM0_59 [16];
  undefined1 extraout_var_05 [12];
  undefined1 extraout_XMM0_60 [16];
  undefined1 extraout_XMM0_61 [16];
  undefined1 extraout_XMM0_62 [16];
  undefined1 extraout_XMM0_63 [16];
  undefined1 extraout_XMM0_64 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 extraout_XMM0_65 [16];
  undefined1 extraout_var_06 [12];
  undefined1 extraout_XMM0_66 [16];
  undefined1 extraout_XMM0_67 [16];
  undefined1 extraout_XMM0_68 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 extraout_XMM0_69 [16];
  undefined1 extraout_XMM0_70 [16];
  undefined1 extraout_var_07 [12];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 extraout_XMM0_71 [16];
  undefined1 extraout_XMM0_72 [16];
  undefined1 extraout_var_08 [12];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 extraout_XMM0_73 [16];
  undefined1 extraout_XMM0_74 [16];
  undefined1 extraout_var_09 [12];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  int iVar264;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  int size_6;
  int axes_flag [4];
  Option *in_stack_fffffffffffffed8;
  void *local_110;
  Mat *local_108;
  Mat *local_100;
  Mat *local_f8;
  Mat *local_f0;
  Mat *local_e8;
  Mat *local_e0;
  Mat local_c8;
  Mat *local_78;
  Mat *local_70;
  Mat *local_68;
  Mat *local_60;
  undefined1 local_58 [16];
  Mat *local_40;
  long local_38;
  long lVar286;
  
  uVar25 = bottom_blob->dims;
  auVar52 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  if (this->reduce_all == 0) {
    lVar13 = (long)(this->axes).w;
    if (0 < lVar13) {
      pvVar32 = (this->axes).data;
      lVar29 = 0;
      do {
        iVar9 = *(int *)((long)pvVar32 + lVar29 * 4);
        *(undefined4 *)(local_58 + (long)(int)((iVar9 >> 0x1f & uVar25) + iVar9) * 4) = 1;
        lVar29 = lVar29 + 1;
      } while (lVar13 != lVar29);
    }
    uVar19 = (undefined7)
             ((ulong)((long)&switchD_0033a515::switchdataD_0051c920 +
                     (long)(int)(&switchD_0033a515::switchdataD_0051c920)[uVar25 - 1]) >> 8);
    uVar20 = local_58._0_4_;
    uVar8 = local_58._4_4_;
    iVar9 = local_58._8_4_;
    switch(uVar25) {
    case 1:
      auVar151 = _DAT_00514730;
      break;
    case 2:
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_58._0_8_;
      auVar151._0_4_ = -(uint)(uVar20 == 1);
      auVar151._4_4_ = -(uint)(uVar8 == 1);
      auVar151._8_4_ = -(uint)(uVar8 == 1);
      auVar151._12_4_ = 0xffffffff;
      break;
    case 3:
      uVar20 = (undefined4)CONCAT71(uVar19,local_58._0_4_ == 1);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_58._4_8_;
      auVar151._0_4_ = -(uint)(uVar8 == 1);
      auVar151._4_4_ = -(uint)(iVar9 == 1);
      auVar151._8_4_ = -(uint)(iVar9 == 1);
      auVar151._12_4_ = 0xffffffff;
      goto LAB_0033a590;
    case 4:
      uVar20 = (undefined4)CONCAT71(uVar19,local_58._0_4_ == 1);
      reduce_d = local_58._4_4_ == 1;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_58._8_8_;
      auVar151._0_4_ = -(uint)(iVar9 == 1);
      auVar151._4_4_ = -(uint)(local_58._12_4_ == 1);
      auVar151._8_4_ = -(uint)(local_58._12_4_ == 1);
      auVar151._12_4_ = 0xffffffff;
      goto LAB_0033a592;
    default:
      auVar151 = (undefined1  [16])0x0;
    }
    uVar20 = 0;
LAB_0033a590:
    reduce_d = false;
  }
  else {
    uVar20 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    reduce_d = true;
    auVar151 = _DAT_00515190;
  }
LAB_0033a592:
  uVar21 = this->operation;
  if (10 < (ulong)uVar21) {
    return 0;
  }
  puVar30 = (uint *)((long)&switchD_0033a5b0::switchdataD_0051c930 +
                    (long)(int)(&switchD_0033a5b0::switchdataD_0051c930)[uVar21]);
  lVar13 = auVar151._0_8_;
  lVar29 = auVar151._8_8_;
  reduce_c = SUB41(uVar20,0);
  bVar37 = auVar151[0];
  bVar36 = auVar151[8];
  uVar6 = auVar151._1_3_;
  switch(uVar21) {
  case 0:
    auVar152._0_8_ = lVar13 << 0x3f;
    auVar152._8_8_ = lVar29 << 0x3f;
    uVar20 = movmskpd(uVar25,auVar152);
    iVar9 = reduction<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                      (bottom_blob,top_blob,this->coeff,(bool)((byte)uVar20 >> 1),
                       (bool)((byte)uVar20 & 1),reduce_d,reduce_c,false,0.0,this->keepdims,opt);
    return iVar9;
  case 1:
    fVar50 = this->coeff;
    post_process = (undefined1)this->keepdims;
    auVar156._0_8_ = lVar13 << 0x3f;
    auVar156._8_8_ = lVar29 << 0x3f;
    uVar20 = movmskpd(uVar25,auVar156);
    bVar37 = (byte)uVar20;
    goto LAB_0033a7e7;
  case 2:
    fVar50 = this->coeff;
    auVar154._0_8_ = lVar13 << 0x3f;
    auVar154._8_8_ = lVar29 << 0x3f;
    uVar20 = movmskpd(uVar25,auVar154);
    puVar30 = (uint *)top_blob;
    iVar9 = reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                      (bottom_blob,top_blob,fVar50,(bool)((byte)uVar20 >> 1),
                       (bool)((byte)uVar20 & 1),reduce_d,reduce_c,this->keepdims,opt);
    if (iVar9 != 0) {
      return -100;
    }
    if (ABS(fVar50 + -1.0) <= 1.1920929e-07) {
      return 0;
    }
    goto LAB_0034213c;
  case 3:
    uVar25 = uVar25 - 1;
    uVar31 = (ulong)uVar25;
    if (3 < uVar25) {
      iVar9 = 1;
      goto LAB_0033b14a;
    }
    uVar25 = (&switchD_0033a774::switchdataD_0051c99c)[uVar31] + 0x51c99c;
    switch(uVar31) {
    case 0:
      iVar9 = bottom_blob->w;
      break;
    case 1:
      auVar60._0_8_ = lVar13 << 0x3f;
      auVar60._8_8_ = lVar29 << 0x3f;
      uVar25 = movmskpd(uVar25,auVar60);
      iVar9 = 1;
      if ((uVar25 & 2) != 0) {
        iVar9 = bottom_blob->w;
      }
      if ((uVar25 & 1) != 0) {
        iVar9 = iVar9 * bottom_blob->h;
      }
      break;
    case 2:
      uVar3 = bottom_blob->w;
      uVar4 = bottom_blob->h;
      uVar25 = (auVar151._0_4_ << 0x1f) >> 0x1f;
      uVar21 = (auVar151._8_4_ << 0x1f) >> 0x1f;
      uVar25 = ~uVar25 & 1 | uVar4 & uVar25;
      uVar21 = ~uVar21 & 1 | uVar3 & uVar21;
      goto LAB_0033ac3d;
    case 3:
      auVar59._0_8_ = lVar13 << 0x3f;
      auVar59._8_8_ = lVar29 << 0x3f;
      uVar21 = movmskpd(0x51c930,auVar59);
      uVar25 = 1;
      iVar9 = 1;
      if ((uVar21 & 2) != 0) {
        iVar9 = bottom_blob->w;
      }
      iVar10 = 1;
      if ((uVar21 & 1) != 0) {
        iVar10 = bottom_blob->h;
      }
      uVar21 = iVar10 * iVar9;
      if (reduce_d != false) {
        uVar25 = bottom_blob->d;
      }
LAB_0033ac3d:
      iVar9 = uVar21 * uVar25;
      if (reduce_c != false) {
        iVar9 = iVar9 * bottom_blob->c;
      }
    }
LAB_0033b14a:
    fVar50 = this->coeff;
    auVar158._0_8_ = lVar13 << 0x3f;
    auVar158._8_8_ = lVar29 << 0x3f;
    uVar20 = movmskpd(uVar25,auVar158);
    puVar30 = (uint *)top_blob;
    iVar10 = reduction_op<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
                       (bottom_blob,top_blob,fVar50,(bool)((byte)uVar20 >> 1),
                        (bool)((byte)uVar20 & 1),reduce_d,reduce_c,this->keepdims,opt);
    if (iVar10 != 0) {
      return -100;
    }
    fVar50 = fVar50 / (float)iVar9;
    goto LAB_0034213c;
  case 4:
    fVar50 = this->coeff;
    if (3 < uVar25 - 1) break;
    iVar9 = this->keepdims;
    sVar18 = bottom_blob->elemsize;
    puVar30 = &switchD_0033a639::switchdataD_0051c98c;
    switch(uVar25) {
    case 1:
      iVar9 = bottom_blob->w;
      puVar30 = (uint *)0x1;
      Mat::create(top_blob,1,sVar18,opt->blob_allocator);
      if ((long)iVar9 < 1) {
        fVar51 = -3.4028235e+38;
      }
      else {
        fVar51 = -3.4028235e+38;
        lVar13 = 0;
        do {
          fVar2 = *(float *)((long)bottom_blob->data + lVar13 * 4);
          if (fVar51 <= fVar2) {
            fVar51 = fVar2;
          }
          lVar13 = lVar13 + 1;
        } while (iVar9 != lVar13);
      }
LAB_0033babe:
      *(float *)top_blob->data = fVar51;
      break;
    case 2:
      uVar25 = bottom_blob->w;
      pMVar27 = (Mat *)(ulong)uVar25;
      uVar21 = bottom_blob->h;
      pMVar15 = (Mat *)(ulong)uVar21;
      auVar57._8_4_ = 0xffffffff;
      auVar57._0_8_ = 0xffffffffffffffff;
      auVar57._12_4_ = 0xffffffff;
      auVar58._0_8_ = SUB168(auVar57 ^ auVar151,0) << 0x3f;
      auVar58._8_8_ = SUB168(auVar57 ^ auVar151,8) << 0x3f;
      iVar10 = movmskpd(uVar20,auVar58);
      if (iVar10 == 0) {
        if (iVar9 == 0) {
          Mat::create(top_blob,1,sVar18,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,sVar18,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        puVar30 = (uint *)pMVar15;
        Mat::create(&local_c8,uVar21,sVar18,opt->workspace_allocator);
        iVar10 = -100;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          if ((int)uVar21 < 1) {
            fVar51 = -3.4028235e+38;
          }
          else {
            pvVar32 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar18 = bottom_blob->elemsize;
            puVar30 = (uint *)0x0;
            do {
              fVar51 = -3.4028235e+38;
              if (0 < (int)uVar25) {
                pMVar38 = (Mat *)0x0;
                fVar51 = -3.4028235e+38;
                do {
                  fVar2 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                  if (fVar51 <= fVar2) {
                    fVar51 = fVar2;
                  }
                  pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                } while (pMVar27 != pMVar38);
              }
              *(float *)((long)(void **)local_c8.data + (long)puVar30 * 4) = fVar51;
              puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
              pvVar32 = (void *)((long)pvVar32 + (long)iVar9 * sVar18);
            } while ((Mat *)puVar30 != pMVar15);
            fVar51 = -3.4028235e+38;
            pMVar27 = (Mat *)0x0;
            do {
              fVar2 = *(float *)((long)(void **)local_c8.data + (long)pMVar27 * 4);
              if (fVar51 <= fVar2) {
                fVar51 = fVar2;
              }
              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
            } while (pMVar15 != pMVar27);
          }
          *(float *)top_blob->data = fVar51;
          iVar10 = 0;
        }
        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar30 = (uint *)local_c8.data;
            if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_00342105;
      }
      if (((bVar37 | (byte)iVar10 >> 1) & 1) == 0) {
        if (iVar9 == 0) {
          puVar30 = (uint *)pMVar15;
          Mat::create(top_blob,uVar21,sVar18,opt->blob_allocator);
        }
        else {
          puVar30 = (uint *)0x1;
          Mat::create(top_blob,1,uVar21,sVar18,opt->blob_allocator);
        }
        if (0 < (int)uVar21) {
          iVar9 = bottom_blob->w;
          sVar18 = bottom_blob->elemsize;
          pvVar32 = bottom_blob->data;
          pvVar45 = top_blob->data;
          puVar30 = (uint *)0x0;
          do {
            fVar51 = -3.4028235e+38;
            if (0 < (int)uVar25) {
              pMVar38 = (Mat *)0x0;
              fVar51 = -3.4028235e+38;
              do {
                fVar2 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                if (fVar51 <= fVar2) {
                  fVar51 = fVar2;
                }
                pMVar38 = (Mat *)((long)&pMVar38->data + 1);
              } while (pMVar27 != pMVar38);
            }
            *(float *)((long)pvVar45 + (long)puVar30 * 4) = fVar51;
            puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
            pvVar32 = (void *)((long)pvVar32 + (long)iVar9 * sVar18);
          } while ((Mat *)puVar30 != pMVar15);
        }
      }
      else if (((bVar36 | (byte)iVar10) & 1) == 0) {
        puVar30 = (uint *)pMVar27;
        if (iVar9 == 0) {
          Mat::create(top_blob,uVar25,sVar18,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,uVar25,1,sVar18,opt->blob_allocator);
        }
        auVar71 = _DAT_00514730;
        auVar151 = _DAT_00514720;
        auVar52 = _DAT_005140e0;
        uVar11 = top_blob->c * (int)top_blob->cstep;
        pvVar32 = top_blob->data;
        if (0 < (int)uVar11) {
          lVar13 = (ulong)uVar11 - 1;
          auVar79._8_4_ = (int)lVar13;
          auVar79._0_8_ = lVar13;
          auVar79._12_4_ = (int)((ulong)lVar13 >> 0x20);
          uVar31 = 0;
          auVar79 = auVar79 ^ _DAT_005140e0;
          do {
            auVar178._8_4_ = (int)uVar31;
            auVar178._0_8_ = uVar31;
            auVar178._12_4_ = (int)(uVar31 >> 0x20);
            auVar285 = (auVar178 | auVar71) ^ auVar52;
            iVar9 = auVar79._4_4_;
            iVar10 = auVar79._12_4_;
            if ((bool)(~(auVar285._4_4_ == iVar9 && auVar79._0_4_ < auVar285._0_4_ ||
                        iVar9 < auVar285._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar32 + uVar31 * 4) = 0xff7fffff;
            }
            if ((auVar285._12_4_ != iVar10 || auVar285._8_4_ <= auVar79._8_4_) &&
                auVar285._12_4_ <= iVar10) {
              *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 4) = 0xff7fffff;
            }
            auVar285 = (auVar178 | auVar151) ^ auVar52;
            auVar265._0_4_ = -(uint)(auVar79._0_4_ < auVar285._0_4_);
            auVar265._4_4_ = -(uint)(iVar9 < auVar285._4_4_);
            auVar265._8_4_ = -(uint)(auVar79._8_4_ < auVar285._8_4_);
            auVar265._12_4_ = -(uint)(iVar10 < auVar285._12_4_);
            iVar9 = -(uint)(auVar285._4_4_ == iVar9);
            iVar10 = -(uint)(auVar285._12_4_ == iVar10);
            auVar287._4_4_ = iVar9;
            auVar287._0_4_ = iVar9;
            auVar287._8_4_ = iVar10;
            auVar287._12_4_ = iVar10;
            auVar179._4_4_ = auVar265._4_4_;
            auVar179._0_4_ = auVar265._4_4_;
            auVar179._8_4_ = auVar265._12_4_;
            auVar179._12_4_ = auVar265._12_4_;
            auVar180._8_4_ = 0xffffffff;
            auVar180._0_8_ = 0xffffffffffffffff;
            auVar180._12_4_ = 0xffffffff;
            auVar180 = (auVar179 | auVar287 & auVar265) ^ auVar180;
            if ((auVar180 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 8) = 0xff7fffff;
            }
            puVar30 = (uint *)(ulong)auVar180._8_2_;
            if ((auVar180 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 0xc) = 0xff7fffff;
            }
            uVar31 = uVar31 + 4;
          } while ((uVar11 + 3 & 0xfffffffc) != uVar31);
        }
        if (0 < (int)uVar21) {
          pvVar45 = bottom_blob->data;
          iVar9 = bottom_blob->w;
          sVar18 = bottom_blob->elemsize;
          puVar30 = (uint *)0x0;
          do {
            if (0 < (int)uVar25) {
              pMVar38 = (Mat *)0x0;
              do {
                fVar2 = *(float *)((long)pvVar45 + (long)pMVar38 * 4);
                fVar51 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                if (fVar2 <= fVar51) {
                  fVar2 = fVar51;
                }
                *(float *)((long)pvVar32 + (long)pMVar38 * 4) = fVar2;
                pMVar38 = (Mat *)((long)&pMVar38->data + 1);
              } while (pMVar27 != pMVar38);
            }
            puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
            pvVar45 = (void *)((long)pvVar45 + (long)iVar9 * sVar18);
          } while ((Mat *)puVar30 != pMVar15);
        }
      }
      break;
    case 3:
      uVar21 = bottom_blob->w;
      lVar13 = (long)(int)uVar21;
      uVar11 = bottom_blob->h;
      pMVar15 = (Mat *)(ulong)uVar11;
      uVar12 = bottom_blob->c;
      pMVar27 = (Mat *)(ulong)uVar12;
      uVar34 = uVar11 * uVar21;
      auVar53._8_4_ = 0xffffffff;
      auVar53._0_8_ = 0xffffffffffffffff;
      auVar53._12_4_ = 0xffffffff;
      auVar54._0_8_ = SUB168(auVar53 ^ auVar151,0) << 0x3f;
      auVar54._8_8_ = SUB168(auVar53 ^ auVar151,8) << 0x3f;
      iVar10 = movmskpd((&switchD_0033a639::switchdataD_0051c98c)[uVar25 - 1] + 0x51c98c,auVar54);
      bVar24 = reduce_c ^ 1;
      puVar30 = (uint *)pMVar27;
      if ((iVar10 != 0) || (bVar24 != 0)) {
        if (iVar10 == 0 && reduce_c == false) {
          if (iVar9 == 0) {
            Mat::create(top_blob,uVar12,sVar18,opt->blob_allocator);
          }
          else {
            puVar30 = (uint *)0x1;
            Mat::create(top_blob,1,1,uVar12,sVar18,opt->blob_allocator);
          }
          if (0 < (int)uVar12) {
            pvVar32 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            pvVar45 = top_blob->data;
            puVar30 = (uint *)(top_blob->elemsize * top_blob->cstep);
            sVar17 = bottom_blob->cstep;
            pMVar15 = (Mat *)0x0;
            do {
              fVar51 = -3.4028235e+38;
              if (0 < (int)uVar34) {
                uVar31 = 0;
                fVar51 = -3.4028235e+38;
                do {
                  fVar2 = *(float *)((long)pvVar32 + uVar31 * 4);
                  if (fVar51 <= fVar2) {
                    fVar51 = fVar2;
                  }
                  uVar31 = uVar31 + 1;
                } while (uVar34 != uVar31);
              }
              lVar13 = (long)puVar30 * (long)pMVar15;
              if (iVar9 == 0) {
                lVar13 = (long)pMVar15 * 4;
              }
              *(float *)((long)pvVar45 + lVar13) = fVar51;
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
            } while (pMVar15 != pMVar27);
          }
          break;
        }
        pMVar38 = (Mat *)(ulong)uVar21;
        bVar33 = (byte)iVar10 >> 1 | bVar37;
        if ((bVar33 & 1) == 0 && bVar24 == 0) {
          if (iVar9 == 0) {
            Mat::create(top_blob,uVar11,sVar18,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,uVar11,1,sVar18,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar30 = (uint *)0x1;
          Mat::create(&local_c8,1,uVar11,uVar12,sVar18,opt->workspace_allocator);
          auVar71 = _DAT_00514730;
          auVar151 = _DAT_00514720;
          auVar52 = _DAT_005140e0;
          iVar10 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
            uVar25 = (int)local_c8.cstep * local_c8.c;
            if (0 < (int)uVar25) {
              lVar29 = (ulong)uVar25 - 1;
              auVar75._8_4_ = (int)lVar29;
              auVar75._0_8_ = lVar29;
              auVar75._12_4_ = (int)((ulong)lVar29 >> 0x20);
              puVar30 = (uint *)0x0;
              auVar75 = auVar75 ^ _DAT_005140e0;
              do {
                auVar174._8_4_ = (int)puVar30;
                auVar174._0_8_ = puVar30;
                auVar174._12_4_ = (int)((ulong)puVar30 >> 0x20);
                auVar285 = (auVar174 | auVar71) ^ auVar52;
                iVar9 = auVar75._4_4_;
                if ((bool)(~(auVar285._4_4_ == iVar9 && auVar75._0_4_ < auVar285._0_4_ ||
                            iVar9 < auVar285._4_4_) & 1)) {
                  *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) = 0xff7fffff;
                }
                if ((auVar285._12_4_ != auVar75._12_4_ || auVar285._8_4_ <= auVar75._8_4_) &&
                    auVar285._12_4_ <= auVar75._12_4_) {
                  *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) = 0xff7fffff
                  ;
                }
                auVar285 = (auVar174 | auVar151) ^ auVar52;
                iVar10 = auVar285._4_4_;
                if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar75._0_4_)) {
                  *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) = 0xff7fffff;
                  *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                       0xff7fffff;
                }
                puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
              } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != (Mat *)puVar30);
            }
            if (0 < (int)uVar12) {
              pvVar32 = bottom_blob->data;
              puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
              pMVar47 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  pMVar46 = (Mat *)0x0;
                  pvVar45 = pvVar32;
                  do {
                    auVar159 = ZEXT816(0xff7fffff);
                    if (0 < (int)uVar21) {
                      pMVar16 = (Mat *)0x0;
                      auVar159 = ZEXT816(0xff7fffff);
                      do {
                        fVar51 = *(float *)((long)pvVar45 + (long)pMVar16 * 4);
                        if (auVar159._0_4_ <= fVar51) {
                          auVar159._0_4_ = fVar51;
                        }
                        pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                      } while (pMVar38 != pMVar16);
                    }
                    *(int *)((long)(void **)local_c8.data +
                            (long)pMVar46 * 4 +
                            CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                            local_c8.cstep * (long)pMVar47) = auVar159._0_4_;
                    pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                    pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                  } while (pMVar46 != pMVar15);
                }
                pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                pvVar32 = (void *)((long)&((Mat *)puVar30)->data + (long)pvVar32);
              } while (pMVar47 != pMVar27);
            }
            auVar71 = _DAT_00514730;
            auVar151 = _DAT_00514720;
            auVar52 = _DAT_005140e0;
            uVar25 = top_blob->c * (int)top_blob->cstep;
            if (0 < (int)uVar25) {
              puVar30 = (uint *)top_blob->data;
              lVar13 = (ulong)uVar25 - 1;
              auVar76._8_4_ = (int)lVar13;
              auVar76._0_8_ = lVar13;
              auVar76._12_4_ = (int)((ulong)lVar13 >> 0x20);
              uVar31 = 0;
              auVar76 = auVar76 ^ _DAT_005140e0;
              do {
                auVar175._8_4_ = (int)uVar31;
                auVar175._0_8_ = uVar31;
                auVar175._12_4_ = (int)(uVar31 >> 0x20);
                auVar285 = (auVar175 | auVar71) ^ auVar52;
                iVar9 = auVar76._4_4_;
                if ((bool)(~(auVar285._4_4_ == iVar9 && auVar76._0_4_ < auVar285._0_4_ ||
                            iVar9 < auVar285._4_4_) & 1)) {
                  *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0xff7fffff;
                }
                if ((auVar285._12_4_ != auVar76._12_4_ || auVar285._8_4_ <= auVar76._8_4_) &&
                    auVar285._12_4_ <= auVar76._12_4_) {
                  *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0xff7fffff;
                }
                auVar285 = (auVar175 | auVar151) ^ auVar52;
                iVar10 = auVar285._4_4_;
                if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar76._0_4_)) {
                  *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0xff7fffff;
                  *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) = 0xff7fffff;
                }
                uVar31 = uVar31 + 4;
              } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
            }
            if (0 < (int)uVar12) {
              pvVar32 = top_blob->data;
              puVar30 = (uint *)0x0;
              pMVar38 = (Mat *)local_c8.data;
              do {
                if (0 < (int)uVar11) {
                  pMVar47 = (Mat *)0x0;
                  do {
                    fVar2 = *(float *)((long)&pMVar38->data + (long)pMVar47 * 4);
                    fVar51 = *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                    if (fVar2 <= fVar51) {
                      fVar2 = fVar51;
                    }
                    *(float *)((long)pvVar32 + (long)pMVar47 * 4) = fVar2;
                    pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                  } while (pMVar15 != pMVar47);
                }
                puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                pMVar38 = (Mat *)((long)&pMVar38->data +
                                 local_c8.cstep *
                                 CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
              } while ((Mat *)puVar30 != pMVar27);
            }
            iVar10 = 0;
          }
          piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar30 = (uint *)local_c8.data;
              if (local_c8.allocator == (Allocator *)0x0) {
joined_r0x00346c6e:
                local_c8.data = puVar30;
                if ((Mat *)puVar30 != (Mat *)0x0) {
                  free(puVar30);
                }
              }
              else {
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          bVar40 = (byte)iVar10 | bVar36;
          if ((bVar40 & 1) != 0 || bVar24 != 0) {
            if ((bVar33 & 1) == 0 && reduce_c == false) {
              if (iVar9 == 0) {
                puVar30 = (uint *)pMVar15;
                Mat::create(top_blob,uVar11,uVar12,sVar18,opt->blob_allocator);
              }
              else {
                puVar30 = (uint *)0x1;
                Mat::create(top_blob,1,uVar11,uVar12,sVar18,opt->blob_allocator);
              }
              if (0 < (int)uVar12) {
                sVar18 = bottom_blob->elemsize;
                if (iVar9 == 0) {
                  sVar17 = (size_t)top_blob->w;
                }
                else {
                  sVar17 = top_blob->cstep;
                }
                pvVar32 = bottom_blob->data;
                sVar39 = top_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                puVar30 = (uint *)top_blob->data;
                pMVar47 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    pMVar46 = (Mat *)0x0;
                    pvVar45 = pvVar32;
                    do {
                      auVar165 = ZEXT816(0xff7fffff);
                      if (0 < (int)uVar21) {
                        pMVar16 = (Mat *)0x0;
                        auVar165 = ZEXT816(0xff7fffff);
                        do {
                          fVar51 = *(float *)((long)pvVar45 + (long)pMVar16 * 4);
                          if (auVar165._0_4_ <= fVar51) {
                            auVar165._0_4_ = fVar51;
                          }
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar38 != pMVar16);
                      }
                      *(int *)((long)&((Mat *)puVar30)->data +
                              (long)pMVar46 * 4 + sVar17 * sVar39 * (long)pMVar47) = auVar165._0_4_;
                      pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                      pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                    } while (pMVar46 != pMVar15);
                  }
                  pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                  pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar5);
                } while (pMVar47 != pMVar27);
              }
            }
            else {
              puVar30 = (uint *)(ulong)CONCAT31(uVar6,bVar37 | bVar36 | bVar24);
              if (((bVar37 | bVar36) & 1) == 0 && bVar24 == 0) {
                if (iVar9 == 0) {
                  Mat::create(top_blob,uVar21,uVar11,sVar18,opt->blob_allocator);
                  puVar30 = (uint *)pMVar38;
                }
                else {
                  Mat::create(top_blob,uVar21,uVar11,1,sVar18,opt->blob_allocator);
                  puVar30 = (uint *)pMVar38;
                }
                auVar71 = _DAT_00514730;
                auVar151 = _DAT_00514720;
                auVar52 = _DAT_005140e0;
                uVar25 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar25) {
                  pvVar32 = top_blob->data;
                  lVar13 = (ulong)uVar25 - 1;
                  auVar110._8_4_ = (int)lVar13;
                  auVar110._0_8_ = lVar13;
                  auVar110._12_4_ = (int)((ulong)lVar13 >> 0x20);
                  uVar31 = 0;
                  auVar110 = auVar110 ^ _DAT_005140e0;
                  do {
                    auVar213._8_4_ = (int)uVar31;
                    auVar213._0_8_ = uVar31;
                    auVar213._12_4_ = (int)(uVar31 >> 0x20);
                    auVar285 = (auVar213 | auVar71) ^ auVar52;
                    iVar9 = auVar110._4_4_;
                    iVar10 = auVar110._12_4_;
                    if ((bool)(~(auVar285._4_4_ == iVar9 && auVar110._0_4_ < auVar285._0_4_ ||
                                iVar9 < auVar285._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar32 + uVar31 * 4) = 0xff7fffff;
                    }
                    if ((auVar285._12_4_ != iVar10 || auVar285._8_4_ <= auVar110._8_4_) &&
                        auVar285._12_4_ <= iVar10) {
                      *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 4) = 0xff7fffff;
                    }
                    auVar285 = (auVar213 | auVar151) ^ auVar52;
                    auVar268._0_4_ = -(uint)(auVar110._0_4_ < auVar285._0_4_);
                    auVar268._4_4_ = -(uint)(iVar9 < auVar285._4_4_);
                    auVar268._8_4_ = -(uint)(auVar110._8_4_ < auVar285._8_4_);
                    auVar268._12_4_ = -(uint)(iVar10 < auVar285._12_4_);
                    iVar9 = -(uint)(auVar285._4_4_ == iVar9);
                    iVar10 = -(uint)(auVar285._12_4_ == iVar10);
                    auVar290._4_4_ = iVar9;
                    auVar290._0_4_ = iVar9;
                    auVar290._8_4_ = iVar10;
                    auVar290._12_4_ = iVar10;
                    auVar214._4_4_ = auVar268._4_4_;
                    auVar214._0_4_ = auVar268._4_4_;
                    auVar214._8_4_ = auVar268._12_4_;
                    auVar214._12_4_ = auVar268._12_4_;
                    auVar215._8_4_ = 0xffffffff;
                    auVar215._0_8_ = 0xffffffffffffffff;
                    auVar215._12_4_ = 0xffffffff;
                    auVar215 = (auVar214 | auVar290 & auVar268) ^ auVar215;
                    if ((auVar215 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 8) = 0xff7fffff;
                    }
                    puVar30 = (uint *)(ulong)auVar215._8_2_;
                    if ((auVar215 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar31 = uVar31 + 4;
                  } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
                }
                if (0 < (int)uVar12) {
                  sVar18 = bottom_blob->elemsize;
                  sVar17 = bottom_blob->cstep;
                  pvVar32 = bottom_blob->data;
                  pvVar45 = top_blob->data;
                  puVar30 = (uint *)(ulong)uVar34;
                  pMVar15 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar34) {
                      pMVar38 = (Mat *)0x0;
                      do {
                        fVar2 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                        fVar51 = *(float *)((long)pvVar45 + (long)pMVar38 * 4);
                        if (fVar2 <= fVar51) {
                          fVar2 = fVar51;
                        }
                        *(float *)((long)pvVar45 + (long)pMVar38 * 4) = fVar2;
                        pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                      } while ((Mat *)puVar30 != pMVar38);
                    }
                    pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                    pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
                  } while (pMVar15 != pMVar27);
                }
              }
              else if (reduce_c == false && (bVar40 & 1) == 0) {
                if (iVar9 == 0) {
                  puVar30 = (uint *)pMVar38;
                  Mat::create(top_blob,uVar21,uVar12,sVar18,opt->blob_allocator);
                }
                else {
                  puVar30 = (uint *)(ulong)uVar21;
                  Mat::create(top_blob,uVar21,1,uVar12,sVar18,opt->blob_allocator);
                }
                auVar71 = _DAT_00514730;
                auVar151 = _DAT_00514720;
                auVar52 = _DAT_005140e0;
                uVar25 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar25) {
                  pvVar32 = top_blob->data;
                  lVar13 = (ulong)uVar25 - 1;
                  auVar113._8_4_ = (int)lVar13;
                  auVar113._0_8_ = lVar13;
                  auVar113._12_4_ = (int)((ulong)lVar13 >> 0x20);
                  uVar31 = 0;
                  auVar113 = auVar113 ^ _DAT_005140e0;
                  do {
                    auVar222._8_4_ = (int)uVar31;
                    auVar222._0_8_ = uVar31;
                    auVar222._12_4_ = (int)(uVar31 >> 0x20);
                    auVar285 = (auVar222 | auVar71) ^ auVar52;
                    iVar10 = auVar113._4_4_;
                    iVar264 = auVar113._12_4_;
                    if ((bool)(~(auVar285._4_4_ == iVar10 && auVar113._0_4_ < auVar285._0_4_ ||
                                iVar10 < auVar285._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar32 + uVar31 * 4) = 0xff7fffff;
                    }
                    if ((auVar285._12_4_ != iVar264 || auVar285._8_4_ <= auVar113._8_4_) &&
                        auVar285._12_4_ <= iVar264) {
                      *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 4) = 0xff7fffff;
                    }
                    auVar285 = (auVar222 | auVar151) ^ auVar52;
                    auVar271._0_4_ = -(uint)(auVar113._0_4_ < auVar285._0_4_);
                    auVar271._4_4_ = -(uint)(iVar10 < auVar285._4_4_);
                    auVar271._8_4_ = -(uint)(auVar113._8_4_ < auVar285._8_4_);
                    auVar271._12_4_ = -(uint)(iVar264 < auVar285._12_4_);
                    iVar10 = -(uint)(auVar285._4_4_ == iVar10);
                    iVar264 = -(uint)(auVar285._12_4_ == iVar264);
                    auVar293._4_4_ = iVar10;
                    auVar293._0_4_ = iVar10;
                    auVar293._8_4_ = iVar264;
                    auVar293._12_4_ = iVar264;
                    auVar223._4_4_ = auVar271._4_4_;
                    auVar223._0_4_ = auVar271._4_4_;
                    auVar223._8_4_ = auVar271._12_4_;
                    auVar223._12_4_ = auVar271._12_4_;
                    auVar224._8_4_ = 0xffffffff;
                    auVar224._0_8_ = 0xffffffffffffffff;
                    auVar224._12_4_ = 0xffffffff;
                    auVar224 = (auVar223 | auVar293 & auVar271) ^ auVar224;
                    if ((auVar224 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 8) = 0xff7fffff;
                    }
                    puVar30 = (uint *)(ulong)auVar224._8_2_;
                    if ((auVar224 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar31 = uVar31 + 4;
                  } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
                }
                if (0 < (int)uVar12) {
                  sVar18 = bottom_blob->elemsize;
                  if (iVar9 == 0) {
                    sVar17 = (size_t)top_blob->w;
                  }
                  else {
                    sVar17 = top_blob->cstep;
                  }
                  puVar30 = (uint *)bottom_blob->data;
                  pvVar32 = top_blob->data;
                  sVar39 = top_blob->elemsize;
                  sVar5 = bottom_blob->cstep;
                  pMVar15 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar25 = 0;
                      pMVar47 = (Mat *)puVar30;
                      do {
                        if (0 < (int)uVar21) {
                          pMVar46 = (Mat *)0x0;
                          do {
                            fVar2 = *(float *)((long)&pMVar47->data + (long)pMVar46 * 4);
                            fVar51 = *(float *)((long)pvVar32 + (long)pMVar46 * 4);
                            if (fVar2 <= fVar51) {
                              fVar2 = fVar51;
                            }
                            *(float *)((long)pvVar32 + (long)pMVar46 * 4) = fVar2;
                            pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                          } while (pMVar38 != pMVar46);
                        }
                        uVar25 = uVar25 + 1;
                        pMVar47 = (Mat *)((long)&pMVar47->data + (long)(int)uVar21 * 4);
                      } while (uVar25 != uVar11);
                    }
                    pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                    puVar30 = (uint *)((long)&((Mat *)puVar30)->data + sVar18 * sVar5);
                    pvVar32 = (void *)((long)pvVar32 + sVar17 * sVar39);
                  } while (pMVar15 != pMVar27);
                }
              }
            }
            break;
          }
          if (iVar9 == 0) {
            Mat::create(top_blob,uVar21,sVar18,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar21,1,1,sVar18,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar30 = (uint *)pMVar38;
          Mat::create(&local_c8,uVar21,1,uVar12,sVar18,opt->workspace_allocator);
          auVar71 = _DAT_00514730;
          auVar151 = _DAT_00514720;
          auVar52 = _DAT_005140e0;
          iVar10 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
            uVar25 = (int)local_c8.cstep * local_c8.c;
            if (0 < (int)uVar25) {
              lVar29 = (ulong)uVar25 - 1;
              auVar90._8_4_ = (int)lVar29;
              auVar90._0_8_ = lVar29;
              auVar90._12_4_ = (int)((ulong)lVar29 >> 0x20);
              uVar31 = 0;
              auVar90 = auVar90 ^ _DAT_005140e0;
              do {
                auVar195._8_4_ = (int)uVar31;
                auVar195._0_8_ = uVar31;
                auVar195._12_4_ = (int)(uVar31 >> 0x20);
                auVar285 = (auVar195 | auVar71) ^ auVar52;
                iVar9 = auVar90._4_4_;
                if ((bool)(~(auVar285._4_4_ == iVar9 && auVar90._0_4_ < auVar285._0_4_ ||
                            iVar9 < auVar285._4_4_) & 1)) {
                  *(undefined4 *)((long)(void **)local_c8.data + uVar31 * 4) = 0xff7fffff;
                }
                if ((auVar285._12_4_ != auVar90._12_4_ || auVar285._8_4_ <= auVar90._8_4_) &&
                    auVar285._12_4_ <= auVar90._12_4_) {
                  *(undefined4 *)((long)(void **)local_c8.data + uVar31 * 4 + 4) = 0xff7fffff;
                }
                auVar285 = (auVar195 | auVar151) ^ auVar52;
                iVar10 = auVar285._4_4_;
                if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar90._0_4_)) {
                  *(undefined4 *)((long)((long)local_c8.data + 8) + uVar31 * 4) = 0xff7fffff;
                  *(undefined4 *)((long)((long)local_c8.data + 8) + uVar31 * 4 + 4) = 0xff7fffff;
                }
                uVar31 = uVar31 + 4;
              } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
            }
            if (0 < (int)uVar12) {
              pvVar32 = bottom_blob->data;
              sVar18 = bottom_blob->elemsize;
              sVar17 = bottom_blob->cstep;
              pMVar47 = (Mat *)0x0;
              pMVar15 = (Mat *)local_c8.data;
              do {
                if (0 < (int)uVar11) {
                  uVar25 = 0;
                  pvVar45 = pvVar32;
                  do {
                    if (0 < (int)uVar21) {
                      pMVar46 = (Mat *)0x0;
                      do {
                        fVar2 = *(float *)((long)pvVar45 + (long)pMVar46 * 4);
                        fVar51 = *(float *)((long)&pMVar15->data + (long)pMVar46 * 4);
                        if (fVar2 <= fVar51) {
                          fVar2 = fVar51;
                        }
                        *(float *)((long)&pMVar15->data + (long)pMVar46 * 4) = fVar2;
                        pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                      } while (pMVar38 != pMVar46);
                    }
                    uVar25 = uVar25 + 1;
                    pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                  } while (uVar25 != uVar11);
                }
                pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
                pMVar15 = (Mat *)((long)&pMVar15->data +
                                 CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                                 local_c8.cstep);
              } while (pMVar47 != pMVar27);
            }
            auVar71 = _DAT_00514730;
            auVar151 = _DAT_00514720;
            auVar52 = _DAT_005140e0;
            uVar25 = top_blob->c * (int)top_blob->cstep;
            puVar30 = (uint *)top_blob;
            if (0 < (int)uVar25) {
              puVar30 = (uint *)top_blob->data;
              lVar13 = (ulong)uVar25 - 1;
              auVar91._8_4_ = (int)lVar13;
              auVar91._0_8_ = lVar13;
              auVar91._12_4_ = (int)((ulong)lVar13 >> 0x20);
              uVar31 = 0;
              auVar91 = auVar91 ^ _DAT_005140e0;
              do {
                auVar196._8_4_ = (int)uVar31;
                auVar196._0_8_ = uVar31;
                auVar196._12_4_ = (int)(uVar31 >> 0x20);
                auVar285 = (auVar196 | auVar71) ^ auVar52;
                iVar9 = auVar91._4_4_;
                if ((bool)(~(auVar285._4_4_ == iVar9 && auVar91._0_4_ < auVar285._0_4_ ||
                            iVar9 < auVar285._4_4_) & 1)) {
                  *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0xff7fffff;
                }
                if ((auVar285._12_4_ != auVar91._12_4_ || auVar285._8_4_ <= auVar91._8_4_) &&
                    auVar285._12_4_ <= auVar91._12_4_) {
                  *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0xff7fffff;
                }
                auVar285 = (auVar196 | auVar151) ^ auVar52;
                iVar10 = auVar285._4_4_;
                if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar91._0_4_)) {
                  *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0xff7fffff;
                  *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) = 0xff7fffff;
                }
                uVar31 = uVar31 + 4;
              } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
            }
            if (0 < (int)uVar12) {
              pvVar32 = top_blob->data;
              puVar30 = (uint *)0x0;
              pMVar15 = (Mat *)local_c8.data;
              do {
                if (0 < (int)uVar21) {
                  pMVar47 = (Mat *)0x0;
                  do {
                    fVar2 = *(float *)((long)&pMVar15->data + (long)pMVar47 * 4);
                    fVar51 = *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                    if (fVar2 <= fVar51) {
                      fVar2 = fVar51;
                    }
                    *(float *)((long)pvVar32 + (long)pMVar47 * 4) = fVar2;
                    pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                  } while (pMVar38 != pMVar47);
                }
                puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                pMVar15 = (Mat *)((long)&pMVar15->data +
                                 local_c8.cstep *
                                 CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
              } while ((Mat *)puVar30 != pMVar27);
            }
            iVar10 = 0;
          }
          piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar30 = (uint *)local_c8.data;
              if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        if (iVar9 == 0) {
          Mat::create(top_blob,1,sVar18,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,sVar18,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        Mat::create(&local_c8,uVar12,sVar18,opt->workspace_allocator);
        iVar10 = -100;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          if ((int)uVar12 < 1) {
            fVar51 = -3.4028235e+38;
          }
          else {
            sVar18 = bottom_blob->elemsize;
            sVar17 = bottom_blob->cstep;
            pvVar32 = bottom_blob->data;
            puVar30 = (uint *)(ulong)uVar34;
            pMVar15 = (Mat *)0x0;
            do {
              fVar51 = -3.4028235e+38;
              if (0 < (int)uVar34) {
                pMVar38 = (Mat *)0x0;
                fVar51 = -3.4028235e+38;
                do {
                  fVar2 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                  if (fVar51 <= fVar2) {
                    fVar51 = fVar2;
                  }
                  pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                } while ((Mat *)puVar30 != pMVar38);
              }
              *(float *)((long)(void **)local_c8.data + (long)pMVar15 * 4) = fVar51;
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
            } while (pMVar15 != pMVar27);
            fVar51 = -3.4028235e+38;
            pMVar15 = (Mat *)0x0;
            do {
              fVar2 = *(float *)((long)(void **)local_c8.data + (long)pMVar15 * 4);
              if (fVar51 <= fVar2) {
                fVar51 = fVar2;
              }
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
            } while (pMVar27 != pMVar15);
          }
          *(float *)top_blob->data = fVar51;
          iVar10 = 0;
        }
        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar30 = (uint *)local_c8.data;
            if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_00342105;
    case 4:
      uVar25 = bottom_blob->w;
      lVar13 = (long)(int)uVar25;
      uVar21 = bottom_blob->h;
      pMVar38 = (Mat *)(ulong)uVar21;
      uVar11 = bottom_blob->d;
      pMVar15 = (Mat *)(ulong)uVar11;
      uVar12 = bottom_blob->c;
      pMVar27 = (Mat *)(ulong)uVar12;
      uVar35 = uVar21 * uVar25;
      uVar34 = uVar35 * uVar11;
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar56._0_8_ = SUB168(auVar55 ^ auVar151,0) << 0x3f;
      auVar56._8_8_ = SUB168(auVar55 ^ auVar151,8) << 0x3f;
      iVar10 = movmskpd(uVar11,auVar56);
      bVar49 = iVar10 != 0;
      bVar24 = reduce_d ^ 1;
      bVar33 = reduce_c ^ 1;
      puVar30 = (uint *)pMVar27;
      if ((bVar49 || bVar24 != 0) || (bVar33 != 0)) {
        if ((!bVar49 && bVar24 == 0) && reduce_c == false) {
          if (iVar9 == 0) {
            Mat::create(top_blob,uVar12,sVar18,opt->blob_allocator);
          }
          else {
            puVar30 = (uint *)0x1;
            Mat::create(top_blob,1,1,1,uVar12,sVar18,opt->blob_allocator);
          }
          if (0 < (int)uVar12) {
            pvVar32 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            pvVar45 = top_blob->data;
            puVar30 = (uint *)(top_blob->elemsize * top_blob->cstep);
            sVar17 = bottom_blob->cstep;
            pMVar15 = (Mat *)0x0;
            do {
              fVar51 = -3.4028235e+38;
              if (0 < (int)uVar34) {
                uVar31 = 0;
                fVar51 = -3.4028235e+38;
                do {
                  fVar2 = *(float *)((long)pvVar32 + uVar31 * 4);
                  if (fVar51 <= fVar2) {
                    fVar51 = fVar2;
                  }
                  uVar31 = uVar31 + 1;
                } while (uVar34 != uVar31);
              }
              lVar13 = (long)puVar30 * (long)pMVar15;
              if (iVar9 == 0) {
                lVar13 = (long)pMVar15 * 4;
              }
              *(float *)((long)pvVar45 + lVar13) = fVar51;
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
            } while (pMVar15 != pMVar27);
          }
          break;
        }
        if ((bVar49 || reduce_d != false) || bVar33 != 0) {
          pMVar47 = (Mat *)(ulong)uVar25;
          bVar40 = (byte)iVar10 >> 1 | bVar37;
          if (((bVar40 & 1) == 0 && bVar24 == 0) && bVar33 == 0) {
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar21,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,uVar21,1,1,sVar18,opt->blob_allocator);
            }
            local_c8.cstep = 0;
            local_c8.data = (Mat *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            puVar30 = (uint *)0x1;
            Mat::create(&local_c8,1,uVar21,uVar12,sVar18,opt->workspace_allocator);
            auVar71 = _DAT_00514730;
            auVar151 = _DAT_00514720;
            auVar52 = _DAT_005140e0;
            iVar10 = -100;
            if (((Mat *)local_c8.data != (Mat *)0x0) &&
               (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
              uVar34 = (int)local_c8.cstep * local_c8.c;
              if (0 < (int)uVar34) {
                lVar29 = (ulong)uVar34 - 1;
                auVar92._8_4_ = (int)lVar29;
                auVar92._0_8_ = lVar29;
                auVar92._12_4_ = (int)((ulong)lVar29 >> 0x20);
                uVar31 = 0;
                auVar92 = auVar92 ^ _DAT_005140e0;
                do {
                  auVar197._8_4_ = (int)uVar31;
                  auVar197._0_8_ = uVar31;
                  auVar197._12_4_ = (int)(uVar31 >> 0x20);
                  auVar285 = (auVar197 | auVar71) ^ auVar52;
                  iVar9 = auVar92._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar92._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)(void **)local_c8.data + uVar31 * 4) = 0xff7fffff;
                  }
                  if ((auVar285._12_4_ != auVar92._12_4_ || auVar285._8_4_ <= auVar92._8_4_) &&
                      auVar285._12_4_ <= auVar92._12_4_) {
                    *(undefined4 *)((long)(void **)local_c8.data + uVar31 * 4 + 4) = 0xff7fffff;
                  }
                  auVar285 = (auVar197 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar92._0_4_)) {
                    *(undefined4 *)((long)((long)local_c8.data + 8) + uVar31 * 4) = 0xff7fffff;
                    *(undefined4 *)((long)((long)local_c8.data + 8) + uVar31 * 4 + 4) = 0xff7fffff;
                  }
                  uVar31 = uVar31 + 4;
                } while ((uVar34 + 3 & 0xfffffffc) != uVar31);
              }
              if (0 < (int)uVar12) {
                pvVar32 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar17 = bottom_blob->cstep;
                pMVar15 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    lVar29 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                             local_c8.cstep * (long)pMVar15;
                    pvVar45 = (void *)(sVar18 * sVar17 * (long)pMVar15 + (long)pvVar32);
                    uVar34 = 0;
                    do {
                      if (0 < (int)uVar21) {
                        pMVar46 = (Mat *)0x0;
                        do {
                          if (0 < (int)uVar25) {
                            auVar93 = ZEXT416(*(uint *)((long)(void **)local_c8.data +
                                                       (long)pMVar46 * 4 + lVar29));
                            pMVar16 = (Mat *)0x0;
                            do {
                              fVar51 = *(float *)((long)pvVar45 + (long)pMVar16 * 4);
                              if (auVar93._0_4_ <= fVar51) {
                                auVar93._0_4_ = fVar51;
                              }
                              *(int *)((long)(void **)local_c8.data + (long)pMVar46 * 4 + lVar29) =
                                   auVar93._0_4_;
                              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                            } while (pMVar47 != pMVar16);
                          }
                          pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                          pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                        } while (pMVar46 != pMVar38);
                      }
                      uVar34 = uVar34 + 1;
                    } while (uVar34 != uVar11);
                  }
                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                } while (pMVar15 != pMVar27);
              }
              auVar71 = _DAT_00514730;
              auVar151 = _DAT_00514720;
              auVar52 = _DAT_005140e0;
              uVar25 = top_blob->c * (int)top_blob->cstep;
              puVar30 = (uint *)top_blob;
              if (0 < (int)uVar25) {
                puVar30 = (uint *)top_blob->data;
                lVar13 = (ulong)uVar25 - 1;
                auVar94._8_4_ = (int)lVar13;
                auVar94._0_8_ = lVar13;
                auVar94._12_4_ = (int)((ulong)lVar13 >> 0x20);
                uVar31 = 0;
                auVar94 = auVar94 ^ _DAT_005140e0;
                do {
                  auVar198._8_4_ = (int)uVar31;
                  auVar198._0_8_ = uVar31;
                  auVar198._12_4_ = (int)(uVar31 >> 0x20);
                  auVar285 = (auVar198 | auVar71) ^ auVar52;
                  iVar9 = auVar94._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar94._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0xff7fffff;
                  }
                  if ((auVar285._12_4_ != auVar94._12_4_ || auVar285._8_4_ <= auVar94._8_4_) &&
                      auVar285._12_4_ <= auVar94._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0xff7fffff;
                  }
                  auVar285 = (auVar198 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar94._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0xff7fffff;
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) = 0xff7fffff
                    ;
                  }
                  uVar31 = uVar31 + 4;
                } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
              }
              if (0 < (int)uVar12) {
                pvVar32 = top_blob->data;
                puVar30 = (uint *)0x0;
                pMVar15 = (Mat *)local_c8.data;
                do {
                  if (0 < (int)uVar21) {
                    pMVar47 = (Mat *)0x0;
                    do {
                      fVar2 = *(float *)((long)&pMVar15->data + (long)pMVar47 * 4);
                      fVar51 = *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                      if (fVar2 <= fVar51) {
                        fVar2 = fVar51;
                      }
                      *(float *)((long)pvVar32 + (long)pMVar47 * 4) = fVar2;
                      pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                    } while (pMVar38 != pMVar47);
                  }
                  puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                  pMVar15 = (Mat *)((long)&pMVar15->data +
                                   local_c8.cstep *
                                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
                } while ((Mat *)puVar30 != pMVar27);
              }
              iVar10 = 0;
            }
            piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                puVar30 = (uint *)local_c8.data;
                if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          else {
            bVar28 = (byte)iVar10 | bVar36;
            if (((bVar28 & 1) == 0 && bVar24 == 0) && bVar33 == 0) {
              if (iVar9 == 0) {
                Mat::create(top_blob,uVar25,sVar18,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar25,1,1,1,sVar18,opt->blob_allocator);
              }
              local_c8.cstep = 0;
              local_c8.data = (Mat *)0x0;
              local_c8.refcount._0_4_ = 0;
              local_c8.refcount._4_4_ = 0;
              local_c8.elemsize._0_4_ = 0;
              local_c8.elemsize._4_4_ = 0;
              local_c8.elempack = 0;
              local_c8.allocator = (Allocator *)0x0;
              local_c8.dims = 0;
              local_c8.w = 0;
              local_c8.h = 0;
              local_c8.d = 0;
              local_c8.c = 0;
              puVar30 = (uint *)(ulong)uVar25;
              Mat::create(&local_c8,uVar25,1,uVar12,sVar18,opt->workspace_allocator);
              auVar71 = _DAT_00514730;
              auVar151 = _DAT_00514720;
              auVar52 = _DAT_005140e0;
              iVar10 = -100;
              if (((Mat *)local_c8.data != (Mat *)0x0) &&
                 (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
                uVar34 = (int)local_c8.cstep * local_c8.c;
                if (0 < (int)uVar34) {
                  lVar29 = (ulong)uVar34 - 1;
                  auVar104._8_4_ = (int)lVar29;
                  auVar104._0_8_ = lVar29;
                  auVar104._12_4_ = (int)((ulong)lVar29 >> 0x20);
                  puVar30 = (uint *)0x0;
                  auVar104 = auVar104 ^ _DAT_005140e0;
                  do {
                    auVar207._8_4_ = (int)puVar30;
                    auVar207._0_8_ = puVar30;
                    auVar207._12_4_ = (int)((ulong)puVar30 >> 0x20);
                    auVar285 = (auVar207 | auVar71) ^ auVar52;
                    iVar9 = auVar104._4_4_;
                    if ((bool)(~(auVar285._4_4_ == iVar9 && auVar104._0_4_ < auVar285._0_4_ ||
                                iVar9 < auVar285._4_4_) & 1)) {
                      *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) = 0xff7fffff
                      ;
                    }
                    if ((auVar285._12_4_ != auVar104._12_4_ || auVar285._8_4_ <= auVar104._8_4_) &&
                        auVar285._12_4_ <= auVar104._12_4_) {
                      *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                           0xff7fffff;
                    }
                    auVar285 = (auVar207 | auVar151) ^ auVar52;
                    iVar10 = auVar285._4_4_;
                    if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar104._0_4_)) {
                      *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                           0xff7fffff;
                      *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                           0xff7fffff;
                    }
                    puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                  } while ((Mat *)(ulong)(uVar34 + 3 & 0xfffffffc) != (Mat *)puVar30);
                }
                if (0 < (int)uVar12) {
                  pvVar32 = bottom_blob->data;
                  puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar38 = (Mat *)0x0;
                  pMVar15 = (Mat *)local_c8.data;
                  do {
                    if (0 < (int)uVar11) {
                      pvVar45 = (void *)((long)puVar30 * (long)pMVar38 + (long)pvVar32);
                      uVar34 = 0;
                      do {
                        if (0 < (int)uVar21) {
                          uVar35 = 0;
                          do {
                            if (0 < (int)uVar25) {
                              pMVar46 = (Mat *)0x0;
                              do {
                                fVar2 = *(float *)((long)pvVar45 + (long)pMVar46 * 4);
                                fVar51 = *(float *)((long)&pMVar15->data + (long)pMVar46 * 4);
                                if (fVar2 <= fVar51) {
                                  fVar2 = fVar51;
                                }
                                *(float *)((long)&pMVar15->data + (long)pMVar46 * 4) = fVar2;
                                pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                              } while (pMVar47 != pMVar46);
                            }
                            pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                            uVar35 = uVar35 + 1;
                          } while (uVar35 != uVar21);
                        }
                        uVar34 = uVar34 + 1;
                      } while (uVar34 != uVar11);
                    }
                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                    pMVar15 = (Mat *)((long)&pMVar15->data +
                                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                                     * local_c8.cstep);
                  } while (pMVar38 != pMVar27);
                }
                auVar71 = _DAT_00514730;
                auVar151 = _DAT_00514720;
                auVar52 = _DAT_005140e0;
                uVar21 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar21) {
                  puVar30 = (uint *)top_blob->data;
                  lVar13 = (ulong)uVar21 - 1;
                  auVar105._8_4_ = (int)lVar13;
                  auVar105._0_8_ = lVar13;
                  auVar105._12_4_ = (int)((ulong)lVar13 >> 0x20);
                  uVar31 = 0;
                  auVar105 = auVar105 ^ _DAT_005140e0;
                  do {
                    auVar208._8_4_ = (int)uVar31;
                    auVar208._0_8_ = uVar31;
                    auVar208._12_4_ = (int)(uVar31 >> 0x20);
                    auVar285 = (auVar208 | auVar71) ^ auVar52;
                    iVar9 = auVar105._4_4_;
                    if ((bool)(~(auVar285._4_4_ == iVar9 && auVar105._0_4_ < auVar285._0_4_ ||
                                iVar9 < auVar285._4_4_) & 1)) {
                      *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0xff7fffff;
                    }
                    if ((auVar285._12_4_ != auVar105._12_4_ || auVar285._8_4_ <= auVar105._8_4_) &&
                        auVar285._12_4_ <= auVar105._12_4_) {
                      *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0xff7fffff;
                    }
                    auVar285 = (auVar208 | auVar151) ^ auVar52;
                    iVar10 = auVar285._4_4_;
                    if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar105._0_4_)) {
                      *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0xff7fffff;
                      *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) =
                           0xff7fffff;
                    }
                    uVar31 = uVar31 + 4;
                  } while ((uVar21 + 3 & 0xfffffffc) != uVar31);
                }
                if (0 < (int)uVar12) {
                  pvVar32 = top_blob->data;
                  puVar30 = (uint *)0x0;
                  pMVar15 = (Mat *)local_c8.data;
                  do {
                    if (0 < (int)uVar25) {
                      pMVar38 = (Mat *)0x0;
                      do {
                        fVar2 = *(float *)((long)&pMVar15->data + (long)pMVar38 * 4);
                        fVar51 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                        if (fVar2 <= fVar51) {
                          fVar2 = fVar51;
                        }
                        *(float *)((long)pvVar32 + (long)pMVar38 * 4) = fVar2;
                        pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                      } while (pMVar47 != pMVar38);
                    }
                    puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                    pMVar15 = (Mat *)((long)&pMVar15->data +
                                     local_c8.cstep *
                                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                                     );
                  } while ((Mat *)puVar30 != pMVar27);
                }
                iVar10 = 0;
              }
              piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  puVar30 = (uint *)local_c8.data;
                  if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            else {
              if ((!bVar49 && reduce_d == false) && reduce_c == false) {
                if (iVar9 == 0) {
                  puVar30 = (uint *)pMVar15;
                  Mat::create(top_blob,uVar11,uVar12,sVar18,opt->blob_allocator);
                }
                else {
                  puVar30 = (uint *)0x1;
                  Mat::create(top_blob,1,1,uVar11,uVar12,sVar18,opt->blob_allocator);
                }
                if (0 < (int)uVar12) {
                  sVar18 = bottom_blob->elemsize;
                  if (iVar9 == 0) {
                    sVar17 = (size_t)top_blob->w;
                  }
                  else {
                    sVar17 = top_blob->cstep;
                  }
                  puVar30 = (uint *)bottom_blob->data;
                  pvVar32 = top_blob->data;
                  sVar39 = top_blob->elemsize;
                  sVar5 = bottom_blob->cstep;
                  pMVar38 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      pMVar46 = (Mat *)0x0;
                      pMVar47 = (Mat *)puVar30;
                      do {
                        auVar168 = ZEXT816(0xff7fffff);
                        if (0 < (int)uVar35) {
                          uVar31 = 0;
                          auVar168 = ZEXT816(0xff7fffff);
                          do {
                            fVar51 = *(float *)((long)&pMVar47->data + uVar31 * 4);
                            if (auVar168._0_4_ <= fVar51) {
                              auVar168._0_4_ = fVar51;
                            }
                            uVar31 = uVar31 + 1;
                          } while (uVar35 != uVar31);
                        }
                        *(int *)((long)pvVar32 + (long)pMVar46 * 4 + sVar17 * sVar39 * (long)pMVar38
                                ) = auVar168._0_4_;
                        pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                        pMVar47 = (Mat *)((long)&pMVar47->data + (long)(int)uVar35 * 4);
                      } while (pMVar46 != pMVar15);
                    }
                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                    puVar30 = (uint *)((long)&((Mat *)puVar30)->data + sVar18 * sVar5);
                  } while (pMVar38 != pMVar27);
                }
                break;
              }
              if (((bVar40 & 1) == 0 && reduce_d == false) && bVar33 == 0) {
                if (iVar9 == 0) {
                  Mat::create(top_blob,uVar21,uVar11,sVar18,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,1,uVar21,uVar11,1,sVar18,opt->blob_allocator);
                }
                local_c8.cstep = 0;
                local_c8.data = (Mat *)0x0;
                local_c8.refcount._0_4_ = 0;
                local_c8.refcount._4_4_ = 0;
                local_c8.elemsize._0_4_ = 0;
                local_c8.elemsize._4_4_ = 0;
                local_c8.elempack = 0;
                local_c8.allocator = (Allocator *)0x0;
                local_c8.dims = 0;
                local_c8.w = 0;
                local_c8.h = 0;
                local_c8.d = 0;
                local_c8.c = 0;
                puVar30 = (uint *)pMVar38;
                Mat::create(&local_c8,uVar21,uVar11,uVar12,sVar18,opt->workspace_allocator);
                auVar71 = _DAT_00514730;
                auVar151 = _DAT_00514720;
                auVar52 = _DAT_005140e0;
                iVar10 = -100;
                if (((Mat *)local_c8.data != (Mat *)0x0) &&
                   (puVar30 = (uint *)local_c8.cstep, local_c8.cstep * (long)local_c8.c != 0)) {
                  uVar34 = (int)local_c8.cstep * local_c8.c;
                  if (0 < (int)uVar34) {
                    lVar29 = (ulong)uVar34 - 1;
                    auVar114._8_4_ = (int)lVar29;
                    auVar114._0_8_ = lVar29;
                    auVar114._12_4_ = (int)((ulong)lVar29 >> 0x20);
                    puVar30 = (uint *)0x0;
                    auVar114 = auVar114 ^ _DAT_005140e0;
                    do {
                      auVar225._8_4_ = (int)puVar30;
                      auVar225._0_8_ = puVar30;
                      auVar225._12_4_ = (int)((ulong)puVar30 >> 0x20);
                      auVar285 = (auVar225 | auVar71) ^ auVar52;
                      iVar10 = auVar114._4_4_;
                      if ((bool)(~(auVar285._4_4_ == iVar10 && auVar114._0_4_ < auVar285._0_4_ ||
                                  iVar10 < auVar285._4_4_) & 1)) {
                        *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) =
                             0xff7fffff;
                      }
                      if ((auVar285._12_4_ != auVar114._12_4_ || auVar285._8_4_ <= auVar114._8_4_)
                          && auVar285._12_4_ <= auVar114._12_4_) {
                        *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                             0xff7fffff;
                      }
                      auVar285 = (auVar225 | auVar151) ^ auVar52;
                      iVar264 = auVar285._4_4_;
                      if (iVar264 <= iVar10 &&
                          (iVar264 != iVar10 || auVar285._0_4_ <= auVar114._0_4_)) {
                        *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                             0xff7fffff;
                        *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                             0xff7fffff;
                      }
                      puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                    } while ((Mat *)(ulong)(uVar34 + 3 & 0xfffffffc) != (Mat *)puVar30);
                  }
                  if (0 < (int)uVar12) {
                    pvVar32 = bottom_blob->data;
                    puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar46 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar11) {
                        pvVar45 = (void *)((long)puVar30 * (long)pMVar46 + (long)pvVar32);
                        pMVar16 = (Mat *)0x0;
                        do {
                          if (0 < (int)uVar21) {
                            lVar29 = (long)local_c8.w *
                                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                                     * (long)pMVar16 +
                                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                                     * local_c8.cstep * (long)pMVar46;
                            pMVar43 = (Mat *)0x0;
                            do {
                              if (0 < (int)uVar25) {
                                auVar115 = ZEXT416(*(uint *)((long)(void **)local_c8.data +
                                                            (long)pMVar43 * 4 + lVar29));
                                pMVar26 = (Mat *)0x0;
                                do {
                                  fVar51 = *(float *)((long)pvVar45 + (long)pMVar26 * 4);
                                  if (auVar115._0_4_ <= fVar51) {
                                    auVar115._0_4_ = fVar51;
                                  }
                                  *(int *)((long)(void **)local_c8.data + (long)pMVar43 * 4 + lVar29
                                          ) = auVar115._0_4_;
                                  pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                } while (pMVar47 != pMVar26);
                              }
                              pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                              pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                            } while (pMVar43 != pMVar38);
                          }
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar16 != pMVar15);
                      }
                      pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                    } while (pMVar46 != pMVar27);
                  }
                  auVar71 = _DAT_00514730;
                  auVar151 = _DAT_00514720;
                  auVar52 = _DAT_005140e0;
                  uVar25 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar25) {
                    puVar30 = (uint *)top_blob->data;
                    lVar13 = (ulong)uVar25 - 1;
                    auVar116._8_4_ = (int)lVar13;
                    auVar116._0_8_ = lVar13;
                    auVar116._12_4_ = (int)((ulong)lVar13 >> 0x20);
                    uVar31 = 0;
                    auVar116 = auVar116 ^ _DAT_005140e0;
                    do {
                      auVar226._8_4_ = (int)uVar31;
                      auVar226._0_8_ = uVar31;
                      auVar226._12_4_ = (int)(uVar31 >> 0x20);
                      auVar285 = (auVar226 | auVar71) ^ auVar52;
                      iVar10 = auVar116._4_4_;
                      if ((bool)(~(auVar285._4_4_ == iVar10 && auVar116._0_4_ < auVar285._0_4_ ||
                                  iVar10 < auVar285._4_4_) & 1)) {
                        *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0xff7fffff;
                      }
                      if ((auVar285._12_4_ != auVar116._12_4_ || auVar285._8_4_ <= auVar116._8_4_)
                          && auVar285._12_4_ <= auVar116._12_4_) {
                        *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0xff7fffff
                        ;
                      }
                      auVar285 = (auVar226 | auVar151) ^ auVar52;
                      iVar264 = auVar285._4_4_;
                      if (iVar264 <= iVar10 &&
                          (iVar264 != iVar10 || auVar285._0_4_ <= auVar116._0_4_)) {
                        *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0xff7fffff
                        ;
                        *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) =
                             0xff7fffff;
                      }
                      uVar31 = uVar31 + 4;
                    } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
                  }
                  if (0 < (int)uVar12) {
                    puVar30 = (uint *)0x0;
                    pMVar47 = (Mat *)local_c8.data;
                    do {
                      if (0 < (int)uVar11) {
                        iVar10 = 1;
                        if (iVar9 != 0) {
                          iVar10 = top_blob->h;
                        }
                        iVar264 = top_blob->w;
                        sVar18 = top_blob->elemsize;
                        pvVar32 = top_blob->data;
                        pMVar16 = (Mat *)0x0;
                        pMVar46 = pMVar47;
                        do {
                          if (0 < (int)uVar21) {
                            pMVar43 = (Mat *)0x0;
                            do {
                              fVar2 = *(float *)((long)&pMVar46->data + (long)pMVar43 * 4);
                              fVar51 = *(float *)((long)pvVar32 + (long)pMVar43 * 4);
                              if (fVar2 <= fVar51) {
                                fVar2 = fVar51;
                              }
                              *(float *)((long)pvVar32 + (long)pMVar43 * 4) = fVar2;
                              pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                            } while (pMVar38 != pMVar43);
                          }
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          pMVar46 = (Mat *)((long)&pMVar46->data +
                                           (long)local_c8.w *
                                           CONCAT44(local_c8.elemsize._4_4_,
                                                    (undefined4)local_c8.elemsize));
                          pvVar32 = (void *)((long)pvVar32 + (long)iVar10 * sVar18 * (long)iVar264);
                        } while (pMVar16 != pMVar15);
                      }
                      puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                      pMVar47 = (Mat *)((long)&pMVar47->data +
                                       local_c8.cstep *
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize));
                    } while ((Mat *)puVar30 != pMVar27);
                  }
                  iVar10 = 0;
                }
                piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                if (piVar7 != (int *)0x0) {
                  LOCK();
                  *piVar7 = *piVar7 + -1;
                  UNLOCK();
                  if (*piVar7 == 0) {
                    puVar30 = (uint *)local_c8.data;
                    if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                    (*(local_c8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              else {
                bVar37 = bVar37 | bVar36;
                if ((bVar24 != 0 || (bVar37 & 1) != 0) || bVar33 != 0) {
                  if (((bVar40 & 1) == 0 && bVar24 == 0) && reduce_c == false) {
                    if (iVar9 == 0) {
                      puVar30 = (uint *)(ulong)uVar21;
                      Mat::create(top_blob,uVar21,uVar12,sVar18,opt->blob_allocator);
                    }
                    else {
                      puVar30 = (uint *)0x1;
                      Mat::create(top_blob,1,uVar21,1,uVar12,sVar18,opt->blob_allocator);
                    }
                    auVar71 = _DAT_00514730;
                    auVar151 = _DAT_00514720;
                    auVar52 = _DAT_005140e0;
                    if (0 < (int)uVar12) {
                      sVar18 = bottom_blob->elemsize;
                      pvVar32 = top_blob->data;
                      if (iVar9 == 0) {
                        sVar17 = (size_t)top_blob->w;
                      }
                      else {
                        sVar17 = top_blob->cstep;
                      }
                      puVar30 = (uint *)bottom_blob->data;
                      sVar39 = bottom_blob->cstep;
                      lVar23 = sVar17 * top_blob->elemsize;
                      puVar1 = (undefined1 *)((long)&pMVar38[-1].cstep + 7);
                      auVar130._8_4_ = (int)puVar1;
                      auVar130._0_8_ = puVar1;
                      auVar130._12_4_ = (int)((ulong)puVar1 >> 0x20);
                      lVar29 = (long)pvVar32 + 0xc;
                      pMVar15 = (Mat *)0x0;
                      auVar130 = auVar130 ^ _DAT_005140e0;
                      do {
                        if (0 < (int)uVar21) {
                          lVar41 = 0;
                          auVar274 = auVar71;
                          auVar296 = auVar151;
                          do {
                            auVar285 = auVar274 ^ auVar52;
                            iVar9 = auVar130._4_4_;
                            if ((bool)(~(auVar285._4_4_ == iVar9 && auVar130._0_4_ < auVar285._0_4_
                                        || iVar9 < auVar285._4_4_) & 1)) {
                              *(undefined4 *)(lVar29 + -0xc + lVar41) = 0xff7fffff;
                            }
                            if ((auVar285._12_4_ != auVar130._12_4_ ||
                                auVar285._8_4_ <= auVar130._8_4_) &&
                                auVar285._12_4_ <= auVar130._12_4_) {
                              *(undefined4 *)(lVar29 + -8 + lVar41) = 0xff7fffff;
                            }
                            auVar285 = auVar296 ^ auVar52;
                            iVar10 = auVar285._4_4_;
                            if (iVar10 <= iVar9 &&
                                (iVar10 != iVar9 || auVar285._0_4_ <= auVar130._0_4_)) {
                              *(undefined4 *)(lVar29 + -4 + lVar41) = 0xff7fffff;
                              *(undefined4 *)(lVar29 + lVar41) = 0xff7fffff;
                            }
                            lVar286 = auVar274._8_8_;
                            auVar274._0_8_ = auVar274._0_8_ + 4;
                            auVar274._8_8_ = lVar286 + 4;
                            lVar286 = auVar296._8_8_;
                            auVar296._0_8_ = auVar296._0_8_ + 4;
                            auVar296._8_8_ = lVar286 + 4;
                            lVar41 = lVar41 + 0x10;
                          } while ((ulong)(uVar21 + 3 >> 2) << 4 != lVar41);
                        }
                        if (0 < (int)uVar11) {
                          ppvVar42 = (void **)((long)&((Mat *)puVar30)->data +
                                              sVar18 * sVar39 * (long)pMVar15);
                          lVar41 = lVar23 * (long)pMVar15;
                          uVar12 = 0;
                          do {
                            if (0 < (int)uVar21) {
                              pMVar46 = (Mat *)0x0;
                              do {
                                if (0 < (int)uVar25) {
                                  auVar275 = ZEXT416(*(uint *)((long)pvVar32 +
                                                              (long)pMVar46 * 4 + lVar41));
                                  pMVar16 = (Mat *)0x0;
                                  do {
                                    fVar51 = *(float *)((long)ppvVar42 + (long)pMVar16 * 4);
                                    if (auVar275._0_4_ <= fVar51) {
                                      auVar275._0_4_ = fVar51;
                                    }
                                    *(int *)((long)pvVar32 + (long)pMVar46 * 4 + lVar41) =
                                         auVar275._0_4_;
                                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                                  } while (pMVar47 != pMVar16);
                                }
                                ppvVar42 = (void **)((long)ppvVar42 + lVar13 * 4);
                                pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                              } while (pMVar46 != pMVar38);
                            }
                            uVar12 = uVar12 + 1;
                          } while (uVar12 != uVar11);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        lVar29 = lVar29 + lVar23;
                      } while (pMVar15 != pMVar27);
                    }
                  }
                  else {
                    puVar30 = (uint *)pMVar47;
                    if (((bVar28 & 1) == 0 && reduce_d == false) && bVar33 == 0) {
                      if (iVar9 == 0) {
                        Mat::create(top_blob,uVar25,uVar11,sVar18,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar25,1,uVar11,1,sVar18,opt->blob_allocator);
                      }
                      local_c8.cstep = 0;
                      local_c8.data = (Mat *)0x0;
                      local_c8.refcount._0_4_ = 0;
                      local_c8.refcount._4_4_ = 0;
                      local_c8.elemsize._0_4_ = 0;
                      local_c8.elemsize._4_4_ = 0;
                      local_c8.elempack = 0;
                      local_c8.allocator = (Allocator *)0x0;
                      local_c8.dims = 0;
                      local_c8.w = 0;
                      local_c8.h = 0;
                      local_c8.d = 0;
                      local_c8.c = 0;
                      Mat::create(&local_c8,uVar25,uVar11,uVar12,sVar18,opt->workspace_allocator);
                      auVar71 = _DAT_00514730;
                      auVar151 = _DAT_00514720;
                      auVar52 = _DAT_005140e0;
                      iVar10 = -100;
                      if (((Mat *)local_c8.data != (Mat *)0x0) &&
                         (local_c8.cstep * (long)local_c8.c != 0)) {
                        uVar34 = (int)local_c8.cstep * local_c8.c;
                        if (0 < (int)uVar34) {
                          lVar29 = (ulong)uVar34 - 1;
                          auVar133._8_4_ = (int)lVar29;
                          auVar133._0_8_ = lVar29;
                          auVar133._12_4_ = (int)((ulong)lVar29 >> 0x20);
                          puVar30 = (uint *)0x0;
                          auVar133 = auVar133 ^ _DAT_005140e0;
                          do {
                            auVar243._8_4_ = (int)puVar30;
                            auVar243._0_8_ = puVar30;
                            auVar243._12_4_ = (int)((ulong)puVar30 >> 0x20);
                            auVar285 = (auVar243 | auVar71) ^ auVar52;
                            iVar9 = auVar133._4_4_;
                            if ((bool)(~(auVar285._4_4_ == iVar9 && auVar133._0_4_ < auVar285._0_4_
                                        || iVar9 < auVar285._4_4_) & 1)) {
                              *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) =
                                   0xff7fffff;
                            }
                            if ((auVar285._12_4_ != auVar133._12_4_ ||
                                auVar285._8_4_ <= auVar133._8_4_) &&
                                auVar285._12_4_ <= auVar133._12_4_) {
                              *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4)
                                   = 0xff7fffff;
                            }
                            auVar285 = (auVar243 | auVar151) ^ auVar52;
                            iVar10 = auVar285._4_4_;
                            if (iVar10 <= iVar9 &&
                                (iVar10 != iVar9 || auVar285._0_4_ <= auVar133._0_4_)) {
                              *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                                   0xff7fffff;
                              *(undefined4 *)
                               ((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                                   0xff7fffff;
                            }
                            puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                          } while ((Mat *)(ulong)(uVar34 + 3 & 0xfffffffc) != (Mat *)puVar30);
                        }
                        if (0 < (int)uVar12) {
                          pvVar32 = bottom_blob->data;
                          puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                          pMVar46 = (Mat *)0x0;
                          pMVar38 = (Mat *)local_c8.data;
                          do {
                            if (0 < (int)uVar11) {
                              pvVar45 = (void *)((long)puVar30 * (long)pMVar46 + (long)pvVar32);
                              pMVar43 = (Mat *)0x0;
                              pMVar16 = pMVar38;
                              do {
                                if (0 < (int)uVar21) {
                                  uVar34 = 0;
                                  do {
                                    if (0 < (int)uVar25) {
                                      pMVar26 = (Mat *)0x0;
                                      do {
                                        fVar2 = *(float *)((long)pvVar45 + (long)pMVar26 * 4);
                                        fVar51 = *(float *)((long)&pMVar16->data + (long)pMVar26 * 4
                                                           );
                                        if (fVar2 <= fVar51) {
                                          fVar2 = fVar51;
                                        }
                                        *(float *)((long)&pMVar16->data + (long)pMVar26 * 4) = fVar2
                                        ;
                                        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                      } while (pMVar47 != pMVar26);
                                    }
                                    pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                                    uVar34 = uVar34 + 1;
                                  } while (uVar34 != uVar21);
                                }
                                pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                                pMVar16 = (Mat *)((long)&pMVar16->data +
                                                 (long)local_c8.w *
                                                 CONCAT44(local_c8.elemsize._4_4_,
                                                          (undefined4)local_c8.elemsize));
                              } while (pMVar43 != pMVar15);
                            }
                            pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                            pMVar38 = (Mat *)((long)&pMVar38->data +
                                             CONCAT44(local_c8.elemsize._4_4_,
                                                      (undefined4)local_c8.elemsize) *
                                             local_c8.cstep);
                          } while (pMVar46 != pMVar27);
                        }
                        auVar71 = _DAT_00514730;
                        auVar151 = _DAT_00514720;
                        auVar52 = _DAT_005140e0;
                        uVar21 = top_blob->c * (int)top_blob->cstep;
                        if (0 < (int)uVar21) {
                          puVar30 = (uint *)top_blob->data;
                          lVar13 = (ulong)uVar21 - 1;
                          auVar134._8_4_ = (int)lVar13;
                          auVar134._0_8_ = lVar13;
                          auVar134._12_4_ = (int)((ulong)lVar13 >> 0x20);
                          uVar31 = 0;
                          auVar134 = auVar134 ^ _DAT_005140e0;
                          do {
                            auVar244._8_4_ = (int)uVar31;
                            auVar244._0_8_ = uVar31;
                            auVar244._12_4_ = (int)(uVar31 >> 0x20);
                            auVar285 = (auVar244 | auVar71) ^ auVar52;
                            iVar9 = auVar134._4_4_;
                            if ((bool)(~(auVar285._4_4_ == iVar9 && auVar134._0_4_ < auVar285._0_4_
                                        || iVar9 < auVar285._4_4_) & 1)) {
                              *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) =
                                   0xff7fffff;
                            }
                            if ((auVar285._12_4_ != auVar134._12_4_ ||
                                auVar285._8_4_ <= auVar134._8_4_) &&
                                auVar285._12_4_ <= auVar134._12_4_) {
                              *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) =
                                   0xff7fffff;
                            }
                            auVar285 = (auVar244 | auVar151) ^ auVar52;
                            iVar10 = auVar285._4_4_;
                            if (iVar10 <= iVar9 &&
                                (iVar10 != iVar9 || auVar285._0_4_ <= auVar134._0_4_)) {
                              *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) =
                                   0xff7fffff;
                              *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) =
                                   0xff7fffff;
                            }
                            uVar31 = uVar31 + 4;
                          } while ((uVar21 + 3 & 0xfffffffc) != uVar31);
                        }
                        if (0 < (int)uVar12) {
                          puVar30 = (uint *)top_blob->data;
                          iVar9 = top_blob->w;
                          sVar18 = top_blob->elemsize;
                          pMVar46 = (Mat *)0x0;
                          pMVar38 = (Mat *)local_c8.data;
                          do {
                            if (0 < (int)uVar11) {
                              pMVar26 = (Mat *)0x0;
                              pMVar16 = (Mat *)puVar30;
                              pMVar43 = pMVar38;
                              do {
                                if (0 < (int)uVar25) {
                                  pMVar22 = (Mat *)0x0;
                                  do {
                                    fVar2 = *(float *)((long)&pMVar43->data + (long)pMVar22 * 4);
                                    fVar51 = *(float *)((long)&pMVar16->data + (long)pMVar22 * 4);
                                    if (fVar2 <= fVar51) {
                                      fVar2 = fVar51;
                                    }
                                    *(float *)((long)&pMVar16->data + (long)pMVar22 * 4) = fVar2;
                                    pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                                  } while (pMVar47 != pMVar22);
                                }
                                pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                pMVar43 = (Mat *)((long)&pMVar43->data +
                                                 (long)local_c8.w *
                                                 CONCAT44(local_c8.elemsize._4_4_,
                                                          (undefined4)local_c8.elemsize));
                                pMVar16 = (Mat *)((long)&pMVar16->data + (long)iVar9 * sVar18);
                              } while (pMVar26 != pMVar15);
                            }
                            pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                            pMVar38 = (Mat *)((long)&pMVar38->data +
                                             local_c8.cstep *
                                             CONCAT44(local_c8.elemsize._4_4_,
                                                      (undefined4)local_c8.elemsize));
                          } while (pMVar46 != pMVar27);
                        }
                        iVar10 = 0;
                      }
                      piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                      if (piVar7 != (int *)0x0) {
                        LOCK();
                        *piVar7 = *piVar7 + -1;
                        UNLOCK();
                        if (*piVar7 == 0) {
                          puVar30 = (uint *)local_c8.data;
                          if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                          (*(local_c8.allocator)->_vptr_Allocator[3])();
                        }
                      }
                      goto LAB_00342105;
                    }
                    if (((bVar28 & 1) == 0 && bVar24 == 0) && reduce_c == false) {
                      if (iVar9 == 0) {
                        Mat::create(top_blob,uVar25,uVar12,sVar18,opt->blob_allocator);
                      }
                      else {
                        puVar30 = (uint *)(ulong)uVar25;
                        Mat::create(top_blob,uVar25,1,1,uVar12,sVar18,opt->blob_allocator);
                      }
                      auVar71 = _DAT_00514730;
                      auVar151 = _DAT_00514720;
                      auVar52 = _DAT_005140e0;
                      if (0 < (int)uVar12) {
                        sVar18 = bottom_blob->elemsize;
                        pvVar32 = top_blob->data;
                        if (iVar9 == 0) {
                          sVar17 = (size_t)top_blob->w;
                        }
                        else {
                          sVar17 = top_blob->cstep;
                        }
                        puVar30 = (uint *)bottom_blob->data;
                        sVar39 = bottom_blob->cstep;
                        puVar1 = (undefined1 *)((long)&pMVar47[-1].cstep + 7);
                        auVar139._8_4_ = (int)puVar1;
                        auVar139._0_8_ = puVar1;
                        auVar139._12_4_ = (int)((ulong)puVar1 >> 0x20);
                        lVar23 = sVar17 * top_blob->elemsize;
                        lVar29 = (long)pvVar32 + 0xc;
                        pMVar15 = (Mat *)0x0;
                        auVar139 = auVar139 ^ _DAT_005140e0;
                        do {
                          if (0 < (int)uVar25) {
                            lVar41 = 0;
                            auVar279 = auVar71;
                            auVar299 = auVar151;
                            do {
                              auVar285 = auVar279 ^ auVar52;
                              iVar9 = auVar139._4_4_;
                              if ((bool)(~(auVar285._4_4_ == iVar9 &&
                                           auVar139._0_4_ < auVar285._0_4_ || iVar9 < auVar285._4_4_
                                          ) & 1)) {
                                *(undefined4 *)(lVar29 + -0xc + lVar41) = 0xff7fffff;
                              }
                              if ((auVar285._12_4_ != auVar139._12_4_ ||
                                  auVar285._8_4_ <= auVar139._8_4_) &&
                                  auVar285._12_4_ <= auVar139._12_4_) {
                                *(undefined4 *)(lVar29 + -8 + lVar41) = 0xff7fffff;
                              }
                              auVar285 = auVar299 ^ auVar52;
                              iVar10 = auVar285._4_4_;
                              if (iVar10 <= iVar9 &&
                                  (iVar10 != iVar9 || auVar285._0_4_ <= auVar139._0_4_)) {
                                *(undefined4 *)(lVar29 + -4 + lVar41) = 0xff7fffff;
                                *(undefined4 *)(lVar29 + lVar41) = 0xff7fffff;
                              }
                              lVar286 = auVar279._8_8_;
                              auVar279._0_8_ = auVar279._0_8_ + 4;
                              auVar279._8_8_ = lVar286 + 4;
                              lVar286 = auVar299._8_8_;
                              auVar299._0_8_ = auVar299._0_8_ + 4;
                              auVar299._8_8_ = lVar286 + 4;
                              lVar41 = lVar41 + 0x10;
                            } while ((ulong)(uVar25 + 3 >> 2) << 4 != lVar41);
                          }
                          if (0 < (int)uVar11) {
                            ppvVar42 = (void **)((long)&((Mat *)puVar30)->data +
                                                sVar18 * sVar39 * (long)pMVar15);
                            uVar12 = 0;
                            do {
                              if (0 < (int)uVar21) {
                                uVar34 = 0;
                                do {
                                  if (0 < (int)uVar25) {
                                    pMVar38 = (Mat *)0x0;
                                    do {
                                      fVar2 = *(float *)((long)ppvVar42 + (long)pMVar38 * 4);
                                      fVar51 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                                      if (fVar2 <= fVar51) {
                                        fVar2 = fVar51;
                                      }
                                      *(float *)((long)pvVar32 + (long)pMVar38 * 4) = fVar2;
                                      pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                                    } while (pMVar47 != pMVar38);
                                  }
                                  ppvVar42 = (void **)((long)ppvVar42 + lVar13 * 4);
                                  uVar34 = uVar34 + 1;
                                } while (uVar34 != uVar21);
                              }
                              uVar12 = uVar12 + 1;
                            } while (uVar12 != uVar11);
                          }
                          pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                          lVar29 = lVar29 + lVar23;
                          pvVar32 = (void *)((long)pvVar32 + lVar23);
                        } while (pMVar15 != pMVar27);
                      }
                    }
                    else if (((bVar40 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                      if (iVar9 == 0) {
                        puVar30 = (uint *)(ulong)uVar21;
                        Mat::create(top_blob,uVar21,uVar11,uVar12,sVar18,opt->blob_allocator);
                      }
                      else {
                        puVar30 = (uint *)0x1;
                        Mat::create(top_blob,1,uVar21,uVar11,uVar12,sVar18,opt->blob_allocator);
                      }
                      if (0 < (int)uVar12) {
                        pvVar32 = bottom_blob->data;
                        sVar18 = bottom_blob->elemsize;
                        sVar17 = top_blob->elemsize;
                        sVar39 = top_blob->cstep;
                        puVar30 = (uint *)top_blob->data;
                        sVar5 = bottom_blob->cstep;
                        pMVar15 = (Mat *)0x0;
                        do {
                          if (0 < (int)(uVar21 * uVar11)) {
                            uVar31 = 0;
                            pvVar45 = pvVar32;
                            do {
                              auVar171 = ZEXT816(0xff7fffff);
                              if (0 < (int)uVar25) {
                                pMVar38 = (Mat *)0x0;
                                auVar171 = ZEXT816(0xff7fffff);
                                do {
                                  fVar51 = *(float *)((long)pvVar45 + (long)pMVar38 * 4);
                                  if (auVar171._0_4_ <= fVar51) {
                                    auVar171._0_4_ = fVar51;
                                  }
                                  pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                                } while (pMVar47 != pMVar38);
                              }
                              *(int *)((long)&((Mat *)puVar30)->data +
                                      uVar31 * 4 + sVar17 * sVar39 * (long)pMVar15) = auVar171._0_4_
                              ;
                              uVar31 = uVar31 + 1;
                              pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                            } while (uVar31 != uVar21 * uVar11);
                          }
                          pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                          pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar5);
                        } while (pMVar15 != pMVar27);
                      }
                    }
                    else if ((reduce_d == false && (bVar37 & 1) == 0) && bVar33 == 0) {
                      if (iVar9 == 0) {
                        Mat::create(top_blob,uVar25,uVar21,uVar11,sVar18,opt->blob_allocator);
                      }
                      else {
                        puVar30 = (uint *)(ulong)uVar25;
                        Mat::create(top_blob,uVar25,uVar21,uVar11,1,sVar18,opt->blob_allocator);
                      }
                      auVar71 = _DAT_00514730;
                      auVar151 = _DAT_00514720;
                      auVar52 = _DAT_005140e0;
                      uVar34 = top_blob->c * (int)top_blob->cstep;
                      if (0 < (int)uVar34) {
                        pvVar32 = top_blob->data;
                        lVar29 = (ulong)uVar34 - 1;
                        auVar142._8_4_ = (int)lVar29;
                        auVar142._0_8_ = lVar29;
                        auVar142._12_4_ = (int)((ulong)lVar29 >> 0x20);
                        uVar31 = 0;
                        auVar142 = auVar142 ^ _DAT_005140e0;
                        do {
                          auVar249._8_4_ = (int)uVar31;
                          auVar249._0_8_ = uVar31;
                          auVar249._12_4_ = (int)(uVar31 >> 0x20);
                          auVar285 = (auVar249 | auVar71) ^ auVar52;
                          iVar10 = auVar142._4_4_;
                          iVar264 = auVar142._12_4_;
                          if ((bool)(~(auVar285._4_4_ == iVar10 && auVar142._0_4_ < auVar285._0_4_
                                      || iVar10 < auVar285._4_4_) & 1)) {
                            *(undefined4 *)((long)pvVar32 + uVar31 * 4) = 0xff7fffff;
                          }
                          if ((auVar285._12_4_ != iVar264 || auVar285._8_4_ <= auVar142._8_4_) &&
                              auVar285._12_4_ <= iVar264) {
                            *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 4) = 0xff7fffff;
                          }
                          auVar285 = (auVar249 | auVar151) ^ auVar52;
                          auVar282._0_4_ = -(uint)(auVar142._0_4_ < auVar285._0_4_);
                          auVar282._4_4_ = -(uint)(iVar10 < auVar285._4_4_);
                          auVar282._8_4_ = -(uint)(auVar142._8_4_ < auVar285._8_4_);
                          auVar282._12_4_ = -(uint)(iVar264 < auVar285._12_4_);
                          iVar10 = -(uint)(auVar285._4_4_ == iVar10);
                          iVar264 = -(uint)(auVar285._12_4_ == iVar264);
                          auVar302._4_4_ = iVar10;
                          auVar302._0_4_ = iVar10;
                          auVar302._8_4_ = iVar264;
                          auVar302._12_4_ = iVar264;
                          auVar250._4_4_ = auVar282._4_4_;
                          auVar250._0_4_ = auVar282._4_4_;
                          auVar250._8_4_ = auVar282._12_4_;
                          auVar250._12_4_ = auVar282._12_4_;
                          auVar251._8_4_ = 0xffffffff;
                          auVar251._0_8_ = 0xffffffffffffffff;
                          auVar251._12_4_ = 0xffffffff;
                          auVar251 = (auVar250 | auVar302 & auVar282) ^ auVar251;
                          if ((auVar251 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 8) = 0xff7fffff;
                          }
                          puVar30 = (uint *)(ulong)auVar251._8_2_;
                          if ((auVar251 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 0xc) = 0xff7fffff;
                          }
                          uVar31 = uVar31 + 4;
                        } while ((uVar34 + 3 & 0xfffffffc) != uVar31);
                      }
                      if (0 < (int)uVar12) {
                        pvVar32 = bottom_blob->data;
                        sVar18 = bottom_blob->elemsize;
                        sVar17 = bottom_blob->cstep;
                        puVar30 = (uint *)0x0;
                        do {
                          if (0 < (int)uVar11) {
                            iVar10 = top_blob->w;
                            if (iVar9 == 0) {
                              sVar39 = top_blob->cstep;
                            }
                            else {
                              sVar39 = (long)top_blob->h * (long)iVar10;
                            }
                            pvVar48 = (void *)(sVar18 * sVar17 * (long)puVar30 + (long)pvVar32);
                            pvVar45 = top_blob->data;
                            sVar5 = top_blob->elemsize;
                            pMVar46 = (Mat *)0x0;
                            do {
                              if (0 < (int)uVar21) {
                                pMVar16 = (Mat *)0x0;
                                pvVar44 = pvVar45;
                                do {
                                  if (0 < (int)uVar25) {
                                    pMVar43 = (Mat *)0x0;
                                    do {
                                      fVar2 = *(float *)((long)pvVar48 + (long)pMVar43 * 4);
                                      fVar51 = *(float *)((long)pvVar44 + (long)pMVar43 * 4);
                                      if (fVar2 <= fVar51) {
                                        fVar2 = fVar51;
                                      }
                                      *(float *)((long)pvVar44 + (long)pMVar43 * 4) = fVar2;
                                      pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                                    } while (pMVar47 != pMVar43);
                                  }
                                  pvVar48 = (void *)((long)pvVar48 + lVar13 * 4);
                                  pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                                  pvVar44 = (void *)((long)pvVar44 + (long)iVar10 * sVar5);
                                } while (pMVar16 != pMVar38);
                              }
                              pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                              pvVar45 = (void *)((long)pvVar45 + sVar39 * sVar5);
                            } while (pMVar46 != pMVar15);
                          }
                          puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                        } while ((Mat *)puVar30 != pMVar27);
                      }
                    }
                    else {
                      puVar30 = (uint *)(ulong)CONCAT31((int3)((uint)iVar10 >> 8),
                                                        bVar28 | reduce_d | reduce_c);
                      if (((bVar28 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                        if (iVar9 == 0) {
                          puVar30 = (uint *)pMVar47;
                          Mat::create(top_blob,uVar25,uVar11,uVar12,sVar18,opt->blob_allocator);
                        }
                        else {
                          puVar30 = (uint *)(ulong)uVar25;
                          Mat::create(top_blob,uVar25,1,uVar11,uVar12,sVar18,opt->blob_allocator);
                        }
                        auVar71 = _DAT_00514730;
                        auVar151 = _DAT_00514720;
                        auVar52 = _DAT_005140e0;
                        if (0 < (int)uVar12) {
                          pvVar32 = bottom_blob->data;
                          sVar18 = bottom_blob->elemsize;
                          sVar17 = bottom_blob->cstep;
                          iVar9 = top_blob->w;
                          pvVar45 = top_blob->data;
                          uVar31 = top_blob->elemsize;
                          lVar13 = (long)top_blob->h * (long)iVar9;
                          pMVar38 = (Mat *)0x0;
                          iVar10 = (int)((uVar31 * lVar13 + 0xf & 0xfffffffffffffff0) / uVar31);
                          if (top_blob->dims == 4) {
                            iVar10 = (int)lVar13;
                          }
                          uVar12 = iVar10 * top_blob->d;
                          lVar13 = (ulong)uVar12 - 1;
                          auVar145._8_4_ = (int)lVar13;
                          auVar145._0_8_ = lVar13;
                          auVar145._12_4_ = (int)((ulong)lVar13 >> 0x20);
                          lVar13 = (long)pvVar45 + 0xc;
                          lVar29 = top_blob->cstep * uVar31;
                          auVar145 = auVar145 ^ _DAT_005140e0;
                          puVar30 = (uint *)top_blob;
                          do {
                            if (0 < (int)uVar12) {
                              uVar14 = 0;
                              do {
                                auVar258._8_4_ = (int)uVar14;
                                auVar258._0_8_ = uVar14;
                                auVar258._12_4_ = (int)(uVar14 >> 0x20);
                                auVar285 = (auVar258 | auVar71) ^ auVar52;
                                iVar10 = auVar145._4_4_;
                                if ((bool)(~(iVar10 < auVar285._4_4_ ||
                                            auVar145._0_4_ < auVar285._0_4_ &&
                                            auVar285._4_4_ == iVar10) & 1)) {
                                  *(undefined4 *)(lVar13 + -0xc + uVar14 * 4) = 0xff7fffff;
                                }
                                if (auVar285._12_4_ <= auVar145._12_4_ &&
                                    (auVar285._8_4_ <= auVar145._8_4_ ||
                                    auVar285._12_4_ != auVar145._12_4_)) {
                                  *(undefined4 *)(lVar13 + -8 + uVar14 * 4) = 0xff7fffff;
                                }
                                auVar285 = (auVar258 | auVar151) ^ auVar52;
                                iVar264 = auVar285._4_4_;
                                if (iVar264 <= iVar10 &&
                                    (iVar264 != iVar10 || auVar285._0_4_ <= auVar145._0_4_)) {
                                  *(undefined4 *)(lVar13 + -4 + uVar14 * 4) = 0xff7fffff;
                                  *(undefined4 *)(lVar13 + uVar14 * 4) = 0xff7fffff;
                                }
                                uVar14 = uVar14 + 4;
                              } while ((uVar12 + 3 & 0xfffffffc) != uVar14);
                            }
                            if (0 < (int)uVar11) {
                              pvVar44 = (void *)(sVar18 * sVar17 * (long)pMVar38 + (long)pvVar32);
                              pMVar46 = (Mat *)0x0;
                              pvVar48 = pvVar45;
                              do {
                                if (0 < (int)uVar21) {
                                  uVar34 = 0;
                                  do {
                                    if (0 < (int)uVar25) {
                                      puVar30 = (uint *)0x0;
                                      do {
                                        fVar2 = *(float *)((long)pvVar44 + (long)puVar30 * 4);
                                        fVar51 = *(float *)((long)pvVar48 + (long)puVar30 * 4);
                                        if (fVar2 <= fVar51) {
                                          fVar2 = fVar51;
                                        }
                                        *(float *)((long)pvVar48 + (long)puVar30 * 4) = fVar2;
                                        puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                                      } while (pMVar47 != (Mat *)puVar30);
                                    }
                                    pvVar44 = (void *)((long)pvVar44 + (long)(int)uVar25 * 4);
                                    uVar34 = uVar34 + 1;
                                  } while (uVar34 != uVar21);
                                }
                                pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                                pvVar48 = (void *)((long)pvVar48 + uVar31 * (long)iVar9);
                              } while (pMVar46 != pMVar15);
                            }
                            pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                            lVar13 = lVar13 + lVar29;
                            pvVar45 = (void *)((long)pvVar45 + lVar29);
                          } while (pMVar38 != pMVar27);
                        }
                      }
                      else if (reduce_c == false && (bVar24 == 0 && (bVar37 & 1) == 0)) {
                        if (iVar9 == 0) {
                          puVar30 = (uint *)pMVar47;
                          Mat::create(top_blob,uVar25,uVar21,uVar12,sVar18,opt->blob_allocator);
                        }
                        else {
                          puVar30 = (uint *)pMVar47;
                          Mat::create(top_blob,uVar25,uVar21,1,uVar12,sVar18,opt->blob_allocator);
                        }
                        auVar71 = _DAT_00514730;
                        auVar151 = _DAT_00514720;
                        auVar52 = _DAT_005140e0;
                        if (0 < (int)uVar12) {
                          pvVar32 = bottom_blob->data;
                          sVar18 = bottom_blob->elemsize;
                          sVar17 = bottom_blob->cstep;
                          iVar9 = top_blob->w;
                          pvVar45 = top_blob->data;
                          uVar31 = top_blob->elemsize;
                          lVar13 = (long)top_blob->h * (long)iVar9;
                          pMVar15 = (Mat *)0x0;
                          iVar10 = (int)((uVar31 * lVar13 + 0xf & 0xfffffffffffffff0) / uVar31);
                          if (top_blob->dims == 4) {
                            iVar10 = (int)lVar13;
                          }
                          uVar12 = iVar10 * top_blob->d;
                          lVar13 = (ulong)uVar12 - 1;
                          auVar148._8_4_ = (int)lVar13;
                          auVar148._0_8_ = lVar13;
                          auVar148._12_4_ = (int)((ulong)lVar13 >> 0x20);
                          lVar13 = (long)pvVar45 + 0xc;
                          lVar29 = top_blob->cstep * uVar31;
                          auVar148 = auVar148 ^ _DAT_005140e0;
                          puVar30 = (uint *)top_blob;
                          do {
                            if (0 < (int)uVar12) {
                              uVar14 = 0;
                              do {
                                auVar261._8_4_ = (int)uVar14;
                                auVar261._0_8_ = uVar14;
                                auVar261._12_4_ = (int)(uVar14 >> 0x20);
                                auVar285 = (auVar261 | auVar71) ^ auVar52;
                                iVar10 = auVar148._4_4_;
                                if ((bool)(~(iVar10 < auVar285._4_4_ ||
                                            auVar148._0_4_ < auVar285._0_4_ &&
                                            auVar285._4_4_ == iVar10) & 1)) {
                                  *(undefined4 *)(lVar13 + -0xc + uVar14 * 4) = 0xff7fffff;
                                }
                                if (auVar285._12_4_ <= auVar148._12_4_ &&
                                    (auVar285._8_4_ <= auVar148._8_4_ ||
                                    auVar285._12_4_ != auVar148._12_4_)) {
                                  *(undefined4 *)(lVar13 + -8 + uVar14 * 4) = 0xff7fffff;
                                }
                                auVar285 = (auVar261 | auVar151) ^ auVar52;
                                iVar264 = auVar285._4_4_;
                                if (iVar264 <= iVar10 &&
                                    (iVar264 != iVar10 || auVar285._0_4_ <= auVar148._0_4_)) {
                                  *(undefined4 *)(lVar13 + -4 + uVar14 * 4) = 0xff7fffff;
                                  *(undefined4 *)(lVar13 + uVar14 * 4) = 0xff7fffff;
                                }
                                uVar14 = uVar14 + 4;
                              } while ((uVar12 + 3 & 0xfffffffc) != uVar14);
                            }
                            if (0 < (int)uVar11) {
                              pvVar48 = (void *)(sVar18 * sVar17 * (long)pMVar15 + (long)pvVar32);
                              uVar34 = 0;
                              do {
                                if (0 < (int)uVar21) {
                                  pMVar46 = (Mat *)0x0;
                                  pvVar44 = pvVar45;
                                  do {
                                    if (0 < (int)uVar25) {
                                      puVar30 = (uint *)0x0;
                                      do {
                                        fVar2 = *(float *)((long)pvVar48 + (long)puVar30 * 4);
                                        fVar51 = *(float *)((long)pvVar44 + (long)puVar30 * 4);
                                        if (fVar2 <= fVar51) {
                                          fVar2 = fVar51;
                                        }
                                        *(float *)((long)pvVar44 + (long)puVar30 * 4) = fVar2;
                                        puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                                      } while (pMVar47 != (Mat *)puVar30);
                                    }
                                    pvVar48 = (void *)((long)pvVar48 + (long)(int)uVar25 * 4);
                                    pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                                    pvVar44 = (void *)((long)pvVar44 + uVar31 * (long)iVar9);
                                  } while (pMVar46 != pMVar38);
                                }
                                uVar34 = uVar34 + 1;
                              } while (uVar34 != uVar11);
                            }
                            pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                            lVar13 = lVar13 + lVar29;
                            pvVar45 = (void *)((long)pvVar45 + lVar29);
                          } while (pMVar15 != pMVar27);
                        }
                      }
                    }
                  }
                  break;
                }
                if (iVar9 == 0) {
                  Mat::create(top_blob,uVar25,uVar21,sVar18,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,uVar25,uVar21,1,1,sVar18,opt->blob_allocator);
                }
                local_c8.cstep = 0;
                local_c8.data = (Mat *)0x0;
                local_c8.refcount._0_4_ = 0;
                local_c8.refcount._4_4_ = 0;
                local_c8.elemsize._0_4_ = 0;
                local_c8.elemsize._4_4_ = 0;
                local_c8.elempack = 0;
                local_c8.allocator = (Allocator *)0x0;
                local_c8.dims = 0;
                local_c8.w = 0;
                local_c8.h = 0;
                local_c8.d = 0;
                local_c8.c = 0;
                puVar30 = (uint *)(ulong)uVar25;
                Mat::create(&local_c8,uVar25,uVar21,uVar12,sVar18,opt->workspace_allocator);
                auVar71 = _DAT_00514730;
                auVar151 = _DAT_00514720;
                auVar52 = _DAT_005140e0;
                iVar10 = -100;
                if (((Mat *)local_c8.data != (Mat *)0x0) && (local_c8.cstep * (long)local_c8.c != 0)
                   ) {
                  uVar34 = (int)local_c8.cstep * local_c8.c;
                  if (0 < (int)uVar34) {
                    lVar29 = (ulong)uVar34 - 1;
                    auVar124._8_4_ = (int)lVar29;
                    auVar124._0_8_ = lVar29;
                    auVar124._12_4_ = (int)((ulong)lVar29 >> 0x20);
                    puVar30 = (uint *)0x0;
                    auVar124 = auVar124 ^ _DAT_005140e0;
                    do {
                      auVar237._8_4_ = (int)puVar30;
                      auVar237._0_8_ = puVar30;
                      auVar237._12_4_ = (int)((ulong)puVar30 >> 0x20);
                      auVar285 = (auVar237 | auVar71) ^ auVar52;
                      iVar9 = auVar124._4_4_;
                      if ((bool)(~(auVar285._4_4_ == iVar9 && auVar124._0_4_ < auVar285._0_4_ ||
                                  iVar9 < auVar285._4_4_) & 1)) {
                        *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) =
                             0xff7fffff;
                      }
                      if ((auVar285._12_4_ != auVar124._12_4_ || auVar285._8_4_ <= auVar124._8_4_)
                          && auVar285._12_4_ <= auVar124._12_4_) {
                        *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                             0xff7fffff;
                      }
                      auVar285 = (auVar237 | auVar151) ^ auVar52;
                      iVar10 = auVar285._4_4_;
                      if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar124._0_4_))
                      {
                        *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                             0xff7fffff;
                        *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                             0xff7fffff;
                      }
                      puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                    } while ((Mat *)(ulong)(uVar34 + 3 & 0xfffffffc) != (Mat *)puVar30);
                  }
                  if (0 < (int)uVar12) {
                    pvVar32 = bottom_blob->data;
                    puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar46 = (Mat *)0x0;
                    pMVar15 = (Mat *)local_c8.data;
                    do {
                      if (0 < (int)uVar11) {
                        pvVar45 = (void *)((long)puVar30 * (long)pMVar46 + (long)pvVar32);
                        uVar34 = 0;
                        do {
                          if (0 < (int)uVar21) {
                            pMVar43 = (Mat *)0x0;
                            pMVar16 = pMVar15;
                            do {
                              if (0 < (int)uVar25) {
                                pMVar26 = (Mat *)0x0;
                                do {
                                  fVar2 = *(float *)((long)pvVar45 + (long)pMVar26 * 4);
                                  fVar51 = *(float *)((long)&pMVar16->data + (long)pMVar26 * 4);
                                  if (fVar2 <= fVar51) {
                                    fVar2 = fVar51;
                                  }
                                  *(float *)((long)&pMVar16->data + (long)pMVar26 * 4) = fVar2;
                                  pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                } while (pMVar47 != pMVar26);
                              }
                              pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                              pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                              pMVar16 = (Mat *)((long)&pMVar16->data +
                                               (long)local_c8.w *
                                               CONCAT44(local_c8.elemsize._4_4_,
                                                        (undefined4)local_c8.elemsize));
                            } while (pMVar43 != pMVar38);
                          }
                          uVar34 = uVar34 + 1;
                        } while (uVar34 != uVar11);
                      }
                      pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                      pMVar15 = (Mat *)((long)&pMVar15->data +
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize) * local_c8.cstep);
                    } while (pMVar46 != pMVar27);
                  }
                  auVar71 = _DAT_00514730;
                  auVar151 = _DAT_00514720;
                  auVar52 = _DAT_005140e0;
                  uVar11 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar11) {
                    puVar30 = (uint *)top_blob->data;
                    lVar13 = (ulong)uVar11 - 1;
                    auVar125._8_4_ = (int)lVar13;
                    auVar125._0_8_ = lVar13;
                    auVar125._12_4_ = (int)((ulong)lVar13 >> 0x20);
                    uVar31 = 0;
                    auVar125 = auVar125 ^ _DAT_005140e0;
                    do {
                      auVar238._8_4_ = (int)uVar31;
                      auVar238._0_8_ = uVar31;
                      auVar238._12_4_ = (int)(uVar31 >> 0x20);
                      auVar285 = (auVar238 | auVar71) ^ auVar52;
                      iVar9 = auVar125._4_4_;
                      if ((bool)(~(auVar285._4_4_ == iVar9 && auVar125._0_4_ < auVar285._0_4_ ||
                                  iVar9 < auVar285._4_4_) & 1)) {
                        *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0xff7fffff;
                      }
                      if ((auVar285._12_4_ != auVar125._12_4_ || auVar285._8_4_ <= auVar125._8_4_)
                          && auVar285._12_4_ <= auVar125._12_4_) {
                        *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0xff7fffff
                        ;
                      }
                      auVar285 = (auVar238 | auVar151) ^ auVar52;
                      iVar10 = auVar285._4_4_;
                      if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar125._0_4_))
                      {
                        *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0xff7fffff
                        ;
                        *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) =
                             0xff7fffff;
                      }
                      uVar31 = uVar31 + 4;
                    } while ((uVar11 + 3 & 0xfffffffc) != uVar31);
                  }
                  if (0 < (int)uVar12) {
                    puVar30 = (uint *)top_blob->data;
                    iVar9 = top_blob->w;
                    sVar18 = top_blob->elemsize;
                    pMVar46 = (Mat *)0x0;
                    pMVar15 = (Mat *)local_c8.data;
                    do {
                      if (0 < (int)uVar21) {
                        pMVar26 = (Mat *)0x0;
                        pMVar16 = pMVar15;
                        pMVar43 = (Mat *)puVar30;
                        do {
                          if (0 < (int)uVar25) {
                            pMVar22 = (Mat *)0x0;
                            do {
                              fVar2 = *(float *)((long)&pMVar16->data + (long)pMVar22 * 4);
                              fVar51 = *(float *)((long)&pMVar43->data + (long)pMVar22 * 4);
                              if (fVar2 <= fVar51) {
                                fVar2 = fVar51;
                              }
                              *(float *)((long)&pMVar43->data + (long)pMVar22 * 4) = fVar2;
                              pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                            } while (pMVar47 != pMVar22);
                          }
                          pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                          pMVar16 = (Mat *)((long)&pMVar16->data +
                                           (long)local_c8.w *
                                           CONCAT44(local_c8.elemsize._4_4_,
                                                    (undefined4)local_c8.elemsize));
                          pMVar43 = (Mat *)((long)&pMVar43->data + (long)iVar9 * sVar18);
                        } while (pMVar26 != pMVar38);
                      }
                      pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                      pMVar15 = (Mat *)((long)&pMVar15->data +
                                       local_c8.cstep *
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize));
                    } while (pMVar46 != pMVar27);
                  }
                  iVar10 = 0;
                }
                piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                if (piVar7 != (int *)0x0) {
                  LOCK();
                  *piVar7 = *piVar7 + -1;
                  UNLOCK();
                  if (*piVar7 == 0) {
                    puVar30 = (uint *)local_c8.data;
                    if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                    (*(local_c8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
          }
        }
        else {
          if (iVar9 == 0) {
            Mat::create(top_blob,uVar11,sVar18,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,uVar11,1,sVar18,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar30 = (uint *)0x1;
          Mat::create(&local_c8,1,uVar11,uVar12,sVar18,opt->workspace_allocator);
          auVar71 = _DAT_00514730;
          auVar151 = _DAT_00514720;
          auVar52 = _DAT_005140e0;
          iVar10 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
            uVar25 = (int)local_c8.cstep * local_c8.c;
            if (0 < (int)uVar25) {
              lVar13 = (ulong)uVar25 - 1;
              auVar77._8_4_ = (int)lVar13;
              auVar77._0_8_ = lVar13;
              auVar77._12_4_ = (int)((ulong)lVar13 >> 0x20);
              puVar30 = (uint *)0x0;
              auVar77 = auVar77 ^ _DAT_005140e0;
              do {
                auVar176._8_4_ = (int)puVar30;
                auVar176._0_8_ = puVar30;
                auVar176._12_4_ = (int)((ulong)puVar30 >> 0x20);
                auVar285 = (auVar176 | auVar71) ^ auVar52;
                iVar9 = auVar77._4_4_;
                if ((bool)(~(auVar285._4_4_ == iVar9 && auVar77._0_4_ < auVar285._0_4_ ||
                            iVar9 < auVar285._4_4_) & 1)) {
                  *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) = 0xff7fffff;
                }
                if ((auVar285._12_4_ != auVar77._12_4_ || auVar285._8_4_ <= auVar77._8_4_) &&
                    auVar285._12_4_ <= auVar77._12_4_) {
                  *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) = 0xff7fffff
                  ;
                }
                auVar285 = (auVar176 | auVar151) ^ auVar52;
                iVar10 = auVar285._4_4_;
                if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar77._0_4_)) {
                  *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) = 0xff7fffff;
                  *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                       0xff7fffff;
                }
                puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
              } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != (Mat *)puVar30);
            }
            if (0 < (int)uVar12) {
              pvVar32 = bottom_blob->data;
              puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
              pMVar38 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  pMVar47 = (Mat *)0x0;
                  pvVar45 = pvVar32;
                  do {
                    auVar160 = ZEXT816(0xff7fffff);
                    if (0 < (int)uVar35) {
                      uVar31 = 0;
                      auVar160 = ZEXT816(0xff7fffff);
                      do {
                        fVar51 = *(float *)((long)pvVar45 + uVar31 * 4);
                        if (auVar160._0_4_ <= fVar51) {
                          auVar160._0_4_ = fVar51;
                        }
                        uVar31 = uVar31 + 1;
                      } while (uVar35 != uVar31);
                    }
                    *(int *)((long)(void **)local_c8.data +
                            (long)pMVar47 * 4 +
                            CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                            local_c8.cstep * (long)pMVar38) = auVar160._0_4_;
                    pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                    pvVar45 = (void *)((long)pvVar45 + (long)(int)uVar35 * 4);
                  } while (pMVar47 != pMVar15);
                }
                pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                pvVar32 = (void *)((long)&((Mat *)puVar30)->data + (long)pvVar32);
              } while (pMVar38 != pMVar27);
            }
            auVar71 = _DAT_00514730;
            auVar151 = _DAT_00514720;
            auVar52 = _DAT_005140e0;
            uVar25 = top_blob->c * (int)top_blob->cstep;
            if (0 < (int)uVar25) {
              puVar30 = (uint *)top_blob->data;
              lVar13 = (ulong)uVar25 - 1;
              auVar78._8_4_ = (int)lVar13;
              auVar78._0_8_ = lVar13;
              auVar78._12_4_ = (int)((ulong)lVar13 >> 0x20);
              uVar31 = 0;
              auVar78 = auVar78 ^ _DAT_005140e0;
              do {
                auVar177._8_4_ = (int)uVar31;
                auVar177._0_8_ = uVar31;
                auVar177._12_4_ = (int)(uVar31 >> 0x20);
                auVar285 = (auVar177 | auVar71) ^ auVar52;
                iVar9 = auVar78._4_4_;
                if ((bool)(~(auVar285._4_4_ == iVar9 && auVar78._0_4_ < auVar285._0_4_ ||
                            iVar9 < auVar285._4_4_) & 1)) {
                  *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0xff7fffff;
                }
                if ((auVar285._12_4_ != auVar78._12_4_ || auVar285._8_4_ <= auVar78._8_4_) &&
                    auVar285._12_4_ <= auVar78._12_4_) {
                  *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0xff7fffff;
                }
                auVar285 = (auVar177 | auVar151) ^ auVar52;
                iVar10 = auVar285._4_4_;
                if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar78._0_4_)) {
                  *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0xff7fffff;
                  *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) = 0xff7fffff;
                }
                uVar31 = uVar31 + 4;
              } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
            }
            if (0 < (int)uVar12) {
              pvVar32 = top_blob->data;
              puVar30 = (uint *)0x0;
              pMVar38 = (Mat *)local_c8.data;
              do {
                if (0 < (int)uVar11) {
                  pMVar47 = (Mat *)0x0;
                  do {
                    fVar2 = *(float *)((long)&pMVar38->data + (long)pMVar47 * 4);
                    fVar51 = *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                    if (fVar2 <= fVar51) {
                      fVar2 = fVar51;
                    }
                    *(float *)((long)pvVar32 + (long)pMVar47 * 4) = fVar2;
                    pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                  } while (pMVar15 != pMVar47);
                }
                puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                pMVar38 = (Mat *)((long)&pMVar38->data +
                                 local_c8.cstep *
                                 CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
              } while ((Mat *)puVar30 != pMVar27);
            }
            iVar10 = 0;
          }
          piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar30 = (uint *)local_c8.data;
              if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        if (iVar9 == 0) {
          Mat::create(top_blob,1,sVar18,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,1,sVar18,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        Mat::create(&local_c8,uVar12,sVar18,opt->workspace_allocator);
        iVar10 = -100;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          if ((int)uVar12 < 1) {
            fVar51 = -3.4028235e+38;
          }
          else {
            sVar18 = bottom_blob->elemsize;
            sVar17 = bottom_blob->cstep;
            pvVar32 = bottom_blob->data;
            puVar30 = (uint *)(ulong)uVar34;
            pMVar15 = (Mat *)0x0;
            do {
              fVar51 = -3.4028235e+38;
              if (0 < (int)uVar34) {
                pMVar38 = (Mat *)0x0;
                fVar51 = -3.4028235e+38;
                do {
                  fVar2 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                  if (fVar51 <= fVar2) {
                    fVar51 = fVar2;
                  }
                  pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                } while ((Mat *)puVar30 != pMVar38);
              }
              *(float *)((long)(void **)local_c8.data + (long)pMVar15 * 4) = fVar51;
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
            } while (pMVar15 != pMVar27);
            fVar51 = -3.4028235e+38;
            pMVar15 = (Mat *)0x0;
            do {
              fVar2 = *(float *)((long)(void **)local_c8.data + (long)pMVar15 * 4);
              if (fVar51 <= fVar2) {
                fVar51 = fVar2;
              }
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
            } while (pMVar27 != pMVar15);
          }
          *(float *)top_blob->data = fVar51;
          iVar10 = 0;
        }
        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar30 = (uint *)local_c8.data;
            if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_00342105:
      if (iVar10 != 0) {
        return -100;
      }
    }
    break;
  case 5:
    fVar50 = this->coeff;
    if (uVar25 - 1 < 4) {
      iVar9 = this->keepdims;
      sVar18 = bottom_blob->elemsize;
      puVar30 = &switchD_0033a833::switchdataD_0051c97c;
      switch(uVar25) {
      case 1:
        iVar9 = bottom_blob->w;
        puVar30 = (uint *)0x1;
        Mat::create(top_blob,1,sVar18,opt->blob_allocator);
        if ((long)iVar9 < 1) {
          fVar51 = 3.4028235e+38;
        }
        else {
          fVar51 = 3.4028235e+38;
          lVar13 = 0;
          do {
            fVar2 = *(float *)((long)bottom_blob->data + lVar13 * 4);
            if (fVar2 <= fVar51) {
              fVar51 = fVar2;
            }
            lVar13 = lVar13 + 1;
          } while (iVar9 != lVar13);
        }
        goto LAB_0033babe;
      case 2:
        uVar25 = bottom_blob->w;
        pMVar27 = (Mat *)(ulong)uVar25;
        uVar21 = bottom_blob->h;
        pMVar15 = (Mat *)(ulong)uVar21;
        auVar69._8_4_ = 0xffffffff;
        auVar69._0_8_ = 0xffffffffffffffff;
        auVar69._12_4_ = 0xffffffff;
        auVar70._0_8_ = SUB168(auVar69 ^ auVar151,0) << 0x3f;
        auVar70._8_8_ = SUB168(auVar69 ^ auVar151,8) << 0x3f;
        iVar10 = movmskpd(uVar20,auVar70);
        if (iVar10 != 0) {
          if (((bVar37 | (byte)iVar10 >> 1) & 1) == 0) {
            if (iVar9 == 0) {
              puVar30 = (uint *)pMVar15;
              Mat::create(top_blob,uVar21,sVar18,opt->blob_allocator);
            }
            else {
              puVar30 = (uint *)0x1;
              Mat::create(top_blob,1,uVar21,sVar18,opt->blob_allocator);
            }
            if (0 < (int)uVar21) {
              iVar9 = bottom_blob->w;
              sVar18 = bottom_blob->elemsize;
              pvVar32 = bottom_blob->data;
              pvVar45 = top_blob->data;
              puVar30 = (uint *)0x0;
              do {
                fVar51 = 3.4028235e+38;
                if (0 < (int)uVar25) {
                  pMVar38 = (Mat *)0x0;
                  fVar51 = 3.4028235e+38;
                  do {
                    fVar2 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                    if (fVar2 <= fVar51) {
                      fVar51 = fVar2;
                    }
                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                  } while (pMVar27 != pMVar38);
                }
                *(float *)((long)pvVar45 + (long)puVar30 * 4) = fVar51;
                puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                pvVar32 = (void *)((long)pvVar32 + (long)iVar9 * sVar18);
              } while ((Mat *)puVar30 != pMVar15);
            }
          }
          else if (((bVar36 | (byte)iVar10) & 1) == 0) {
            puVar30 = (uint *)pMVar27;
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar25,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,uVar25,1,sVar18,opt->blob_allocator);
            }
            auVar71 = _DAT_00514730;
            auVar151 = _DAT_00514720;
            auVar52 = _DAT_005140e0;
            uVar11 = top_blob->c * (int)top_blob->cstep;
            pvVar32 = top_blob->data;
            if (0 < (int)uVar11) {
              lVar13 = (ulong)uVar11 - 1;
              auVar88._8_4_ = (int)lVar13;
              auVar88._0_8_ = lVar13;
              auVar88._12_4_ = (int)((ulong)lVar13 >> 0x20);
              uVar31 = 0;
              auVar88 = auVar88 ^ _DAT_005140e0;
              do {
                auVar189._8_4_ = (int)uVar31;
                auVar189._0_8_ = uVar31;
                auVar189._12_4_ = (int)(uVar31 >> 0x20);
                auVar285 = (auVar189 | auVar71) ^ auVar52;
                iVar9 = auVar88._4_4_;
                iVar10 = auVar88._12_4_;
                if ((bool)(~(auVar285._4_4_ == iVar9 && auVar88._0_4_ < auVar285._0_4_ ||
                            iVar9 < auVar285._4_4_) & 1)) {
                  *(undefined4 *)((long)pvVar32 + uVar31 * 4) = 0x7f7fffff;
                }
                if ((auVar285._12_4_ != iVar10 || auVar285._8_4_ <= auVar88._8_4_) &&
                    auVar285._12_4_ <= iVar10) {
                  *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 4) = 0x7f7fffff;
                }
                auVar285 = (auVar189 | auVar151) ^ auVar52;
                auVar266._0_4_ = -(uint)(auVar88._0_4_ < auVar285._0_4_);
                auVar266._4_4_ = -(uint)(iVar9 < auVar285._4_4_);
                auVar266._8_4_ = -(uint)(auVar88._8_4_ < auVar285._8_4_);
                auVar266._12_4_ = -(uint)(iVar10 < auVar285._12_4_);
                iVar9 = -(uint)(auVar285._4_4_ == iVar9);
                iVar10 = -(uint)(auVar285._12_4_ == iVar10);
                auVar288._4_4_ = iVar9;
                auVar288._0_4_ = iVar9;
                auVar288._8_4_ = iVar10;
                auVar288._12_4_ = iVar10;
                auVar190._4_4_ = auVar266._4_4_;
                auVar190._0_4_ = auVar266._4_4_;
                auVar190._8_4_ = auVar266._12_4_;
                auVar190._12_4_ = auVar266._12_4_;
                auVar191._8_4_ = 0xffffffff;
                auVar191._0_8_ = 0xffffffffffffffff;
                auVar191._12_4_ = 0xffffffff;
                auVar191 = (auVar190 | auVar288 & auVar266) ^ auVar191;
                if ((auVar191 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 8) = 0x7f7fffff;
                }
                puVar30 = (uint *)(ulong)auVar191._8_2_;
                if ((auVar191 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 0xc) = 0x7f7fffff;
                }
                uVar31 = uVar31 + 4;
              } while ((uVar11 + 3 & 0xfffffffc) != uVar31);
            }
            if (0 < (int)uVar21) {
              pvVar45 = bottom_blob->data;
              iVar9 = bottom_blob->w;
              sVar18 = bottom_blob->elemsize;
              puVar30 = (uint *)0x0;
              do {
                if (0 < (int)uVar25) {
                  pMVar38 = (Mat *)0x0;
                  do {
                    fVar2 = *(float *)((long)pvVar45 + (long)pMVar38 * 4);
                    fVar51 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                    if (fVar51 <= fVar2) {
                      fVar2 = fVar51;
                    }
                    *(float *)((long)pvVar32 + (long)pMVar38 * 4) = fVar2;
                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                  } while (pMVar27 != pMVar38);
                }
                puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                pvVar45 = (void *)((long)pvVar45 + (long)iVar9 * sVar18);
              } while ((Mat *)puVar30 != pMVar15);
            }
          }
          goto LAB_00342112;
        }
        if (iVar9 == 0) {
          Mat::create(top_blob,1,sVar18,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,sVar18,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        puVar30 = (uint *)pMVar15;
        Mat::create(&local_c8,uVar21,sVar18,opt->workspace_allocator);
        iVar10 = -100;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          if ((int)uVar21 < 1) {
            fVar51 = 3.4028235e+38;
          }
          else {
            pvVar32 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar18 = bottom_blob->elemsize;
            puVar30 = (uint *)0x0;
            do {
              fVar51 = 3.4028235e+38;
              if (0 < (int)uVar25) {
                pMVar38 = (Mat *)0x0;
                fVar51 = 3.4028235e+38;
                do {
                  fVar2 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                  if (fVar2 <= fVar51) {
                    fVar51 = fVar2;
                  }
                  pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                } while (pMVar27 != pMVar38);
              }
              *(float *)((long)(void **)local_c8.data + (long)puVar30 * 4) = fVar51;
              puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
              pvVar32 = (void *)((long)pvVar32 + (long)iVar9 * sVar18);
            } while ((Mat *)puVar30 != pMVar15);
            fVar51 = 3.4028235e+38;
            pMVar27 = (Mat *)0x0;
            do {
              fVar2 = *(float *)((long)(void **)local_c8.data + (long)pMVar27 * 4);
              if (fVar2 <= fVar51) {
                fVar51 = fVar2;
              }
              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
            } while (pMVar15 != pMVar27);
          }
          *(float *)top_blob->data = fVar51;
          iVar10 = 0;
        }
        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar30 = (uint *)local_c8.data;
            if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
        break;
      case 3:
        uVar21 = bottom_blob->w;
        lVar13 = (long)(int)uVar21;
        uVar11 = bottom_blob->h;
        pMVar15 = (Mat *)(ulong)uVar11;
        uVar12 = bottom_blob->c;
        pMVar27 = (Mat *)(ulong)uVar12;
        uVar34 = uVar11 * uVar21;
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar62._0_8_ = SUB168(auVar61 ^ auVar151,0) << 0x3f;
        auVar62._8_8_ = SUB168(auVar61 ^ auVar151,8) << 0x3f;
        iVar10 = movmskpd((&switchD_0033a833::switchdataD_0051c97c)[uVar25 - 1] + 0x51c97c,auVar62);
        bVar24 = reduce_c ^ 1;
        puVar30 = (uint *)pMVar27;
        if ((iVar10 != 0) || (bVar24 != 0)) {
          if (iVar10 == 0 && reduce_c == false) {
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar12,sVar18,opt->blob_allocator);
            }
            else {
              puVar30 = (uint *)0x1;
              Mat::create(top_blob,1,1,uVar12,sVar18,opt->blob_allocator);
            }
            if (0 < (int)uVar12) {
              pvVar32 = bottom_blob->data;
              sVar18 = bottom_blob->elemsize;
              pvVar45 = top_blob->data;
              puVar30 = (uint *)(top_blob->elemsize * top_blob->cstep);
              sVar17 = bottom_blob->cstep;
              pMVar15 = (Mat *)0x0;
              do {
                fVar51 = 3.4028235e+38;
                if (0 < (int)uVar34) {
                  uVar31 = 0;
                  fVar51 = 3.4028235e+38;
                  do {
                    fVar2 = *(float *)((long)pvVar32 + uVar31 * 4);
                    if (fVar2 <= fVar51) {
                      fVar51 = fVar2;
                    }
                    uVar31 = uVar31 + 1;
                  } while (uVar34 != uVar31);
                }
                lVar13 = (long)puVar30 * (long)pMVar15;
                if (iVar9 == 0) {
                  lVar13 = (long)pMVar15 * 4;
                }
                *(float *)((long)pvVar45 + lVar13) = fVar51;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
              } while (pMVar15 != pMVar27);
            }
            goto LAB_00342112;
          }
          pMVar38 = (Mat *)(ulong)uVar21;
          bVar33 = (byte)iVar10 >> 1 | bVar37;
          if ((bVar33 & 1) == 0 && bVar24 == 0) {
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar11,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,uVar11,1,sVar18,opt->blob_allocator);
            }
            local_c8.cstep = 0;
            local_c8.data = (Mat *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            puVar30 = (uint *)0x1;
            Mat::create(&local_c8,1,uVar11,uVar12,sVar18,opt->workspace_allocator);
            auVar71 = _DAT_00514730;
            auVar151 = _DAT_00514720;
            auVar52 = _DAT_005140e0;
            iVar10 = -100;
            if (((Mat *)local_c8.data != (Mat *)0x0) &&
               (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
              uVar25 = (int)local_c8.cstep * local_c8.c;
              if (0 < (int)uVar25) {
                lVar29 = (ulong)uVar25 - 1;
                auVar80._8_4_ = (int)lVar29;
                auVar80._0_8_ = lVar29;
                auVar80._12_4_ = (int)((ulong)lVar29 >> 0x20);
                puVar30 = (uint *)0x0;
                auVar80 = auVar80 ^ _DAT_005140e0;
                do {
                  auVar181._8_4_ = (int)puVar30;
                  auVar181._0_8_ = puVar30;
                  auVar181._12_4_ = (int)((ulong)puVar30 >> 0x20);
                  auVar285 = (auVar181 | auVar71) ^ auVar52;
                  iVar9 = auVar80._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar80._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) = 0x7f7fffff;
                  }
                  if ((auVar285._12_4_ != auVar80._12_4_ || auVar285._8_4_ <= auVar80._8_4_) &&
                      auVar285._12_4_ <= auVar80._12_4_) {
                    *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                         0x7f7fffff;
                  }
                  auVar285 = (auVar181 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar80._0_4_)) {
                    *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                         0x7f7fffff;
                    *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                         0x7f7fffff;
                  }
                  puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != (Mat *)puVar30);
              }
              if (0 < (int)uVar12) {
                pvVar32 = bottom_blob->data;
                puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                pMVar47 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    pMVar46 = (Mat *)0x0;
                    pvVar45 = pvVar32;
                    do {
                      auVar161 = ZEXT816(0x7f7fffff);
                      if (0 < (int)uVar21) {
                        pMVar16 = (Mat *)0x0;
                        auVar161 = ZEXT816(0x7f7fffff);
                        do {
                          fVar51 = *(float *)((long)pvVar45 + (long)pMVar16 * 4);
                          if (fVar51 <= auVar161._0_4_) {
                            auVar161._0_4_ = fVar51;
                          }
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar38 != pMVar16);
                      }
                      *(int *)((long)(void **)local_c8.data +
                              (long)pMVar46 * 4 +
                              CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                              local_c8.cstep * (long)pMVar47) = auVar161._0_4_;
                      pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                      pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                    } while (pMVar46 != pMVar15);
                  }
                  pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                  pvVar32 = (void *)((long)&((Mat *)puVar30)->data + (long)pvVar32);
                } while (pMVar47 != pMVar27);
              }
              auVar71 = _DAT_00514730;
              auVar151 = _DAT_00514720;
              auVar52 = _DAT_005140e0;
              uVar25 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar25) {
                puVar30 = (uint *)top_blob->data;
                lVar13 = (ulong)uVar25 - 1;
                auVar81._8_4_ = (int)lVar13;
                auVar81._0_8_ = lVar13;
                auVar81._12_4_ = (int)((ulong)lVar13 >> 0x20);
                uVar31 = 0;
                auVar81 = auVar81 ^ _DAT_005140e0;
                do {
                  auVar182._8_4_ = (int)uVar31;
                  auVar182._0_8_ = uVar31;
                  auVar182._12_4_ = (int)(uVar31 >> 0x20);
                  auVar285 = (auVar182 | auVar71) ^ auVar52;
                  iVar9 = auVar81._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar81._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x7f7fffff;
                  }
                  if ((auVar285._12_4_ != auVar81._12_4_ || auVar285._8_4_ <= auVar81._8_4_) &&
                      auVar285._12_4_ <= auVar81._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar285 = (auVar182 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar81._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0x7f7fffff;
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) = 0x7f7fffff
                    ;
                  }
                  uVar31 = uVar31 + 4;
                } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
              }
              if (0 < (int)uVar12) {
                pvVar32 = top_blob->data;
                puVar30 = (uint *)0x0;
                pMVar38 = (Mat *)local_c8.data;
                do {
                  if (0 < (int)uVar11) {
                    pMVar47 = (Mat *)0x0;
                    do {
                      fVar2 = *(float *)((long)&pMVar38->data + (long)pMVar47 * 4);
                      fVar51 = *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                      if (fVar51 <= fVar2) {
                        fVar2 = fVar51;
                      }
                      *(float *)((long)pvVar32 + (long)pMVar47 * 4) = fVar2;
                      pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                    } while (pMVar15 != pMVar47);
                  }
                  puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                  pMVar38 = (Mat *)((long)&pMVar38->data +
                                   local_c8.cstep *
                                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
                } while ((Mat *)puVar30 != pMVar27);
              }
              iVar10 = 0;
            }
            piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                puVar30 = (uint *)local_c8.data;
                if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          else {
            bVar40 = (byte)iVar10 | bVar36;
            if ((bVar40 & 1) != 0 || bVar24 != 0) {
              if ((bVar33 & 1) == 0 && reduce_c == false) {
                if (iVar9 == 0) {
                  puVar30 = (uint *)pMVar15;
                  Mat::create(top_blob,uVar11,uVar12,sVar18,opt->blob_allocator);
                }
                else {
                  puVar30 = (uint *)0x1;
                  Mat::create(top_blob,1,uVar11,uVar12,sVar18,opt->blob_allocator);
                }
                if (0 < (int)uVar12) {
                  sVar18 = bottom_blob->elemsize;
                  if (iVar9 == 0) {
                    sVar17 = (size_t)top_blob->w;
                  }
                  else {
                    sVar17 = top_blob->cstep;
                  }
                  pvVar32 = bottom_blob->data;
                  sVar39 = top_blob->elemsize;
                  sVar5 = bottom_blob->cstep;
                  puVar30 = (uint *)top_blob->data;
                  pMVar47 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      pMVar46 = (Mat *)0x0;
                      pvVar45 = pvVar32;
                      do {
                        auVar166 = ZEXT816(0x7f7fffff);
                        if (0 < (int)uVar21) {
                          pMVar16 = (Mat *)0x0;
                          auVar166 = ZEXT816(0x7f7fffff);
                          do {
                            fVar51 = *(float *)((long)pvVar45 + (long)pMVar16 * 4);
                            if (fVar51 <= auVar166._0_4_) {
                              auVar166._0_4_ = fVar51;
                            }
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          } while (pMVar38 != pMVar16);
                        }
                        *(int *)((long)&((Mat *)puVar30)->data +
                                (long)pMVar46 * 4 + sVar17 * sVar39 * (long)pMVar47) =
                             auVar166._0_4_;
                        pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                        pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                      } while (pMVar46 != pMVar15);
                    }
                    pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                    pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar5);
                  } while (pMVar47 != pMVar27);
                }
              }
              else {
                puVar30 = (uint *)(ulong)CONCAT31(uVar6,bVar37 | bVar36 | bVar24);
                if (((bVar37 | bVar36) & 1) == 0 && bVar24 == 0) {
                  if (iVar9 == 0) {
                    Mat::create(top_blob,uVar21,uVar11,sVar18,opt->blob_allocator);
                    puVar30 = (uint *)pMVar38;
                  }
                  else {
                    Mat::create(top_blob,uVar21,uVar11,1,sVar18,opt->blob_allocator);
                    puVar30 = (uint *)pMVar38;
                  }
                  auVar71 = _DAT_00514730;
                  auVar151 = _DAT_00514720;
                  auVar52 = _DAT_005140e0;
                  uVar25 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar25) {
                    pvVar32 = top_blob->data;
                    lVar13 = (ulong)uVar25 - 1;
                    auVar111._8_4_ = (int)lVar13;
                    auVar111._0_8_ = lVar13;
                    auVar111._12_4_ = (int)((ulong)lVar13 >> 0x20);
                    uVar31 = 0;
                    auVar111 = auVar111 ^ _DAT_005140e0;
                    do {
                      auVar216._8_4_ = (int)uVar31;
                      auVar216._0_8_ = uVar31;
                      auVar216._12_4_ = (int)(uVar31 >> 0x20);
                      auVar285 = (auVar216 | auVar71) ^ auVar52;
                      iVar9 = auVar111._4_4_;
                      iVar10 = auVar111._12_4_;
                      if ((bool)(~(auVar285._4_4_ == iVar9 && auVar111._0_4_ < auVar285._0_4_ ||
                                  iVar9 < auVar285._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4) = 0x7f7fffff;
                      }
                      if ((auVar285._12_4_ != iVar10 || auVar285._8_4_ <= auVar111._8_4_) &&
                          auVar285._12_4_ <= iVar10) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar285 = (auVar216 | auVar151) ^ auVar52;
                      auVar269._0_4_ = -(uint)(auVar111._0_4_ < auVar285._0_4_);
                      auVar269._4_4_ = -(uint)(iVar9 < auVar285._4_4_);
                      auVar269._8_4_ = -(uint)(auVar111._8_4_ < auVar285._8_4_);
                      auVar269._12_4_ = -(uint)(iVar10 < auVar285._12_4_);
                      iVar9 = -(uint)(auVar285._4_4_ == iVar9);
                      iVar10 = -(uint)(auVar285._12_4_ == iVar10);
                      auVar291._4_4_ = iVar9;
                      auVar291._0_4_ = iVar9;
                      auVar291._8_4_ = iVar10;
                      auVar291._12_4_ = iVar10;
                      auVar217._4_4_ = auVar269._4_4_;
                      auVar217._0_4_ = auVar269._4_4_;
                      auVar217._8_4_ = auVar269._12_4_;
                      auVar217._12_4_ = auVar269._12_4_;
                      auVar218._8_4_ = 0xffffffff;
                      auVar218._0_8_ = 0xffffffffffffffff;
                      auVar218._12_4_ = 0xffffffff;
                      auVar218 = (auVar217 | auVar291 & auVar269) ^ auVar218;
                      if ((auVar218 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 8) = 0x7f7fffff;
                      }
                      puVar30 = (uint *)(ulong)auVar218._8_2_;
                      if ((auVar218 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 0xc) = 0x7f7fffff;
                      }
                      uVar31 = uVar31 + 4;
                    } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
                  }
                  if (0 < (int)uVar12) {
                    sVar18 = bottom_blob->elemsize;
                    sVar17 = bottom_blob->cstep;
                    pvVar32 = bottom_blob->data;
                    pvVar45 = top_blob->data;
                    puVar30 = (uint *)(ulong)uVar34;
                    pMVar15 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar34) {
                        pMVar38 = (Mat *)0x0;
                        do {
                          fVar2 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                          fVar51 = *(float *)((long)pvVar45 + (long)pMVar38 * 4);
                          if (fVar51 <= fVar2) {
                            fVar2 = fVar51;
                          }
                          *(float *)((long)pvVar45 + (long)pMVar38 * 4) = fVar2;
                          pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                        } while ((Mat *)puVar30 != pMVar38);
                      }
                      pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                      pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
                    } while (pMVar15 != pMVar27);
                  }
                }
                else if (reduce_c == false && (bVar40 & 1) == 0) {
                  if (iVar9 == 0) {
                    puVar30 = (uint *)pMVar38;
                    Mat::create(top_blob,uVar21,uVar12,sVar18,opt->blob_allocator);
                  }
                  else {
                    puVar30 = (uint *)(ulong)uVar21;
                    Mat::create(top_blob,uVar21,1,uVar12,sVar18,opt->blob_allocator);
                  }
                  auVar71 = _DAT_00514730;
                  auVar151 = _DAT_00514720;
                  auVar52 = _DAT_005140e0;
                  uVar25 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar25) {
                    pvVar32 = top_blob->data;
                    lVar13 = (ulong)uVar25 - 1;
                    auVar117._8_4_ = (int)lVar13;
                    auVar117._0_8_ = lVar13;
                    auVar117._12_4_ = (int)((ulong)lVar13 >> 0x20);
                    uVar31 = 0;
                    auVar117 = auVar117 ^ _DAT_005140e0;
                    do {
                      auVar227._8_4_ = (int)uVar31;
                      auVar227._0_8_ = uVar31;
                      auVar227._12_4_ = (int)(uVar31 >> 0x20);
                      auVar285 = (auVar227 | auVar71) ^ auVar52;
                      iVar10 = auVar117._4_4_;
                      iVar264 = auVar117._12_4_;
                      if ((bool)(~(auVar285._4_4_ == iVar10 && auVar117._0_4_ < auVar285._0_4_ ||
                                  iVar10 < auVar285._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4) = 0x7f7fffff;
                      }
                      if ((auVar285._12_4_ != iVar264 || auVar285._8_4_ <= auVar117._8_4_) &&
                          auVar285._12_4_ <= iVar264) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar285 = (auVar227 | auVar151) ^ auVar52;
                      auVar272._0_4_ = -(uint)(auVar117._0_4_ < auVar285._0_4_);
                      auVar272._4_4_ = -(uint)(iVar10 < auVar285._4_4_);
                      auVar272._8_4_ = -(uint)(auVar117._8_4_ < auVar285._8_4_);
                      auVar272._12_4_ = -(uint)(iVar264 < auVar285._12_4_);
                      iVar10 = -(uint)(auVar285._4_4_ == iVar10);
                      iVar264 = -(uint)(auVar285._12_4_ == iVar264);
                      auVar294._4_4_ = iVar10;
                      auVar294._0_4_ = iVar10;
                      auVar294._8_4_ = iVar264;
                      auVar294._12_4_ = iVar264;
                      auVar228._4_4_ = auVar272._4_4_;
                      auVar228._0_4_ = auVar272._4_4_;
                      auVar228._8_4_ = auVar272._12_4_;
                      auVar228._12_4_ = auVar272._12_4_;
                      auVar229._8_4_ = 0xffffffff;
                      auVar229._0_8_ = 0xffffffffffffffff;
                      auVar229._12_4_ = 0xffffffff;
                      auVar229 = (auVar228 | auVar294 & auVar272) ^ auVar229;
                      if ((auVar229 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 8) = 0x7f7fffff;
                      }
                      puVar30 = (uint *)(ulong)auVar229._8_2_;
                      if ((auVar229 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 0xc) = 0x7f7fffff;
                      }
                      uVar31 = uVar31 + 4;
                    } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
                  }
                  if (0 < (int)uVar12) {
                    sVar18 = bottom_blob->elemsize;
                    if (iVar9 == 0) {
                      sVar17 = (size_t)top_blob->w;
                    }
                    else {
                      sVar17 = top_blob->cstep;
                    }
                    puVar30 = (uint *)bottom_blob->data;
                    pvVar32 = top_blob->data;
                    sVar39 = top_blob->elemsize;
                    sVar5 = bottom_blob->cstep;
                    pMVar15 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar25 = 0;
                        pMVar47 = (Mat *)puVar30;
                        do {
                          if (0 < (int)uVar21) {
                            pMVar46 = (Mat *)0x0;
                            do {
                              fVar2 = *(float *)((long)&pMVar47->data + (long)pMVar46 * 4);
                              fVar51 = *(float *)((long)pvVar32 + (long)pMVar46 * 4);
                              if (fVar51 <= fVar2) {
                                fVar2 = fVar51;
                              }
                              *(float *)((long)pvVar32 + (long)pMVar46 * 4) = fVar2;
                              pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                            } while (pMVar38 != pMVar46);
                          }
                          uVar25 = uVar25 + 1;
                          pMVar47 = (Mat *)((long)&pMVar47->data + (long)(int)uVar21 * 4);
                        } while (uVar25 != uVar11);
                      }
                      pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                      puVar30 = (uint *)((long)&((Mat *)puVar30)->data + sVar18 * sVar5);
                      pvVar32 = (void *)((long)pvVar32 + sVar17 * sVar39);
                    } while (pMVar15 != pMVar27);
                  }
                }
              }
              goto LAB_00342112;
            }
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar21,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,uVar21,1,1,sVar18,opt->blob_allocator);
            }
            local_c8.cstep = 0;
            local_c8.data = (Mat *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            puVar30 = (uint *)pMVar38;
            Mat::create(&local_c8,uVar21,1,uVar12,sVar18,opt->workspace_allocator);
            auVar71 = _DAT_00514730;
            auVar151 = _DAT_00514720;
            auVar52 = _DAT_005140e0;
            iVar10 = -100;
            if (((Mat *)local_c8.data != (Mat *)0x0) &&
               (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
              uVar25 = (int)local_c8.cstep * local_c8.c;
              if (0 < (int)uVar25) {
                lVar29 = (ulong)uVar25 - 1;
                auVar95._8_4_ = (int)lVar29;
                auVar95._0_8_ = lVar29;
                auVar95._12_4_ = (int)((ulong)lVar29 >> 0x20);
                uVar31 = 0;
                auVar95 = auVar95 ^ _DAT_005140e0;
                do {
                  auVar199._8_4_ = (int)uVar31;
                  auVar199._0_8_ = uVar31;
                  auVar199._12_4_ = (int)(uVar31 >> 0x20);
                  auVar285 = (auVar199 | auVar71) ^ auVar52;
                  iVar9 = auVar95._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar95._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)(void **)local_c8.data + uVar31 * 4) = 0x7f7fffff;
                  }
                  if ((auVar285._12_4_ != auVar95._12_4_ || auVar285._8_4_ <= auVar95._8_4_) &&
                      auVar285._12_4_ <= auVar95._12_4_) {
                    *(undefined4 *)((long)(void **)local_c8.data + uVar31 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar285 = (auVar199 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar95._0_4_)) {
                    *(undefined4 *)((long)((long)local_c8.data + 8) + uVar31 * 4) = 0x7f7fffff;
                    *(undefined4 *)((long)((long)local_c8.data + 8) + uVar31 * 4 + 4) = 0x7f7fffff;
                  }
                  uVar31 = uVar31 + 4;
                } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
              }
              if (0 < (int)uVar12) {
                pvVar32 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar17 = bottom_blob->cstep;
                pMVar47 = (Mat *)0x0;
                pMVar15 = (Mat *)local_c8.data;
                do {
                  if (0 < (int)uVar11) {
                    uVar25 = 0;
                    pvVar45 = pvVar32;
                    do {
                      if (0 < (int)uVar21) {
                        pMVar46 = (Mat *)0x0;
                        do {
                          fVar2 = *(float *)((long)pvVar45 + (long)pMVar46 * 4);
                          fVar51 = *(float *)((long)&pMVar15->data + (long)pMVar46 * 4);
                          if (fVar51 <= fVar2) {
                            fVar2 = fVar51;
                          }
                          *(float *)((long)&pMVar15->data + (long)pMVar46 * 4) = fVar2;
                          pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                        } while (pMVar38 != pMVar46);
                      }
                      uVar25 = uVar25 + 1;
                      pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                    } while (uVar25 != uVar11);
                  }
                  pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                  pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
                  pMVar15 = (Mat *)((long)&pMVar15->data +
                                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                                   local_c8.cstep);
                } while (pMVar47 != pMVar27);
              }
              auVar71 = _DAT_00514730;
              auVar151 = _DAT_00514720;
              auVar52 = _DAT_005140e0;
              uVar25 = top_blob->c * (int)top_blob->cstep;
              puVar30 = (uint *)top_blob;
              if (0 < (int)uVar25) {
                puVar30 = (uint *)top_blob->data;
                lVar13 = (ulong)uVar25 - 1;
                auVar96._8_4_ = (int)lVar13;
                auVar96._0_8_ = lVar13;
                auVar96._12_4_ = (int)((ulong)lVar13 >> 0x20);
                uVar31 = 0;
                auVar96 = auVar96 ^ _DAT_005140e0;
                do {
                  auVar200._8_4_ = (int)uVar31;
                  auVar200._0_8_ = uVar31;
                  auVar200._12_4_ = (int)(uVar31 >> 0x20);
                  auVar285 = (auVar200 | auVar71) ^ auVar52;
                  iVar9 = auVar96._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar96._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x7f7fffff;
                  }
                  if ((auVar285._12_4_ != auVar96._12_4_ || auVar285._8_4_ <= auVar96._8_4_) &&
                      auVar285._12_4_ <= auVar96._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar285 = (auVar200 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar96._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0x7f7fffff;
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) = 0x7f7fffff
                    ;
                  }
                  uVar31 = uVar31 + 4;
                } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
              }
              if (0 < (int)uVar12) {
                pvVar32 = top_blob->data;
                puVar30 = (uint *)0x0;
                pMVar15 = (Mat *)local_c8.data;
                do {
                  if (0 < (int)uVar21) {
                    pMVar47 = (Mat *)0x0;
                    do {
                      fVar2 = *(float *)((long)&pMVar15->data + (long)pMVar47 * 4);
                      fVar51 = *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                      if (fVar51 <= fVar2) {
                        fVar2 = fVar51;
                      }
                      *(float *)((long)pvVar32 + (long)pMVar47 * 4) = fVar2;
                      pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                    } while (pMVar38 != pMVar47);
                  }
                  puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                  pMVar15 = (Mat *)((long)&pMVar15->data +
                                   local_c8.cstep *
                                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
                } while ((Mat *)puVar30 != pMVar27);
              }
              iVar10 = 0;
            }
            piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                puVar30 = (uint *)local_c8.data;
                if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          if (iVar9 == 0) {
            Mat::create(top_blob,1,sVar18,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,1,sVar18,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          Mat::create(&local_c8,uVar12,sVar18,opt->workspace_allocator);
          iVar10 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
            if ((int)uVar12 < 1) {
              fVar51 = 3.4028235e+38;
            }
            else {
              sVar18 = bottom_blob->elemsize;
              sVar17 = bottom_blob->cstep;
              pvVar32 = bottom_blob->data;
              puVar30 = (uint *)(ulong)uVar34;
              pMVar15 = (Mat *)0x0;
              do {
                fVar51 = 3.4028235e+38;
                if (0 < (int)uVar34) {
                  pMVar38 = (Mat *)0x0;
                  fVar51 = 3.4028235e+38;
                  do {
                    fVar2 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                    if (fVar2 <= fVar51) {
                      fVar51 = fVar2;
                    }
                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                  } while ((Mat *)puVar30 != pMVar38);
                }
                *(float *)((long)(void **)local_c8.data + (long)pMVar15 * 4) = fVar51;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
              } while (pMVar15 != pMVar27);
              fVar51 = 3.4028235e+38;
              pMVar15 = (Mat *)0x0;
              do {
                fVar2 = *(float *)((long)(void **)local_c8.data + (long)pMVar15 * 4);
                if (fVar2 <= fVar51) {
                  fVar51 = fVar2;
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              } while (pMVar27 != pMVar15);
            }
            *(float *)top_blob->data = fVar51;
            iVar10 = 0;
          }
          piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar30 = (uint *)local_c8.data;
              if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        break;
      case 4:
        uVar25 = bottom_blob->w;
        lVar13 = (long)(int)uVar25;
        uVar21 = bottom_blob->h;
        pMVar38 = (Mat *)(ulong)uVar21;
        uVar11 = bottom_blob->d;
        pMVar15 = (Mat *)(ulong)uVar11;
        uVar12 = bottom_blob->c;
        pMVar27 = (Mat *)(ulong)uVar12;
        uVar35 = uVar21 * uVar25;
        uVar34 = uVar35 * uVar11;
        auVar65._8_4_ = 0xffffffff;
        auVar65._0_8_ = 0xffffffffffffffff;
        auVar65._12_4_ = 0xffffffff;
        auVar66._0_8_ = SUB168(auVar65 ^ auVar151,0) << 0x3f;
        auVar66._8_8_ = SUB168(auVar65 ^ auVar151,8) << 0x3f;
        iVar10 = movmskpd(uVar11,auVar66);
        bVar49 = iVar10 != 0;
        bVar24 = reduce_d ^ 1;
        bVar33 = reduce_c ^ 1;
        puVar30 = (uint *)pMVar27;
        if ((bVar49 || bVar24 != 0) || (bVar33 != 0)) {
          if ((!bVar49 && bVar24 == 0) && reduce_c == false) {
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar12,sVar18,opt->blob_allocator);
            }
            else {
              puVar30 = (uint *)0x1;
              Mat::create(top_blob,1,1,1,uVar12,sVar18,opt->blob_allocator);
            }
            if (0 < (int)uVar12) {
              pvVar32 = bottom_blob->data;
              sVar18 = bottom_blob->elemsize;
              pvVar45 = top_blob->data;
              puVar30 = (uint *)(top_blob->elemsize * top_blob->cstep);
              sVar17 = bottom_blob->cstep;
              pMVar15 = (Mat *)0x0;
              do {
                fVar51 = 3.4028235e+38;
                if (0 < (int)uVar34) {
                  uVar31 = 0;
                  fVar51 = 3.4028235e+38;
                  do {
                    fVar2 = *(float *)((long)pvVar32 + uVar31 * 4);
                    if (fVar2 <= fVar51) {
                      fVar51 = fVar2;
                    }
                    uVar31 = uVar31 + 1;
                  } while (uVar34 != uVar31);
                }
                lVar13 = (long)puVar30 * (long)pMVar15;
                if (iVar9 == 0) {
                  lVar13 = (long)pMVar15 * 4;
                }
                *(float *)((long)pvVar45 + lVar13) = fVar51;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
              } while (pMVar15 != pMVar27);
            }
            goto LAB_00342112;
          }
          if ((bVar49 || reduce_d != false) || bVar33 != 0) {
            pMVar47 = (Mat *)(ulong)uVar25;
            bVar40 = (byte)iVar10 >> 1 | bVar37;
            if (((bVar40 & 1) == 0 && bVar24 == 0) && bVar33 == 0) {
              if (iVar9 == 0) {
                Mat::create(top_blob,uVar21,sVar18,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,1,uVar21,1,1,sVar18,opt->blob_allocator);
              }
              local_c8.cstep = 0;
              local_c8.data = (Mat *)0x0;
              local_c8.refcount._0_4_ = 0;
              local_c8.refcount._4_4_ = 0;
              local_c8.elemsize._0_4_ = 0;
              local_c8.elemsize._4_4_ = 0;
              local_c8.elempack = 0;
              local_c8.allocator = (Allocator *)0x0;
              local_c8.dims = 0;
              local_c8.w = 0;
              local_c8.h = 0;
              local_c8.d = 0;
              local_c8.c = 0;
              puVar30 = (uint *)0x1;
              Mat::create(&local_c8,1,uVar21,uVar12,sVar18,opt->workspace_allocator);
              auVar71 = _DAT_00514730;
              auVar151 = _DAT_00514720;
              auVar52 = _DAT_005140e0;
              iVar10 = -100;
              if (((Mat *)local_c8.data != (Mat *)0x0) &&
                 (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
                uVar34 = (int)local_c8.cstep * local_c8.c;
                if (0 < (int)uVar34) {
                  lVar29 = (ulong)uVar34 - 1;
                  auVar99._8_4_ = (int)lVar29;
                  auVar99._0_8_ = lVar29;
                  auVar99._12_4_ = (int)((ulong)lVar29 >> 0x20);
                  uVar31 = 0;
                  auVar99 = auVar99 ^ _DAT_005140e0;
                  do {
                    auVar203._8_4_ = (int)uVar31;
                    auVar203._0_8_ = uVar31;
                    auVar203._12_4_ = (int)(uVar31 >> 0x20);
                    auVar285 = (auVar203 | auVar71) ^ auVar52;
                    iVar9 = auVar99._4_4_;
                    if ((bool)(~(auVar285._4_4_ == iVar9 && auVar99._0_4_ < auVar285._0_4_ ||
                                iVar9 < auVar285._4_4_) & 1)) {
                      *(undefined4 *)((long)(void **)local_c8.data + uVar31 * 4) = 0x7f7fffff;
                    }
                    if ((auVar285._12_4_ != auVar99._12_4_ || auVar285._8_4_ <= auVar99._8_4_) &&
                        auVar285._12_4_ <= auVar99._12_4_) {
                      *(undefined4 *)((long)(void **)local_c8.data + uVar31 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar285 = (auVar203 | auVar151) ^ auVar52;
                    iVar10 = auVar285._4_4_;
                    if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar99._0_4_)) {
                      *(undefined4 *)((long)((long)local_c8.data + 8) + uVar31 * 4) = 0x7f7fffff;
                      *(undefined4 *)((long)((long)local_c8.data + 8) + uVar31 * 4 + 4) = 0x7f7fffff
                      ;
                    }
                    uVar31 = uVar31 + 4;
                  } while ((uVar34 + 3 & 0xfffffffc) != uVar31);
                }
                if (0 < (int)uVar12) {
                  pvVar32 = bottom_blob->data;
                  sVar18 = bottom_blob->elemsize;
                  sVar17 = bottom_blob->cstep;
                  pMVar15 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      lVar29 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                               local_c8.cstep * (long)pMVar15;
                      pvVar45 = (void *)(sVar18 * sVar17 * (long)pMVar15 + (long)pvVar32);
                      uVar34 = 0;
                      do {
                        if (0 < (int)uVar21) {
                          pMVar46 = (Mat *)0x0;
                          do {
                            if (0 < (int)uVar25) {
                              auVar100 = ZEXT416(*(uint *)((long)(void **)local_c8.data +
                                                          (long)pMVar46 * 4 + lVar29));
                              pMVar16 = (Mat *)0x0;
                              do {
                                fVar51 = *(float *)((long)pvVar45 + (long)pMVar16 * 4);
                                if (fVar51 <= auVar100._0_4_) {
                                  auVar100._0_4_ = fVar51;
                                }
                                *(int *)((long)(void **)local_c8.data + (long)pMVar46 * 4 + lVar29)
                                     = auVar100._0_4_;
                                pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                              } while (pMVar47 != pMVar16);
                            }
                            pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                            pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                          } while (pMVar46 != pMVar38);
                        }
                        uVar34 = uVar34 + 1;
                      } while (uVar34 != uVar11);
                    }
                    pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                  } while (pMVar15 != pMVar27);
                }
                auVar71 = _DAT_00514730;
                auVar151 = _DAT_00514720;
                auVar52 = _DAT_005140e0;
                uVar25 = top_blob->c * (int)top_blob->cstep;
                puVar30 = (uint *)top_blob;
                if (0 < (int)uVar25) {
                  puVar30 = (uint *)top_blob->data;
                  lVar13 = (ulong)uVar25 - 1;
                  auVar101._8_4_ = (int)lVar13;
                  auVar101._0_8_ = lVar13;
                  auVar101._12_4_ = (int)((ulong)lVar13 >> 0x20);
                  uVar31 = 0;
                  auVar101 = auVar101 ^ _DAT_005140e0;
                  do {
                    auVar204._8_4_ = (int)uVar31;
                    auVar204._0_8_ = uVar31;
                    auVar204._12_4_ = (int)(uVar31 >> 0x20);
                    auVar285 = (auVar204 | auVar71) ^ auVar52;
                    iVar9 = auVar101._4_4_;
                    if ((bool)(~(auVar285._4_4_ == iVar9 && auVar101._0_4_ < auVar285._0_4_ ||
                                iVar9 < auVar285._4_4_) & 1)) {
                      *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x7f7fffff;
                    }
                    if ((auVar285._12_4_ != auVar101._12_4_ || auVar285._8_4_ <= auVar101._8_4_) &&
                        auVar285._12_4_ <= auVar101._12_4_) {
                      *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar285 = (auVar204 | auVar151) ^ auVar52;
                    iVar10 = auVar285._4_4_;
                    if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar101._0_4_)) {
                      *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0x7f7fffff;
                      *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) =
                           0x7f7fffff;
                    }
                    uVar31 = uVar31 + 4;
                  } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
                }
                if (0 < (int)uVar12) {
                  pvVar32 = top_blob->data;
                  puVar30 = (uint *)0x0;
                  pMVar15 = (Mat *)local_c8.data;
                  do {
                    if (0 < (int)uVar21) {
                      pMVar47 = (Mat *)0x0;
                      do {
                        fVar2 = *(float *)((long)&pMVar15->data + (long)pMVar47 * 4);
                        fVar51 = *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                        if (fVar51 <= fVar2) {
                          fVar2 = fVar51;
                        }
                        *(float *)((long)pvVar32 + (long)pMVar47 * 4) = fVar2;
                        pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                      } while (pMVar38 != pMVar47);
                    }
                    puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                    pMVar15 = (Mat *)((long)&pMVar15->data +
                                     local_c8.cstep *
                                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                                     );
                  } while ((Mat *)puVar30 != pMVar27);
                }
                iVar10 = 0;
              }
              piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  puVar30 = (uint *)local_c8.data;
                  if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            else {
              bVar28 = (byte)iVar10 | bVar36;
              if (((bVar28 & 1) == 0 && bVar24 == 0) && bVar33 == 0) {
                if (iVar9 == 0) {
                  Mat::create(top_blob,uVar25,sVar18,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,uVar25,1,1,1,sVar18,opt->blob_allocator);
                }
                local_c8.cstep = 0;
                local_c8.data = (Mat *)0x0;
                local_c8.refcount._0_4_ = 0;
                local_c8.refcount._4_4_ = 0;
                local_c8.elemsize._0_4_ = 0;
                local_c8.elemsize._4_4_ = 0;
                local_c8.elempack = 0;
                local_c8.allocator = (Allocator *)0x0;
                local_c8.dims = 0;
                local_c8.w = 0;
                local_c8.h = 0;
                local_c8.d = 0;
                local_c8.c = 0;
                puVar30 = (uint *)(ulong)uVar25;
                Mat::create(&local_c8,uVar25,1,uVar12,sVar18,opt->workspace_allocator);
                auVar71 = _DAT_00514730;
                auVar151 = _DAT_00514720;
                auVar52 = _DAT_005140e0;
                iVar10 = -100;
                if (((Mat *)local_c8.data != (Mat *)0x0) &&
                   (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
                  uVar34 = (int)local_c8.cstep * local_c8.c;
                  if (0 < (int)uVar34) {
                    lVar29 = (ulong)uVar34 - 1;
                    auVar106._8_4_ = (int)lVar29;
                    auVar106._0_8_ = lVar29;
                    auVar106._12_4_ = (int)((ulong)lVar29 >> 0x20);
                    puVar30 = (uint *)0x0;
                    auVar106 = auVar106 ^ _DAT_005140e0;
                    do {
                      auVar209._8_4_ = (int)puVar30;
                      auVar209._0_8_ = puVar30;
                      auVar209._12_4_ = (int)((ulong)puVar30 >> 0x20);
                      auVar285 = (auVar209 | auVar71) ^ auVar52;
                      iVar9 = auVar106._4_4_;
                      if ((bool)(~(auVar285._4_4_ == iVar9 && auVar106._0_4_ < auVar285._0_4_ ||
                                  iVar9 < auVar285._4_4_) & 1)) {
                        *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) =
                             0x7f7fffff;
                      }
                      if ((auVar285._12_4_ != auVar106._12_4_ || auVar285._8_4_ <= auVar106._8_4_)
                          && auVar285._12_4_ <= auVar106._12_4_) {
                        *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                             0x7f7fffff;
                      }
                      auVar285 = (auVar209 | auVar151) ^ auVar52;
                      iVar10 = auVar285._4_4_;
                      if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar106._0_4_))
                      {
                        *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                             0x7f7fffff;
                        *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                             0x7f7fffff;
                      }
                      puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                    } while ((Mat *)(ulong)(uVar34 + 3 & 0xfffffffc) != (Mat *)puVar30);
                  }
                  if (0 < (int)uVar12) {
                    pvVar32 = bottom_blob->data;
                    puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar38 = (Mat *)0x0;
                    pMVar15 = (Mat *)local_c8.data;
                    do {
                      if (0 < (int)uVar11) {
                        pvVar45 = (void *)((long)puVar30 * (long)pMVar38 + (long)pvVar32);
                        uVar34 = 0;
                        do {
                          if (0 < (int)uVar21) {
                            uVar35 = 0;
                            do {
                              if (0 < (int)uVar25) {
                                pMVar46 = (Mat *)0x0;
                                do {
                                  fVar2 = *(float *)((long)pvVar45 + (long)pMVar46 * 4);
                                  fVar51 = *(float *)((long)&pMVar15->data + (long)pMVar46 * 4);
                                  if (fVar51 <= fVar2) {
                                    fVar2 = fVar51;
                                  }
                                  *(float *)((long)&pMVar15->data + (long)pMVar46 * 4) = fVar2;
                                  pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                                } while (pMVar47 != pMVar46);
                              }
                              pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                              uVar35 = uVar35 + 1;
                            } while (uVar35 != uVar21);
                          }
                          uVar34 = uVar34 + 1;
                        } while (uVar34 != uVar11);
                      }
                      pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                      pMVar15 = (Mat *)((long)&pMVar15->data +
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize) * local_c8.cstep);
                    } while (pMVar38 != pMVar27);
                  }
                  auVar71 = _DAT_00514730;
                  auVar151 = _DAT_00514720;
                  auVar52 = _DAT_005140e0;
                  uVar21 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar21) {
                    puVar30 = (uint *)top_blob->data;
                    lVar13 = (ulong)uVar21 - 1;
                    auVar107._8_4_ = (int)lVar13;
                    auVar107._0_8_ = lVar13;
                    auVar107._12_4_ = (int)((ulong)lVar13 >> 0x20);
                    uVar31 = 0;
                    auVar107 = auVar107 ^ _DAT_005140e0;
                    do {
                      auVar210._8_4_ = (int)uVar31;
                      auVar210._0_8_ = uVar31;
                      auVar210._12_4_ = (int)(uVar31 >> 0x20);
                      auVar285 = (auVar210 | auVar71) ^ auVar52;
                      iVar9 = auVar107._4_4_;
                      if ((bool)(~(auVar285._4_4_ == iVar9 && auVar107._0_4_ < auVar285._0_4_ ||
                                  iVar9 < auVar285._4_4_) & 1)) {
                        *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x7f7fffff;
                      }
                      if ((auVar285._12_4_ != auVar107._12_4_ || auVar285._8_4_ <= auVar107._8_4_)
                          && auVar285._12_4_ <= auVar107._12_4_) {
                        *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0x7f7fffff
                        ;
                      }
                      auVar285 = (auVar210 | auVar151) ^ auVar52;
                      iVar10 = auVar285._4_4_;
                      if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar107._0_4_))
                      {
                        *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0x7f7fffff
                        ;
                        *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) =
                             0x7f7fffff;
                      }
                      uVar31 = uVar31 + 4;
                    } while ((uVar21 + 3 & 0xfffffffc) != uVar31);
                  }
                  if (0 < (int)uVar12) {
                    pvVar32 = top_blob->data;
                    puVar30 = (uint *)0x0;
                    pMVar15 = (Mat *)local_c8.data;
                    do {
                      if (0 < (int)uVar25) {
                        pMVar38 = (Mat *)0x0;
                        do {
                          fVar2 = *(float *)((long)&pMVar15->data + (long)pMVar38 * 4);
                          fVar51 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                          if (fVar51 <= fVar2) {
                            fVar2 = fVar51;
                          }
                          *(float *)((long)pvVar32 + (long)pMVar38 * 4) = fVar2;
                          pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                        } while (pMVar47 != pMVar38);
                      }
                      puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                      pMVar15 = (Mat *)((long)&pMVar15->data +
                                       local_c8.cstep *
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize));
                    } while ((Mat *)puVar30 != pMVar27);
                  }
                  iVar10 = 0;
                }
                piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                if (piVar7 != (int *)0x0) {
                  LOCK();
                  *piVar7 = *piVar7 + -1;
                  UNLOCK();
                  if (*piVar7 == 0) {
                    puVar30 = (uint *)local_c8.data;
                    if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                    (*(local_c8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              else {
                if ((!bVar49 && reduce_d == false) && reduce_c == false) {
                  if (iVar9 == 0) {
                    puVar30 = (uint *)pMVar15;
                    Mat::create(top_blob,uVar11,uVar12,sVar18,opt->blob_allocator);
                  }
                  else {
                    puVar30 = (uint *)0x1;
                    Mat::create(top_blob,1,1,uVar11,uVar12,sVar18,opt->blob_allocator);
                  }
                  if (0 < (int)uVar12) {
                    sVar18 = bottom_blob->elemsize;
                    if (iVar9 == 0) {
                      sVar17 = (size_t)top_blob->w;
                    }
                    else {
                      sVar17 = top_blob->cstep;
                    }
                    puVar30 = (uint *)bottom_blob->data;
                    pvVar32 = top_blob->data;
                    sVar39 = top_blob->elemsize;
                    sVar5 = bottom_blob->cstep;
                    pMVar38 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar11) {
                        pMVar46 = (Mat *)0x0;
                        pMVar47 = (Mat *)puVar30;
                        do {
                          auVar169 = ZEXT816(0x7f7fffff);
                          if (0 < (int)uVar35) {
                            uVar31 = 0;
                            auVar169 = ZEXT816(0x7f7fffff);
                            do {
                              fVar51 = *(float *)((long)&pMVar47->data + uVar31 * 4);
                              if (fVar51 <= auVar169._0_4_) {
                                auVar169._0_4_ = fVar51;
                              }
                              uVar31 = uVar31 + 1;
                            } while (uVar35 != uVar31);
                          }
                          *(int *)((long)pvVar32 +
                                  (long)pMVar46 * 4 + sVar17 * sVar39 * (long)pMVar38) =
                               auVar169._0_4_;
                          pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                          pMVar47 = (Mat *)((long)&pMVar47->data + (long)(int)uVar35 * 4);
                        } while (pMVar46 != pMVar15);
                      }
                      pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                      puVar30 = (uint *)((long)&((Mat *)puVar30)->data + sVar18 * sVar5);
                    } while (pMVar38 != pMVar27);
                  }
                  goto LAB_00342112;
                }
                if (((bVar40 & 1) == 0 && reduce_d == false) && bVar33 == 0) {
                  if (iVar9 == 0) {
                    Mat::create(top_blob,uVar21,uVar11,sVar18,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,1,uVar21,uVar11,1,sVar18,opt->blob_allocator);
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (Mat *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize._0_4_ = 0;
                  local_c8.elemsize._4_4_ = 0;
                  local_c8.elempack = 0;
                  local_c8.allocator = (Allocator *)0x0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  puVar30 = (uint *)pMVar38;
                  Mat::create(&local_c8,uVar21,uVar11,uVar12,sVar18,opt->workspace_allocator);
                  auVar71 = _DAT_00514730;
                  auVar151 = _DAT_00514720;
                  auVar52 = _DAT_005140e0;
                  iVar10 = -100;
                  if (((Mat *)local_c8.data != (Mat *)0x0) &&
                     (puVar30 = (uint *)local_c8.cstep, local_c8.cstep * (long)local_c8.c != 0)) {
                    uVar34 = (int)local_c8.cstep * local_c8.c;
                    if (0 < (int)uVar34) {
                      lVar29 = (ulong)uVar34 - 1;
                      auVar119._8_4_ = (int)lVar29;
                      auVar119._0_8_ = lVar29;
                      auVar119._12_4_ = (int)((ulong)lVar29 >> 0x20);
                      puVar30 = (uint *)0x0;
                      auVar119 = auVar119 ^ _DAT_005140e0;
                      do {
                        auVar233._8_4_ = (int)puVar30;
                        auVar233._0_8_ = puVar30;
                        auVar233._12_4_ = (int)((ulong)puVar30 >> 0x20);
                        auVar285 = (auVar233 | auVar71) ^ auVar52;
                        iVar10 = auVar119._4_4_;
                        if ((bool)(~(auVar285._4_4_ == iVar10 && auVar119._0_4_ < auVar285._0_4_ ||
                                    iVar10 < auVar285._4_4_) & 1)) {
                          *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) =
                               0x7f7fffff;
                        }
                        if ((auVar285._12_4_ != auVar119._12_4_ || auVar285._8_4_ <= auVar119._8_4_)
                            && auVar285._12_4_ <= auVar119._12_4_) {
                          *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                               0x7f7fffff;
                        }
                        auVar285 = (auVar233 | auVar151) ^ auVar52;
                        iVar264 = auVar285._4_4_;
                        if (iVar264 <= iVar10 &&
                            (iVar264 != iVar10 || auVar285._0_4_ <= auVar119._0_4_)) {
                          *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                               0x7f7fffff;
                          *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                               0x7f7fffff;
                        }
                        puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                      } while ((Mat *)(ulong)(uVar34 + 3 & 0xfffffffc) != (Mat *)puVar30);
                    }
                    if (0 < (int)uVar12) {
                      pvVar32 = bottom_blob->data;
                      puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar46 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar11) {
                          pvVar45 = (void *)((long)puVar30 * (long)pMVar46 + (long)pvVar32);
                          pMVar16 = (Mat *)0x0;
                          do {
                            if (0 < (int)uVar21) {
                              lVar29 = (long)local_c8.w *
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize) * (long)pMVar16 +
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize) * local_c8.cstep *
                                       (long)pMVar46;
                              pMVar43 = (Mat *)0x0;
                              do {
                                if (0 < (int)uVar25) {
                                  auVar120 = ZEXT416(*(uint *)((long)(void **)local_c8.data +
                                                              (long)pMVar43 * 4 + lVar29));
                                  pMVar26 = (Mat *)0x0;
                                  do {
                                    fVar51 = *(float *)((long)pvVar45 + (long)pMVar26 * 4);
                                    if (fVar51 <= auVar120._0_4_) {
                                      auVar120._0_4_ = fVar51;
                                    }
                                    *(int *)((long)(void **)local_c8.data +
                                            (long)pMVar43 * 4 + lVar29) = auVar120._0_4_;
                                    pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                  } while (pMVar47 != pMVar26);
                                }
                                pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                                pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                              } while (pMVar43 != pMVar38);
                            }
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          } while (pMVar16 != pMVar15);
                        }
                        pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                      } while (pMVar46 != pMVar27);
                    }
                    auVar71 = _DAT_00514730;
                    auVar151 = _DAT_00514720;
                    auVar52 = _DAT_005140e0;
                    uVar25 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar25) {
                      puVar30 = (uint *)top_blob->data;
                      lVar13 = (ulong)uVar25 - 1;
                      auVar121._8_4_ = (int)lVar13;
                      auVar121._0_8_ = lVar13;
                      auVar121._12_4_ = (int)((ulong)lVar13 >> 0x20);
                      uVar31 = 0;
                      auVar121 = auVar121 ^ _DAT_005140e0;
                      do {
                        auVar234._8_4_ = (int)uVar31;
                        auVar234._0_8_ = uVar31;
                        auVar234._12_4_ = (int)(uVar31 >> 0x20);
                        auVar285 = (auVar234 | auVar71) ^ auVar52;
                        iVar10 = auVar121._4_4_;
                        if ((bool)(~(auVar285._4_4_ == iVar10 && auVar121._0_4_ < auVar285._0_4_ ||
                                    iVar10 < auVar285._4_4_) & 1)) {
                          *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x7f7fffff;
                        }
                        if ((auVar285._12_4_ != auVar121._12_4_ || auVar285._8_4_ <= auVar121._8_4_)
                            && auVar285._12_4_ <= auVar121._12_4_) {
                          *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) =
                               0x7f7fffff;
                        }
                        auVar285 = (auVar234 | auVar151) ^ auVar52;
                        iVar264 = auVar285._4_4_;
                        if (iVar264 <= iVar10 &&
                            (iVar264 != iVar10 || auVar285._0_4_ <= auVar121._0_4_)) {
                          *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) =
                               0x7f7fffff;
                          *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) =
                               0x7f7fffff;
                        }
                        uVar31 = uVar31 + 4;
                      } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
                    }
                    if (0 < (int)uVar12) {
                      puVar30 = (uint *)0x0;
                      pMVar47 = (Mat *)local_c8.data;
                      do {
                        if (0 < (int)uVar11) {
                          iVar10 = 1;
                          if (iVar9 != 0) {
                            iVar10 = top_blob->h;
                          }
                          iVar264 = top_blob->w;
                          sVar18 = top_blob->elemsize;
                          pvVar32 = top_blob->data;
                          pMVar16 = (Mat *)0x0;
                          pMVar46 = pMVar47;
                          do {
                            if (0 < (int)uVar21) {
                              pMVar43 = (Mat *)0x0;
                              do {
                                fVar2 = *(float *)((long)&pMVar46->data + (long)pMVar43 * 4);
                                fVar51 = *(float *)((long)pvVar32 + (long)pMVar43 * 4);
                                if (fVar51 <= fVar2) {
                                  fVar2 = fVar51;
                                }
                                *(float *)((long)pvVar32 + (long)pMVar43 * 4) = fVar2;
                                pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                              } while (pMVar38 != pMVar43);
                            }
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                            pMVar46 = (Mat *)((long)&pMVar46->data +
                                             (long)local_c8.w *
                                             CONCAT44(local_c8.elemsize._4_4_,
                                                      (undefined4)local_c8.elemsize));
                            pvVar32 = (void *)((long)pvVar32 + (long)iVar10 * sVar18 * (long)iVar264
                                              );
                          } while (pMVar16 != pMVar15);
                        }
                        puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                        pMVar47 = (Mat *)((long)&pMVar47->data +
                                         local_c8.cstep *
                                         CONCAT44(local_c8.elemsize._4_4_,
                                                  (undefined4)local_c8.elemsize));
                      } while ((Mat *)puVar30 != pMVar27);
                    }
                    iVar10 = 0;
                  }
                  piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar7 != (int *)0x0) {
                    LOCK();
                    *piVar7 = *piVar7 + -1;
                    UNLOCK();
                    if (*piVar7 == 0) {
                      puVar30 = (uint *)local_c8.data;
                      if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                      (*(local_c8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                else {
                  bVar37 = bVar37 | bVar36;
                  if ((bVar24 != 0 || (bVar37 & 1) != 0) || bVar33 != 0) {
                    if (((bVar40 & 1) == 0 && bVar24 == 0) && reduce_c == false) {
                      if (iVar9 == 0) {
                        puVar30 = (uint *)(ulong)uVar21;
                        Mat::create(top_blob,uVar21,uVar12,sVar18,opt->blob_allocator);
                      }
                      else {
                        puVar30 = (uint *)0x1;
                        Mat::create(top_blob,1,uVar21,1,uVar12,sVar18,opt->blob_allocator);
                      }
                      auVar71 = _DAT_00514730;
                      auVar151 = _DAT_00514720;
                      auVar52 = _DAT_005140e0;
                      if (0 < (int)uVar12) {
                        sVar18 = bottom_blob->elemsize;
                        pvVar32 = top_blob->data;
                        if (iVar9 == 0) {
                          sVar17 = (size_t)top_blob->w;
                        }
                        else {
                          sVar17 = top_blob->cstep;
                        }
                        puVar30 = (uint *)bottom_blob->data;
                        sVar39 = bottom_blob->cstep;
                        lVar23 = sVar17 * top_blob->elemsize;
                        puVar1 = (undefined1 *)((long)&pMVar38[-1].cstep + 7);
                        auVar131._8_4_ = (int)puVar1;
                        auVar131._0_8_ = puVar1;
                        auVar131._12_4_ = (int)((ulong)puVar1 >> 0x20);
                        lVar29 = (long)pvVar32 + 0xc;
                        pMVar15 = (Mat *)0x0;
                        auVar131 = auVar131 ^ _DAT_005140e0;
                        do {
                          if (0 < (int)uVar21) {
                            lVar41 = 0;
                            auVar276 = auVar71;
                            auVar297 = auVar151;
                            do {
                              auVar285 = auVar276 ^ auVar52;
                              iVar9 = auVar131._4_4_;
                              if ((bool)(~(auVar285._4_4_ == iVar9 &&
                                           auVar131._0_4_ < auVar285._0_4_ || iVar9 < auVar285._4_4_
                                          ) & 1)) {
                                *(undefined4 *)(lVar29 + -0xc + lVar41) = 0x7f7fffff;
                              }
                              if ((auVar285._12_4_ != auVar131._12_4_ ||
                                  auVar285._8_4_ <= auVar131._8_4_) &&
                                  auVar285._12_4_ <= auVar131._12_4_) {
                                *(undefined4 *)(lVar29 + -8 + lVar41) = 0x7f7fffff;
                              }
                              auVar285 = auVar297 ^ auVar52;
                              iVar10 = auVar285._4_4_;
                              if (iVar10 <= iVar9 &&
                                  (iVar10 != iVar9 || auVar285._0_4_ <= auVar131._0_4_)) {
                                *(undefined4 *)(lVar29 + -4 + lVar41) = 0x7f7fffff;
                                *(undefined4 *)(lVar29 + lVar41) = 0x7f7fffff;
                              }
                              lVar286 = auVar276._8_8_;
                              auVar276._0_8_ = auVar276._0_8_ + 4;
                              auVar276._8_8_ = lVar286 + 4;
                              lVar286 = auVar297._8_8_;
                              auVar297._0_8_ = auVar297._0_8_ + 4;
                              auVar297._8_8_ = lVar286 + 4;
                              lVar41 = lVar41 + 0x10;
                            } while ((ulong)(uVar21 + 3 >> 2) << 4 != lVar41);
                          }
                          if (0 < (int)uVar11) {
                            ppvVar42 = (void **)((long)&((Mat *)puVar30)->data +
                                                sVar18 * sVar39 * (long)pMVar15);
                            lVar41 = lVar23 * (long)pMVar15;
                            uVar12 = 0;
                            do {
                              if (0 < (int)uVar21) {
                                pMVar46 = (Mat *)0x0;
                                do {
                                  if (0 < (int)uVar25) {
                                    auVar277 = ZEXT416(*(uint *)((long)pvVar32 +
                                                                (long)pMVar46 * 4 + lVar41));
                                    pMVar16 = (Mat *)0x0;
                                    do {
                                      fVar51 = *(float *)((long)ppvVar42 + (long)pMVar16 * 4);
                                      if (fVar51 <= auVar277._0_4_) {
                                        auVar277._0_4_ = fVar51;
                                      }
                                      *(int *)((long)pvVar32 + (long)pMVar46 * 4 + lVar41) =
                                           auVar277._0_4_;
                                      pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                                    } while (pMVar47 != pMVar16);
                                  }
                                  ppvVar42 = (void **)((long)ppvVar42 + lVar13 * 4);
                                  pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                                } while (pMVar46 != pMVar38);
                              }
                              uVar12 = uVar12 + 1;
                            } while (uVar12 != uVar11);
                          }
                          pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                          lVar29 = lVar29 + lVar23;
                        } while (pMVar15 != pMVar27);
                      }
                    }
                    else {
                      puVar30 = (uint *)pMVar47;
                      if (((bVar28 & 1) == 0 && reduce_d == false) && bVar33 == 0) {
                        if (iVar9 == 0) {
                          Mat::create(top_blob,uVar25,uVar11,sVar18,opt->blob_allocator);
                        }
                        else {
                          Mat::create(top_blob,uVar25,1,uVar11,1,sVar18,opt->blob_allocator);
                        }
                        local_c8.cstep = 0;
                        local_c8.data = (Mat *)0x0;
                        local_c8.refcount._0_4_ = 0;
                        local_c8.refcount._4_4_ = 0;
                        local_c8.elemsize._0_4_ = 0;
                        local_c8.elemsize._4_4_ = 0;
                        local_c8.elempack = 0;
                        local_c8.allocator = (Allocator *)0x0;
                        local_c8.dims = 0;
                        local_c8.w = 0;
                        local_c8.h = 0;
                        local_c8.d = 0;
                        local_c8.c = 0;
                        Mat::create(&local_c8,uVar25,uVar11,uVar12,sVar18,opt->workspace_allocator);
                        auVar71 = _DAT_00514730;
                        auVar151 = _DAT_00514720;
                        auVar52 = _DAT_005140e0;
                        iVar10 = -100;
                        if (((Mat *)local_c8.data != (Mat *)0x0) &&
                           (local_c8.cstep * (long)local_c8.c != 0)) {
                          uVar34 = (int)local_c8.cstep * local_c8.c;
                          if (0 < (int)uVar34) {
                            lVar29 = (ulong)uVar34 - 1;
                            auVar135._8_4_ = (int)lVar29;
                            auVar135._0_8_ = lVar29;
                            auVar135._12_4_ = (int)((ulong)lVar29 >> 0x20);
                            puVar30 = (uint *)0x0;
                            auVar135 = auVar135 ^ _DAT_005140e0;
                            do {
                              auVar245._8_4_ = (int)puVar30;
                              auVar245._0_8_ = puVar30;
                              auVar245._12_4_ = (int)((ulong)puVar30 >> 0x20);
                              auVar285 = (auVar245 | auVar71) ^ auVar52;
                              iVar9 = auVar135._4_4_;
                              if ((bool)(~(auVar285._4_4_ == iVar9 &&
                                           auVar135._0_4_ < auVar285._0_4_ || iVar9 < auVar285._4_4_
                                          ) & 1)) {
                                *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) =
                                     0x7f7fffff;
                              }
                              if ((auVar285._12_4_ != auVar135._12_4_ ||
                                  auVar285._8_4_ <= auVar135._8_4_) &&
                                  auVar285._12_4_ <= auVar135._12_4_) {
                                *(undefined4 *)
                                 ((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) = 0x7f7fffff
                                ;
                              }
                              auVar285 = (auVar245 | auVar151) ^ auVar52;
                              iVar10 = auVar285._4_4_;
                              if (iVar10 <= iVar9 &&
                                  (iVar10 != iVar9 || auVar285._0_4_ <= auVar135._0_4_)) {
                                *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4)
                                     = 0x7f7fffff;
                                *(undefined4 *)
                                 ((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                                     0x7f7fffff;
                              }
                              puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                            } while ((Mat *)(ulong)(uVar34 + 3 & 0xfffffffc) != (Mat *)puVar30);
                          }
                          if (0 < (int)uVar12) {
                            pvVar32 = bottom_blob->data;
                            puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                            pMVar46 = (Mat *)0x0;
                            pMVar38 = (Mat *)local_c8.data;
                            do {
                              if (0 < (int)uVar11) {
                                pvVar45 = (void *)((long)puVar30 * (long)pMVar46 + (long)pvVar32);
                                pMVar43 = (Mat *)0x0;
                                pMVar16 = pMVar38;
                                do {
                                  if (0 < (int)uVar21) {
                                    uVar34 = 0;
                                    do {
                                      if (0 < (int)uVar25) {
                                        pMVar26 = (Mat *)0x0;
                                        do {
                                          fVar2 = *(float *)((long)pvVar45 + (long)pMVar26 * 4);
                                          fVar51 = *(float *)((long)&pMVar16->data +
                                                             (long)pMVar26 * 4);
                                          if (fVar51 <= fVar2) {
                                            fVar2 = fVar51;
                                          }
                                          *(float *)((long)&pMVar16->data + (long)pMVar26 * 4) =
                                               fVar2;
                                          pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                        } while (pMVar47 != pMVar26);
                                      }
                                      pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                                      uVar34 = uVar34 + 1;
                                    } while (uVar34 != uVar21);
                                  }
                                  pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                                  pMVar16 = (Mat *)((long)&pMVar16->data +
                                                   (long)local_c8.w *
                                                   CONCAT44(local_c8.elemsize._4_4_,
                                                            (undefined4)local_c8.elemsize));
                                } while (pMVar43 != pMVar15);
                              }
                              pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                              pMVar38 = (Mat *)((long)&pMVar38->data +
                                               CONCAT44(local_c8.elemsize._4_4_,
                                                        (undefined4)local_c8.elemsize) *
                                               local_c8.cstep);
                            } while (pMVar46 != pMVar27);
                          }
                          auVar71 = _DAT_00514730;
                          auVar151 = _DAT_00514720;
                          auVar52 = _DAT_005140e0;
                          uVar21 = top_blob->c * (int)top_blob->cstep;
                          if (0 < (int)uVar21) {
                            puVar30 = (uint *)top_blob->data;
                            lVar13 = (ulong)uVar21 - 1;
                            auVar136._8_4_ = (int)lVar13;
                            auVar136._0_8_ = lVar13;
                            auVar136._12_4_ = (int)((ulong)lVar13 >> 0x20);
                            uVar31 = 0;
                            auVar136 = auVar136 ^ _DAT_005140e0;
                            do {
                              auVar246._8_4_ = (int)uVar31;
                              auVar246._0_8_ = uVar31;
                              auVar246._12_4_ = (int)(uVar31 >> 0x20);
                              auVar285 = (auVar246 | auVar71) ^ auVar52;
                              iVar9 = auVar136._4_4_;
                              if ((bool)(~(auVar285._4_4_ == iVar9 &&
                                           auVar136._0_4_ < auVar285._0_4_ || iVar9 < auVar285._4_4_
                                          ) & 1)) {
                                *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) =
                                     0x7f7fffff;
                              }
                              if ((auVar285._12_4_ != auVar136._12_4_ ||
                                  auVar285._8_4_ <= auVar136._8_4_) &&
                                  auVar285._12_4_ <= auVar136._12_4_) {
                                *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) =
                                     0x7f7fffff;
                              }
                              auVar285 = (auVar246 | auVar151) ^ auVar52;
                              iVar10 = auVar285._4_4_;
                              if (iVar10 <= iVar9 &&
                                  (iVar10 != iVar9 || auVar285._0_4_ <= auVar136._0_4_)) {
                                *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) =
                                     0x7f7fffff;
                                *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4)
                                     = 0x7f7fffff;
                              }
                              uVar31 = uVar31 + 4;
                            } while ((uVar21 + 3 & 0xfffffffc) != uVar31);
                          }
                          if (0 < (int)uVar12) {
                            puVar30 = (uint *)top_blob->data;
                            iVar9 = top_blob->w;
                            sVar18 = top_blob->elemsize;
                            pMVar46 = (Mat *)0x0;
                            pMVar38 = (Mat *)local_c8.data;
                            do {
                              if (0 < (int)uVar11) {
                                pMVar26 = (Mat *)0x0;
                                pMVar16 = (Mat *)puVar30;
                                pMVar43 = pMVar38;
                                do {
                                  if (0 < (int)uVar25) {
                                    pMVar22 = (Mat *)0x0;
                                    do {
                                      fVar2 = *(float *)((long)&pMVar43->data + (long)pMVar22 * 4);
                                      fVar51 = *(float *)((long)&pMVar16->data + (long)pMVar22 * 4);
                                      if (fVar51 <= fVar2) {
                                        fVar2 = fVar51;
                                      }
                                      *(float *)((long)&pMVar16->data + (long)pMVar22 * 4) = fVar2;
                                      pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                                    } while (pMVar47 != pMVar22);
                                  }
                                  pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                  pMVar43 = (Mat *)((long)&pMVar43->data +
                                                   (long)local_c8.w *
                                                   CONCAT44(local_c8.elemsize._4_4_,
                                                            (undefined4)local_c8.elemsize));
                                  pMVar16 = (Mat *)((long)&pMVar16->data + (long)iVar9 * sVar18);
                                } while (pMVar26 != pMVar15);
                              }
                              pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                              pMVar38 = (Mat *)((long)&pMVar38->data +
                                               local_c8.cstep *
                                               CONCAT44(local_c8.elemsize._4_4_,
                                                        (undefined4)local_c8.elemsize));
                            } while (pMVar46 != pMVar27);
                          }
                          iVar10 = 0;
                        }
                        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                        if (piVar7 != (int *)0x0) {
                          LOCK();
                          *piVar7 = *piVar7 + -1;
                          UNLOCK();
                          if (*piVar7 == 0) {
                            puVar30 = (uint *)local_c8.data;
                            if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                            (*(local_c8.allocator)->_vptr_Allocator[3])();
                          }
                        }
                        break;
                      }
                      if (((bVar28 & 1) == 0 && bVar24 == 0) && reduce_c == false) {
                        if (iVar9 == 0) {
                          Mat::create(top_blob,uVar25,uVar12,sVar18,opt->blob_allocator);
                        }
                        else {
                          puVar30 = (uint *)(ulong)uVar25;
                          Mat::create(top_blob,uVar25,1,1,uVar12,sVar18,opt->blob_allocator);
                        }
                        auVar71 = _DAT_00514730;
                        auVar151 = _DAT_00514720;
                        auVar52 = _DAT_005140e0;
                        if (0 < (int)uVar12) {
                          sVar18 = bottom_blob->elemsize;
                          pvVar32 = top_blob->data;
                          if (iVar9 == 0) {
                            sVar17 = (size_t)top_blob->w;
                          }
                          else {
                            sVar17 = top_blob->cstep;
                          }
                          puVar30 = (uint *)bottom_blob->data;
                          sVar39 = bottom_blob->cstep;
                          puVar1 = (undefined1 *)((long)&pMVar47[-1].cstep + 7);
                          auVar140._8_4_ = (int)puVar1;
                          auVar140._0_8_ = puVar1;
                          auVar140._12_4_ = (int)((ulong)puVar1 >> 0x20);
                          lVar23 = sVar17 * top_blob->elemsize;
                          lVar29 = (long)pvVar32 + 0xc;
                          pMVar15 = (Mat *)0x0;
                          auVar140 = auVar140 ^ _DAT_005140e0;
                          do {
                            if (0 < (int)uVar25) {
                              lVar41 = 0;
                              auVar280 = auVar71;
                              auVar300 = auVar151;
                              do {
                                auVar285 = auVar280 ^ auVar52;
                                iVar9 = auVar140._4_4_;
                                if ((bool)(~(auVar285._4_4_ == iVar9 &&
                                             auVar140._0_4_ < auVar285._0_4_ ||
                                            iVar9 < auVar285._4_4_) & 1)) {
                                  *(undefined4 *)(lVar29 + -0xc + lVar41) = 0x7f7fffff;
                                }
                                if ((auVar285._12_4_ != auVar140._12_4_ ||
                                    auVar285._8_4_ <= auVar140._8_4_) &&
                                    auVar285._12_4_ <= auVar140._12_4_) {
                                  *(undefined4 *)(lVar29 + -8 + lVar41) = 0x7f7fffff;
                                }
                                auVar285 = auVar300 ^ auVar52;
                                iVar10 = auVar285._4_4_;
                                if (iVar10 <= iVar9 &&
                                    (iVar10 != iVar9 || auVar285._0_4_ <= auVar140._0_4_)) {
                                  *(undefined4 *)(lVar29 + -4 + lVar41) = 0x7f7fffff;
                                  *(undefined4 *)(lVar29 + lVar41) = 0x7f7fffff;
                                }
                                lVar286 = auVar280._8_8_;
                                auVar280._0_8_ = auVar280._0_8_ + 4;
                                auVar280._8_8_ = lVar286 + 4;
                                lVar286 = auVar300._8_8_;
                                auVar300._0_8_ = auVar300._0_8_ + 4;
                                auVar300._8_8_ = lVar286 + 4;
                                lVar41 = lVar41 + 0x10;
                              } while ((ulong)(uVar25 + 3 >> 2) << 4 != lVar41);
                            }
                            if (0 < (int)uVar11) {
                              ppvVar42 = (void **)((long)&((Mat *)puVar30)->data +
                                                  sVar18 * sVar39 * (long)pMVar15);
                              uVar12 = 0;
                              do {
                                if (0 < (int)uVar21) {
                                  uVar34 = 0;
                                  do {
                                    if (0 < (int)uVar25) {
                                      pMVar38 = (Mat *)0x0;
                                      do {
                                        fVar2 = *(float *)((long)ppvVar42 + (long)pMVar38 * 4);
                                        fVar51 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                                        if (fVar51 <= fVar2) {
                                          fVar2 = fVar51;
                                        }
                                        *(float *)((long)pvVar32 + (long)pMVar38 * 4) = fVar2;
                                        pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                                      } while (pMVar47 != pMVar38);
                                    }
                                    ppvVar42 = (void **)((long)ppvVar42 + lVar13 * 4);
                                    uVar34 = uVar34 + 1;
                                  } while (uVar34 != uVar21);
                                }
                                uVar12 = uVar12 + 1;
                              } while (uVar12 != uVar11);
                            }
                            pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                            lVar29 = lVar29 + lVar23;
                            pvVar32 = (void *)((long)pvVar32 + lVar23);
                          } while (pMVar15 != pMVar27);
                        }
                      }
                      else if (((bVar40 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                        if (iVar9 == 0) {
                          puVar30 = (uint *)(ulong)uVar21;
                          Mat::create(top_blob,uVar21,uVar11,uVar12,sVar18,opt->blob_allocator);
                        }
                        else {
                          puVar30 = (uint *)0x1;
                          Mat::create(top_blob,1,uVar21,uVar11,uVar12,sVar18,opt->blob_allocator);
                        }
                        if (0 < (int)uVar12) {
                          pvVar32 = bottom_blob->data;
                          sVar18 = bottom_blob->elemsize;
                          sVar17 = top_blob->elemsize;
                          sVar39 = top_blob->cstep;
                          puVar30 = (uint *)top_blob->data;
                          sVar5 = bottom_blob->cstep;
                          pMVar15 = (Mat *)0x0;
                          do {
                            if (0 < (int)(uVar21 * uVar11)) {
                              uVar31 = 0;
                              pvVar45 = pvVar32;
                              do {
                                auVar172 = ZEXT816(0x7f7fffff);
                                if (0 < (int)uVar25) {
                                  pMVar38 = (Mat *)0x0;
                                  auVar172 = ZEXT816(0x7f7fffff);
                                  do {
                                    fVar51 = *(float *)((long)pvVar45 + (long)pMVar38 * 4);
                                    if (fVar51 <= auVar172._0_4_) {
                                      auVar172._0_4_ = fVar51;
                                    }
                                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                                  } while (pMVar47 != pMVar38);
                                }
                                *(int *)((long)&((Mat *)puVar30)->data +
                                        uVar31 * 4 + sVar17 * sVar39 * (long)pMVar15) =
                                     auVar172._0_4_;
                                uVar31 = uVar31 + 1;
                                pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                              } while (uVar31 != uVar21 * uVar11);
                            }
                            pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                            pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar5);
                          } while (pMVar15 != pMVar27);
                        }
                      }
                      else if ((reduce_d == false && (bVar37 & 1) == 0) && bVar33 == 0) {
                        if (iVar9 == 0) {
                          Mat::create(top_blob,uVar25,uVar21,uVar11,sVar18,opt->blob_allocator);
                        }
                        else {
                          puVar30 = (uint *)(ulong)uVar25;
                          Mat::create(top_blob,uVar25,uVar21,uVar11,1,sVar18,opt->blob_allocator);
                        }
                        auVar71 = _DAT_00514730;
                        auVar151 = _DAT_00514720;
                        auVar52 = _DAT_005140e0;
                        uVar34 = top_blob->c * (int)top_blob->cstep;
                        if (0 < (int)uVar34) {
                          pvVar32 = top_blob->data;
                          lVar29 = (ulong)uVar34 - 1;
                          auVar143._8_4_ = (int)lVar29;
                          auVar143._0_8_ = lVar29;
                          auVar143._12_4_ = (int)((ulong)lVar29 >> 0x20);
                          uVar31 = 0;
                          auVar143 = auVar143 ^ _DAT_005140e0;
                          do {
                            auVar252._8_4_ = (int)uVar31;
                            auVar252._0_8_ = uVar31;
                            auVar252._12_4_ = (int)(uVar31 >> 0x20);
                            auVar285 = (auVar252 | auVar71) ^ auVar52;
                            iVar10 = auVar143._4_4_;
                            iVar264 = auVar143._12_4_;
                            if ((bool)(~(auVar285._4_4_ == iVar10 && auVar143._0_4_ < auVar285._0_4_
                                        || iVar10 < auVar285._4_4_) & 1)) {
                              *(undefined4 *)((long)pvVar32 + uVar31 * 4) = 0x7f7fffff;
                            }
                            if ((auVar285._12_4_ != iVar264 || auVar285._8_4_ <= auVar143._8_4_) &&
                                auVar285._12_4_ <= iVar264) {
                              *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 4) = 0x7f7fffff;
                            }
                            auVar285 = (auVar252 | auVar151) ^ auVar52;
                            auVar283._0_4_ = -(uint)(auVar143._0_4_ < auVar285._0_4_);
                            auVar283._4_4_ = -(uint)(iVar10 < auVar285._4_4_);
                            auVar283._8_4_ = -(uint)(auVar143._8_4_ < auVar285._8_4_);
                            auVar283._12_4_ = -(uint)(iVar264 < auVar285._12_4_);
                            iVar10 = -(uint)(auVar285._4_4_ == iVar10);
                            iVar264 = -(uint)(auVar285._12_4_ == iVar264);
                            auVar303._4_4_ = iVar10;
                            auVar303._0_4_ = iVar10;
                            auVar303._8_4_ = iVar264;
                            auVar303._12_4_ = iVar264;
                            auVar253._4_4_ = auVar283._4_4_;
                            auVar253._0_4_ = auVar283._4_4_;
                            auVar253._8_4_ = auVar283._12_4_;
                            auVar253._12_4_ = auVar283._12_4_;
                            auVar254._8_4_ = 0xffffffff;
                            auVar254._0_8_ = 0xffffffffffffffff;
                            auVar254._12_4_ = 0xffffffff;
                            auVar254 = (auVar253 | auVar303 & auVar283) ^ auVar254;
                            if ((auVar254 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                              *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 8) = 0x7f7fffff;
                            }
                            puVar30 = (uint *)(ulong)auVar254._8_2_;
                            if ((auVar254 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                              *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 0xc) = 0x7f7fffff;
                            }
                            uVar31 = uVar31 + 4;
                          } while ((uVar34 + 3 & 0xfffffffc) != uVar31);
                        }
                        if (0 < (int)uVar12) {
                          pvVar32 = bottom_blob->data;
                          sVar18 = bottom_blob->elemsize;
                          sVar17 = bottom_blob->cstep;
                          puVar30 = (uint *)0x0;
                          do {
                            if (0 < (int)uVar11) {
                              iVar10 = top_blob->w;
                              if (iVar9 == 0) {
                                sVar39 = top_blob->cstep;
                              }
                              else {
                                sVar39 = (long)top_blob->h * (long)iVar10;
                              }
                              pvVar48 = (void *)(sVar18 * sVar17 * (long)puVar30 + (long)pvVar32);
                              pvVar45 = top_blob->data;
                              sVar5 = top_blob->elemsize;
                              pMVar46 = (Mat *)0x0;
                              do {
                                if (0 < (int)uVar21) {
                                  pMVar16 = (Mat *)0x0;
                                  pvVar44 = pvVar45;
                                  do {
                                    if (0 < (int)uVar25) {
                                      pMVar43 = (Mat *)0x0;
                                      do {
                                        fVar2 = *(float *)((long)pvVar48 + (long)pMVar43 * 4);
                                        fVar51 = *(float *)((long)pvVar44 + (long)pMVar43 * 4);
                                        if (fVar51 <= fVar2) {
                                          fVar2 = fVar51;
                                        }
                                        *(float *)((long)pvVar44 + (long)pMVar43 * 4) = fVar2;
                                        pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                                      } while (pMVar47 != pMVar43);
                                    }
                                    pvVar48 = (void *)((long)pvVar48 + lVar13 * 4);
                                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                                    pvVar44 = (void *)((long)pvVar44 + (long)iVar10 * sVar5);
                                  } while (pMVar16 != pMVar38);
                                }
                                pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                                pvVar45 = (void *)((long)pvVar45 + sVar39 * sVar5);
                              } while (pMVar46 != pMVar15);
                            }
                            puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                          } while ((Mat *)puVar30 != pMVar27);
                        }
                      }
                      else {
                        puVar30 = (uint *)(ulong)CONCAT31((int3)((uint)iVar10 >> 8),
                                                          bVar28 | reduce_d | reduce_c);
                        if (((bVar28 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                          if (iVar9 == 0) {
                            puVar30 = (uint *)pMVar47;
                            Mat::create(top_blob,uVar25,uVar11,uVar12,sVar18,opt->blob_allocator);
                          }
                          else {
                            puVar30 = (uint *)(ulong)uVar25;
                            Mat::create(top_blob,uVar25,1,uVar11,uVar12,sVar18,opt->blob_allocator);
                          }
                          auVar71 = _DAT_00514730;
                          auVar151 = _DAT_00514720;
                          auVar52 = _DAT_005140e0;
                          if (0 < (int)uVar12) {
                            pvVar32 = bottom_blob->data;
                            sVar18 = bottom_blob->elemsize;
                            sVar17 = bottom_blob->cstep;
                            iVar9 = top_blob->w;
                            pvVar45 = top_blob->data;
                            uVar31 = top_blob->elemsize;
                            lVar13 = (long)top_blob->h * (long)iVar9;
                            pMVar38 = (Mat *)0x0;
                            iVar10 = (int)((uVar31 * lVar13 + 0xf & 0xfffffffffffffff0) / uVar31);
                            if (top_blob->dims == 4) {
                              iVar10 = (int)lVar13;
                            }
                            uVar12 = iVar10 * top_blob->d;
                            lVar13 = (ulong)uVar12 - 1;
                            auVar146._8_4_ = (int)lVar13;
                            auVar146._0_8_ = lVar13;
                            auVar146._12_4_ = (int)((ulong)lVar13 >> 0x20);
                            lVar13 = (long)pvVar45 + 0xc;
                            lVar29 = top_blob->cstep * uVar31;
                            auVar146 = auVar146 ^ _DAT_005140e0;
                            puVar30 = (uint *)top_blob;
                            do {
                              if (0 < (int)uVar12) {
                                uVar14 = 0;
                                do {
                                  auVar259._8_4_ = (int)uVar14;
                                  auVar259._0_8_ = uVar14;
                                  auVar259._12_4_ = (int)(uVar14 >> 0x20);
                                  auVar285 = (auVar259 | auVar71) ^ auVar52;
                                  iVar10 = auVar146._4_4_;
                                  if ((bool)(~(iVar10 < auVar285._4_4_ ||
                                              auVar146._0_4_ < auVar285._0_4_ &&
                                              auVar285._4_4_ == iVar10) & 1)) {
                                    *(undefined4 *)(lVar13 + -0xc + uVar14 * 4) = 0x7f7fffff;
                                  }
                                  if (auVar285._12_4_ <= auVar146._12_4_ &&
                                      (auVar285._8_4_ <= auVar146._8_4_ ||
                                      auVar285._12_4_ != auVar146._12_4_)) {
                                    *(undefined4 *)(lVar13 + -8 + uVar14 * 4) = 0x7f7fffff;
                                  }
                                  auVar285 = (auVar259 | auVar151) ^ auVar52;
                                  iVar264 = auVar285._4_4_;
                                  if (iVar264 <= iVar10 &&
                                      (iVar264 != iVar10 || auVar285._0_4_ <= auVar146._0_4_)) {
                                    *(undefined4 *)(lVar13 + -4 + uVar14 * 4) = 0x7f7fffff;
                                    *(undefined4 *)(lVar13 + uVar14 * 4) = 0x7f7fffff;
                                  }
                                  uVar14 = uVar14 + 4;
                                } while ((uVar12 + 3 & 0xfffffffc) != uVar14);
                              }
                              if (0 < (int)uVar11) {
                                pvVar44 = (void *)(sVar18 * sVar17 * (long)pMVar38 + (long)pvVar32);
                                pMVar46 = (Mat *)0x0;
                                pvVar48 = pvVar45;
                                do {
                                  if (0 < (int)uVar21) {
                                    uVar34 = 0;
                                    do {
                                      if (0 < (int)uVar25) {
                                        puVar30 = (uint *)0x0;
                                        do {
                                          fVar2 = *(float *)((long)pvVar44 + (long)puVar30 * 4);
                                          fVar51 = *(float *)((long)pvVar48 + (long)puVar30 * 4);
                                          if (fVar51 <= fVar2) {
                                            fVar2 = fVar51;
                                          }
                                          *(float *)((long)pvVar48 + (long)puVar30 * 4) = fVar2;
                                          puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                                        } while (pMVar47 != (Mat *)puVar30);
                                      }
                                      pvVar44 = (void *)((long)pvVar44 + (long)(int)uVar25 * 4);
                                      uVar34 = uVar34 + 1;
                                    } while (uVar34 != uVar21);
                                  }
                                  pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                                  pvVar48 = (void *)((long)pvVar48 + uVar31 * (long)iVar9);
                                } while (pMVar46 != pMVar15);
                              }
                              pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                              lVar13 = lVar13 + lVar29;
                              pvVar45 = (void *)((long)pvVar45 + lVar29);
                            } while (pMVar38 != pMVar27);
                          }
                        }
                        else if (reduce_c == false && (bVar24 == 0 && (bVar37 & 1) == 0)) {
                          if (iVar9 == 0) {
                            puVar30 = (uint *)pMVar47;
                            Mat::create(top_blob,uVar25,uVar21,uVar12,sVar18,opt->blob_allocator);
                          }
                          else {
                            puVar30 = (uint *)pMVar47;
                            Mat::create(top_blob,uVar25,uVar21,1,uVar12,sVar18,opt->blob_allocator);
                          }
                          auVar71 = _DAT_00514730;
                          auVar151 = _DAT_00514720;
                          auVar52 = _DAT_005140e0;
                          if (0 < (int)uVar12) {
                            pvVar32 = bottom_blob->data;
                            sVar18 = bottom_blob->elemsize;
                            sVar17 = bottom_blob->cstep;
                            iVar9 = top_blob->w;
                            pvVar45 = top_blob->data;
                            uVar31 = top_blob->elemsize;
                            lVar13 = (long)top_blob->h * (long)iVar9;
                            pMVar15 = (Mat *)0x0;
                            iVar10 = (int)((uVar31 * lVar13 + 0xf & 0xfffffffffffffff0) / uVar31);
                            if (top_blob->dims == 4) {
                              iVar10 = (int)lVar13;
                            }
                            uVar12 = iVar10 * top_blob->d;
                            lVar13 = (ulong)uVar12 - 1;
                            auVar149._8_4_ = (int)lVar13;
                            auVar149._0_8_ = lVar13;
                            auVar149._12_4_ = (int)((ulong)lVar13 >> 0x20);
                            lVar13 = (long)pvVar45 + 0xc;
                            lVar29 = top_blob->cstep * uVar31;
                            auVar149 = auVar149 ^ _DAT_005140e0;
                            puVar30 = (uint *)top_blob;
                            do {
                              if (0 < (int)uVar12) {
                                uVar14 = 0;
                                do {
                                  auVar262._8_4_ = (int)uVar14;
                                  auVar262._0_8_ = uVar14;
                                  auVar262._12_4_ = (int)(uVar14 >> 0x20);
                                  auVar285 = (auVar262 | auVar71) ^ auVar52;
                                  iVar10 = auVar149._4_4_;
                                  if ((bool)(~(iVar10 < auVar285._4_4_ ||
                                              auVar149._0_4_ < auVar285._0_4_ &&
                                              auVar285._4_4_ == iVar10) & 1)) {
                                    *(undefined4 *)(lVar13 + -0xc + uVar14 * 4) = 0x7f7fffff;
                                  }
                                  if (auVar285._12_4_ <= auVar149._12_4_ &&
                                      (auVar285._8_4_ <= auVar149._8_4_ ||
                                      auVar285._12_4_ != auVar149._12_4_)) {
                                    *(undefined4 *)(lVar13 + -8 + uVar14 * 4) = 0x7f7fffff;
                                  }
                                  auVar285 = (auVar262 | auVar151) ^ auVar52;
                                  iVar264 = auVar285._4_4_;
                                  if (iVar264 <= iVar10 &&
                                      (iVar264 != iVar10 || auVar285._0_4_ <= auVar149._0_4_)) {
                                    *(undefined4 *)(lVar13 + -4 + uVar14 * 4) = 0x7f7fffff;
                                    *(undefined4 *)(lVar13 + uVar14 * 4) = 0x7f7fffff;
                                  }
                                  uVar14 = uVar14 + 4;
                                } while ((uVar12 + 3 & 0xfffffffc) != uVar14);
                              }
                              if (0 < (int)uVar11) {
                                pvVar48 = (void *)(sVar18 * sVar17 * (long)pMVar15 + (long)pvVar32);
                                uVar34 = 0;
                                do {
                                  if (0 < (int)uVar21) {
                                    pMVar46 = (Mat *)0x0;
                                    pvVar44 = pvVar45;
                                    do {
                                      if (0 < (int)uVar25) {
                                        puVar30 = (uint *)0x0;
                                        do {
                                          fVar2 = *(float *)((long)pvVar48 + (long)puVar30 * 4);
                                          fVar51 = *(float *)((long)pvVar44 + (long)puVar30 * 4);
                                          if (fVar51 <= fVar2) {
                                            fVar2 = fVar51;
                                          }
                                          *(float *)((long)pvVar44 + (long)puVar30 * 4) = fVar2;
                                          puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                                        } while (pMVar47 != (Mat *)puVar30);
                                      }
                                      pvVar48 = (void *)((long)pvVar48 + (long)(int)uVar25 * 4);
                                      pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                                      pvVar44 = (void *)((long)pvVar44 + uVar31 * (long)iVar9);
                                    } while (pMVar46 != pMVar38);
                                  }
                                  uVar34 = uVar34 + 1;
                                } while (uVar34 != uVar11);
                              }
                              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                              lVar13 = lVar13 + lVar29;
                              pvVar45 = (void *)((long)pvVar45 + lVar29);
                            } while (pMVar15 != pMVar27);
                          }
                        }
                      }
                    }
                    goto LAB_00342112;
                  }
                  if (iVar9 == 0) {
                    Mat::create(top_blob,uVar25,uVar21,sVar18,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar25,uVar21,1,1,sVar18,opt->blob_allocator);
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (Mat *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize._0_4_ = 0;
                  local_c8.elemsize._4_4_ = 0;
                  local_c8.elempack = 0;
                  local_c8.allocator = (Allocator *)0x0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  puVar30 = (uint *)(ulong)uVar25;
                  Mat::create(&local_c8,uVar25,uVar21,uVar12,sVar18,opt->workspace_allocator);
                  auVar71 = _DAT_00514730;
                  auVar151 = _DAT_00514720;
                  auVar52 = _DAT_005140e0;
                  iVar10 = -100;
                  if (((Mat *)local_c8.data != (Mat *)0x0) &&
                     (local_c8.cstep * (long)local_c8.c != 0)) {
                    uVar34 = (int)local_c8.cstep * local_c8.c;
                    if (0 < (int)uVar34) {
                      lVar29 = (ulong)uVar34 - 1;
                      auVar126._8_4_ = (int)lVar29;
                      auVar126._0_8_ = lVar29;
                      auVar126._12_4_ = (int)((ulong)lVar29 >> 0x20);
                      puVar30 = (uint *)0x0;
                      auVar126 = auVar126 ^ _DAT_005140e0;
                      do {
                        auVar239._8_4_ = (int)puVar30;
                        auVar239._0_8_ = puVar30;
                        auVar239._12_4_ = (int)((ulong)puVar30 >> 0x20);
                        auVar285 = (auVar239 | auVar71) ^ auVar52;
                        iVar9 = auVar126._4_4_;
                        if ((bool)(~(auVar285._4_4_ == iVar9 && auVar126._0_4_ < auVar285._0_4_ ||
                                    iVar9 < auVar285._4_4_) & 1)) {
                          *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) =
                               0x7f7fffff;
                        }
                        if ((auVar285._12_4_ != auVar126._12_4_ || auVar285._8_4_ <= auVar126._8_4_)
                            && auVar285._12_4_ <= auVar126._12_4_) {
                          *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                               0x7f7fffff;
                        }
                        auVar285 = (auVar239 | auVar151) ^ auVar52;
                        iVar10 = auVar285._4_4_;
                        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar126._0_4_)
                           ) {
                          *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                               0x7f7fffff;
                          *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                               0x7f7fffff;
                        }
                        puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                      } while ((Mat *)(ulong)(uVar34 + 3 & 0xfffffffc) != (Mat *)puVar30);
                    }
                    if (0 < (int)uVar12) {
                      pvVar32 = bottom_blob->data;
                      puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar46 = (Mat *)0x0;
                      pMVar15 = (Mat *)local_c8.data;
                      do {
                        if (0 < (int)uVar11) {
                          pvVar45 = (void *)((long)puVar30 * (long)pMVar46 + (long)pvVar32);
                          uVar34 = 0;
                          do {
                            if (0 < (int)uVar21) {
                              pMVar43 = (Mat *)0x0;
                              pMVar16 = pMVar15;
                              do {
                                if (0 < (int)uVar25) {
                                  pMVar26 = (Mat *)0x0;
                                  do {
                                    fVar2 = *(float *)((long)pvVar45 + (long)pMVar26 * 4);
                                    fVar51 = *(float *)((long)&pMVar16->data + (long)pMVar26 * 4);
                                    if (fVar51 <= fVar2) {
                                      fVar2 = fVar51;
                                    }
                                    *(float *)((long)&pMVar16->data + (long)pMVar26 * 4) = fVar2;
                                    pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                  } while (pMVar47 != pMVar26);
                                }
                                pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                                pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                                pMVar16 = (Mat *)((long)&pMVar16->data +
                                                 (long)local_c8.w *
                                                 CONCAT44(local_c8.elemsize._4_4_,
                                                          (undefined4)local_c8.elemsize));
                              } while (pMVar43 != pMVar38);
                            }
                            uVar34 = uVar34 + 1;
                          } while (uVar34 != uVar11);
                        }
                        pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                        pMVar15 = (Mat *)((long)&pMVar15->data +
                                         CONCAT44(local_c8.elemsize._4_4_,
                                                  (undefined4)local_c8.elemsize) * local_c8.cstep);
                      } while (pMVar46 != pMVar27);
                    }
                    auVar71 = _DAT_00514730;
                    auVar151 = _DAT_00514720;
                    auVar52 = _DAT_005140e0;
                    uVar11 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar11) {
                      puVar30 = (uint *)top_blob->data;
                      lVar13 = (ulong)uVar11 - 1;
                      auVar127._8_4_ = (int)lVar13;
                      auVar127._0_8_ = lVar13;
                      auVar127._12_4_ = (int)((ulong)lVar13 >> 0x20);
                      uVar31 = 0;
                      auVar127 = auVar127 ^ _DAT_005140e0;
                      do {
                        auVar240._8_4_ = (int)uVar31;
                        auVar240._0_8_ = uVar31;
                        auVar240._12_4_ = (int)(uVar31 >> 0x20);
                        auVar285 = (auVar240 | auVar71) ^ auVar52;
                        iVar9 = auVar127._4_4_;
                        if ((bool)(~(auVar285._4_4_ == iVar9 && auVar127._0_4_ < auVar285._0_4_ ||
                                    iVar9 < auVar285._4_4_) & 1)) {
                          *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x7f7fffff;
                        }
                        if ((auVar285._12_4_ != auVar127._12_4_ || auVar285._8_4_ <= auVar127._8_4_)
                            && auVar285._12_4_ <= auVar127._12_4_) {
                          *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) =
                               0x7f7fffff;
                        }
                        auVar285 = (auVar240 | auVar151) ^ auVar52;
                        iVar10 = auVar285._4_4_;
                        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar127._0_4_)
                           ) {
                          *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) =
                               0x7f7fffff;
                          *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) =
                               0x7f7fffff;
                        }
                        uVar31 = uVar31 + 4;
                      } while ((uVar11 + 3 & 0xfffffffc) != uVar31);
                    }
                    if (0 < (int)uVar12) {
                      puVar30 = (uint *)top_blob->data;
                      iVar9 = top_blob->w;
                      sVar18 = top_blob->elemsize;
                      pMVar46 = (Mat *)0x0;
                      pMVar15 = (Mat *)local_c8.data;
                      do {
                        if (0 < (int)uVar21) {
                          pMVar26 = (Mat *)0x0;
                          pMVar16 = pMVar15;
                          pMVar43 = (Mat *)puVar30;
                          do {
                            if (0 < (int)uVar25) {
                              pMVar22 = (Mat *)0x0;
                              do {
                                fVar2 = *(float *)((long)&pMVar16->data + (long)pMVar22 * 4);
                                fVar51 = *(float *)((long)&pMVar43->data + (long)pMVar22 * 4);
                                if (fVar51 <= fVar2) {
                                  fVar2 = fVar51;
                                }
                                *(float *)((long)&pMVar43->data + (long)pMVar22 * 4) = fVar2;
                                pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                              } while (pMVar47 != pMVar22);
                            }
                            pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                            pMVar16 = (Mat *)((long)&pMVar16->data +
                                             (long)local_c8.w *
                                             CONCAT44(local_c8.elemsize._4_4_,
                                                      (undefined4)local_c8.elemsize));
                            pMVar43 = (Mat *)((long)&pMVar43->data + (long)iVar9 * sVar18);
                          } while (pMVar26 != pMVar38);
                        }
                        pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                        pMVar15 = (Mat *)((long)&pMVar15->data +
                                         local_c8.cstep *
                                         CONCAT44(local_c8.elemsize._4_4_,
                                                  (undefined4)local_c8.elemsize));
                      } while (pMVar46 != pMVar27);
                    }
                    iVar10 = 0;
                  }
                  piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar7 != (int *)0x0) {
                    LOCK();
                    *piVar7 = *piVar7 + -1;
                    UNLOCK();
                    if (*piVar7 == 0) {
                      puVar30 = (uint *)local_c8.data;
                      if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                      (*(local_c8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
              }
            }
          }
          else {
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar11,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,1,uVar11,1,sVar18,opt->blob_allocator);
            }
            local_c8.cstep = 0;
            local_c8.data = (Mat *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            puVar30 = (uint *)0x1;
            Mat::create(&local_c8,1,uVar11,uVar12,sVar18,opt->workspace_allocator);
            auVar71 = _DAT_00514730;
            auVar151 = _DAT_00514720;
            auVar52 = _DAT_005140e0;
            iVar10 = -100;
            if (((Mat *)local_c8.data != (Mat *)0x0) &&
               (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
              uVar25 = (int)local_c8.cstep * local_c8.c;
              if (0 < (int)uVar25) {
                lVar13 = (ulong)uVar25 - 1;
                auVar84._8_4_ = (int)lVar13;
                auVar84._0_8_ = lVar13;
                auVar84._12_4_ = (int)((ulong)lVar13 >> 0x20);
                puVar30 = (uint *)0x0;
                auVar84 = auVar84 ^ _DAT_005140e0;
                do {
                  auVar185._8_4_ = (int)puVar30;
                  auVar185._0_8_ = puVar30;
                  auVar185._12_4_ = (int)((ulong)puVar30 >> 0x20);
                  auVar285 = (auVar185 | auVar71) ^ auVar52;
                  iVar9 = auVar84._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar84._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) = 0x7f7fffff;
                  }
                  if ((auVar285._12_4_ != auVar84._12_4_ || auVar285._8_4_ <= auVar84._8_4_) &&
                      auVar285._12_4_ <= auVar84._12_4_) {
                    *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                         0x7f7fffff;
                  }
                  auVar285 = (auVar185 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar84._0_4_)) {
                    *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                         0x7f7fffff;
                    *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                         0x7f7fffff;
                  }
                  puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != (Mat *)puVar30);
              }
              if (0 < (int)uVar12) {
                pvVar32 = bottom_blob->data;
                puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                pMVar38 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    pMVar47 = (Mat *)0x0;
                    pvVar45 = pvVar32;
                    do {
                      auVar163 = ZEXT816(0x7f7fffff);
                      if (0 < (int)uVar35) {
                        uVar31 = 0;
                        auVar163 = ZEXT816(0x7f7fffff);
                        do {
                          fVar51 = *(float *)((long)pvVar45 + uVar31 * 4);
                          if (fVar51 <= auVar163._0_4_) {
                            auVar163._0_4_ = fVar51;
                          }
                          uVar31 = uVar31 + 1;
                        } while (uVar35 != uVar31);
                      }
                      *(int *)((long)(void **)local_c8.data +
                              (long)pMVar47 * 4 +
                              CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                              local_c8.cstep * (long)pMVar38) = auVar163._0_4_;
                      pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                      pvVar45 = (void *)((long)pvVar45 + (long)(int)uVar35 * 4);
                    } while (pMVar47 != pMVar15);
                  }
                  pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                  pvVar32 = (void *)((long)&((Mat *)puVar30)->data + (long)pvVar32);
                } while (pMVar38 != pMVar27);
              }
              auVar71 = _DAT_00514730;
              auVar151 = _DAT_00514720;
              auVar52 = _DAT_005140e0;
              uVar25 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar25) {
                puVar30 = (uint *)top_blob->data;
                lVar13 = (ulong)uVar25 - 1;
                auVar85._8_4_ = (int)lVar13;
                auVar85._0_8_ = lVar13;
                auVar85._12_4_ = (int)((ulong)lVar13 >> 0x20);
                uVar31 = 0;
                auVar85 = auVar85 ^ _DAT_005140e0;
                do {
                  auVar186._8_4_ = (int)uVar31;
                  auVar186._0_8_ = uVar31;
                  auVar186._12_4_ = (int)(uVar31 >> 0x20);
                  auVar285 = (auVar186 | auVar71) ^ auVar52;
                  iVar9 = auVar85._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar85._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x7f7fffff;
                  }
                  if ((auVar285._12_4_ != auVar85._12_4_ || auVar285._8_4_ <= auVar85._8_4_) &&
                      auVar285._12_4_ <= auVar85._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar285 = (auVar186 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar85._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0x7f7fffff;
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) = 0x7f7fffff
                    ;
                  }
                  uVar31 = uVar31 + 4;
                } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
              }
              if (0 < (int)uVar12) {
                pvVar32 = top_blob->data;
                puVar30 = (uint *)0x0;
                pMVar38 = (Mat *)local_c8.data;
                do {
                  if (0 < (int)uVar11) {
                    pMVar47 = (Mat *)0x0;
                    do {
                      fVar2 = *(float *)((long)&pMVar38->data + (long)pMVar47 * 4);
                      fVar51 = *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                      if (fVar51 <= fVar2) {
                        fVar2 = fVar51;
                      }
                      *(float *)((long)pvVar32 + (long)pMVar47 * 4) = fVar2;
                      pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                    } while (pMVar15 != pMVar47);
                  }
                  puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                  pMVar38 = (Mat *)((long)&pMVar38->data +
                                   local_c8.cstep *
                                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
                } while ((Mat *)puVar30 != pMVar27);
              }
              iVar10 = 0;
            }
            piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                puVar30 = (uint *)local_c8.data;
                if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          if (iVar9 == 0) {
            Mat::create(top_blob,1,sVar18,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,1,1,sVar18,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          Mat::create(&local_c8,uVar12,sVar18,opt->workspace_allocator);
          iVar10 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
            if ((int)uVar12 < 1) {
              fVar51 = 3.4028235e+38;
            }
            else {
              sVar18 = bottom_blob->elemsize;
              sVar17 = bottom_blob->cstep;
              pvVar32 = bottom_blob->data;
              puVar30 = (uint *)(ulong)uVar34;
              pMVar15 = (Mat *)0x0;
              do {
                fVar51 = 3.4028235e+38;
                if (0 < (int)uVar34) {
                  pMVar38 = (Mat *)0x0;
                  fVar51 = 3.4028235e+38;
                  do {
                    fVar2 = *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                    if (fVar2 <= fVar51) {
                      fVar51 = fVar2;
                    }
                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                  } while ((Mat *)puVar30 != pMVar38);
                }
                *(float *)((long)(void **)local_c8.data + (long)pMVar15 * 4) = fVar51;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
              } while (pMVar15 != pMVar27);
              fVar51 = 3.4028235e+38;
              pMVar15 = (Mat *)0x0;
              do {
                fVar2 = *(float *)((long)(void **)local_c8.data + (long)pMVar15 * 4);
                if (fVar2 <= fVar51) {
                  fVar51 = fVar2;
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              } while (pMVar27 != pMVar15);
            }
            *(float *)top_blob->data = fVar51;
            iVar10 = 0;
          }
          piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar30 = (uint *)local_c8.data;
              if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      goto LAB_00342105;
    }
    break;
  case 6:
    fVar50 = this->coeff;
    if (uVar25 - 1 < 4) {
      iVar9 = this->keepdims;
      sVar18 = bottom_blob->elemsize;
      puVar30 = &switchD_0033a8c0::switchdataD_0051c96c;
      switch(uVar25) {
      case 1:
        iVar9 = bottom_blob->w;
        puVar30 = (uint *)0x1;
        Mat::create(top_blob,1,sVar18,opt->blob_allocator);
        if ((long)iVar9 < 1) {
          fVar51 = 1.0;
        }
        else {
          fVar51 = 1.0;
          lVar13 = 0;
          do {
            fVar51 = fVar51 * *(float *)((long)bottom_blob->data + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (iVar9 != lVar13);
        }
        goto LAB_0033babe;
      case 2:
        uVar25 = bottom_blob->w;
        pMVar27 = (Mat *)(ulong)uVar25;
        uVar21 = bottom_blob->h;
        pMVar15 = (Mat *)(ulong)uVar21;
        auVar72._8_4_ = 0xffffffff;
        auVar72._0_8_ = 0xffffffffffffffff;
        auVar72._12_4_ = 0xffffffff;
        auVar73._0_8_ = SUB168(auVar72 ^ auVar151,0) << 0x3f;
        auVar73._8_8_ = SUB168(auVar72 ^ auVar151,8) << 0x3f;
        iVar10 = movmskpd(uVar20,auVar73);
        if (iVar10 != 0) {
          if (((bVar37 | (byte)iVar10 >> 1) & 1) == 0) {
            if (iVar9 == 0) {
              puVar30 = (uint *)pMVar15;
              Mat::create(top_blob,uVar21,sVar18,opt->blob_allocator);
            }
            else {
              puVar30 = (uint *)0x1;
              Mat::create(top_blob,1,uVar21,sVar18,opt->blob_allocator);
            }
            if (0 < (int)uVar21) {
              iVar9 = bottom_blob->w;
              sVar18 = bottom_blob->elemsize;
              pvVar32 = bottom_blob->data;
              pvVar45 = top_blob->data;
              puVar30 = (uint *)0x0;
              do {
                fVar51 = 1.0;
                if (0 < (int)uVar25) {
                  pMVar38 = (Mat *)0x0;
                  fVar51 = 1.0;
                  do {
                    fVar51 = fVar51 * *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                  } while (pMVar27 != pMVar38);
                }
                *(float *)((long)pvVar45 + (long)puVar30 * 4) = fVar51;
                puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                pvVar32 = (void *)((long)pvVar32 + (long)iVar9 * sVar18);
              } while ((Mat *)puVar30 != pMVar15);
            }
          }
          else if (((bVar36 | (byte)iVar10) & 1) == 0) {
            puVar30 = (uint *)pMVar27;
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar25,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,uVar25,1,sVar18,opt->blob_allocator);
            }
            auVar71 = _DAT_00514730;
            auVar151 = _DAT_00514720;
            auVar52 = _DAT_005140e0;
            uVar11 = top_blob->c * (int)top_blob->cstep;
            pvVar32 = top_blob->data;
            if (0 < (int)uVar11) {
              lVar13 = (ulong)uVar11 - 1;
              auVar89._8_4_ = (int)lVar13;
              auVar89._0_8_ = lVar13;
              auVar89._12_4_ = (int)((ulong)lVar13 >> 0x20);
              uVar31 = 0;
              auVar89 = auVar89 ^ _DAT_005140e0;
              do {
                auVar192._8_4_ = (int)uVar31;
                auVar192._0_8_ = uVar31;
                auVar192._12_4_ = (int)(uVar31 >> 0x20);
                auVar285 = (auVar192 | auVar71) ^ auVar52;
                iVar9 = auVar89._4_4_;
                iVar10 = auVar89._12_4_;
                if ((bool)(~(auVar285._4_4_ == iVar9 && auVar89._0_4_ < auVar285._0_4_ ||
                            iVar9 < auVar285._4_4_) & 1)) {
                  *(undefined4 *)((long)pvVar32 + uVar31 * 4) = 0x3f800000;
                }
                if ((auVar285._12_4_ != iVar10 || auVar285._8_4_ <= auVar89._8_4_) &&
                    auVar285._12_4_ <= iVar10) {
                  *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 4) = 0x3f800000;
                }
                auVar285 = (auVar192 | auVar151) ^ auVar52;
                auVar267._0_4_ = -(uint)(auVar89._0_4_ < auVar285._0_4_);
                auVar267._4_4_ = -(uint)(iVar9 < auVar285._4_4_);
                auVar267._8_4_ = -(uint)(auVar89._8_4_ < auVar285._8_4_);
                auVar267._12_4_ = -(uint)(iVar10 < auVar285._12_4_);
                iVar9 = -(uint)(auVar285._4_4_ == iVar9);
                iVar10 = -(uint)(auVar285._12_4_ == iVar10);
                auVar289._4_4_ = iVar9;
                auVar289._0_4_ = iVar9;
                auVar289._8_4_ = iVar10;
                auVar289._12_4_ = iVar10;
                auVar193._4_4_ = auVar267._4_4_;
                auVar193._0_4_ = auVar267._4_4_;
                auVar193._8_4_ = auVar267._12_4_;
                auVar193._12_4_ = auVar267._12_4_;
                auVar194._8_4_ = 0xffffffff;
                auVar194._0_8_ = 0xffffffffffffffff;
                auVar194._12_4_ = 0xffffffff;
                auVar194 = (auVar193 | auVar289 & auVar267) ^ auVar194;
                if ((auVar194 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 8) = 0x3f800000;
                }
                puVar30 = (uint *)(ulong)auVar194._8_2_;
                if ((auVar194 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 0xc) = 0x3f800000;
                }
                uVar31 = uVar31 + 4;
              } while ((uVar11 + 3 & 0xfffffffc) != uVar31);
            }
            if (0 < (int)uVar21) {
              pvVar45 = bottom_blob->data;
              iVar9 = bottom_blob->w;
              sVar18 = bottom_blob->elemsize;
              puVar30 = (uint *)0x0;
              do {
                if (0 < (int)uVar25) {
                  pMVar38 = (Mat *)0x0;
                  do {
                    *(float *)((long)pvVar32 + (long)pMVar38 * 4) =
                         *(float *)((long)pvVar45 + (long)pMVar38 * 4) *
                         *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                  } while (pMVar27 != pMVar38);
                }
                puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                pvVar45 = (void *)((long)pvVar45 + (long)iVar9 * sVar18);
              } while ((Mat *)puVar30 != pMVar15);
            }
          }
          goto LAB_00342112;
        }
        if (iVar9 == 0) {
          Mat::create(top_blob,1,sVar18,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,sVar18,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        puVar30 = (uint *)pMVar15;
        Mat::create(&local_c8,uVar21,sVar18,opt->workspace_allocator);
        iVar10 = -100;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          if ((int)uVar21 < 1) {
            fVar51 = 1.0;
          }
          else {
            pvVar32 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar18 = bottom_blob->elemsize;
            puVar30 = (uint *)0x0;
            do {
              fVar51 = 1.0;
              if (0 < (int)uVar25) {
                pMVar38 = (Mat *)0x0;
                fVar51 = 1.0;
                do {
                  fVar51 = fVar51 * *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                  pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                } while (pMVar27 != pMVar38);
              }
              *(float *)((long)(void **)local_c8.data + (long)puVar30 * 4) = fVar51;
              puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
              pvVar32 = (void *)((long)pvVar32 + (long)iVar9 * sVar18);
            } while ((Mat *)puVar30 != pMVar15);
            fVar51 = 1.0;
            pMVar27 = (Mat *)0x0;
            do {
              fVar51 = fVar51 * *(float *)((long)(void **)local_c8.data + (long)pMVar27 * 4);
              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
            } while (pMVar15 != pMVar27);
          }
          *(float *)top_blob->data = fVar51;
          iVar10 = 0;
        }
        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar30 = (uint *)local_c8.data;
            if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
        break;
      case 3:
        uVar21 = bottom_blob->w;
        lVar13 = (long)(int)uVar21;
        uVar11 = bottom_blob->h;
        pMVar15 = (Mat *)(ulong)uVar11;
        uVar12 = bottom_blob->c;
        pMVar27 = (Mat *)(ulong)uVar12;
        uVar34 = uVar11 * uVar21;
        auVar63._8_4_ = 0xffffffff;
        auVar63._0_8_ = 0xffffffffffffffff;
        auVar63._12_4_ = 0xffffffff;
        auVar64._0_8_ = SUB168(auVar63 ^ auVar151,0) << 0x3f;
        auVar64._8_8_ = SUB168(auVar63 ^ auVar151,8) << 0x3f;
        iVar10 = movmskpd((&switchD_0033a8c0::switchdataD_0051c96c)[uVar25 - 1] + 0x51c96c,auVar64);
        bVar24 = reduce_c ^ 1;
        puVar30 = (uint *)pMVar27;
        if ((iVar10 != 0) || (bVar24 != 0)) {
          if (iVar10 == 0 && reduce_c == false) {
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar12,sVar18,opt->blob_allocator);
            }
            else {
              puVar30 = (uint *)0x1;
              Mat::create(top_blob,1,1,uVar12,sVar18,opt->blob_allocator);
            }
            if (0 < (int)uVar12) {
              pvVar32 = bottom_blob->data;
              sVar18 = bottom_blob->elemsize;
              pvVar45 = top_blob->data;
              puVar30 = (uint *)(top_blob->elemsize * top_blob->cstep);
              sVar17 = bottom_blob->cstep;
              pMVar15 = (Mat *)0x0;
              do {
                fVar51 = 1.0;
                if (0 < (int)uVar34) {
                  uVar31 = 0;
                  fVar51 = 1.0;
                  do {
                    fVar51 = fVar51 * *(float *)((long)pvVar32 + uVar31 * 4);
                    uVar31 = uVar31 + 1;
                  } while (uVar34 != uVar31);
                }
                lVar13 = (long)puVar30 * (long)pMVar15;
                if (iVar9 == 0) {
                  lVar13 = (long)pMVar15 * 4;
                }
                *(float *)((long)pvVar45 + lVar13) = fVar51;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
              } while (pMVar15 != pMVar27);
            }
            goto LAB_00342112;
          }
          pMVar38 = (Mat *)(ulong)uVar21;
          bVar33 = (byte)iVar10 >> 1 | bVar37;
          if ((bVar33 & 1) == 0 && bVar24 == 0) {
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar11,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,uVar11,1,sVar18,opt->blob_allocator);
            }
            local_c8.cstep = 0;
            local_c8.data = (Mat *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            puVar30 = (uint *)0x1;
            Mat::create(&local_c8,1,uVar11,uVar12,sVar18,opt->workspace_allocator);
            auVar71 = _DAT_00514730;
            auVar151 = _DAT_00514720;
            auVar52 = _DAT_005140e0;
            iVar10 = -100;
            if (((Mat *)local_c8.data != (Mat *)0x0) &&
               (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
              uVar25 = (int)local_c8.cstep * local_c8.c;
              if (0 < (int)uVar25) {
                lVar29 = (ulong)uVar25 - 1;
                auVar82._8_4_ = (int)lVar29;
                auVar82._0_8_ = lVar29;
                auVar82._12_4_ = (int)((ulong)lVar29 >> 0x20);
                puVar30 = (uint *)0x0;
                auVar82 = auVar82 ^ _DAT_005140e0;
                do {
                  auVar183._8_4_ = (int)puVar30;
                  auVar183._0_8_ = puVar30;
                  auVar183._12_4_ = (int)((ulong)puVar30 >> 0x20);
                  auVar285 = (auVar183 | auVar71) ^ auVar52;
                  iVar9 = auVar82._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar82._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) = 0x3f800000;
                  }
                  if ((auVar285._12_4_ != auVar82._12_4_ || auVar285._8_4_ <= auVar82._8_4_) &&
                      auVar285._12_4_ <= auVar82._12_4_) {
                    *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                         0x3f800000;
                  }
                  auVar285 = (auVar183 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar82._0_4_)) {
                    *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                         0x3f800000;
                    *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                         0x3f800000;
                  }
                  puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != (Mat *)puVar30);
              }
              if (0 < (int)uVar12) {
                pvVar32 = bottom_blob->data;
                puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                pMVar47 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    pMVar46 = (Mat *)0x0;
                    pvVar45 = pvVar32;
                    do {
                      auVar162 = ZEXT816(0x3f800000);
                      if (0 < (int)uVar21) {
                        pMVar16 = (Mat *)0x0;
                        auVar162 = ZEXT816(0x3f800000);
                        do {
                          auVar162._0_4_ =
                               auVar162._0_4_ * *(float *)((long)pvVar45 + (long)pMVar16 * 4);
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar38 != pMVar16);
                      }
                      *(int *)((long)(void **)local_c8.data +
                              (long)pMVar46 * 4 +
                              CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                              local_c8.cstep * (long)pMVar47) = auVar162._0_4_;
                      pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                      pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                    } while (pMVar46 != pMVar15);
                  }
                  pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                  pvVar32 = (void *)((long)&((Mat *)puVar30)->data + (long)pvVar32);
                } while (pMVar47 != pMVar27);
              }
              auVar71 = _DAT_00514730;
              auVar151 = _DAT_00514720;
              auVar52 = _DAT_005140e0;
              uVar25 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar25) {
                puVar30 = (uint *)top_blob->data;
                lVar13 = (ulong)uVar25 - 1;
                auVar83._8_4_ = (int)lVar13;
                auVar83._0_8_ = lVar13;
                auVar83._12_4_ = (int)((ulong)lVar13 >> 0x20);
                uVar31 = 0;
                auVar83 = auVar83 ^ _DAT_005140e0;
                do {
                  auVar184._8_4_ = (int)uVar31;
                  auVar184._0_8_ = uVar31;
                  auVar184._12_4_ = (int)(uVar31 >> 0x20);
                  auVar285 = (auVar184 | auVar71) ^ auVar52;
                  iVar9 = auVar83._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar83._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x3f800000;
                  }
                  if ((auVar285._12_4_ != auVar83._12_4_ || auVar285._8_4_ <= auVar83._8_4_) &&
                      auVar285._12_4_ <= auVar83._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0x3f800000;
                  }
                  auVar285 = (auVar184 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar83._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0x3f800000;
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) = 0x3f800000
                    ;
                  }
                  uVar31 = uVar31 + 4;
                } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
              }
              if (0 < (int)uVar12) {
                pvVar32 = top_blob->data;
                puVar30 = (uint *)0x0;
                pMVar38 = (Mat *)local_c8.data;
                do {
                  if (0 < (int)uVar11) {
                    pMVar47 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar32 + (long)pMVar47 * 4) =
                           *(float *)((long)&pMVar38->data + (long)pMVar47 * 4) *
                           *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                      pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                    } while (pMVar15 != pMVar47);
                  }
                  puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                  pMVar38 = (Mat *)((long)&pMVar38->data +
                                   local_c8.cstep *
                                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
                } while ((Mat *)puVar30 != pMVar27);
              }
              iVar10 = 0;
            }
            piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                puVar30 = (uint *)local_c8.data;
                if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          else {
            bVar40 = (byte)iVar10 | bVar36;
            if ((bVar40 & 1) != 0 || bVar24 != 0) {
              if ((bVar33 & 1) == 0 && reduce_c == false) {
                if (iVar9 == 0) {
                  puVar30 = (uint *)pMVar15;
                  Mat::create(top_blob,uVar11,uVar12,sVar18,opt->blob_allocator);
                }
                else {
                  puVar30 = (uint *)0x1;
                  Mat::create(top_blob,1,uVar11,uVar12,sVar18,opt->blob_allocator);
                }
                if (0 < (int)uVar12) {
                  sVar18 = bottom_blob->elemsize;
                  if (iVar9 == 0) {
                    sVar17 = (size_t)top_blob->w;
                  }
                  else {
                    sVar17 = top_blob->cstep;
                  }
                  pvVar32 = bottom_blob->data;
                  sVar39 = top_blob->elemsize;
                  sVar5 = bottom_blob->cstep;
                  puVar30 = (uint *)top_blob->data;
                  pMVar47 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      pMVar46 = (Mat *)0x0;
                      pvVar45 = pvVar32;
                      do {
                        auVar167 = ZEXT816(0x3f800000);
                        if (0 < (int)uVar21) {
                          pMVar16 = (Mat *)0x0;
                          auVar167 = ZEXT816(0x3f800000);
                          do {
                            auVar167._0_4_ =
                                 auVar167._0_4_ * *(float *)((long)pvVar45 + (long)pMVar16 * 4);
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          } while (pMVar38 != pMVar16);
                        }
                        *(int *)((long)&((Mat *)puVar30)->data +
                                (long)pMVar46 * 4 + sVar17 * sVar39 * (long)pMVar47) =
                             auVar167._0_4_;
                        pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                        pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                      } while (pMVar46 != pMVar15);
                    }
                    pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                    pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar5);
                  } while (pMVar47 != pMVar27);
                }
              }
              else {
                puVar30 = (uint *)(ulong)CONCAT31(uVar6,bVar37 | bVar36 | bVar24);
                if (((bVar37 | bVar36) & 1) == 0 && bVar24 == 0) {
                  if (iVar9 == 0) {
                    Mat::create(top_blob,uVar21,uVar11,sVar18,opt->blob_allocator);
                    puVar30 = (uint *)pMVar38;
                  }
                  else {
                    Mat::create(top_blob,uVar21,uVar11,1,sVar18,opt->blob_allocator);
                    puVar30 = (uint *)pMVar38;
                  }
                  auVar71 = _DAT_00514730;
                  auVar151 = _DAT_00514720;
                  auVar52 = _DAT_005140e0;
                  uVar25 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar25) {
                    pvVar32 = top_blob->data;
                    lVar13 = (ulong)uVar25 - 1;
                    auVar112._8_4_ = (int)lVar13;
                    auVar112._0_8_ = lVar13;
                    auVar112._12_4_ = (int)((ulong)lVar13 >> 0x20);
                    uVar31 = 0;
                    auVar112 = auVar112 ^ _DAT_005140e0;
                    do {
                      auVar219._8_4_ = (int)uVar31;
                      auVar219._0_8_ = uVar31;
                      auVar219._12_4_ = (int)(uVar31 >> 0x20);
                      auVar285 = (auVar219 | auVar71) ^ auVar52;
                      iVar9 = auVar112._4_4_;
                      iVar10 = auVar112._12_4_;
                      if ((bool)(~(auVar285._4_4_ == iVar9 && auVar112._0_4_ < auVar285._0_4_ ||
                                  iVar9 < auVar285._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4) = 0x3f800000;
                      }
                      if ((auVar285._12_4_ != iVar10 || auVar285._8_4_ <= auVar112._8_4_) &&
                          auVar285._12_4_ <= iVar10) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 4) = 0x3f800000;
                      }
                      auVar285 = (auVar219 | auVar151) ^ auVar52;
                      auVar270._0_4_ = -(uint)(auVar112._0_4_ < auVar285._0_4_);
                      auVar270._4_4_ = -(uint)(iVar9 < auVar285._4_4_);
                      auVar270._8_4_ = -(uint)(auVar112._8_4_ < auVar285._8_4_);
                      auVar270._12_4_ = -(uint)(iVar10 < auVar285._12_4_);
                      iVar9 = -(uint)(auVar285._4_4_ == iVar9);
                      iVar10 = -(uint)(auVar285._12_4_ == iVar10);
                      auVar292._4_4_ = iVar9;
                      auVar292._0_4_ = iVar9;
                      auVar292._8_4_ = iVar10;
                      auVar292._12_4_ = iVar10;
                      auVar220._4_4_ = auVar270._4_4_;
                      auVar220._0_4_ = auVar270._4_4_;
                      auVar220._8_4_ = auVar270._12_4_;
                      auVar220._12_4_ = auVar270._12_4_;
                      auVar221._8_4_ = 0xffffffff;
                      auVar221._0_8_ = 0xffffffffffffffff;
                      auVar221._12_4_ = 0xffffffff;
                      auVar221 = (auVar220 | auVar292 & auVar270) ^ auVar221;
                      if ((auVar221 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 8) = 0x3f800000;
                      }
                      puVar30 = (uint *)(ulong)auVar221._8_2_;
                      if ((auVar221 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 0xc) = 0x3f800000;
                      }
                      uVar31 = uVar31 + 4;
                    } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
                  }
                  if (0 < (int)uVar12) {
                    sVar18 = bottom_blob->elemsize;
                    sVar17 = bottom_blob->cstep;
                    pvVar32 = bottom_blob->data;
                    pvVar45 = top_blob->data;
                    puVar30 = (uint *)(ulong)uVar34;
                    pMVar15 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar34) {
                        pMVar38 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar45 + (long)pMVar38 * 4) =
                               *(float *)((long)pvVar32 + (long)pMVar38 * 4) *
                               *(float *)((long)pvVar45 + (long)pMVar38 * 4);
                          pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                        } while ((Mat *)puVar30 != pMVar38);
                      }
                      pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                      pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
                    } while (pMVar15 != pMVar27);
                  }
                }
                else if (reduce_c == false && (bVar40 & 1) == 0) {
                  if (iVar9 == 0) {
                    puVar30 = (uint *)pMVar38;
                    Mat::create(top_blob,uVar21,uVar12,sVar18,opt->blob_allocator);
                  }
                  else {
                    puVar30 = (uint *)(ulong)uVar21;
                    Mat::create(top_blob,uVar21,1,uVar12,sVar18,opt->blob_allocator);
                  }
                  auVar71 = _DAT_00514730;
                  auVar151 = _DAT_00514720;
                  auVar52 = _DAT_005140e0;
                  uVar25 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar25) {
                    pvVar32 = top_blob->data;
                    lVar13 = (ulong)uVar25 - 1;
                    auVar118._8_4_ = (int)lVar13;
                    auVar118._0_8_ = lVar13;
                    auVar118._12_4_ = (int)((ulong)lVar13 >> 0x20);
                    uVar31 = 0;
                    auVar118 = auVar118 ^ _DAT_005140e0;
                    do {
                      auVar230._8_4_ = (int)uVar31;
                      auVar230._0_8_ = uVar31;
                      auVar230._12_4_ = (int)(uVar31 >> 0x20);
                      auVar285 = (auVar230 | auVar71) ^ auVar52;
                      iVar10 = auVar118._4_4_;
                      iVar264 = auVar118._12_4_;
                      if ((bool)(~(auVar285._4_4_ == iVar10 && auVar118._0_4_ < auVar285._0_4_ ||
                                  iVar10 < auVar285._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4) = 0x3f800000;
                      }
                      if ((auVar285._12_4_ != iVar264 || auVar285._8_4_ <= auVar118._8_4_) &&
                          auVar285._12_4_ <= iVar264) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 4) = 0x3f800000;
                      }
                      auVar285 = (auVar230 | auVar151) ^ auVar52;
                      auVar273._0_4_ = -(uint)(auVar118._0_4_ < auVar285._0_4_);
                      auVar273._4_4_ = -(uint)(iVar10 < auVar285._4_4_);
                      auVar273._8_4_ = -(uint)(auVar118._8_4_ < auVar285._8_4_);
                      auVar273._12_4_ = -(uint)(iVar264 < auVar285._12_4_);
                      iVar10 = -(uint)(auVar285._4_4_ == iVar10);
                      iVar264 = -(uint)(auVar285._12_4_ == iVar264);
                      auVar295._4_4_ = iVar10;
                      auVar295._0_4_ = iVar10;
                      auVar295._8_4_ = iVar264;
                      auVar295._12_4_ = iVar264;
                      auVar231._4_4_ = auVar273._4_4_;
                      auVar231._0_4_ = auVar273._4_4_;
                      auVar231._8_4_ = auVar273._12_4_;
                      auVar231._12_4_ = auVar273._12_4_;
                      auVar232._8_4_ = 0xffffffff;
                      auVar232._0_8_ = 0xffffffffffffffff;
                      auVar232._12_4_ = 0xffffffff;
                      auVar232 = (auVar231 | auVar295 & auVar273) ^ auVar232;
                      if ((auVar232 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 8) = 0x3f800000;
                      }
                      puVar30 = (uint *)(ulong)auVar232._8_2_;
                      if ((auVar232 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 0xc) = 0x3f800000;
                      }
                      uVar31 = uVar31 + 4;
                    } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
                  }
                  if (0 < (int)uVar12) {
                    sVar18 = bottom_blob->elemsize;
                    if (iVar9 == 0) {
                      sVar17 = (size_t)top_blob->w;
                    }
                    else {
                      sVar17 = top_blob->cstep;
                    }
                    puVar30 = (uint *)bottom_blob->data;
                    pvVar32 = top_blob->data;
                    sVar39 = top_blob->elemsize;
                    sVar5 = bottom_blob->cstep;
                    pMVar15 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar25 = 0;
                        pMVar47 = (Mat *)puVar30;
                        do {
                          if (0 < (int)uVar21) {
                            pMVar46 = (Mat *)0x0;
                            do {
                              *(float *)((long)pvVar32 + (long)pMVar46 * 4) =
                                   *(float *)((long)&pMVar47->data + (long)pMVar46 * 4) *
                                   *(float *)((long)pvVar32 + (long)pMVar46 * 4);
                              pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                            } while (pMVar38 != pMVar46);
                          }
                          uVar25 = uVar25 + 1;
                          pMVar47 = (Mat *)((long)&pMVar47->data + (long)(int)uVar21 * 4);
                        } while (uVar25 != uVar11);
                      }
                      pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                      puVar30 = (uint *)((long)&((Mat *)puVar30)->data + sVar18 * sVar5);
                      pvVar32 = (void *)((long)pvVar32 + sVar17 * sVar39);
                    } while (pMVar15 != pMVar27);
                  }
                }
              }
              goto LAB_00342112;
            }
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar21,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,uVar21,1,1,sVar18,opt->blob_allocator);
            }
            local_c8.cstep = 0;
            local_c8.data = (Mat *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            puVar30 = (uint *)pMVar38;
            Mat::create(&local_c8,uVar21,1,uVar12,sVar18,opt->workspace_allocator);
            auVar71 = _DAT_00514730;
            auVar151 = _DAT_00514720;
            auVar52 = _DAT_005140e0;
            iVar10 = -100;
            if (((Mat *)local_c8.data != (Mat *)0x0) &&
               (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
              uVar25 = (int)local_c8.cstep * local_c8.c;
              if (0 < (int)uVar25) {
                lVar29 = (ulong)uVar25 - 1;
                auVar97._8_4_ = (int)lVar29;
                auVar97._0_8_ = lVar29;
                auVar97._12_4_ = (int)((ulong)lVar29 >> 0x20);
                uVar31 = 0;
                auVar97 = auVar97 ^ _DAT_005140e0;
                do {
                  auVar201._8_4_ = (int)uVar31;
                  auVar201._0_8_ = uVar31;
                  auVar201._12_4_ = (int)(uVar31 >> 0x20);
                  auVar285 = (auVar201 | auVar71) ^ auVar52;
                  iVar9 = auVar97._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar97._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)(void **)local_c8.data + uVar31 * 4) = 0x3f800000;
                  }
                  if ((auVar285._12_4_ != auVar97._12_4_ || auVar285._8_4_ <= auVar97._8_4_) &&
                      auVar285._12_4_ <= auVar97._12_4_) {
                    *(undefined4 *)((long)(void **)local_c8.data + uVar31 * 4 + 4) = 0x3f800000;
                  }
                  auVar285 = (auVar201 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar97._0_4_)) {
                    *(undefined4 *)((long)((long)local_c8.data + 8) + uVar31 * 4) = 0x3f800000;
                    *(undefined4 *)((long)((long)local_c8.data + 8) + uVar31 * 4 + 4) = 0x3f800000;
                  }
                  uVar31 = uVar31 + 4;
                } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
              }
              if (0 < (int)uVar12) {
                pvVar32 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar17 = bottom_blob->cstep;
                pMVar47 = (Mat *)0x0;
                pMVar15 = (Mat *)local_c8.data;
                do {
                  if (0 < (int)uVar11) {
                    uVar25 = 0;
                    pvVar45 = pvVar32;
                    do {
                      if (0 < (int)uVar21) {
                        pMVar46 = (Mat *)0x0;
                        do {
                          *(float *)((long)&pMVar15->data + (long)pMVar46 * 4) =
                               *(float *)((long)pvVar45 + (long)pMVar46 * 4) *
                               *(float *)((long)&pMVar15->data + (long)pMVar46 * 4);
                          pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                        } while (pMVar38 != pMVar46);
                      }
                      uVar25 = uVar25 + 1;
                      pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                    } while (uVar25 != uVar11);
                  }
                  pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                  pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
                  pMVar15 = (Mat *)((long)&pMVar15->data +
                                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                                   local_c8.cstep);
                } while (pMVar47 != pMVar27);
              }
              auVar71 = _DAT_00514730;
              auVar151 = _DAT_00514720;
              auVar52 = _DAT_005140e0;
              uVar25 = top_blob->c * (int)top_blob->cstep;
              puVar30 = (uint *)top_blob;
              if (0 < (int)uVar25) {
                puVar30 = (uint *)top_blob->data;
                lVar13 = (ulong)uVar25 - 1;
                auVar98._8_4_ = (int)lVar13;
                auVar98._0_8_ = lVar13;
                auVar98._12_4_ = (int)((ulong)lVar13 >> 0x20);
                uVar31 = 0;
                auVar98 = auVar98 ^ _DAT_005140e0;
                do {
                  auVar202._8_4_ = (int)uVar31;
                  auVar202._0_8_ = uVar31;
                  auVar202._12_4_ = (int)(uVar31 >> 0x20);
                  auVar285 = (auVar202 | auVar71) ^ auVar52;
                  iVar9 = auVar98._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar98._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x3f800000;
                  }
                  if ((auVar285._12_4_ != auVar98._12_4_ || auVar285._8_4_ <= auVar98._8_4_) &&
                      auVar285._12_4_ <= auVar98._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0x3f800000;
                  }
                  auVar285 = (auVar202 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar98._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0x3f800000;
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) = 0x3f800000
                    ;
                  }
                  uVar31 = uVar31 + 4;
                } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
              }
              if (0 < (int)uVar12) {
                pvVar32 = top_blob->data;
                puVar30 = (uint *)0x0;
                pMVar15 = (Mat *)local_c8.data;
                do {
                  if (0 < (int)uVar21) {
                    pMVar47 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar32 + (long)pMVar47 * 4) =
                           *(float *)((long)&pMVar15->data + (long)pMVar47 * 4) *
                           *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                      pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                    } while (pMVar38 != pMVar47);
                  }
                  puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                  pMVar15 = (Mat *)((long)&pMVar15->data +
                                   local_c8.cstep *
                                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
                } while ((Mat *)puVar30 != pMVar27);
              }
              iVar10 = 0;
            }
            piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                puVar30 = (uint *)local_c8.data;
                if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          if (iVar9 == 0) {
            Mat::create(top_blob,1,sVar18,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,1,sVar18,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          Mat::create(&local_c8,uVar12,sVar18,opt->workspace_allocator);
          iVar10 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
            if ((int)uVar12 < 1) {
              fVar51 = 1.0;
            }
            else {
              sVar18 = bottom_blob->elemsize;
              sVar17 = bottom_blob->cstep;
              pvVar32 = bottom_blob->data;
              puVar30 = (uint *)(ulong)uVar34;
              pMVar15 = (Mat *)0x0;
              do {
                fVar51 = 1.0;
                if (0 < (int)uVar34) {
                  pMVar38 = (Mat *)0x0;
                  fVar51 = 1.0;
                  do {
                    fVar51 = fVar51 * *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                  } while ((Mat *)puVar30 != pMVar38);
                }
                *(float *)((long)(void **)local_c8.data + (long)pMVar15 * 4) = fVar51;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
              } while (pMVar15 != pMVar27);
              fVar51 = 1.0;
              pMVar15 = (Mat *)0x0;
              do {
                fVar51 = fVar51 * *(float *)((long)(void **)local_c8.data + (long)pMVar15 * 4);
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              } while (pMVar27 != pMVar15);
            }
            *(float *)top_blob->data = fVar51;
            iVar10 = 0;
          }
          piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar30 = (uint *)local_c8.data;
              if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        break;
      case 4:
        uVar25 = bottom_blob->w;
        lVar13 = (long)(int)uVar25;
        uVar21 = bottom_blob->h;
        pMVar38 = (Mat *)(ulong)uVar21;
        uVar11 = bottom_blob->d;
        pMVar15 = (Mat *)(ulong)uVar11;
        uVar12 = bottom_blob->c;
        pMVar27 = (Mat *)(ulong)uVar12;
        uVar35 = uVar21 * uVar25;
        uVar34 = uVar35 * uVar11;
        auVar67._8_4_ = 0xffffffff;
        auVar67._0_8_ = 0xffffffffffffffff;
        auVar67._12_4_ = 0xffffffff;
        auVar68._0_8_ = SUB168(auVar67 ^ auVar151,0) << 0x3f;
        auVar68._8_8_ = SUB168(auVar67 ^ auVar151,8) << 0x3f;
        iVar10 = movmskpd(uVar11,auVar68);
        bVar49 = iVar10 != 0;
        bVar24 = reduce_d ^ 1;
        bVar33 = reduce_c ^ 1;
        puVar30 = (uint *)pMVar27;
        if ((bVar49 || bVar24 != 0) || (bVar33 != 0)) {
          if ((!bVar49 && bVar24 == 0) && reduce_c == false) {
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar12,sVar18,opt->blob_allocator);
            }
            else {
              puVar30 = (uint *)0x1;
              Mat::create(top_blob,1,1,1,uVar12,sVar18,opt->blob_allocator);
            }
            if (0 < (int)uVar12) {
              pvVar32 = bottom_blob->data;
              sVar18 = bottom_blob->elemsize;
              pvVar45 = top_blob->data;
              puVar30 = (uint *)(top_blob->elemsize * top_blob->cstep);
              sVar17 = bottom_blob->cstep;
              pMVar15 = (Mat *)0x0;
              do {
                fVar51 = 1.0;
                if (0 < (int)uVar34) {
                  uVar31 = 0;
                  fVar51 = 1.0;
                  do {
                    fVar51 = fVar51 * *(float *)((long)pvVar32 + uVar31 * 4);
                    uVar31 = uVar31 + 1;
                  } while (uVar34 != uVar31);
                }
                lVar13 = (long)puVar30 * (long)pMVar15;
                if (iVar9 == 0) {
                  lVar13 = (long)pMVar15 * 4;
                }
                *(float *)((long)pvVar45 + lVar13) = fVar51;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
              } while (pMVar15 != pMVar27);
            }
            goto LAB_00342112;
          }
          if ((bVar49 || reduce_d != false) || bVar33 != 0) {
            pMVar47 = (Mat *)(ulong)uVar25;
            bVar40 = (byte)iVar10 >> 1 | bVar37;
            if (((bVar40 & 1) == 0 && bVar24 == 0) && bVar33 == 0) {
              if (iVar9 == 0) {
                Mat::create(top_blob,uVar21,sVar18,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,1,uVar21,1,1,sVar18,opt->blob_allocator);
              }
              local_c8.cstep = 0;
              local_c8.data = (Mat *)0x0;
              local_c8.refcount._0_4_ = 0;
              local_c8.refcount._4_4_ = 0;
              local_c8.elemsize._0_4_ = 0;
              local_c8.elemsize._4_4_ = 0;
              local_c8.elempack = 0;
              local_c8.allocator = (Allocator *)0x0;
              local_c8.dims = 0;
              local_c8.w = 0;
              local_c8.h = 0;
              local_c8.d = 0;
              local_c8.c = 0;
              puVar30 = (uint *)0x1;
              Mat::create(&local_c8,1,uVar21,uVar12,sVar18,opt->workspace_allocator);
              auVar71 = _DAT_00514730;
              auVar151 = _DAT_00514720;
              auVar52 = _DAT_005140e0;
              iVar10 = -100;
              if (((Mat *)local_c8.data != (Mat *)0x0) &&
                 (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
                uVar34 = (int)local_c8.cstep * local_c8.c;
                if (0 < (int)uVar34) {
                  lVar29 = (ulong)uVar34 - 1;
                  auVar102._8_4_ = (int)lVar29;
                  auVar102._0_8_ = lVar29;
                  auVar102._12_4_ = (int)((ulong)lVar29 >> 0x20);
                  uVar31 = 0;
                  auVar102 = auVar102 ^ _DAT_005140e0;
                  do {
                    auVar205._8_4_ = (int)uVar31;
                    auVar205._0_8_ = uVar31;
                    auVar205._12_4_ = (int)(uVar31 >> 0x20);
                    auVar285 = (auVar205 | auVar71) ^ auVar52;
                    iVar9 = auVar102._4_4_;
                    if ((bool)(~(auVar285._4_4_ == iVar9 && auVar102._0_4_ < auVar285._0_4_ ||
                                iVar9 < auVar285._4_4_) & 1)) {
                      *(undefined4 *)((long)(void **)local_c8.data + uVar31 * 4) = 0x3f800000;
                    }
                    if ((auVar285._12_4_ != auVar102._12_4_ || auVar285._8_4_ <= auVar102._8_4_) &&
                        auVar285._12_4_ <= auVar102._12_4_) {
                      *(undefined4 *)((long)(void **)local_c8.data + uVar31 * 4 + 4) = 0x3f800000;
                    }
                    auVar285 = (auVar205 | auVar151) ^ auVar52;
                    iVar10 = auVar285._4_4_;
                    if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar102._0_4_)) {
                      *(undefined4 *)((long)((long)local_c8.data + 8) + uVar31 * 4) = 0x3f800000;
                      *(undefined4 *)((long)((long)local_c8.data + 8) + uVar31 * 4 + 4) = 0x3f800000
                      ;
                    }
                    uVar31 = uVar31 + 4;
                  } while ((uVar34 + 3 & 0xfffffffc) != uVar31);
                }
                if (0 < (int)uVar12) {
                  pvVar32 = bottom_blob->data;
                  sVar18 = bottom_blob->elemsize;
                  sVar17 = bottom_blob->cstep;
                  pMVar15 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      lVar29 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                               local_c8.cstep * (long)pMVar15;
                      pvVar45 = (void *)(sVar18 * sVar17 * (long)pMVar15 + (long)pvVar32);
                      uVar34 = 0;
                      do {
                        if (0 < (int)uVar21) {
                          pMVar46 = (Mat *)0x0;
                          do {
                            if (0 < (int)uVar25) {
                              fVar51 = *(float *)((long)(void **)local_c8.data +
                                                 (long)pMVar46 * 4 + lVar29);
                              pMVar16 = (Mat *)0x0;
                              do {
                                fVar51 = fVar51 * *(float *)((long)pvVar45 + (long)pMVar16 * 4);
                                *(float *)((long)(void **)local_c8.data + (long)pMVar46 * 4 + lVar29
                                          ) = fVar51;
                                pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                              } while (pMVar47 != pMVar16);
                            }
                            pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                            pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                          } while (pMVar46 != pMVar38);
                        }
                        uVar34 = uVar34 + 1;
                      } while (uVar34 != uVar11);
                    }
                    pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                  } while (pMVar15 != pMVar27);
                }
                auVar71 = _DAT_00514730;
                auVar151 = _DAT_00514720;
                auVar52 = _DAT_005140e0;
                uVar25 = top_blob->c * (int)top_blob->cstep;
                puVar30 = (uint *)top_blob;
                if (0 < (int)uVar25) {
                  puVar30 = (uint *)top_blob->data;
                  lVar13 = (ulong)uVar25 - 1;
                  auVar103._8_4_ = (int)lVar13;
                  auVar103._0_8_ = lVar13;
                  auVar103._12_4_ = (int)((ulong)lVar13 >> 0x20);
                  uVar31 = 0;
                  auVar103 = auVar103 ^ _DAT_005140e0;
                  do {
                    auVar206._8_4_ = (int)uVar31;
                    auVar206._0_8_ = uVar31;
                    auVar206._12_4_ = (int)(uVar31 >> 0x20);
                    auVar285 = (auVar206 | auVar71) ^ auVar52;
                    iVar9 = auVar103._4_4_;
                    if ((bool)(~(auVar285._4_4_ == iVar9 && auVar103._0_4_ < auVar285._0_4_ ||
                                iVar9 < auVar285._4_4_) & 1)) {
                      *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x3f800000;
                    }
                    if ((auVar285._12_4_ != auVar103._12_4_ || auVar285._8_4_ <= auVar103._8_4_) &&
                        auVar285._12_4_ <= auVar103._12_4_) {
                      *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0x3f800000;
                    }
                    auVar285 = (auVar206 | auVar151) ^ auVar52;
                    iVar10 = auVar285._4_4_;
                    if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar103._0_4_)) {
                      *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0x3f800000;
                      *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) =
                           0x3f800000;
                    }
                    uVar31 = uVar31 + 4;
                  } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
                }
                if (0 < (int)uVar12) {
                  pvVar32 = top_blob->data;
                  puVar30 = (uint *)0x0;
                  pMVar15 = (Mat *)local_c8.data;
                  do {
                    if (0 < (int)uVar21) {
                      pMVar47 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar32 + (long)pMVar47 * 4) =
                             *(float *)((long)&pMVar15->data + (long)pMVar47 * 4) *
                             *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                        pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                      } while (pMVar38 != pMVar47);
                    }
                    puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                    pMVar15 = (Mat *)((long)&pMVar15->data +
                                     local_c8.cstep *
                                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                                     );
                  } while ((Mat *)puVar30 != pMVar27);
                }
                iVar10 = 0;
              }
              piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  puVar30 = (uint *)local_c8.data;
                  if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            else {
              bVar28 = (byte)iVar10 | bVar36;
              if (((bVar28 & 1) == 0 && bVar24 == 0) && bVar33 == 0) {
                if (iVar9 == 0) {
                  Mat::create(top_blob,uVar25,sVar18,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,uVar25,1,1,1,sVar18,opt->blob_allocator);
                }
                local_c8.cstep = 0;
                local_c8.data = (Mat *)0x0;
                local_c8.refcount._0_4_ = 0;
                local_c8.refcount._4_4_ = 0;
                local_c8.elemsize._0_4_ = 0;
                local_c8.elemsize._4_4_ = 0;
                local_c8.elempack = 0;
                local_c8.allocator = (Allocator *)0x0;
                local_c8.dims = 0;
                local_c8.w = 0;
                local_c8.h = 0;
                local_c8.d = 0;
                local_c8.c = 0;
                puVar30 = (uint *)(ulong)uVar25;
                Mat::create(&local_c8,uVar25,1,uVar12,sVar18,opt->workspace_allocator);
                auVar71 = _DAT_00514730;
                auVar151 = _DAT_00514720;
                auVar52 = _DAT_005140e0;
                iVar10 = -100;
                if (((Mat *)local_c8.data != (Mat *)0x0) &&
                   (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
                  uVar34 = (int)local_c8.cstep * local_c8.c;
                  if (0 < (int)uVar34) {
                    lVar29 = (ulong)uVar34 - 1;
                    auVar108._8_4_ = (int)lVar29;
                    auVar108._0_8_ = lVar29;
                    auVar108._12_4_ = (int)((ulong)lVar29 >> 0x20);
                    puVar30 = (uint *)0x0;
                    auVar108 = auVar108 ^ _DAT_005140e0;
                    do {
                      auVar211._8_4_ = (int)puVar30;
                      auVar211._0_8_ = puVar30;
                      auVar211._12_4_ = (int)((ulong)puVar30 >> 0x20);
                      auVar285 = (auVar211 | auVar71) ^ auVar52;
                      iVar9 = auVar108._4_4_;
                      if ((bool)(~(auVar285._4_4_ == iVar9 && auVar108._0_4_ < auVar285._0_4_ ||
                                  iVar9 < auVar285._4_4_) & 1)) {
                        *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) =
                             0x3f800000;
                      }
                      if ((auVar285._12_4_ != auVar108._12_4_ || auVar285._8_4_ <= auVar108._8_4_)
                          && auVar285._12_4_ <= auVar108._12_4_) {
                        *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                             0x3f800000;
                      }
                      auVar285 = (auVar211 | auVar151) ^ auVar52;
                      iVar10 = auVar285._4_4_;
                      if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar108._0_4_))
                      {
                        *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                             0x3f800000;
                        *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                             0x3f800000;
                      }
                      puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                    } while ((Mat *)(ulong)(uVar34 + 3 & 0xfffffffc) != (Mat *)puVar30);
                  }
                  if (0 < (int)uVar12) {
                    pvVar32 = bottom_blob->data;
                    puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar38 = (Mat *)0x0;
                    pMVar15 = (Mat *)local_c8.data;
                    do {
                      if (0 < (int)uVar11) {
                        pvVar45 = (void *)((long)puVar30 * (long)pMVar38 + (long)pvVar32);
                        uVar34 = 0;
                        do {
                          if (0 < (int)uVar21) {
                            uVar35 = 0;
                            do {
                              if (0 < (int)uVar25) {
                                pMVar46 = (Mat *)0x0;
                                do {
                                  *(float *)((long)&pMVar15->data + (long)pMVar46 * 4) =
                                       *(float *)((long)pvVar45 + (long)pMVar46 * 4) *
                                       *(float *)((long)&pMVar15->data + (long)pMVar46 * 4);
                                  pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                                } while (pMVar47 != pMVar46);
                              }
                              pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                              uVar35 = uVar35 + 1;
                            } while (uVar35 != uVar21);
                          }
                          uVar34 = uVar34 + 1;
                        } while (uVar34 != uVar11);
                      }
                      pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                      pMVar15 = (Mat *)((long)&pMVar15->data +
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize) * local_c8.cstep);
                    } while (pMVar38 != pMVar27);
                  }
                  auVar71 = _DAT_00514730;
                  auVar151 = _DAT_00514720;
                  auVar52 = _DAT_005140e0;
                  uVar21 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar21) {
                    puVar30 = (uint *)top_blob->data;
                    lVar13 = (ulong)uVar21 - 1;
                    auVar109._8_4_ = (int)lVar13;
                    auVar109._0_8_ = lVar13;
                    auVar109._12_4_ = (int)((ulong)lVar13 >> 0x20);
                    uVar31 = 0;
                    auVar109 = auVar109 ^ _DAT_005140e0;
                    do {
                      auVar212._8_4_ = (int)uVar31;
                      auVar212._0_8_ = uVar31;
                      auVar212._12_4_ = (int)(uVar31 >> 0x20);
                      auVar285 = (auVar212 | auVar71) ^ auVar52;
                      iVar9 = auVar109._4_4_;
                      if ((bool)(~(auVar285._4_4_ == iVar9 && auVar109._0_4_ < auVar285._0_4_ ||
                                  iVar9 < auVar285._4_4_) & 1)) {
                        *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x3f800000;
                      }
                      if ((auVar285._12_4_ != auVar109._12_4_ || auVar285._8_4_ <= auVar109._8_4_)
                          && auVar285._12_4_ <= auVar109._12_4_) {
                        *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0x3f800000
                        ;
                      }
                      auVar285 = (auVar212 | auVar151) ^ auVar52;
                      iVar10 = auVar285._4_4_;
                      if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar109._0_4_))
                      {
                        *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0x3f800000
                        ;
                        *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) =
                             0x3f800000;
                      }
                      uVar31 = uVar31 + 4;
                    } while ((uVar21 + 3 & 0xfffffffc) != uVar31);
                  }
                  if (0 < (int)uVar12) {
                    pvVar32 = top_blob->data;
                    puVar30 = (uint *)0x0;
                    pMVar15 = (Mat *)local_c8.data;
                    do {
                      if (0 < (int)uVar25) {
                        pMVar38 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar32 + (long)pMVar38 * 4) =
                               *(float *)((long)&pMVar15->data + (long)pMVar38 * 4) *
                               *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                          pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                        } while (pMVar47 != pMVar38);
                      }
                      puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                      pMVar15 = (Mat *)((long)&pMVar15->data +
                                       local_c8.cstep *
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize));
                    } while ((Mat *)puVar30 != pMVar27);
                  }
                  iVar10 = 0;
                }
                piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                if (piVar7 != (int *)0x0) {
                  LOCK();
                  *piVar7 = *piVar7 + -1;
                  UNLOCK();
                  if (*piVar7 == 0) {
                    puVar30 = (uint *)local_c8.data;
                    if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                    (*(local_c8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              else {
                if ((!bVar49 && reduce_d == false) && reduce_c == false) {
                  if (iVar9 == 0) {
                    puVar30 = (uint *)pMVar15;
                    Mat::create(top_blob,uVar11,uVar12,sVar18,opt->blob_allocator);
                  }
                  else {
                    puVar30 = (uint *)0x1;
                    Mat::create(top_blob,1,1,uVar11,uVar12,sVar18,opt->blob_allocator);
                  }
                  if (0 < (int)uVar12) {
                    sVar18 = bottom_blob->elemsize;
                    if (iVar9 == 0) {
                      sVar17 = (size_t)top_blob->w;
                    }
                    else {
                      sVar17 = top_blob->cstep;
                    }
                    puVar30 = (uint *)bottom_blob->data;
                    pvVar32 = top_blob->data;
                    sVar39 = top_blob->elemsize;
                    sVar5 = bottom_blob->cstep;
                    pMVar38 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar11) {
                        pMVar46 = (Mat *)0x0;
                        pMVar47 = (Mat *)puVar30;
                        do {
                          auVar170 = ZEXT816(0x3f800000);
                          if (0 < (int)uVar35) {
                            uVar31 = 0;
                            auVar170 = ZEXT816(0x3f800000);
                            do {
                              auVar170._0_4_ =
                                   auVar170._0_4_ * *(float *)((long)&pMVar47->data + uVar31 * 4);
                              uVar31 = uVar31 + 1;
                            } while (uVar35 != uVar31);
                          }
                          *(int *)((long)pvVar32 +
                                  (long)pMVar46 * 4 + sVar17 * sVar39 * (long)pMVar38) =
                               auVar170._0_4_;
                          pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                          pMVar47 = (Mat *)((long)&pMVar47->data + (long)(int)uVar35 * 4);
                        } while (pMVar46 != pMVar15);
                      }
                      pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                      puVar30 = (uint *)((long)&((Mat *)puVar30)->data + sVar18 * sVar5);
                    } while (pMVar38 != pMVar27);
                  }
                  goto LAB_00342112;
                }
                if (((bVar40 & 1) == 0 && reduce_d == false) && bVar33 == 0) {
                  if (iVar9 == 0) {
                    Mat::create(top_blob,uVar21,uVar11,sVar18,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,1,uVar21,uVar11,1,sVar18,opt->blob_allocator);
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (Mat *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize._0_4_ = 0;
                  local_c8.elemsize._4_4_ = 0;
                  local_c8.elempack = 0;
                  local_c8.allocator = (Allocator *)0x0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  puVar30 = (uint *)pMVar38;
                  Mat::create(&local_c8,uVar21,uVar11,uVar12,sVar18,opt->workspace_allocator);
                  auVar71 = _DAT_00514730;
                  auVar151 = _DAT_00514720;
                  auVar52 = _DAT_005140e0;
                  iVar10 = -100;
                  if (((Mat *)local_c8.data != (Mat *)0x0) &&
                     (puVar30 = (uint *)local_c8.cstep, local_c8.cstep * (long)local_c8.c != 0)) {
                    uVar34 = (int)local_c8.cstep * local_c8.c;
                    if (0 < (int)uVar34) {
                      lVar29 = (ulong)uVar34 - 1;
                      auVar122._8_4_ = (int)lVar29;
                      auVar122._0_8_ = lVar29;
                      auVar122._12_4_ = (int)((ulong)lVar29 >> 0x20);
                      puVar30 = (uint *)0x0;
                      auVar122 = auVar122 ^ _DAT_005140e0;
                      do {
                        auVar235._8_4_ = (int)puVar30;
                        auVar235._0_8_ = puVar30;
                        auVar235._12_4_ = (int)((ulong)puVar30 >> 0x20);
                        auVar285 = (auVar235 | auVar71) ^ auVar52;
                        iVar10 = auVar122._4_4_;
                        if ((bool)(~(auVar285._4_4_ == iVar10 && auVar122._0_4_ < auVar285._0_4_ ||
                                    iVar10 < auVar285._4_4_) & 1)) {
                          *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) =
                               0x3f800000;
                        }
                        if ((auVar285._12_4_ != auVar122._12_4_ || auVar285._8_4_ <= auVar122._8_4_)
                            && auVar285._12_4_ <= auVar122._12_4_) {
                          *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                               0x3f800000;
                        }
                        auVar285 = (auVar235 | auVar151) ^ auVar52;
                        iVar264 = auVar285._4_4_;
                        if (iVar264 <= iVar10 &&
                            (iVar264 != iVar10 || auVar285._0_4_ <= auVar122._0_4_)) {
                          *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                               0x3f800000;
                          *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                               0x3f800000;
                        }
                        puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                      } while ((Mat *)(ulong)(uVar34 + 3 & 0xfffffffc) != (Mat *)puVar30);
                    }
                    if (0 < (int)uVar12) {
                      pvVar32 = bottom_blob->data;
                      puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar46 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar11) {
                          pvVar45 = (void *)((long)puVar30 * (long)pMVar46 + (long)pvVar32);
                          pMVar16 = (Mat *)0x0;
                          do {
                            if (0 < (int)uVar21) {
                              lVar29 = (long)local_c8.w *
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize) * (long)pMVar16 +
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize) * local_c8.cstep *
                                       (long)pMVar46;
                              pMVar43 = (Mat *)0x0;
                              do {
                                if (0 < (int)uVar25) {
                                  fVar51 = *(float *)((long)(void **)local_c8.data +
                                                     (long)pMVar43 * 4 + lVar29);
                                  pMVar26 = (Mat *)0x0;
                                  do {
                                    fVar51 = fVar51 * *(float *)((long)pvVar45 + (long)pMVar26 * 4);
                                    *(float *)((long)(void **)local_c8.data +
                                              (long)pMVar43 * 4 + lVar29) = fVar51;
                                    pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                  } while (pMVar47 != pMVar26);
                                }
                                pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                                pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                              } while (pMVar43 != pMVar38);
                            }
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          } while (pMVar16 != pMVar15);
                        }
                        pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                      } while (pMVar46 != pMVar27);
                    }
                    auVar71 = _DAT_00514730;
                    auVar151 = _DAT_00514720;
                    auVar52 = _DAT_005140e0;
                    uVar25 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar25) {
                      puVar30 = (uint *)top_blob->data;
                      lVar13 = (ulong)uVar25 - 1;
                      auVar123._8_4_ = (int)lVar13;
                      auVar123._0_8_ = lVar13;
                      auVar123._12_4_ = (int)((ulong)lVar13 >> 0x20);
                      uVar31 = 0;
                      auVar123 = auVar123 ^ _DAT_005140e0;
                      do {
                        auVar236._8_4_ = (int)uVar31;
                        auVar236._0_8_ = uVar31;
                        auVar236._12_4_ = (int)(uVar31 >> 0x20);
                        auVar285 = (auVar236 | auVar71) ^ auVar52;
                        iVar10 = auVar123._4_4_;
                        if ((bool)(~(auVar285._4_4_ == iVar10 && auVar123._0_4_ < auVar285._0_4_ ||
                                    iVar10 < auVar285._4_4_) & 1)) {
                          *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x3f800000;
                        }
                        if ((auVar285._12_4_ != auVar123._12_4_ || auVar285._8_4_ <= auVar123._8_4_)
                            && auVar285._12_4_ <= auVar123._12_4_) {
                          *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) =
                               0x3f800000;
                        }
                        auVar285 = (auVar236 | auVar151) ^ auVar52;
                        iVar264 = auVar285._4_4_;
                        if (iVar264 <= iVar10 &&
                            (iVar264 != iVar10 || auVar285._0_4_ <= auVar123._0_4_)) {
                          *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) =
                               0x3f800000;
                          *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) =
                               0x3f800000;
                        }
                        uVar31 = uVar31 + 4;
                      } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
                    }
                    if (0 < (int)uVar12) {
                      puVar30 = (uint *)0x0;
                      pMVar47 = (Mat *)local_c8.data;
                      do {
                        if (0 < (int)uVar11) {
                          iVar10 = 1;
                          if (iVar9 != 0) {
                            iVar10 = top_blob->h;
                          }
                          iVar264 = top_blob->w;
                          sVar18 = top_blob->elemsize;
                          pvVar32 = top_blob->data;
                          pMVar16 = (Mat *)0x0;
                          pMVar46 = pMVar47;
                          do {
                            if (0 < (int)uVar21) {
                              pMVar43 = (Mat *)0x0;
                              do {
                                *(float *)((long)pvVar32 + (long)pMVar43 * 4) =
                                     *(float *)((long)&pMVar46->data + (long)pMVar43 * 4) *
                                     *(float *)((long)pvVar32 + (long)pMVar43 * 4);
                                pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                              } while (pMVar38 != pMVar43);
                            }
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                            pMVar46 = (Mat *)((long)&pMVar46->data +
                                             (long)local_c8.w *
                                             CONCAT44(local_c8.elemsize._4_4_,
                                                      (undefined4)local_c8.elemsize));
                            pvVar32 = (void *)((long)pvVar32 + (long)iVar10 * sVar18 * (long)iVar264
                                              );
                          } while (pMVar16 != pMVar15);
                        }
                        puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                        pMVar47 = (Mat *)((long)&pMVar47->data +
                                         local_c8.cstep *
                                         CONCAT44(local_c8.elemsize._4_4_,
                                                  (undefined4)local_c8.elemsize));
                      } while ((Mat *)puVar30 != pMVar27);
                    }
                    iVar10 = 0;
                  }
                  piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar7 != (int *)0x0) {
                    LOCK();
                    *piVar7 = *piVar7 + -1;
                    UNLOCK();
                    if (*piVar7 == 0) {
                      puVar30 = (uint *)local_c8.data;
                      if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                      (*(local_c8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                else {
                  bVar37 = bVar37 | bVar36;
                  if ((bVar24 != 0 || (bVar37 & 1) != 0) || bVar33 != 0) {
                    if (((bVar40 & 1) == 0 && bVar24 == 0) && reduce_c == false) {
                      if (iVar9 == 0) {
                        puVar30 = (uint *)(ulong)uVar21;
                        Mat::create(top_blob,uVar21,uVar12,sVar18,opt->blob_allocator);
                      }
                      else {
                        puVar30 = (uint *)0x1;
                        Mat::create(top_blob,1,uVar21,1,uVar12,sVar18,opt->blob_allocator);
                      }
                      auVar71 = _DAT_00514730;
                      auVar151 = _DAT_00514720;
                      auVar52 = _DAT_005140e0;
                      if (0 < (int)uVar12) {
                        sVar18 = bottom_blob->elemsize;
                        pvVar32 = top_blob->data;
                        if (iVar9 == 0) {
                          sVar17 = (size_t)top_blob->w;
                        }
                        else {
                          sVar17 = top_blob->cstep;
                        }
                        puVar30 = (uint *)bottom_blob->data;
                        sVar39 = bottom_blob->cstep;
                        lVar23 = sVar17 * top_blob->elemsize;
                        puVar1 = (undefined1 *)((long)&pMVar38[-1].cstep + 7);
                        auVar132._8_4_ = (int)puVar1;
                        auVar132._0_8_ = puVar1;
                        auVar132._12_4_ = (int)((ulong)puVar1 >> 0x20);
                        lVar29 = (long)pvVar32 + 0xc;
                        pMVar15 = (Mat *)0x0;
                        auVar132 = auVar132 ^ _DAT_005140e0;
                        do {
                          if (0 < (int)uVar21) {
                            lVar41 = 0;
                            auVar278 = auVar71;
                            auVar298 = auVar151;
                            do {
                              auVar285 = auVar278 ^ auVar52;
                              iVar9 = auVar132._4_4_;
                              if ((bool)(~(auVar285._4_4_ == iVar9 &&
                                           auVar132._0_4_ < auVar285._0_4_ || iVar9 < auVar285._4_4_
                                          ) & 1)) {
                                *(undefined4 *)(lVar29 + -0xc + lVar41) = 0x3f800000;
                              }
                              if ((auVar285._12_4_ != auVar132._12_4_ ||
                                  auVar285._8_4_ <= auVar132._8_4_) &&
                                  auVar285._12_4_ <= auVar132._12_4_) {
                                *(undefined4 *)(lVar29 + -8 + lVar41) = 0x3f800000;
                              }
                              auVar285 = auVar298 ^ auVar52;
                              iVar10 = auVar285._4_4_;
                              if (iVar10 <= iVar9 &&
                                  (iVar10 != iVar9 || auVar285._0_4_ <= auVar132._0_4_)) {
                                *(undefined4 *)(lVar29 + -4 + lVar41) = 0x3f800000;
                                *(undefined4 *)(lVar29 + lVar41) = 0x3f800000;
                              }
                              lVar286 = auVar278._8_8_;
                              auVar278._0_8_ = auVar278._0_8_ + 4;
                              auVar278._8_8_ = lVar286 + 4;
                              lVar286 = auVar298._8_8_;
                              auVar298._0_8_ = auVar298._0_8_ + 4;
                              auVar298._8_8_ = lVar286 + 4;
                              lVar41 = lVar41 + 0x10;
                            } while ((ulong)(uVar21 + 3 >> 2) << 4 != lVar41);
                          }
                          if (0 < (int)uVar11) {
                            ppvVar42 = (void **)((long)&((Mat *)puVar30)->data +
                                                sVar18 * sVar39 * (long)pMVar15);
                            lVar41 = lVar23 * (long)pMVar15;
                            uVar12 = 0;
                            do {
                              if (0 < (int)uVar21) {
                                pMVar46 = (Mat *)0x0;
                                do {
                                  if (0 < (int)uVar25) {
                                    fVar51 = *(float *)((long)pvVar32 + (long)pMVar46 * 4 + lVar41);
                                    pMVar16 = (Mat *)0x0;
                                    do {
                                      fVar51 = fVar51 * *(float *)((long)ppvVar42 +
                                                                  (long)pMVar16 * 4);
                                      *(float *)((long)pvVar32 + (long)pMVar46 * 4 + lVar41) =
                                           fVar51;
                                      pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                                    } while (pMVar47 != pMVar16);
                                  }
                                  ppvVar42 = (void **)((long)ppvVar42 + lVar13 * 4);
                                  pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                                } while (pMVar46 != pMVar38);
                              }
                              uVar12 = uVar12 + 1;
                            } while (uVar12 != uVar11);
                          }
                          pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                          lVar29 = lVar29 + lVar23;
                        } while (pMVar15 != pMVar27);
                      }
                    }
                    else {
                      puVar30 = (uint *)pMVar47;
                      if (((bVar28 & 1) == 0 && reduce_d == false) && bVar33 == 0) {
                        if (iVar9 == 0) {
                          Mat::create(top_blob,uVar25,uVar11,sVar18,opt->blob_allocator);
                        }
                        else {
                          Mat::create(top_blob,uVar25,1,uVar11,1,sVar18,opt->blob_allocator);
                        }
                        local_c8.cstep = 0;
                        local_c8.data = (Mat *)0x0;
                        local_c8.refcount._0_4_ = 0;
                        local_c8.refcount._4_4_ = 0;
                        local_c8.elemsize._0_4_ = 0;
                        local_c8.elemsize._4_4_ = 0;
                        local_c8.elempack = 0;
                        local_c8.allocator = (Allocator *)0x0;
                        local_c8.dims = 0;
                        local_c8.w = 0;
                        local_c8.h = 0;
                        local_c8.d = 0;
                        local_c8.c = 0;
                        Mat::create(&local_c8,uVar25,uVar11,uVar12,sVar18,opt->workspace_allocator);
                        auVar71 = _DAT_00514730;
                        auVar151 = _DAT_00514720;
                        auVar52 = _DAT_005140e0;
                        iVar10 = -100;
                        if (((Mat *)local_c8.data != (Mat *)0x0) &&
                           (local_c8.cstep * (long)local_c8.c != 0)) {
                          uVar34 = (int)local_c8.cstep * local_c8.c;
                          if (0 < (int)uVar34) {
                            lVar29 = (ulong)uVar34 - 1;
                            auVar137._8_4_ = (int)lVar29;
                            auVar137._0_8_ = lVar29;
                            auVar137._12_4_ = (int)((ulong)lVar29 >> 0x20);
                            puVar30 = (uint *)0x0;
                            auVar137 = auVar137 ^ _DAT_005140e0;
                            do {
                              auVar247._8_4_ = (int)puVar30;
                              auVar247._0_8_ = puVar30;
                              auVar247._12_4_ = (int)((ulong)puVar30 >> 0x20);
                              auVar285 = (auVar247 | auVar71) ^ auVar52;
                              iVar9 = auVar137._4_4_;
                              if ((bool)(~(auVar285._4_4_ == iVar9 &&
                                           auVar137._0_4_ < auVar285._0_4_ || iVar9 < auVar285._4_4_
                                          ) & 1)) {
                                *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) =
                                     0x3f800000;
                              }
                              if ((auVar285._12_4_ != auVar137._12_4_ ||
                                  auVar285._8_4_ <= auVar137._8_4_) &&
                                  auVar285._12_4_ <= auVar137._12_4_) {
                                *(undefined4 *)
                                 ((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) = 0x3f800000
                                ;
                              }
                              auVar285 = (auVar247 | auVar151) ^ auVar52;
                              iVar10 = auVar285._4_4_;
                              if (iVar10 <= iVar9 &&
                                  (iVar10 != iVar9 || auVar285._0_4_ <= auVar137._0_4_)) {
                                *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4)
                                     = 0x3f800000;
                                *(undefined4 *)
                                 ((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                                     0x3f800000;
                              }
                              puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                            } while ((Mat *)(ulong)(uVar34 + 3 & 0xfffffffc) != (Mat *)puVar30);
                          }
                          if (0 < (int)uVar12) {
                            pvVar32 = bottom_blob->data;
                            puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                            pMVar46 = (Mat *)0x0;
                            pMVar38 = (Mat *)local_c8.data;
                            do {
                              if (0 < (int)uVar11) {
                                pvVar45 = (void *)((long)puVar30 * (long)pMVar46 + (long)pvVar32);
                                pMVar43 = (Mat *)0x0;
                                pMVar16 = pMVar38;
                                do {
                                  if (0 < (int)uVar21) {
                                    uVar34 = 0;
                                    do {
                                      if (0 < (int)uVar25) {
                                        pMVar26 = (Mat *)0x0;
                                        do {
                                          *(float *)((long)&pMVar16->data + (long)pMVar26 * 4) =
                                               *(float *)((long)pvVar45 + (long)pMVar26 * 4) *
                                               *(float *)((long)&pMVar16->data + (long)pMVar26 * 4);
                                          pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                        } while (pMVar47 != pMVar26);
                                      }
                                      pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                                      uVar34 = uVar34 + 1;
                                    } while (uVar34 != uVar21);
                                  }
                                  pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                                  pMVar16 = (Mat *)((long)&pMVar16->data +
                                                   (long)local_c8.w *
                                                   CONCAT44(local_c8.elemsize._4_4_,
                                                            (undefined4)local_c8.elemsize));
                                } while (pMVar43 != pMVar15);
                              }
                              pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                              pMVar38 = (Mat *)((long)&pMVar38->data +
                                               CONCAT44(local_c8.elemsize._4_4_,
                                                        (undefined4)local_c8.elemsize) *
                                               local_c8.cstep);
                            } while (pMVar46 != pMVar27);
                          }
                          auVar71 = _DAT_00514730;
                          auVar151 = _DAT_00514720;
                          auVar52 = _DAT_005140e0;
                          uVar21 = top_blob->c * (int)top_blob->cstep;
                          if (0 < (int)uVar21) {
                            puVar30 = (uint *)top_blob->data;
                            lVar13 = (ulong)uVar21 - 1;
                            auVar138._8_4_ = (int)lVar13;
                            auVar138._0_8_ = lVar13;
                            auVar138._12_4_ = (int)((ulong)lVar13 >> 0x20);
                            uVar31 = 0;
                            auVar138 = auVar138 ^ _DAT_005140e0;
                            do {
                              auVar248._8_4_ = (int)uVar31;
                              auVar248._0_8_ = uVar31;
                              auVar248._12_4_ = (int)(uVar31 >> 0x20);
                              auVar285 = (auVar248 | auVar71) ^ auVar52;
                              iVar9 = auVar138._4_4_;
                              if ((bool)(~(auVar285._4_4_ == iVar9 &&
                                           auVar138._0_4_ < auVar285._0_4_ || iVar9 < auVar285._4_4_
                                          ) & 1)) {
                                *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) =
                                     0x3f800000;
                              }
                              if ((auVar285._12_4_ != auVar138._12_4_ ||
                                  auVar285._8_4_ <= auVar138._8_4_) &&
                                  auVar285._12_4_ <= auVar138._12_4_) {
                                *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) =
                                     0x3f800000;
                              }
                              auVar285 = (auVar248 | auVar151) ^ auVar52;
                              iVar10 = auVar285._4_4_;
                              if (iVar10 <= iVar9 &&
                                  (iVar10 != iVar9 || auVar285._0_4_ <= auVar138._0_4_)) {
                                *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) =
                                     0x3f800000;
                                *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4)
                                     = 0x3f800000;
                              }
                              uVar31 = uVar31 + 4;
                            } while ((uVar21 + 3 & 0xfffffffc) != uVar31);
                          }
                          if (0 < (int)uVar12) {
                            puVar30 = (uint *)top_blob->data;
                            iVar9 = top_blob->w;
                            sVar18 = top_blob->elemsize;
                            pMVar46 = (Mat *)0x0;
                            pMVar38 = (Mat *)local_c8.data;
                            do {
                              if (0 < (int)uVar11) {
                                pMVar26 = (Mat *)0x0;
                                pMVar16 = (Mat *)puVar30;
                                pMVar43 = pMVar38;
                                do {
                                  if (0 < (int)uVar25) {
                                    pMVar22 = (Mat *)0x0;
                                    do {
                                      *(float *)((long)&pMVar16->data + (long)pMVar22 * 4) =
                                           *(float *)((long)&pMVar43->data + (long)pMVar22 * 4) *
                                           *(float *)((long)&pMVar16->data + (long)pMVar22 * 4);
                                      pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                                    } while (pMVar47 != pMVar22);
                                  }
                                  pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                  pMVar43 = (Mat *)((long)&pMVar43->data +
                                                   (long)local_c8.w *
                                                   CONCAT44(local_c8.elemsize._4_4_,
                                                            (undefined4)local_c8.elemsize));
                                  pMVar16 = (Mat *)((long)&pMVar16->data + (long)iVar9 * sVar18);
                                } while (pMVar26 != pMVar15);
                              }
                              pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                              pMVar38 = (Mat *)((long)&pMVar38->data +
                                               local_c8.cstep *
                                               CONCAT44(local_c8.elemsize._4_4_,
                                                        (undefined4)local_c8.elemsize));
                            } while (pMVar46 != pMVar27);
                          }
                          iVar10 = 0;
                        }
                        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                        if (piVar7 != (int *)0x0) {
                          LOCK();
                          *piVar7 = *piVar7 + -1;
                          UNLOCK();
                          if (*piVar7 == 0) {
                            puVar30 = (uint *)local_c8.data;
                            if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                            (*(local_c8.allocator)->_vptr_Allocator[3])();
                          }
                        }
                        break;
                      }
                      if (((bVar28 & 1) == 0 && bVar24 == 0) && reduce_c == false) {
                        if (iVar9 == 0) {
                          Mat::create(top_blob,uVar25,uVar12,sVar18,opt->blob_allocator);
                        }
                        else {
                          puVar30 = (uint *)(ulong)uVar25;
                          Mat::create(top_blob,uVar25,1,1,uVar12,sVar18,opt->blob_allocator);
                        }
                        auVar71 = _DAT_00514730;
                        auVar151 = _DAT_00514720;
                        auVar52 = _DAT_005140e0;
                        if (0 < (int)uVar12) {
                          sVar18 = bottom_blob->elemsize;
                          pvVar32 = top_blob->data;
                          if (iVar9 == 0) {
                            sVar17 = (size_t)top_blob->w;
                          }
                          else {
                            sVar17 = top_blob->cstep;
                          }
                          puVar30 = (uint *)bottom_blob->data;
                          sVar39 = bottom_blob->cstep;
                          puVar1 = (undefined1 *)((long)&pMVar47[-1].cstep + 7);
                          auVar141._8_4_ = (int)puVar1;
                          auVar141._0_8_ = puVar1;
                          auVar141._12_4_ = (int)((ulong)puVar1 >> 0x20);
                          lVar23 = sVar17 * top_blob->elemsize;
                          lVar29 = (long)pvVar32 + 0xc;
                          pMVar15 = (Mat *)0x0;
                          auVar141 = auVar141 ^ _DAT_005140e0;
                          do {
                            if (0 < (int)uVar25) {
                              lVar41 = 0;
                              auVar281 = auVar71;
                              auVar301 = auVar151;
                              do {
                                auVar285 = auVar281 ^ auVar52;
                                iVar9 = auVar141._4_4_;
                                if ((bool)(~(auVar285._4_4_ == iVar9 &&
                                             auVar141._0_4_ < auVar285._0_4_ ||
                                            iVar9 < auVar285._4_4_) & 1)) {
                                  *(undefined4 *)(lVar29 + -0xc + lVar41) = 0x3f800000;
                                }
                                if ((auVar285._12_4_ != auVar141._12_4_ ||
                                    auVar285._8_4_ <= auVar141._8_4_) &&
                                    auVar285._12_4_ <= auVar141._12_4_) {
                                  *(undefined4 *)(lVar29 + -8 + lVar41) = 0x3f800000;
                                }
                                auVar285 = auVar301 ^ auVar52;
                                iVar10 = auVar285._4_4_;
                                if (iVar10 <= iVar9 &&
                                    (iVar10 != iVar9 || auVar285._0_4_ <= auVar141._0_4_)) {
                                  *(undefined4 *)(lVar29 + -4 + lVar41) = 0x3f800000;
                                  *(undefined4 *)(lVar29 + lVar41) = 0x3f800000;
                                }
                                lVar286 = auVar281._8_8_;
                                auVar281._0_8_ = auVar281._0_8_ + 4;
                                auVar281._8_8_ = lVar286 + 4;
                                lVar286 = auVar301._8_8_;
                                auVar301._0_8_ = auVar301._0_8_ + 4;
                                auVar301._8_8_ = lVar286 + 4;
                                lVar41 = lVar41 + 0x10;
                              } while ((ulong)(uVar25 + 3 >> 2) << 4 != lVar41);
                            }
                            if (0 < (int)uVar11) {
                              ppvVar42 = (void **)((long)&((Mat *)puVar30)->data +
                                                  sVar18 * sVar39 * (long)pMVar15);
                              uVar12 = 0;
                              do {
                                if (0 < (int)uVar21) {
                                  uVar34 = 0;
                                  do {
                                    if (0 < (int)uVar25) {
                                      pMVar38 = (Mat *)0x0;
                                      do {
                                        *(float *)((long)pvVar32 + (long)pMVar38 * 4) =
                                             *(float *)((long)ppvVar42 + (long)pMVar38 * 4) *
                                             *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                                        pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                                      } while (pMVar47 != pMVar38);
                                    }
                                    ppvVar42 = (void **)((long)ppvVar42 + lVar13 * 4);
                                    uVar34 = uVar34 + 1;
                                  } while (uVar34 != uVar21);
                                }
                                uVar12 = uVar12 + 1;
                              } while (uVar12 != uVar11);
                            }
                            pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                            lVar29 = lVar29 + lVar23;
                            pvVar32 = (void *)((long)pvVar32 + lVar23);
                          } while (pMVar15 != pMVar27);
                        }
                      }
                      else if (((bVar40 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                        if (iVar9 == 0) {
                          puVar30 = (uint *)(ulong)uVar21;
                          Mat::create(top_blob,uVar21,uVar11,uVar12,sVar18,opt->blob_allocator);
                        }
                        else {
                          puVar30 = (uint *)0x1;
                          Mat::create(top_blob,1,uVar21,uVar11,uVar12,sVar18,opt->blob_allocator);
                        }
                        if (0 < (int)uVar12) {
                          pvVar32 = bottom_blob->data;
                          sVar18 = bottom_blob->elemsize;
                          sVar17 = top_blob->elemsize;
                          sVar39 = top_blob->cstep;
                          puVar30 = (uint *)top_blob->data;
                          sVar5 = bottom_blob->cstep;
                          pMVar15 = (Mat *)0x0;
                          do {
                            if (0 < (int)(uVar21 * uVar11)) {
                              uVar31 = 0;
                              pvVar45 = pvVar32;
                              do {
                                auVar173 = ZEXT816(0x3f800000);
                                if (0 < (int)uVar25) {
                                  pMVar38 = (Mat *)0x0;
                                  auVar173 = ZEXT816(0x3f800000);
                                  do {
                                    auVar173._0_4_ =
                                         auVar173._0_4_ *
                                         *(float *)((long)pvVar45 + (long)pMVar38 * 4);
                                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                                  } while (pMVar47 != pMVar38);
                                }
                                *(int *)((long)&((Mat *)puVar30)->data +
                                        uVar31 * 4 + sVar17 * sVar39 * (long)pMVar15) =
                                     auVar173._0_4_;
                                uVar31 = uVar31 + 1;
                                pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                              } while (uVar31 != uVar21 * uVar11);
                            }
                            pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                            pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar5);
                          } while (pMVar15 != pMVar27);
                        }
                      }
                      else if ((reduce_d == false && (bVar37 & 1) == 0) && bVar33 == 0) {
                        if (iVar9 == 0) {
                          Mat::create(top_blob,uVar25,uVar21,uVar11,sVar18,opt->blob_allocator);
                        }
                        else {
                          puVar30 = (uint *)(ulong)uVar25;
                          Mat::create(top_blob,uVar25,uVar21,uVar11,1,sVar18,opt->blob_allocator);
                        }
                        auVar71 = _DAT_00514730;
                        auVar151 = _DAT_00514720;
                        auVar52 = _DAT_005140e0;
                        uVar34 = top_blob->c * (int)top_blob->cstep;
                        if (0 < (int)uVar34) {
                          pvVar32 = top_blob->data;
                          lVar29 = (ulong)uVar34 - 1;
                          auVar144._8_4_ = (int)lVar29;
                          auVar144._0_8_ = lVar29;
                          auVar144._12_4_ = (int)((ulong)lVar29 >> 0x20);
                          uVar31 = 0;
                          auVar144 = auVar144 ^ _DAT_005140e0;
                          do {
                            auVar255._8_4_ = (int)uVar31;
                            auVar255._0_8_ = uVar31;
                            auVar255._12_4_ = (int)(uVar31 >> 0x20);
                            auVar285 = (auVar255 | auVar71) ^ auVar52;
                            iVar10 = auVar144._4_4_;
                            iVar264 = auVar144._12_4_;
                            if ((bool)(~(auVar285._4_4_ == iVar10 && auVar144._0_4_ < auVar285._0_4_
                                        || iVar10 < auVar285._4_4_) & 1)) {
                              *(undefined4 *)((long)pvVar32 + uVar31 * 4) = 0x3f800000;
                            }
                            if ((auVar285._12_4_ != iVar264 || auVar285._8_4_ <= auVar144._8_4_) &&
                                auVar285._12_4_ <= iVar264) {
                              *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 4) = 0x3f800000;
                            }
                            auVar285 = (auVar255 | auVar151) ^ auVar52;
                            auVar284._0_4_ = -(uint)(auVar144._0_4_ < auVar285._0_4_);
                            auVar284._4_4_ = -(uint)(iVar10 < auVar285._4_4_);
                            auVar284._8_4_ = -(uint)(auVar144._8_4_ < auVar285._8_4_);
                            auVar284._12_4_ = -(uint)(iVar264 < auVar285._12_4_);
                            iVar10 = -(uint)(auVar285._4_4_ == iVar10);
                            iVar264 = -(uint)(auVar285._12_4_ == iVar264);
                            auVar304._4_4_ = iVar10;
                            auVar304._0_4_ = iVar10;
                            auVar304._8_4_ = iVar264;
                            auVar304._12_4_ = iVar264;
                            auVar256._4_4_ = auVar284._4_4_;
                            auVar256._0_4_ = auVar284._4_4_;
                            auVar256._8_4_ = auVar284._12_4_;
                            auVar256._12_4_ = auVar284._12_4_;
                            auVar257._8_4_ = 0xffffffff;
                            auVar257._0_8_ = 0xffffffffffffffff;
                            auVar257._12_4_ = 0xffffffff;
                            auVar257 = (auVar256 | auVar304 & auVar284) ^ auVar257;
                            if ((auVar257 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                              *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 8) = 0x3f800000;
                            }
                            puVar30 = (uint *)(ulong)auVar257._8_2_;
                            if ((auVar257 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                              *(undefined4 *)((long)pvVar32 + uVar31 * 4 + 0xc) = 0x3f800000;
                            }
                            uVar31 = uVar31 + 4;
                          } while ((uVar34 + 3 & 0xfffffffc) != uVar31);
                        }
                        if (0 < (int)uVar12) {
                          pvVar32 = bottom_blob->data;
                          sVar18 = bottom_blob->elemsize;
                          sVar17 = bottom_blob->cstep;
                          puVar30 = (uint *)0x0;
                          do {
                            if (0 < (int)uVar11) {
                              iVar10 = top_blob->w;
                              if (iVar9 == 0) {
                                sVar39 = top_blob->cstep;
                              }
                              else {
                                sVar39 = (long)top_blob->h * (long)iVar10;
                              }
                              pvVar48 = (void *)(sVar18 * sVar17 * (long)puVar30 + (long)pvVar32);
                              pvVar45 = top_blob->data;
                              sVar5 = top_blob->elemsize;
                              pMVar46 = (Mat *)0x0;
                              do {
                                if (0 < (int)uVar21) {
                                  pMVar16 = (Mat *)0x0;
                                  pvVar44 = pvVar45;
                                  do {
                                    if (0 < (int)uVar25) {
                                      pMVar43 = (Mat *)0x0;
                                      do {
                                        *(float *)((long)pvVar44 + (long)pMVar43 * 4) =
                                             *(float *)((long)pvVar48 + (long)pMVar43 * 4) *
                                             *(float *)((long)pvVar44 + (long)pMVar43 * 4);
                                        pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                                      } while (pMVar47 != pMVar43);
                                    }
                                    pvVar48 = (void *)((long)pvVar48 + lVar13 * 4);
                                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                                    pvVar44 = (void *)((long)pvVar44 + (long)iVar10 * sVar5);
                                  } while (pMVar16 != pMVar38);
                                }
                                pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                                pvVar45 = (void *)((long)pvVar45 + sVar39 * sVar5);
                              } while (pMVar46 != pMVar15);
                            }
                            puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                          } while ((Mat *)puVar30 != pMVar27);
                        }
                      }
                      else {
                        puVar30 = (uint *)(ulong)CONCAT31((int3)((uint)iVar10 >> 8),
                                                          bVar28 | reduce_d | reduce_c);
                        if (((bVar28 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                          if (iVar9 == 0) {
                            puVar30 = (uint *)pMVar47;
                            Mat::create(top_blob,uVar25,uVar11,uVar12,sVar18,opt->blob_allocator);
                          }
                          else {
                            puVar30 = (uint *)(ulong)uVar25;
                            Mat::create(top_blob,uVar25,1,uVar11,uVar12,sVar18,opt->blob_allocator);
                          }
                          auVar71 = _DAT_00514730;
                          auVar151 = _DAT_00514720;
                          auVar52 = _DAT_005140e0;
                          if (0 < (int)uVar12) {
                            pvVar32 = bottom_blob->data;
                            sVar18 = bottom_blob->elemsize;
                            sVar17 = bottom_blob->cstep;
                            iVar9 = top_blob->w;
                            pvVar45 = top_blob->data;
                            uVar31 = top_blob->elemsize;
                            lVar13 = (long)top_blob->h * (long)iVar9;
                            pMVar38 = (Mat *)0x0;
                            iVar10 = (int)((uVar31 * lVar13 + 0xf & 0xfffffffffffffff0) / uVar31);
                            if (top_blob->dims == 4) {
                              iVar10 = (int)lVar13;
                            }
                            uVar12 = iVar10 * top_blob->d;
                            lVar13 = (ulong)uVar12 - 1;
                            auVar147._8_4_ = (int)lVar13;
                            auVar147._0_8_ = lVar13;
                            auVar147._12_4_ = (int)((ulong)lVar13 >> 0x20);
                            lVar13 = (long)pvVar45 + 0xc;
                            lVar29 = top_blob->cstep * uVar31;
                            auVar147 = auVar147 ^ _DAT_005140e0;
                            puVar30 = (uint *)top_blob;
                            do {
                              if (0 < (int)uVar12) {
                                uVar14 = 0;
                                do {
                                  auVar260._8_4_ = (int)uVar14;
                                  auVar260._0_8_ = uVar14;
                                  auVar260._12_4_ = (int)(uVar14 >> 0x20);
                                  auVar285 = (auVar260 | auVar71) ^ auVar52;
                                  iVar10 = auVar147._4_4_;
                                  if ((bool)(~(iVar10 < auVar285._4_4_ ||
                                              auVar147._0_4_ < auVar285._0_4_ &&
                                              auVar285._4_4_ == iVar10) & 1)) {
                                    *(undefined4 *)(lVar13 + -0xc + uVar14 * 4) = 0x3f800000;
                                  }
                                  if (auVar285._12_4_ <= auVar147._12_4_ &&
                                      (auVar285._8_4_ <= auVar147._8_4_ ||
                                      auVar285._12_4_ != auVar147._12_4_)) {
                                    *(undefined4 *)(lVar13 + -8 + uVar14 * 4) = 0x3f800000;
                                  }
                                  auVar285 = (auVar260 | auVar151) ^ auVar52;
                                  iVar264 = auVar285._4_4_;
                                  if (iVar264 <= iVar10 &&
                                      (iVar264 != iVar10 || auVar285._0_4_ <= auVar147._0_4_)) {
                                    *(undefined4 *)(lVar13 + -4 + uVar14 * 4) = 0x3f800000;
                                    *(undefined4 *)(lVar13 + uVar14 * 4) = 0x3f800000;
                                  }
                                  uVar14 = uVar14 + 4;
                                } while ((uVar12 + 3 & 0xfffffffc) != uVar14);
                              }
                              if (0 < (int)uVar11) {
                                pvVar44 = (void *)(sVar18 * sVar17 * (long)pMVar38 + (long)pvVar32);
                                pMVar46 = (Mat *)0x0;
                                pvVar48 = pvVar45;
                                do {
                                  if (0 < (int)uVar21) {
                                    uVar34 = 0;
                                    do {
                                      if (0 < (int)uVar25) {
                                        puVar30 = (uint *)0x0;
                                        do {
                                          *(float *)((long)pvVar48 + (long)puVar30 * 4) =
                                               *(float *)((long)pvVar44 + (long)puVar30 * 4) *
                                               *(float *)((long)pvVar48 + (long)puVar30 * 4);
                                          puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                                        } while (pMVar47 != (Mat *)puVar30);
                                      }
                                      pvVar44 = (void *)((long)pvVar44 + (long)(int)uVar25 * 4);
                                      uVar34 = uVar34 + 1;
                                    } while (uVar34 != uVar21);
                                  }
                                  pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                                  pvVar48 = (void *)((long)pvVar48 + uVar31 * (long)iVar9);
                                } while (pMVar46 != pMVar15);
                              }
                              pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                              lVar13 = lVar13 + lVar29;
                              pvVar45 = (void *)((long)pvVar45 + lVar29);
                            } while (pMVar38 != pMVar27);
                          }
                        }
                        else if (reduce_c == false && (bVar24 == 0 && (bVar37 & 1) == 0)) {
                          if (iVar9 == 0) {
                            puVar30 = (uint *)pMVar47;
                            Mat::create(top_blob,uVar25,uVar21,uVar12,sVar18,opt->blob_allocator);
                          }
                          else {
                            puVar30 = (uint *)pMVar47;
                            Mat::create(top_blob,uVar25,uVar21,1,uVar12,sVar18,opt->blob_allocator);
                          }
                          auVar71 = _DAT_00514730;
                          auVar151 = _DAT_00514720;
                          auVar52 = _DAT_005140e0;
                          if (0 < (int)uVar12) {
                            pvVar32 = bottom_blob->data;
                            sVar18 = bottom_blob->elemsize;
                            sVar17 = bottom_blob->cstep;
                            iVar9 = top_blob->w;
                            pvVar45 = top_blob->data;
                            uVar31 = top_blob->elemsize;
                            lVar13 = (long)top_blob->h * (long)iVar9;
                            pMVar15 = (Mat *)0x0;
                            iVar10 = (int)((uVar31 * lVar13 + 0xf & 0xfffffffffffffff0) / uVar31);
                            if (top_blob->dims == 4) {
                              iVar10 = (int)lVar13;
                            }
                            uVar12 = iVar10 * top_blob->d;
                            lVar13 = (ulong)uVar12 - 1;
                            auVar150._8_4_ = (int)lVar13;
                            auVar150._0_8_ = lVar13;
                            auVar150._12_4_ = (int)((ulong)lVar13 >> 0x20);
                            lVar13 = (long)pvVar45 + 0xc;
                            lVar29 = top_blob->cstep * uVar31;
                            auVar150 = auVar150 ^ _DAT_005140e0;
                            puVar30 = (uint *)top_blob;
                            do {
                              if (0 < (int)uVar12) {
                                uVar14 = 0;
                                do {
                                  auVar263._8_4_ = (int)uVar14;
                                  auVar263._0_8_ = uVar14;
                                  auVar263._12_4_ = (int)(uVar14 >> 0x20);
                                  auVar285 = (auVar263 | auVar71) ^ auVar52;
                                  iVar10 = auVar150._4_4_;
                                  if ((bool)(~(iVar10 < auVar285._4_4_ ||
                                              auVar150._0_4_ < auVar285._0_4_ &&
                                              auVar285._4_4_ == iVar10) & 1)) {
                                    *(undefined4 *)(lVar13 + -0xc + uVar14 * 4) = 0x3f800000;
                                  }
                                  if (auVar285._12_4_ <= auVar150._12_4_ &&
                                      (auVar285._8_4_ <= auVar150._8_4_ ||
                                      auVar285._12_4_ != auVar150._12_4_)) {
                                    *(undefined4 *)(lVar13 + -8 + uVar14 * 4) = 0x3f800000;
                                  }
                                  auVar285 = (auVar263 | auVar151) ^ auVar52;
                                  iVar264 = auVar285._4_4_;
                                  if (iVar264 <= iVar10 &&
                                      (iVar264 != iVar10 || auVar285._0_4_ <= auVar150._0_4_)) {
                                    *(undefined4 *)(lVar13 + -4 + uVar14 * 4) = 0x3f800000;
                                    *(undefined4 *)(lVar13 + uVar14 * 4) = 0x3f800000;
                                  }
                                  uVar14 = uVar14 + 4;
                                } while ((uVar12 + 3 & 0xfffffffc) != uVar14);
                              }
                              if (0 < (int)uVar11) {
                                pvVar48 = (void *)(sVar18 * sVar17 * (long)pMVar15 + (long)pvVar32);
                                uVar34 = 0;
                                do {
                                  if (0 < (int)uVar21) {
                                    pMVar46 = (Mat *)0x0;
                                    pvVar44 = pvVar45;
                                    do {
                                      if (0 < (int)uVar25) {
                                        puVar30 = (uint *)0x0;
                                        do {
                                          *(float *)((long)pvVar44 + (long)puVar30 * 4) =
                                               *(float *)((long)pvVar48 + (long)puVar30 * 4) *
                                               *(float *)((long)pvVar44 + (long)puVar30 * 4);
                                          puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                                        } while (pMVar47 != (Mat *)puVar30);
                                      }
                                      pvVar48 = (void *)((long)pvVar48 + (long)(int)uVar25 * 4);
                                      pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                                      pvVar44 = (void *)((long)pvVar44 + uVar31 * (long)iVar9);
                                    } while (pMVar46 != pMVar38);
                                  }
                                  uVar34 = uVar34 + 1;
                                } while (uVar34 != uVar11);
                              }
                              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                              lVar13 = lVar13 + lVar29;
                              pvVar45 = (void *)((long)pvVar45 + lVar29);
                            } while (pMVar15 != pMVar27);
                          }
                        }
                      }
                    }
                    goto LAB_00342112;
                  }
                  if (iVar9 == 0) {
                    Mat::create(top_blob,uVar25,uVar21,sVar18,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar25,uVar21,1,1,sVar18,opt->blob_allocator);
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (Mat *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize._0_4_ = 0;
                  local_c8.elemsize._4_4_ = 0;
                  local_c8.elempack = 0;
                  local_c8.allocator = (Allocator *)0x0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  puVar30 = (uint *)(ulong)uVar25;
                  Mat::create(&local_c8,uVar25,uVar21,uVar12,sVar18,opt->workspace_allocator);
                  auVar71 = _DAT_00514730;
                  auVar151 = _DAT_00514720;
                  auVar52 = _DAT_005140e0;
                  iVar10 = -100;
                  if (((Mat *)local_c8.data != (Mat *)0x0) &&
                     (local_c8.cstep * (long)local_c8.c != 0)) {
                    uVar34 = (int)local_c8.cstep * local_c8.c;
                    if (0 < (int)uVar34) {
                      lVar29 = (ulong)uVar34 - 1;
                      auVar128._8_4_ = (int)lVar29;
                      auVar128._0_8_ = lVar29;
                      auVar128._12_4_ = (int)((ulong)lVar29 >> 0x20);
                      puVar30 = (uint *)0x0;
                      auVar128 = auVar128 ^ _DAT_005140e0;
                      do {
                        auVar241._8_4_ = (int)puVar30;
                        auVar241._0_8_ = puVar30;
                        auVar241._12_4_ = (int)((ulong)puVar30 >> 0x20);
                        auVar285 = (auVar241 | auVar71) ^ auVar52;
                        iVar9 = auVar128._4_4_;
                        if ((bool)(~(auVar285._4_4_ == iVar9 && auVar128._0_4_ < auVar285._0_4_ ||
                                    iVar9 < auVar285._4_4_) & 1)) {
                          *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) =
                               0x3f800000;
                        }
                        if ((auVar285._12_4_ != auVar128._12_4_ || auVar285._8_4_ <= auVar128._8_4_)
                            && auVar285._12_4_ <= auVar128._12_4_) {
                          *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                               0x3f800000;
                        }
                        auVar285 = (auVar241 | auVar151) ^ auVar52;
                        iVar10 = auVar285._4_4_;
                        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar128._0_4_)
                           ) {
                          *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                               0x3f800000;
                          *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                               0x3f800000;
                        }
                        puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                      } while ((Mat *)(ulong)(uVar34 + 3 & 0xfffffffc) != (Mat *)puVar30);
                    }
                    if (0 < (int)uVar12) {
                      pvVar32 = bottom_blob->data;
                      puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar46 = (Mat *)0x0;
                      pMVar15 = (Mat *)local_c8.data;
                      do {
                        if (0 < (int)uVar11) {
                          pvVar45 = (void *)((long)puVar30 * (long)pMVar46 + (long)pvVar32);
                          uVar34 = 0;
                          do {
                            if (0 < (int)uVar21) {
                              pMVar43 = (Mat *)0x0;
                              pMVar16 = pMVar15;
                              do {
                                if (0 < (int)uVar25) {
                                  pMVar26 = (Mat *)0x0;
                                  do {
                                    *(float *)((long)&pMVar16->data + (long)pMVar26 * 4) =
                                         *(float *)((long)pvVar45 + (long)pMVar26 * 4) *
                                         *(float *)((long)&pMVar16->data + (long)pMVar26 * 4);
                                    pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                  } while (pMVar47 != pMVar26);
                                }
                                pvVar45 = (void *)((long)pvVar45 + lVar13 * 4);
                                pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                                pMVar16 = (Mat *)((long)&pMVar16->data +
                                                 (long)local_c8.w *
                                                 CONCAT44(local_c8.elemsize._4_4_,
                                                          (undefined4)local_c8.elemsize));
                              } while (pMVar43 != pMVar38);
                            }
                            uVar34 = uVar34 + 1;
                          } while (uVar34 != uVar11);
                        }
                        pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                        pMVar15 = (Mat *)((long)&pMVar15->data +
                                         CONCAT44(local_c8.elemsize._4_4_,
                                                  (undefined4)local_c8.elemsize) * local_c8.cstep);
                      } while (pMVar46 != pMVar27);
                    }
                    auVar71 = _DAT_00514730;
                    auVar151 = _DAT_00514720;
                    auVar52 = _DAT_005140e0;
                    uVar11 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar11) {
                      puVar30 = (uint *)top_blob->data;
                      lVar13 = (ulong)uVar11 - 1;
                      auVar129._8_4_ = (int)lVar13;
                      auVar129._0_8_ = lVar13;
                      auVar129._12_4_ = (int)((ulong)lVar13 >> 0x20);
                      uVar31 = 0;
                      auVar129 = auVar129 ^ _DAT_005140e0;
                      do {
                        auVar242._8_4_ = (int)uVar31;
                        auVar242._0_8_ = uVar31;
                        auVar242._12_4_ = (int)(uVar31 >> 0x20);
                        auVar285 = (auVar242 | auVar71) ^ auVar52;
                        iVar9 = auVar129._4_4_;
                        if ((bool)(~(auVar285._4_4_ == iVar9 && auVar129._0_4_ < auVar285._0_4_ ||
                                    iVar9 < auVar285._4_4_) & 1)) {
                          *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x3f800000;
                        }
                        if ((auVar285._12_4_ != auVar129._12_4_ || auVar285._8_4_ <= auVar129._8_4_)
                            && auVar285._12_4_ <= auVar129._12_4_) {
                          *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) =
                               0x3f800000;
                        }
                        auVar285 = (auVar242 | auVar151) ^ auVar52;
                        iVar10 = auVar285._4_4_;
                        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar129._0_4_)
                           ) {
                          *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) =
                               0x3f800000;
                          *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) =
                               0x3f800000;
                        }
                        uVar31 = uVar31 + 4;
                      } while ((uVar11 + 3 & 0xfffffffc) != uVar31);
                    }
                    if (0 < (int)uVar12) {
                      puVar30 = (uint *)top_blob->data;
                      iVar9 = top_blob->w;
                      sVar18 = top_blob->elemsize;
                      pMVar46 = (Mat *)0x0;
                      pMVar15 = (Mat *)local_c8.data;
                      do {
                        if (0 < (int)uVar21) {
                          pMVar26 = (Mat *)0x0;
                          pMVar16 = pMVar15;
                          pMVar43 = (Mat *)puVar30;
                          do {
                            if (0 < (int)uVar25) {
                              pMVar22 = (Mat *)0x0;
                              do {
                                *(float *)((long)&pMVar43->data + (long)pMVar22 * 4) =
                                     *(float *)((long)&pMVar16->data + (long)pMVar22 * 4) *
                                     *(float *)((long)&pMVar43->data + (long)pMVar22 * 4);
                                pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                              } while (pMVar47 != pMVar22);
                            }
                            pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                            pMVar16 = (Mat *)((long)&pMVar16->data +
                                             (long)local_c8.w *
                                             CONCAT44(local_c8.elemsize._4_4_,
                                                      (undefined4)local_c8.elemsize));
                            pMVar43 = (Mat *)((long)&pMVar43->data + (long)iVar9 * sVar18);
                          } while (pMVar26 != pMVar38);
                        }
                        pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                        pMVar15 = (Mat *)((long)&pMVar15->data +
                                         local_c8.cstep *
                                         CONCAT44(local_c8.elemsize._4_4_,
                                                  (undefined4)local_c8.elemsize));
                      } while (pMVar46 != pMVar27);
                    }
                    iVar10 = 0;
                  }
                  piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar7 != (int *)0x0) {
                    LOCK();
                    *piVar7 = *piVar7 + -1;
                    UNLOCK();
                    if (*piVar7 == 0) {
                      puVar30 = (uint *)local_c8.data;
                      if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                      (*(local_c8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
              }
            }
          }
          else {
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar11,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,1,uVar11,1,sVar18,opt->blob_allocator);
            }
            local_c8.cstep = 0;
            local_c8.data = (Mat *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            puVar30 = (uint *)0x1;
            Mat::create(&local_c8,1,uVar11,uVar12,sVar18,opt->workspace_allocator);
            auVar71 = _DAT_00514730;
            auVar151 = _DAT_00514720;
            auVar52 = _DAT_005140e0;
            iVar10 = -100;
            if (((Mat *)local_c8.data != (Mat *)0x0) &&
               (puVar30 = (uint *)(long)local_c8.c, local_c8.cstep * (long)puVar30 != 0)) {
              uVar25 = (int)local_c8.cstep * local_c8.c;
              if (0 < (int)uVar25) {
                lVar13 = (ulong)uVar25 - 1;
                auVar86._8_4_ = (int)lVar13;
                auVar86._0_8_ = lVar13;
                auVar86._12_4_ = (int)((ulong)lVar13 >> 0x20);
                puVar30 = (uint *)0x0;
                auVar86 = auVar86 ^ _DAT_005140e0;
                do {
                  auVar187._8_4_ = (int)puVar30;
                  auVar187._0_8_ = puVar30;
                  auVar187._12_4_ = (int)((ulong)puVar30 >> 0x20);
                  auVar285 = (auVar187 | auVar71) ^ auVar52;
                  iVar9 = auVar86._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar86._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4) = 0x3f800000;
                  }
                  if ((auVar285._12_4_ != auVar86._12_4_ || auVar285._8_4_ <= auVar86._8_4_) &&
                      auVar285._12_4_ <= auVar86._12_4_) {
                    *(undefined4 *)((long)(void **)local_c8.data + (long)puVar30 * 4 + 4) =
                         0x3f800000;
                  }
                  auVar285 = (auVar187 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar86._0_4_)) {
                    *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4) =
                         0x3f800000;
                    *(undefined4 *)((long)((long)local_c8.data + 8) + (long)puVar30 * 4 + 4) =
                         0x3f800000;
                  }
                  puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 4);
                } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != (Mat *)puVar30);
              }
              if (0 < (int)uVar12) {
                pvVar32 = bottom_blob->data;
                puVar30 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                pMVar38 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    pMVar47 = (Mat *)0x0;
                    pvVar45 = pvVar32;
                    do {
                      auVar164 = ZEXT816(0x3f800000);
                      if (0 < (int)uVar35) {
                        uVar31 = 0;
                        auVar164 = ZEXT816(0x3f800000);
                        do {
                          auVar164._0_4_ = auVar164._0_4_ * *(float *)((long)pvVar45 + uVar31 * 4);
                          uVar31 = uVar31 + 1;
                        } while (uVar35 != uVar31);
                      }
                      *(int *)((long)(void **)local_c8.data +
                              (long)pMVar47 * 4 +
                              CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                              local_c8.cstep * (long)pMVar38) = auVar164._0_4_;
                      pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                      pvVar45 = (void *)((long)pvVar45 + (long)(int)uVar35 * 4);
                    } while (pMVar47 != pMVar15);
                  }
                  pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                  pvVar32 = (void *)((long)&((Mat *)puVar30)->data + (long)pvVar32);
                } while (pMVar38 != pMVar27);
              }
              auVar71 = _DAT_00514730;
              auVar151 = _DAT_00514720;
              auVar52 = _DAT_005140e0;
              uVar25 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar25) {
                puVar30 = (uint *)top_blob->data;
                lVar13 = (ulong)uVar25 - 1;
                auVar87._8_4_ = (int)lVar13;
                auVar87._0_8_ = lVar13;
                auVar87._12_4_ = (int)((ulong)lVar13 >> 0x20);
                uVar31 = 0;
                auVar87 = auVar87 ^ _DAT_005140e0;
                do {
                  auVar188._8_4_ = (int)uVar31;
                  auVar188._0_8_ = uVar31;
                  auVar188._12_4_ = (int)(uVar31 >> 0x20);
                  auVar285 = (auVar188 | auVar71) ^ auVar52;
                  iVar9 = auVar87._4_4_;
                  if ((bool)(~(auVar285._4_4_ == iVar9 && auVar87._0_4_ < auVar285._0_4_ ||
                              iVar9 < auVar285._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4) = 0x3f800000;
                  }
                  if ((auVar285._12_4_ != auVar87._12_4_ || auVar285._8_4_ <= auVar87._8_4_) &&
                      auVar285._12_4_ <= auVar87._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->data + uVar31 * 4 + 4) = 0x3f800000;
                  }
                  auVar285 = (auVar188 | auVar151) ^ auVar52;
                  iVar10 = auVar285._4_4_;
                  if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar285._0_4_ <= auVar87._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4) = 0x3f800000;
                    *(undefined4 *)((long)&((Mat *)puVar30)->refcount + uVar31 * 4 + 4) = 0x3f800000
                    ;
                  }
                  uVar31 = uVar31 + 4;
                } while ((uVar25 + 3 & 0xfffffffc) != uVar31);
              }
              if (0 < (int)uVar12) {
                pvVar32 = top_blob->data;
                puVar30 = (uint *)0x0;
                pMVar38 = (Mat *)local_c8.data;
                do {
                  if (0 < (int)uVar11) {
                    pMVar47 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar32 + (long)pMVar47 * 4) =
                           *(float *)((long)&pMVar38->data + (long)pMVar47 * 4) *
                           *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                      pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                    } while (pMVar15 != pMVar47);
                  }
                  puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                  pMVar38 = (Mat *)((long)&pMVar38->data +
                                   local_c8.cstep *
                                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
                } while ((Mat *)puVar30 != pMVar27);
              }
              iVar10 = 0;
            }
            piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                puVar30 = (uint *)local_c8.data;
                if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          if (iVar9 == 0) {
            Mat::create(top_blob,1,sVar18,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,1,1,sVar18,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          Mat::create(&local_c8,uVar12,sVar18,opt->workspace_allocator);
          iVar10 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
            if ((int)uVar12 < 1) {
              fVar51 = 1.0;
            }
            else {
              sVar18 = bottom_blob->elemsize;
              sVar17 = bottom_blob->cstep;
              pvVar32 = bottom_blob->data;
              puVar30 = (uint *)(ulong)uVar34;
              pMVar15 = (Mat *)0x0;
              do {
                fVar51 = 1.0;
                if (0 < (int)uVar34) {
                  pMVar38 = (Mat *)0x0;
                  fVar51 = 1.0;
                  do {
                    fVar51 = fVar51 * *(float *)((long)pvVar32 + (long)pMVar38 * 4);
                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                  } while ((Mat *)puVar30 != pMVar38);
                }
                *(float *)((long)(void **)local_c8.data + (long)pMVar15 * 4) = fVar51;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
              } while (pMVar15 != pMVar27);
              fVar51 = 1.0;
              pMVar15 = (Mat *)0x0;
              do {
                fVar51 = fVar51 * *(float *)((long)(void **)local_c8.data + (long)pMVar15 * 4);
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              } while (pMVar27 != pMVar15);
            }
            *(float *)top_blob->data = fVar51;
            iVar10 = 0;
          }
          piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar30 = (uint *)local_c8.data;
              if (local_c8.allocator == (Allocator *)0x0) goto joined_r0x00346c6e;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      goto LAB_00342105;
    }
    break;
  case 7:
    post_process = (undefined1)this->keepdims;
    auVar155._0_8_ = lVar13 << 0x3f;
    auVar155._8_8_ = lVar29 << 0x3f;
    uVar20 = movmskpd(uVar25,auVar155);
    bVar37 = (byte)uVar20;
    fVar50 = 1.0;
LAB_0033a7e7:
    iVar9 = reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                      (bottom_blob,top_blob,fVar50,(bool)(bVar37 >> 1),(bool)(bVar37 & 1),reduce_d,
                       reduce_c,(bool)post_process,0.0,(int)opt,in_stack_fffffffffffffed8);
    return iVar9;
  case 8:
    auVar157._0_8_ = lVar13 << 0x3f;
    auVar157._8_8_ = lVar29 << 0x3f;
    uVar20 = movmskpd(uVar25,auVar157);
    iVar9 = reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                      (bottom_blob,top_blob,auVar52._0_4_,(bool)((byte)uVar20 >> 1),
                       (bool)((byte)uVar20 & 1),reduce_d,reduce_c,this->keepdims,opt);
    if (iVar9 != 0) {
      return -100;
    }
    iVar9 = top_blob->dims;
    if (iVar9 == 2) {
      uVar25 = top_blob->h * top_blob->w;
      if (0 < (int)uVar25) {
        pvVar32 = top_blob->data;
        uVar31 = 0;
        do {
          *(float *)((long)pvVar32 + uVar31 * 4) = SQRT(*(float *)((long)pvVar32 + uVar31 * 4));
          uVar31 = uVar31 + 1;
        } while (uVar25 != uVar31);
        return 0;
      }
      return 0;
    }
    if (iVar9 == 1) {
      iVar9 = top_blob->w;
      if (0 < (long)iVar9) {
        pvVar32 = top_blob->data;
        lVar13 = 0;
        do {
          *(float *)((long)pvVar32 + lVar13 * 4) = SQRT(*(float *)((long)pvVar32 + lVar13 * 4));
          lVar13 = lVar13 + 1;
        } while (iVar9 != lVar13);
        return 0;
      }
      return 0;
    }
    if (1 < iVar9 - 3U) {
      return 0;
    }
    uVar25 = top_blob->c;
    uVar21 = top_blob->h * top_blob->w * top_blob->d;
    if ((ulong)uVar25 != 1) {
      if (0 < (int)uVar25) {
        pvVar32 = top_blob->data;
        sVar18 = top_blob->elemsize;
        sVar17 = top_blob->cstep;
        uVar31 = 0;
        do {
          if (0 < (int)uVar21) {
            uVar14 = 0;
            do {
              *(float *)((long)pvVar32 + uVar14 * 4) = SQRT(*(float *)((long)pvVar32 + uVar14 * 4));
              uVar14 = uVar14 + 1;
            } while (uVar21 != uVar14);
          }
          uVar31 = uVar31 + 1;
          pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
        } while (uVar31 != uVar25);
        return 0;
      }
      return 0;
    }
    if (0 < (int)uVar21) {
      pvVar32 = top_blob->data;
      uVar31 = 0;
      do {
        *(float *)((long)pvVar32 + uVar31 * 4) = SQRT(*(float *)((long)pvVar32 + uVar31 * 4));
        uVar31 = uVar31 + 1;
      } while (uVar21 != uVar31);
      return 0;
    }
    return 0;
  case 9:
    auVar153._0_8_ = lVar13 << 0x3f;
    auVar153._8_8_ = lVar29 << 0x3f;
    uVar20 = movmskpd(uVar25,auVar153);
    puVar30 = (uint *)top_blob;
    iVar9 = reduction_op<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
                      (bottom_blob,top_blob,auVar52._0_4_,(bool)((byte)uVar20 >> 1),
                       (bool)((byte)uVar20 & 1),reduce_d,reduce_c,this->keepdims,opt);
    fVar50 = extraout_XMM0_Da;
    if (iVar9 != 0) {
      return -100;
    }
    goto LAB_00346f4e;
  case 10:
    if (3 < uVar25 - 1) goto LAB_00346f49;
    iVar9 = this->keepdims;
    sVar18 = bottom_blob->elemsize;
    puVar30 = &switchD_0033a93d::switchdataD_0051c95c;
    switch(uVar25) {
    case 1:
      iVar9 = bottom_blob->w;
      puVar30 = (uint *)0x1;
      Mat::create(top_blob,1,sVar18,opt->blob_allocator);
      if ((long)iVar9 < 1) {
        auVar52 = (undefined1  [16])0x0;
      }
      else {
        pvVar32 = bottom_blob->data;
        auVar52 = (undefined1  [16])0x0;
        lVar13 = 0;
        do {
          fVar50 = expf(*(float *)((long)pvVar32 + lVar13 * 4));
          auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar50));
          lVar13 = lVar13 + 1;
        } while (iVar9 != lVar13);
      }
      *(int *)top_blob->data = auVar52._0_4_;
      break;
    case 2:
      uVar25 = bottom_blob->w;
      pMVar27 = (Mat *)(ulong)uVar25;
      uVar21 = bottom_blob->h;
      pMVar15 = (Mat *)(ulong)uVar21;
      auVar74._8_4_ = 0xffffffff;
      auVar74._0_8_ = 0xffffffffffffffff;
      auVar74._12_4_ = 0xffffffff;
      auVar52._0_8_ = SUB168(auVar74 ^ auVar151,0) << 0x3f;
      auVar52._8_8_ = SUB168(auVar74 ^ auVar151,8) << 0x3f;
      iVar10 = movmskpd(uVar20,auVar52);
      if (iVar10 == 0) {
        if (iVar9 == 0) {
          Mat::create(top_blob,1,sVar18,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,sVar18,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        puVar30 = (uint *)pMVar15;
        Mat::create(&local_c8,uVar21,sVar18,opt->workspace_allocator);
        pvVar32 = local_c8.data;
        iVar10 = -100;
        auVar52 = extraout_XMM0_07;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          if ((int)uVar21 < 1) {
            auVar52 = ZEXT816(0);
          }
          else {
            pvVar45 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar18 = bottom_blob->elemsize;
            pMVar38 = (Mat *)0x0;
            do {
              fVar50 = 0.0;
              if (0 < (int)uVar25) {
                pMVar47 = (Mat *)0x0;
                do {
                  fVar51 = expf(*(float *)((long)pvVar45 + (long)pMVar47 * 4));
                  fVar50 = fVar50 + fVar51;
                  pMVar47 = (Mat *)((long)&pMVar47->data + 1);
                } while (pMVar27 != pMVar47);
              }
              *(float *)((long)(void **)pvVar32 + (long)pMVar38 * 4) = fVar50;
              pMVar38 = (Mat *)((long)&pMVar38->data + 1);
              pvVar45 = (void *)((long)pvVar45 + (long)iVar9 * sVar18);
            } while (pMVar38 != pMVar15);
            auVar52 = ZEXT816(0);
            pMVar27 = (Mat *)0x0;
            do {
              auVar52._0_4_ = auVar52._0_4_ + *(float *)((long)(void **)pvVar32 + (long)pMVar27 * 4)
              ;
              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
            } while (pMVar15 != pMVar27);
          }
          *(int *)top_blob->data = auVar52._0_4_;
          iVar10 = 0;
        }
        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) goto LAB_00340907;
            puVar30 = (uint *)local_c8.data;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
            auVar52 = extraout_XMM0_13;
          }
        }
        goto LAB_00346f40;
      }
      if (((bVar37 | (byte)iVar10 >> 1) & 1) == 0) {
        if (iVar9 == 0) {
          puVar30 = (uint *)pMVar15;
          Mat::create(top_blob,uVar21,sVar18,opt->blob_allocator);
          auVar52 = extraout_XMM0_10;
        }
        else {
          puVar30 = (uint *)0x1;
          Mat::create(top_blob,1,uVar21,sVar18,opt->blob_allocator);
          auVar52 = extraout_XMM0_04;
        }
        if (0 < (int)uVar21) {
          pvVar32 = bottom_blob->data;
          iVar9 = bottom_blob->w;
          sVar18 = bottom_blob->elemsize;
          pvVar45 = top_blob->data;
          pMVar38 = (Mat *)0x0;
          do {
            auVar52 = ZEXT816(0);
            if (0 < (int)uVar25) {
              pMVar47 = (Mat *)0x0;
              do {
                fVar50 = expf(*(float *)((long)pvVar32 + (long)pMVar47 * 4));
                auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar50));
                pMVar47 = (Mat *)((long)&pMVar47->data + 1);
              } while (pMVar27 != pMVar47);
            }
            *(int *)((long)pvVar45 + (long)pMVar38 * 4) = auVar52._0_4_;
            pMVar38 = (Mat *)((long)&pMVar38->data + 1);
            pvVar32 = (void *)((long)pvVar32 + (long)iVar9 * sVar18);
          } while (pMVar38 != pMVar15);
        }
      }
      else if (((bVar36 | (byte)iVar10) & 1) == 0) {
        puVar30 = (uint *)pMVar27;
        if (iVar9 == 0) {
          Mat::create(top_blob,uVar25,sVar18,opt->blob_allocator);
          auVar52 = extraout_XMM0_22;
        }
        else {
          Mat::create(top_blob,uVar25,1,sVar18,opt->blob_allocator);
          auVar52 = extraout_XMM0;
        }
        uVar11 = top_blob->c * (int)top_blob->cstep;
        pvVar32 = top_blob->data;
        if (0 < (int)uVar11) {
          puVar30 = (uint *)0x0;
          memset(pvVar32,0,(ulong)uVar11 << 2);
          auVar52 = extraout_XMM0_23;
        }
        if (0 < (int)uVar21) {
          pvVar45 = bottom_blob->data;
          iVar9 = bottom_blob->w;
          sVar18 = bottom_blob->elemsize;
          pMVar38 = (Mat *)0x0;
          do {
            if (0 < (int)uVar25) {
              pMVar47 = (Mat *)0x0;
              do {
                fVar50 = expf(*(float *)((long)pvVar45 + (long)pMVar47 * 4));
                auVar52._0_4_ = fVar50 + *(float *)((long)pvVar32 + (long)pMVar47 * 4);
                auVar52._4_12_ = extraout_var;
                *(float *)((long)pvVar32 + (long)pMVar47 * 4) = auVar52._0_4_;
                pMVar47 = (Mat *)((long)&pMVar47->data + 1);
              } while (pMVar27 != pMVar47);
            }
            pMVar38 = (Mat *)((long)&pMVar38->data + 1);
            pvVar45 = (void *)((long)pvVar45 + (long)iVar9 * sVar18);
          } while (pMVar38 != pMVar15);
        }
      }
      break;
    case 3:
      uVar21 = bottom_blob->w;
      pMVar27 = (Mat *)(long)(int)uVar21;
      uVar11 = bottom_blob->h;
      uVar31 = (ulong)uVar11;
      uVar12 = bottom_blob->c;
      pMVar15 = (Mat *)(ulong)uVar12;
      uVar34 = uVar11 * uVar21;
      auVar285._8_4_ = 0xffffffff;
      auVar285._0_8_ = 0xffffffffffffffff;
      auVar285._12_4_ = 0xffffffff;
      auVar52._0_8_ = SUB168(auVar285 ^ auVar151,0) << 0x3f;
      auVar52._8_8_ = SUB168(auVar285 ^ auVar151,8) << 0x3f;
      iVar10 = movmskpd((&switchD_0033a93d::switchdataD_0051c95c)[uVar25 - 1] + 0x51c95c,auVar52);
      bVar24 = reduce_c ^ 1;
      puVar30 = (uint *)pMVar15;
      if ((iVar10 != 0) || (bVar24 != 0)) {
        if (iVar10 == 0 && reduce_c == false) {
          if (iVar9 == 0) {
            Mat::create(top_blob,uVar12,sVar18,opt->blob_allocator);
            auVar52 = extraout_XMM0_08;
          }
          else {
            puVar30 = (uint *)0x1;
            Mat::create(top_blob,1,1,uVar12,sVar18,opt->blob_allocator);
            auVar52 = extraout_XMM0_02;
          }
          if (0 < (int)uVar12) {
            pvVar32 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            pvVar45 = top_blob->data;
            sVar17 = top_blob->elemsize;
            sVar39 = top_blob->cstep;
            sVar5 = bottom_blob->cstep;
            pMVar27 = (Mat *)0x0;
            do {
              if ((int)uVar34 < 1) {
                auVar52 = ZEXT816(0);
              }
              else {
                auVar52 = ZEXT816(0);
                uVar31 = 0;
                do {
                  fVar50 = expf(*(float *)((long)pvVar32 + uVar31 * 4));
                  auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar50));
                  uVar31 = uVar31 + 1;
                } while (uVar34 != uVar31);
              }
              lVar13 = sVar17 * sVar39 * (long)pMVar27;
              if (iVar9 == 0) {
                lVar13 = (long)pMVar27 * 4;
              }
              *(int *)((long)pvVar45 + lVar13) = auVar52._0_4_;
              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
              pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar5);
            } while (pMVar27 != pMVar15);
          }
          break;
        }
        pMVar38 = (Mat *)(ulong)uVar21;
        bVar33 = (byte)iVar10 >> 1 | bVar37;
        if ((bVar33 & 1) == 0 && bVar24 == 0) {
          if (iVar9 == 0) {
            Mat::create(top_blob,uVar11,sVar18,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,uVar11,1,sVar18,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar30 = (uint *)0x1;
          Mat::create(&local_c8,1,uVar11,uVar12,sVar18,opt->workspace_allocator);
          pMVar47 = (Mat *)local_c8.data;
          iVar10 = -100;
          auVar52 = extraout_XMM0_14;
          if (((Mat *)local_c8.data != (Mat *)0x0) && (local_c8.cstep * (long)local_c8.c != 0)) {
            local_78 = (Mat *)local_c8.cstep;
            uVar25 = (int)local_c8.cstep * local_c8.c;
            if (0 < (int)uVar25) {
              memset(local_c8.data,0,(ulong)uVar25 << 2);
              auVar52 = extraout_XMM0_15;
            }
            if (0 < (int)uVar12) {
              local_e0 = (Mat *)bottom_blob->data;
              sVar18 = bottom_blob->elemsize;
              sVar17 = bottom_blob->cstep;
              lVar13 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                       (long)local_78;
              local_f0 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  uVar14 = 0;
                  pMVar46 = local_e0;
                  do {
                    if ((int)uVar21 < 1) {
                      auVar52 = ZEXT816(0);
                    }
                    else {
                      auVar52 = ZEXT816(0);
                      pMVar16 = (Mat *)0x0;
                      do {
                        fVar50 = expf(*(float *)((long)pMVar46 + (long)pMVar16 * 4));
                        auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar50));
                        pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                      } while (pMVar38 != pMVar16);
                    }
                    *(int *)((long)&pMVar47->data + uVar14 * 4 + lVar13 * (long)local_f0) =
                         auVar52._0_4_;
                    uVar14 = uVar14 + 1;
                    pMVar46 = (Mat *)((long)pMVar46 + (long)pMVar27 * 4);
                  } while (uVar14 != uVar31);
                }
                local_f0 = (Mat *)((long)&local_f0->data + 1);
                local_e0 = (Mat *)((long)local_e0 + sVar18 * sVar17);
              } while (local_f0 != pMVar15);
            }
            uVar25 = top_blob->c * (int)top_blob->cstep;
            if (0 < (int)uVar25) {
              memset(top_blob->data,0,(ulong)uVar25 << 2);
              auVar52 = extraout_XMM0_16;
            }
            if (0 < (int)uVar12) {
              pvVar32 = top_blob->data;
              pMVar27 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  uVar14 = 0;
                  do {
                    fVar50 = *(float *)((long)&pMVar47->data + uVar14 * 4) +
                             *(float *)((long)pvVar32 + uVar14 * 4);
                    auVar52 = ZEXT416((uint)fVar50);
                    *(float *)((long)pvVar32 + uVar14 * 4) = fVar50;
                    uVar14 = uVar14 + 1;
                  } while (uVar31 != uVar14);
                }
                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                pMVar47 = (Mat *)((long)&pMVar47->data +
                                 (long)local_78 *
                                 CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
              } while (pMVar27 != pMVar15);
            }
            iVar10 = 0;
            puVar30 = (uint *)pMVar15;
          }
          piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) {
LAB_00340907:
                puVar30 = (uint *)local_c8.data;
                if ((Mat *)local_c8.data != (Mat *)0x0) {
                  free(local_c8.data);
                  auVar52 = extraout_XMM0_29;
                }
              }
              else {
                puVar30 = (uint *)local_c8.data;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
                auVar52 = extraout_XMM0_17;
              }
            }
          }
        }
        else {
          bVar40 = (byte)iVar10 | bVar36;
          if ((bVar40 & 1) != 0 || bVar24 != 0) {
            if ((bVar33 & 1) == 0 && reduce_c == false) {
              if (iVar9 == 0) {
                puVar30 = (uint *)(ulong)uVar11;
                Mat::create(top_blob,uVar11,uVar12,sVar18,opt->blob_allocator);
                auVar52 = extraout_XMM0_36;
              }
              else {
                puVar30 = (uint *)0x1;
                Mat::create(top_blob,1,uVar11,uVar12,sVar18,opt->blob_allocator);
                auVar52 = extraout_XMM0_24;
              }
              if (0 < (int)uVar12) {
                sVar18 = bottom_blob->elemsize;
                if (iVar9 == 0) {
                  sVar17 = (size_t)top_blob->w;
                }
                else {
                  sVar17 = top_blob->cstep;
                }
                local_f0 = (Mat *)bottom_blob->data;
                pvVar32 = top_blob->data;
                sVar39 = top_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                local_e0 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    uVar14 = 0;
                    pMVar47 = local_f0;
                    do {
                      if ((int)uVar21 < 1) {
                        auVar52 = ZEXT816(0);
                      }
                      else {
                        auVar52 = ZEXT816(0);
                        pMVar46 = (Mat *)0x0;
                        do {
                          fVar50 = expf(*(float *)((long)pMVar47 + (long)pMVar46 * 4));
                          auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar50));
                          pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                        } while (pMVar38 != pMVar46);
                      }
                      *(int *)((long)pvVar32 + uVar14 * 4 + sVar17 * sVar39 * (long)local_e0) =
                           auVar52._0_4_;
                      uVar14 = uVar14 + 1;
                      pMVar47 = (Mat *)((long)pMVar47 + (long)pMVar27 * 4);
                    } while (uVar14 != uVar31);
                  }
                  local_e0 = (Mat *)((long)&local_e0->data + 1);
                  local_f0 = (Mat *)((long)local_f0 + sVar18 * sVar5);
                } while (local_e0 != pMVar15);
              }
            }
            else {
              puVar30 = (uint *)(ulong)CONCAT31(uVar6,bVar37 | bVar36 | bVar24);
              if (((bVar37 | bVar36) & 1) == 0 && bVar24 == 0) {
                if (iVar9 == 0) {
                  Mat::create(top_blob,uVar21,uVar11,sVar18,opt->blob_allocator);
                  puVar30 = (uint *)pMVar38;
                  auVar52 = extraout_XMM0_41;
                }
                else {
                  Mat::create(top_blob,uVar21,uVar11,1,sVar18,opt->blob_allocator);
                  puVar30 = (uint *)pMVar38;
                  auVar52 = extraout_XMM0_34;
                }
                uVar25 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar25) {
                  puVar30 = (uint *)0x0;
                  memset(top_blob->data,0,(ulong)uVar25 << 2);
                  auVar52 = extraout_XMM0_42;
                }
                if (0 < (int)uVar12) {
                  sVar18 = bottom_blob->elemsize;
                  sVar17 = bottom_blob->cstep;
                  pvVar32 = bottom_blob->data;
                  pvVar45 = top_blob->data;
                  pMVar27 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar34) {
                      uVar31 = 0;
                      do {
                        fVar50 = expf(*(float *)((long)pvVar32 + uVar31 * 4));
                        auVar52._0_4_ = fVar50 + *(float *)((long)pvVar45 + uVar31 * 4);
                        auVar52._4_12_ = extraout_var_02;
                        *(float *)((long)pvVar45 + uVar31 * 4) = auVar52._0_4_;
                        uVar31 = uVar31 + 1;
                      } while (uVar34 != uVar31);
                    }
                    pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                    pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
                  } while (pMVar27 != pMVar15);
                }
              }
              else if (reduce_c == false && (bVar40 & 1) == 0) {
                if (iVar9 == 0) {
                  puVar30 = (uint *)pMVar38;
                  Mat::create(top_blob,uVar21,uVar12,sVar18,opt->blob_allocator);
                  auVar52 = extraout_XMM0_44;
                }
                else {
                  Mat::create(top_blob,uVar21,1,uVar12,sVar18,opt->blob_allocator);
                  puVar30 = (uint *)pMVar27;
                  auVar52 = extraout_XMM0_00;
                }
                uVar25 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar25) {
                  puVar30 = (uint *)0x0;
                  memset(top_blob->data,0,(ulong)uVar25 << 2);
                  auVar52 = extraout_XMM0_45;
                }
                if (0 < (int)uVar12) {
                  sVar18 = bottom_blob->elemsize;
                  if (iVar9 == 0) {
                    sVar17 = (size_t)top_blob->w;
                  }
                  else {
                    sVar17 = top_blob->cstep;
                  }
                  local_110 = bottom_blob->data;
                  pvVar32 = top_blob->data;
                  sVar39 = top_blob->elemsize;
                  sVar5 = bottom_blob->cstep;
                  local_100 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar25 = 0;
                      pvVar45 = local_110;
                      do {
                        if (0 < (int)uVar21) {
                          pMVar27 = (Mat *)0x0;
                          do {
                            fVar50 = expf(*(float *)((long)pvVar45 + (long)pMVar27 * 4));
                            auVar52._0_4_ = fVar50 + *(float *)((long)pvVar32 + (long)pMVar27 * 4);
                            auVar52._4_12_ = extraout_var_03;
                            *(float *)((long)pvVar32 + (long)pMVar27 * 4) = auVar52._0_4_;
                            pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                          } while (pMVar38 != pMVar27);
                        }
                        uVar25 = uVar25 + 1;
                        pvVar45 = (void *)((long)pvVar45 + (long)(int)uVar21 * 4);
                      } while (uVar25 != uVar11);
                    }
                    local_100 = (Mat *)((long)&local_100->data + 1);
                    local_110 = (void *)((long)local_110 + sVar18 * sVar5);
                    pvVar32 = (void *)((long)pvVar32 + sVar17 * sVar39);
                  } while (local_100 != pMVar15);
                }
              }
            }
            break;
          }
          if (iVar9 == 0) {
            Mat::create(top_blob,uVar21,sVar18,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar21,1,1,sVar18,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar30 = (uint *)pMVar38;
          Mat::create(&local_c8,uVar21,1,uVar12,sVar18,opt->workspace_allocator);
          sVar18 = local_c8.cstep;
          pMVar47 = (Mat *)local_c8.data;
          iVar10 = -100;
          auVar52 = extraout_XMM0_25;
          if (((Mat *)local_c8.data != (Mat *)0x0) && (local_c8.cstep * (long)local_c8.c != 0)) {
            uVar25 = (int)local_c8.cstep * local_c8.c;
            if (0 < (int)uVar25) {
              memset(local_c8.data,0,(ulong)uVar25 << 2);
              auVar52 = extraout_XMM0_26;
            }
            if (0 < (int)uVar12) {
              local_f0 = (Mat *)bottom_blob->data;
              sVar17 = bottom_blob->elemsize;
              sVar39 = bottom_blob->cstep;
              lVar13 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
              pMVar16 = (Mat *)0x0;
              pMVar46 = pMVar47;
              do {
                if (0 < (int)uVar11) {
                  uVar25 = 0;
                  pMVar43 = local_f0;
                  do {
                    if (0 < (int)uVar21) {
                      pMVar26 = (Mat *)0x0;
                      do {
                        fVar50 = expf(*(float *)((long)pMVar43 + (long)pMVar26 * 4));
                        auVar52._0_4_ =
                             fVar50 + *(float *)((long)&pMVar46->data + (long)pMVar26 * 4);
                        auVar52._4_12_ = extraout_var_00;
                        *(float *)((long)&pMVar46->data + (long)pMVar26 * 4) = auVar52._0_4_;
                        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                      } while (pMVar38 != pMVar26);
                    }
                    uVar25 = uVar25 + 1;
                    pMVar43 = (Mat *)((long)pMVar43 + (long)pMVar27 * 4);
                  } while (uVar25 != uVar11);
                }
                pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                local_f0 = (Mat *)((long)local_f0 + sVar17 * sVar39);
                pMVar46 = (Mat *)((long)&pMVar46->data + lVar13 * sVar18);
              } while (pMVar16 != pMVar15);
            }
            uVar25 = top_blob->c * (int)top_blob->cstep;
            if (0 < (int)uVar25) {
              memset(top_blob->data,0,(ulong)uVar25 << 2);
              auVar52 = extraout_XMM0_27;
            }
            if (0 < (int)uVar12) {
              pvVar32 = top_blob->data;
              pMVar27 = (Mat *)0x0;
              do {
                if (0 < (int)uVar21) {
                  pMVar46 = (Mat *)0x0;
                  do {
                    fVar50 = *(float *)((long)&pMVar47->data + (long)pMVar46 * 4) +
                             *(float *)((long)pvVar32 + (long)pMVar46 * 4);
                    auVar52 = ZEXT416((uint)fVar50);
                    *(float *)((long)pvVar32 + (long)pMVar46 * 4) = fVar50;
                    pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                  } while (pMVar38 != pMVar46);
                }
                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                pMVar47 = (Mat *)((long)&pMVar47->data +
                                 sVar18 * CONCAT44(local_c8.elemsize._4_4_,
                                                   (undefined4)local_c8.elemsize));
              } while (pMVar27 != pMVar15);
            }
            iVar10 = 0;
            puVar30 = (uint *)pMVar47;
          }
          piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) goto LAB_00340907;
              puVar30 = (uint *)local_c8.data;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
              auVar52 = extraout_XMM0_28;
            }
          }
        }
      }
      else {
        if (iVar9 == 0) {
          Mat::create(top_blob,1,sVar18,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,sVar18,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        Mat::create(&local_c8,uVar12,sVar18,opt->workspace_allocator);
        pvVar32 = local_c8.data;
        iVar10 = -100;
        auVar52 = extraout_XMM0_05;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          if ((int)uVar12 < 1) {
            auVar52 = ZEXT816(0);
          }
          else {
            pvVar45 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar17 = bottom_blob->cstep;
            pMVar27 = (Mat *)0x0;
            do {
              if ((int)uVar34 < 1) {
                fVar50 = 0.0;
              }
              else {
                fVar50 = 0.0;
                uVar31 = 0;
                do {
                  fVar51 = expf(*(float *)((long)pvVar45 + uVar31 * 4));
                  fVar50 = fVar50 + fVar51;
                  uVar31 = uVar31 + 1;
                } while (uVar34 != uVar31);
              }
              *(float *)((long)(void **)pvVar32 + (long)pMVar27 * 4) = fVar50;
              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
              pvVar45 = (void *)((long)pvVar45 + sVar18 * sVar17);
            } while (pMVar27 != pMVar15);
            auVar52 = ZEXT816(0);
            pMVar27 = (Mat *)0x0;
            do {
              auVar52._0_4_ = auVar52._0_4_ + *(float *)((long)(void **)pvVar32 + (long)pMVar27 * 4)
              ;
              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
            } while (pMVar15 != pMVar27);
          }
          *(int *)top_blob->data = auVar52._0_4_;
          iVar10 = 0;
        }
        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) goto LAB_00340907;
            puVar30 = (uint *)local_c8.data;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
            auVar52 = extraout_XMM0_11;
          }
        }
      }
      goto LAB_00346f40;
    case 4:
      uVar25 = bottom_blob->w;
      pMVar38 = (Mat *)(long)(int)uVar25;
      uVar21 = bottom_blob->h;
      pMVar15 = (Mat *)(ulong)uVar21;
      uVar11 = bottom_blob->d;
      pMVar27 = (Mat *)(ulong)uVar11;
      uVar12 = bottom_blob->c;
      pMVar47 = (Mat *)(ulong)uVar12;
      uVar34 = uVar21 * uVar25;
      uVar35 = uVar34 * uVar11;
      auVar71._8_4_ = 0xffffffff;
      auVar71._0_8_ = 0xffffffffffffffff;
      auVar71._12_4_ = 0xffffffff;
      auVar52._0_8_ = SUB168(auVar71 ^ auVar151,0) << 0x3f;
      auVar52._8_8_ = SUB168(auVar71 ^ auVar151,8) << 0x3f;
      iVar10 = movmskpd(0x51c95c,auVar52);
      bVar49 = iVar10 != 0;
      bVar24 = reduce_d ^ 1;
      bVar33 = reduce_c ^ 1;
      puVar30 = (uint *)pMVar47;
      if ((bVar49 || bVar24 != 0) || (bVar33 != 0)) {
        if ((!bVar49 && bVar24 == 0) && reduce_c == false) {
          if (iVar9 == 0) {
            Mat::create(top_blob,uVar12,sVar18,opt->blob_allocator);
            auVar52 = extraout_XMM0_09;
          }
          else {
            puVar30 = (uint *)0x1;
            Mat::create(top_blob,1,1,1,uVar12,sVar18,opt->blob_allocator);
            auVar52 = extraout_XMM0_03;
          }
          if (0 < (int)uVar12) {
            pvVar32 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            pvVar45 = top_blob->data;
            sVar17 = top_blob->elemsize;
            sVar39 = top_blob->cstep;
            sVar5 = bottom_blob->cstep;
            pMVar27 = (Mat *)0x0;
            do {
              if ((int)uVar35 < 1) {
                auVar52 = ZEXT816(0);
              }
              else {
                auVar52 = ZEXT816(0);
                uVar31 = 0;
                do {
                  fVar50 = expf(*(float *)((long)pvVar32 + uVar31 * 4));
                  auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar50));
                  uVar31 = uVar31 + 1;
                } while (uVar35 != uVar31);
              }
              lVar13 = sVar17 * sVar39 * (long)pMVar27;
              if (iVar9 == 0) {
                lVar13 = (long)pMVar27 * 4;
              }
              *(int *)((long)pvVar45 + lVar13) = auVar52._0_4_;
              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
              pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar5);
            } while (pMVar27 != pMVar47);
          }
          break;
        }
        if ((bVar49 || reduce_d != false) || bVar33 != 0) {
          pMVar46 = (Mat *)(ulong)uVar25;
          bVar40 = (byte)iVar10 >> 1 | bVar37;
          if (((bVar40 & 1) == 0 && bVar24 == 0) && bVar33 == 0) {
            if (iVar9 == 0) {
              Mat::create(top_blob,uVar21,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,uVar21,1,1,sVar18,opt->blob_allocator);
            }
            local_c8.cstep = 0;
            local_c8.data = (Mat *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            puVar30 = (uint *)0x1;
            Mat::create(&local_c8,1,uVar21,uVar12,sVar18,opt->workspace_allocator);
            pMVar27 = (Mat *)local_c8.data;
            iVar10 = -100;
            auVar52 = extraout_XMM0_30;
            if (((Mat *)local_c8.data != (Mat *)0x0) && (local_c8.cstep * (long)local_c8.c != 0)) {
              local_68 = (Mat *)local_c8.cstep;
              uVar34 = (int)local_c8.cstep * local_c8.c;
              if (0 < (int)uVar34) {
                memset(local_c8.data,0,(ulong)uVar34 << 2);
                auVar52 = extraout_XMM0_31;
              }
              if (0 < (int)uVar12) {
                pvVar32 = bottom_blob->data;
                local_78 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                local_70 = (Mat *)(CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                                  (long)local_68);
                local_e0 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    lVar13 = (long)local_70 * (long)local_e0;
                    pvVar45 = (void *)((long)local_78 * (long)local_e0 + (long)pvVar32);
                    uVar34 = 0;
                    do {
                      if (0 < (int)uVar21) {
                        pMVar16 = (Mat *)0x0;
                        do {
                          if (0 < (int)uVar25) {
                            auVar52 = ZEXT416(*(uint *)((long)&pMVar27->data +
                                                       (long)pMVar16 * 4 + lVar13));
                            pMVar43 = (Mat *)0x0;
                            do {
                              fVar50 = expf(*(float *)((long)pvVar45 + (long)pMVar43 * 4));
                              fVar50 = auVar52._0_4_ + fVar50;
                              auVar52 = ZEXT416((uint)fVar50);
                              *(float *)((long)&pMVar27->data + (long)pMVar16 * 4 + lVar13) = fVar50
                              ;
                              pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                            } while (pMVar46 != pMVar43);
                          }
                          pvVar45 = (void *)((long)pvVar45 + (long)pMVar38 * 4);
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar16 != pMVar15);
                      }
                      uVar34 = uVar34 + 1;
                    } while (uVar34 != uVar11);
                  }
                  local_e0 = (Mat *)((long)&local_e0->data + 1);
                } while (local_e0 != pMVar47);
              }
              uVar25 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar25) {
                memset(top_blob->data,0,(ulong)uVar25 << 2);
                auVar52 = extraout_XMM0_32;
              }
              if (0 < (int)uVar12) {
                pvVar32 = top_blob->data;
                pMVar38 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar21) {
                    pMVar46 = (Mat *)0x0;
                    do {
                      fVar50 = *(float *)((long)&pMVar27->data + (long)pMVar46 * 4) +
                               *(float *)((long)pvVar32 + (long)pMVar46 * 4);
                      auVar52 = ZEXT416((uint)fVar50);
                      *(float *)((long)pvVar32 + (long)pMVar46 * 4) = fVar50;
                      pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                    } while (pMVar15 != pMVar46);
                  }
                  pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                  pMVar27 = (Mat *)((long)&pMVar27->data +
                                   (long)local_68 *
                                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
                } while (pMVar38 != pMVar47);
              }
              iVar10 = 0;
              puVar30 = (uint *)pMVar27;
            }
            piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                if (local_c8.allocator == (Allocator *)0x0) {
LAB_00346f31:
                  puVar30 = (uint *)local_c8.data;
                  if ((Mat *)local_c8.data != (Mat *)0x0) {
                    free(local_c8.data);
                    auVar52 = extraout_XMM0_62;
                  }
                }
                else {
                  puVar30 = (uint *)local_c8.data;
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                  auVar52 = extraout_XMM0_33;
                }
              }
            }
          }
          else {
            bVar28 = (byte)iVar10 | bVar36;
            puVar30 = (uint *)pMVar38;
            if (((bVar28 & 1) == 0 && bVar24 == 0) && bVar33 == 0) {
              if (iVar9 == 0) {
                Mat::create(top_blob,uVar25,sVar18,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar25,1,1,1,sVar18,opt->blob_allocator);
              }
              local_c8.cstep = 0;
              local_c8.data = (Mat *)0x0;
              local_c8.refcount._0_4_ = 0;
              local_c8.refcount._4_4_ = 0;
              local_c8.elemsize._0_4_ = 0;
              local_c8.elemsize._4_4_ = 0;
              local_c8.elempack = 0;
              local_c8.allocator = (Allocator *)0x0;
              local_c8.dims = 0;
              local_c8.w = 0;
              local_c8.h = 0;
              local_c8.d = 0;
              local_c8.c = 0;
              Mat::create(&local_c8,uVar25,1,uVar12,sVar18,opt->workspace_allocator);
              pMVar27 = (Mat *)local_c8.data;
              iVar10 = -100;
              auVar52 = extraout_XMM0_37;
              if (((Mat *)local_c8.data != (Mat *)0x0) && (local_c8.cstep * (long)local_c8.c != 0))
              {
                local_70 = (Mat *)local_c8.cstep;
                uVar34 = (int)local_c8.cstep * local_c8.c;
                if (0 < (int)uVar34) {
                  memset(local_c8.data,0,(ulong)uVar34 << 2);
                  auVar52 = extraout_XMM0_38;
                }
                local_78 = pMVar27;
                if (0 < (int)uVar12) {
                  pvVar32 = bottom_blob->data;
                  sVar18 = bottom_blob->elemsize;
                  sVar17 = bottom_blob->cstep;
                  lVar13 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                           (long)local_70;
                  local_f0 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      pvVar45 = (void *)(sVar18 * sVar17 * (long)local_f0 + (long)pvVar32);
                      uVar34 = 0;
                      do {
                        if (0 < (int)uVar21) {
                          uVar35 = 0;
                          do {
                            if (0 < (int)uVar25) {
                              pMVar15 = (Mat *)0x0;
                              do {
                                fVar50 = expf(*(float *)((long)pvVar45 + (long)pMVar15 * 4));
                                auVar52._0_4_ =
                                     fVar50 + *(float *)((long)&pMVar27->data + (long)pMVar15 * 4);
                                auVar52._4_12_ = extraout_var_01;
                                *(float *)((long)&pMVar27->data + (long)pMVar15 * 4) = auVar52._0_4_
                                ;
                                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                              } while (pMVar46 != pMVar15);
                            }
                            pvVar45 = (void *)((long)pvVar45 + (long)pMVar38 * 4);
                            uVar35 = uVar35 + 1;
                          } while (uVar35 != uVar21);
                        }
                        uVar34 = uVar34 + 1;
                      } while (uVar34 != uVar11);
                    }
                    local_f0 = (Mat *)((long)&local_f0->data + 1);
                    pMVar27 = (Mat *)((long)&pMVar27->data + lVar13);
                  } while (local_f0 != pMVar47);
                }
                uVar21 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar21) {
                  memset(top_blob->data,0,(ulong)uVar21 << 2);
                  auVar52 = extraout_XMM0_39;
                }
                puVar30 = (uint *)local_78;
                if (0 < (int)uVar12) {
                  pvVar32 = top_blob->data;
                  pMVar27 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar25) {
                      pMVar15 = (Mat *)0x0;
                      do {
                        fVar50 = *(float *)((long)&((Mat *)puVar30)->data + (long)pMVar15 * 4) +
                                 *(float *)((long)pvVar32 + (long)pMVar15 * 4);
                        auVar52 = ZEXT416((uint)fVar50);
                        *(float *)((long)pvVar32 + (long)pMVar15 * 4) = fVar50;
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                      } while (pMVar46 != pMVar15);
                    }
                    pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                    puVar30 = (uint *)((long)&((Mat *)puVar30)->data +
                                      (long)local_70 *
                                      CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize
                                              ));
                  } while (pMVar27 != pMVar47);
                }
                iVar10 = 0;
              }
              piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  if (local_c8.allocator == (Allocator *)0x0) goto LAB_00346f31;
                  puVar30 = (uint *)local_c8.data;
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                  auVar52 = extraout_XMM0_40;
                }
              }
            }
            else {
              if ((!bVar49 && reduce_d == false) && reduce_c == false) {
                if (iVar9 == 0) {
                  puVar30 = (uint *)pMVar27;
                  Mat::create(top_blob,uVar11,uVar12,sVar18,opt->blob_allocator);
                  auVar52 = extraout_XMM0_43;
                }
                else {
                  puVar30 = (uint *)0x1;
                  Mat::create(top_blob,1,1,uVar11,uVar12,sVar18,opt->blob_allocator);
                  auVar52 = extraout_XMM0_35;
                }
                if (0 < (int)uVar12) {
                  sVar18 = bottom_blob->elemsize;
                  if (iVar9 == 0) {
                    sVar17 = (size_t)top_blob->w;
                  }
                  else {
                    sVar17 = top_blob->cstep;
                  }
                  local_f8 = (Mat *)bottom_blob->data;
                  pMVar15 = (Mat *)top_blob->data;
                  sVar39 = top_blob->elemsize;
                  sVar5 = bottom_blob->cstep;
                  local_100 = (Mat *)0x0;
                  puVar30 = (uint *)pMVar15;
                  do {
                    if (0 < (int)uVar11) {
                      pMVar46 = (Mat *)0x0;
                      pMVar38 = local_f8;
                      do {
                        if ((int)uVar34 < 1) {
                          auVar52 = ZEXT816(0);
                        }
                        else {
                          auVar52 = ZEXT816(0);
                          uVar31 = 0;
                          do {
                            fVar50 = expf(*(float *)((long)pMVar38 + uVar31 * 4));
                            auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar50));
                            uVar31 = uVar31 + 1;
                          } while (uVar34 != uVar31);
                        }
                        *(int *)((long)&pMVar15->data +
                                (long)pMVar46 * 4 + sVar17 * sVar39 * (long)local_100) =
                             auVar52._0_4_;
                        pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                        pMVar38 = (Mat *)((long)pMVar38 + (long)(int)uVar34 * 4);
                      } while (pMVar46 != pMVar27);
                    }
                    local_100 = (Mat *)((long)&local_100->data + 1);
                    local_f8 = (Mat *)((long)local_f8 + sVar18 * sVar5);
                  } while (local_100 != pMVar47);
                }
                break;
              }
              if (((bVar40 & 1) == 0 && reduce_d == false) && bVar33 == 0) {
                if (iVar9 == 0) {
                  Mat::create(top_blob,uVar21,uVar11,sVar18,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,1,uVar21,uVar11,1,sVar18,opt->blob_allocator);
                }
                local_c8.cstep = 0;
                local_c8.data = (Mat *)0x0;
                local_c8.refcount._0_4_ = 0;
                local_c8.refcount._4_4_ = 0;
                local_c8.elemsize._0_4_ = 0;
                local_c8.elemsize._4_4_ = 0;
                local_c8.elempack = 0;
                local_c8.allocator = (Allocator *)0x0;
                local_c8.dims = 0;
                local_c8.w = 0;
                local_c8.h = 0;
                local_c8.d = 0;
                local_c8.c = 0;
                puVar30 = (uint *)pMVar15;
                Mat::create(&local_c8,uVar21,uVar11,uVar12,sVar18,opt->workspace_allocator);
                iVar10 = -100;
                auVar52 = extraout_XMM0_46;
                if (((Mat *)local_c8.data != (Mat *)0x0) &&
                   (local_70 = (Mat *)local_c8.data, local_c8.cstep * (long)local_c8.c != 0)) {
                  local_40 = (Mat *)local_c8.cstep;
                  uVar34 = (int)local_c8.cstep * local_c8.c;
                  if (0 < (int)uVar34) {
                    puVar30 = (uint *)0x0;
                    memset(local_c8.data,0,(ulong)uVar34 << 2);
                    auVar52 = extraout_XMM0_47;
                  }
                  if (0 < (int)uVar12) {
                    local_68 = (Mat *)bottom_blob->data;
                    local_60 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    lVar29 = (long)local_c8.w;
                    lVar13 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
                    local_38 = lVar13 * (long)local_40;
                    local_78 = (Mat *)0x0;
                    do {
                      pMVar16 = local_70;
                      if (0 < (int)uVar11) {
                        lVar23 = local_38 * (long)local_78;
                        ppvVar42 = (void **)((long)&local_68->data + (long)local_60 * (long)local_78
                                            );
                        pMVar43 = (Mat *)0x0;
                        do {
                          if (0 < (int)uVar21) {
                            lVar41 = lVar29 * lVar13 * (long)pMVar43 + lVar23;
                            pMVar26 = (Mat *)0x0;
                            do {
                              if (0 < (int)uVar25) {
                                auVar52 = ZEXT416(*(uint *)((long)&pMVar16->data +
                                                           (long)pMVar26 * 4 + lVar41));
                                pMVar22 = (Mat *)0x0;
                                do {
                                  fVar50 = expf(*(float *)((long)ppvVar42 + (long)pMVar22 * 4));
                                  fVar50 = auVar52._0_4_ + fVar50;
                                  auVar52 = ZEXT416((uint)fVar50);
                                  *(float *)((long)&pMVar16->data + (long)pMVar26 * 4 + lVar41) =
                                       fVar50;
                                  pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                                } while (pMVar46 != pMVar22);
                              }
                              ppvVar42 = (void **)((long)ppvVar42 + (long)pMVar38 * 4);
                              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                            } while (pMVar26 != pMVar15);
                          }
                          pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                        } while (pMVar43 != pMVar27);
                      }
                      puVar30 = (uint *)((long)&local_78->data + 1);
                      local_78 = (Mat *)puVar30;
                    } while ((Mat *)puVar30 != pMVar47);
                  }
                  uVar25 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar25) {
                    puVar30 = (uint *)0x0;
                    memset(top_blob->data,0,(ulong)uVar25 << 2);
                    auVar52 = extraout_XMM0_48;
                  }
                  if (0 < (int)uVar12) {
                    pMVar46 = (Mat *)0x0;
                    pMVar38 = local_70;
                    do {
                      if (0 < (int)uVar11) {
                        iVar10 = 1;
                        if (iVar9 != 0) {
                          iVar10 = top_blob->h;
                        }
                        iVar264 = top_blob->w;
                        sVar18 = top_blob->elemsize;
                        puVar30 = (uint *)top_blob->data;
                        pMVar43 = (Mat *)0x0;
                        pMVar16 = pMVar38;
                        do {
                          if (0 < (int)uVar21) {
                            pMVar26 = (Mat *)0x0;
                            do {
                              fVar50 = *(float *)((long)&pMVar16->data + (long)pMVar26 * 4) +
                                       *(float *)((long)&((Mat *)puVar30)->data + (long)pMVar26 * 4)
                              ;
                              auVar52 = ZEXT416((uint)fVar50);
                              *(float *)((long)&((Mat *)puVar30)->data + (long)pMVar26 * 4) = fVar50
                              ;
                              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                            } while (pMVar15 != pMVar26);
                          }
                          pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                          pMVar16 = (Mat *)((long)&pMVar16->data +
                                           (long)local_c8.w *
                                           CONCAT44(local_c8.elemsize._4_4_,
                                                    (undefined4)local_c8.elemsize));
                          puVar30 = (uint *)((long)&((Mat *)puVar30)->data +
                                            (long)iVar10 * sVar18 * (long)iVar264);
                        } while (pMVar43 != pMVar27);
                      }
                      pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                      pMVar38 = (Mat *)((long)&pMVar38->data +
                                       (long)local_40 *
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize));
                    } while (pMVar46 != pMVar47);
                  }
                  iVar10 = 0;
                }
                piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                if (piVar7 != (int *)0x0) {
                  LOCK();
                  *piVar7 = *piVar7 + -1;
                  UNLOCK();
                  if (*piVar7 == 0) {
                    if (local_c8.allocator == (Allocator *)0x0) goto LAB_00346f31;
                    puVar30 = (uint *)local_c8.data;
                    (*(local_c8.allocator)->_vptr_Allocator[3])();
                    auVar52 = extraout_XMM0_49;
                  }
                }
              }
              else {
                bVar37 = bVar37 | bVar36;
                if ((bVar24 != 0 || (bVar37 & 1) != 0) || bVar33 != 0) {
                  if (((bVar40 & 1) == 0 && bVar24 == 0) && reduce_c == false) {
                    if (iVar9 == 0) {
                      puVar30 = (uint *)pMVar15;
                      Mat::create(top_blob,uVar21,uVar12,sVar18,opt->blob_allocator);
                      auVar52 = extraout_XMM0_55;
                    }
                    else {
                      puVar30 = (uint *)0x1;
                      Mat::create(top_blob,1,uVar21,1,uVar12,sVar18,opt->blob_allocator);
                      auVar52 = extraout_XMM0_50;
                    }
                    if (0 < (int)uVar12) {
                      if (iVar9 == 0) {
                        sVar18 = (size_t)top_blob->w;
                      }
                      else {
                        sVar18 = top_blob->cstep;
                      }
                      local_78 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      local_70 = (Mat *)bottom_blob->data;
                      local_68 = (Mat *)((long)pMVar15 * 4);
                      sVar17 = top_blob->elemsize;
                      pvVar32 = top_blob->data;
                      local_e0 = (Mat *)0x0;
                      do {
                        pvVar45 = (void *)(sVar18 * sVar17 * (long)local_e0 + (long)pvVar32);
                        if (0 < (int)uVar21) {
                          puVar30 = (uint *)0x0;
                          memset(pvVar45,0,(size_t)local_68);
                          auVar52 = extraout_XMM0_56;
                        }
                        if (0 < (int)uVar11) {
                          ppvVar42 = (void **)((long)&local_70->data +
                                              (long)local_78 * (long)local_e0);
                          uVar12 = 0;
                          do {
                            if (0 < (int)uVar21) {
                              pMVar27 = (Mat *)0x0;
                              do {
                                if (0 < (int)uVar25) {
                                  auVar52 = ZEXT416(*(uint *)((long)pvVar45 + (long)pMVar27 * 4));
                                  pMVar16 = (Mat *)0x0;
                                  do {
                                    fVar50 = expf(*(float *)((long)ppvVar42 + (long)pMVar16 * 4));
                                    fVar50 = auVar52._0_4_ + fVar50;
                                    auVar52 = ZEXT416((uint)fVar50);
                                    *(float *)((long)pvVar45 + (long)pMVar27 * 4) = fVar50;
                                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                                  } while (pMVar46 != pMVar16);
                                }
                                ppvVar42 = (void **)((long)ppvVar42 + (long)pMVar38 * 4);
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar27 != pMVar15);
                            }
                            uVar12 = uVar12 + 1;
                          } while (uVar12 != uVar11);
                        }
                        local_e0 = (Mat *)((long)&local_e0->data + 1);
                      } while (local_e0 != pMVar47);
                    }
                  }
                  else {
                    if (((bVar28 & 1) == 0 && reduce_d == false) && bVar33 == 0) {
                      if (iVar9 == 0) {
                        Mat::create(top_blob,uVar25,uVar11,sVar18,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar25,1,uVar11,1,sVar18,opt->blob_allocator);
                      }
                      local_c8.cstep = 0;
                      local_c8.data = (Mat *)0x0;
                      local_c8.refcount._0_4_ = 0;
                      local_c8.refcount._4_4_ = 0;
                      local_c8.elemsize._0_4_ = 0;
                      local_c8.elemsize._4_4_ = 0;
                      local_c8.elempack = 0;
                      local_c8.allocator = (Allocator *)0x0;
                      local_c8.dims = 0;
                      local_c8.w = 0;
                      local_c8.h = 0;
                      local_c8.d = 0;
                      local_c8.c = 0;
                      puVar30 = (uint *)pMVar46;
                      Mat::create(&local_c8,uVar25,uVar11,uVar12,sVar18,opt->workspace_allocator);
                      iVar10 = -100;
                      local_68 = (Mat *)local_c8.data;
                      auVar52 = extraout_XMM0_58;
                      if (((Mat *)local_c8.data != (Mat *)0x0) &&
                         (local_60 = (Mat *)local_c8.cstep, local_c8.cstep * (long)local_c8.c != 0))
                      {
                        uVar34 = (int)local_c8.cstep * local_c8.c;
                        if (0 < (int)uVar34) {
                          puVar30 = (uint *)0x0;
                          memset(local_c8.data,0,(ulong)uVar34 << 2);
                          auVar52 = extraout_XMM0_59;
                        }
                        if (0 < (int)uVar12) {
                          local_78 = (Mat *)bottom_blob->data;
                          local_70 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                          lVar23 = (long)local_c8.w;
                          lVar13 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
                          lVar29 = lVar13 * (long)local_60;
                          local_e0 = (Mat *)0x0;
                          local_e8 = local_68;
                          do {
                            if (0 < (int)uVar11) {
                              ppvVar42 = (void **)((long)&local_78->data +
                                                  (long)local_70 * (long)local_e0);
                              pMVar16 = (Mat *)0x0;
                              pMVar15 = local_e8;
                              do {
                                if (0 < (int)uVar21) {
                                  uVar34 = 0;
                                  do {
                                    if (0 < (int)uVar25) {
                                      pMVar43 = (Mat *)0x0;
                                      do {
                                        fVar50 = expf(*(float *)((long)ppvVar42 + (long)pMVar43 * 4)
                                                     );
                                        auVar52._0_4_ =
                                             fVar50 + *(float *)((long)&pMVar15->data +
                                                                (long)pMVar43 * 4);
                                        auVar52._4_12_ = extraout_var_05;
                                        *(float *)((long)&pMVar15->data + (long)pMVar43 * 4) =
                                             auVar52._0_4_;
                                        pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                                      } while (pMVar46 != pMVar43);
                                    }
                                    ppvVar42 = (void **)((long)ppvVar42 + (long)pMVar38 * 4);
                                    uVar34 = uVar34 + 1;
                                  } while (uVar34 != uVar21);
                                }
                                pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                                pMVar15 = (Mat *)((long)&pMVar15->data + lVar23 * lVar13);
                              } while (pMVar16 != pMVar27);
                            }
                            local_e0 = (Mat *)((long)&local_e0->data + 1);
                            local_e8 = (Mat *)((long)&local_e8->data + lVar29);
                          } while (local_e0 != pMVar47);
                        }
                        uVar21 = top_blob->c * (int)top_blob->cstep;
                        if (0 < (int)uVar21) {
                          puVar30 = (uint *)0x0;
                          memset(top_blob->data,0,(ulong)uVar21 << 2);
                          auVar52 = extraout_XMM0_60;
                        }
                        if (0 < (int)uVar12) {
                          pvVar32 = top_blob->data;
                          iVar9 = top_blob->w;
                          sVar18 = top_blob->elemsize;
                          puVar30 = (uint *)0x0;
                          pMVar15 = local_68;
                          do {
                            if (0 < (int)uVar11) {
                              pMVar16 = (Mat *)0x0;
                              pvVar45 = pvVar32;
                              pMVar38 = pMVar15;
                              do {
                                if (0 < (int)uVar25) {
                                  pMVar43 = (Mat *)0x0;
                                  do {
                                    fVar50 = *(float *)((long)&pMVar38->data + (long)pMVar43 * 4) +
                                             *(float *)((long)pvVar45 + (long)pMVar43 * 4);
                                    auVar52 = ZEXT416((uint)fVar50);
                                    *(float *)((long)pvVar45 + (long)pMVar43 * 4) = fVar50;
                                    pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                                  } while (pMVar46 != pMVar43);
                                }
                                pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                                pMVar38 = (Mat *)((long)&pMVar38->data +
                                                 (long)local_c8.w *
                                                 CONCAT44(local_c8.elemsize._4_4_,
                                                          (undefined4)local_c8.elemsize));
                                pvVar45 = (void *)((long)pvVar45 + (long)iVar9 * sVar18);
                              } while (pMVar16 != pMVar27);
                            }
                            puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                            pMVar15 = (Mat *)((long)&pMVar15->data +
                                             (long)local_60 *
                                             CONCAT44(local_c8.elemsize._4_4_,
                                                      (undefined4)local_c8.elemsize));
                          } while ((Mat *)puVar30 != pMVar47);
                        }
                        iVar10 = 0;
                      }
                      piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                      if (piVar7 != (int *)0x0) {
                        LOCK();
                        *piVar7 = *piVar7 + -1;
                        UNLOCK();
                        if (*piVar7 == 0) {
                          if (local_c8.allocator == (Allocator *)0x0) goto LAB_00346f31;
                          puVar30 = (uint *)local_c8.data;
                          (*(local_c8.allocator)->_vptr_Allocator[3])();
                          auVar52 = extraout_XMM0_61;
                        }
                      }
                      goto LAB_00346f40;
                    }
                    if (((bVar28 & 1) == 0 && bVar24 == 0) && reduce_c == false) {
                      if (iVar9 == 0) {
                        puVar30 = (uint *)pMVar46;
                        Mat::create(top_blob,uVar25,uVar12,sVar18,opt->blob_allocator);
                        auVar52 = extraout_XMM0_64;
                      }
                      else {
                        Mat::create(top_blob,uVar25,1,1,uVar12,sVar18,opt->blob_allocator);
                        auVar52 = extraout_XMM0_57;
                      }
                      if (0 < (int)uVar12) {
                        sVar18 = bottom_blob->elemsize;
                        if (iVar9 == 0) {
                          sVar17 = (size_t)top_blob->w;
                        }
                        else {
                          sVar17 = top_blob->cstep;
                        }
                        local_78 = (Mat *)bottom_blob->data;
                        sVar39 = bottom_blob->cstep;
                        pMVar27 = (Mat *)top_blob->data;
                        lVar13 = sVar17 * top_blob->elemsize;
                        local_f0 = (Mat *)0x0;
                        local_70 = pMVar27;
                        do {
                          if (0 < (int)uVar25) {
                            puVar30 = (uint *)0x0;
                            memset((void **)((long)&local_70->data + lVar13 * (long)local_f0),0,
                                   (long)pMVar46 * 4);
                            auVar52 = extraout_XMM0_65;
                          }
                          if (0 < (int)uVar11) {
                            ppvVar42 = (void **)((long)&local_78->data +
                                                sVar18 * sVar39 * (long)local_f0);
                            uVar12 = 0;
                            do {
                              if (0 < (int)uVar21) {
                                uVar34 = 0;
                                do {
                                  if (0 < (int)uVar25) {
                                    pMVar15 = (Mat *)0x0;
                                    do {
                                      fVar50 = expf(*(float *)((long)ppvVar42 + (long)pMVar15 * 4));
                                      auVar52._0_4_ =
                                           fVar50 + *(float *)((long)&pMVar27->data +
                                                              (long)pMVar15 * 4);
                                      auVar52._4_12_ = extraout_var_06;
                                      *(float *)((long)&pMVar27->data + (long)pMVar15 * 4) =
                                           auVar52._0_4_;
                                      pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                                    } while (pMVar46 != pMVar15);
                                  }
                                  ppvVar42 = (void **)((long)ppvVar42 + (long)pMVar38 * 4);
                                  uVar34 = uVar34 + 1;
                                } while (uVar34 != uVar21);
                              }
                              uVar12 = uVar12 + 1;
                            } while (uVar12 != uVar11);
                          }
                          local_f0 = (Mat *)((long)&local_f0->data + 1);
                          pMVar27 = (Mat *)((long)&pMVar27->data + lVar13);
                        } while (local_f0 != pMVar47);
                      }
                    }
                    else if (((bVar40 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                      if (iVar9 == 0) {
                        Mat::create(top_blob,uVar21,uVar11,uVar12,sVar18,opt->blob_allocator);
                        puVar30 = (uint *)pMVar15;
                        auVar52 = extraout_XMM0_67;
                      }
                      else {
                        puVar30 = (uint *)0x1;
                        Mat::create(top_blob,1,uVar21,uVar11,uVar12,sVar18,opt->blob_allocator);
                        auVar52 = extraout_XMM0_63;
                      }
                      if (0 < (int)uVar12) {
                        local_f0 = (Mat *)bottom_blob->data;
                        sVar18 = bottom_blob->elemsize;
                        pvVar32 = top_blob->data;
                        puVar30 = (uint *)(top_blob->elemsize * top_blob->cstep);
                        sVar17 = bottom_blob->cstep;
                        local_108 = (Mat *)0x0;
                        local_78 = (Mat *)puVar30;
                        do {
                          if (0 < (int)(uVar21 * uVar11)) {
                            lVar13 = (long)local_78 * (long)local_108;
                            uVar31 = 0;
                            pMVar27 = local_f0;
                            do {
                              if ((int)uVar25 < 1) {
                                auVar52 = ZEXT816(0);
                              }
                              else {
                                auVar52 = ZEXT816(0);
                                pMVar15 = (Mat *)0x0;
                                do {
                                  fVar50 = expf(*(float *)((long)pMVar27 + (long)pMVar15 * 4));
                                  auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar50));
                                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                                } while (pMVar46 != pMVar15);
                              }
                              *(int *)((long)pvVar32 + uVar31 * 4 + lVar13) = auVar52._0_4_;
                              uVar31 = uVar31 + 1;
                              pMVar27 = (Mat *)((long)pMVar27 + (long)pMVar38 * 4);
                            } while (uVar31 != uVar21 * uVar11);
                          }
                          local_108 = (Mat *)((long)&local_108->data + 1);
                          local_f0 = (Mat *)((long)local_f0 + sVar18 * sVar17);
                        } while (local_108 != pMVar47);
                      }
                    }
                    else if ((reduce_d == false && (bVar37 & 1) == 0) && bVar33 == 0) {
                      if (iVar9 == 0) {
                        puVar30 = (uint *)pMVar46;
                        Mat::create(top_blob,uVar25,uVar21,uVar11,sVar18,opt->blob_allocator);
                        auVar52 = extraout_XMM0_69;
                      }
                      else {
                        Mat::create(top_blob,uVar25,uVar21,uVar11,1,sVar18,opt->blob_allocator);
                        auVar52 = extraout_XMM0_66;
                      }
                      uVar34 = top_blob->c * (int)top_blob->cstep;
                      if (0 < (int)uVar34) {
                        puVar30 = (uint *)0x0;
                        memset(top_blob->data,0,(ulong)uVar34 << 2);
                        auVar52 = extraout_XMM0_70;
                      }
                      if (0 < (int)uVar12) {
                        local_70 = (Mat *)bottom_blob->data;
                        local_68 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                        local_78 = (Mat *)0x0;
                        do {
                          if (0 < (int)uVar11) {
                            iVar10 = top_blob->w;
                            if (iVar9 == 0) {
                              sVar18 = top_blob->cstep;
                            }
                            else {
                              sVar18 = (long)top_blob->h * (long)iVar10;
                            }
                            ppvVar42 = (void **)((long)&local_70->data +
                                                (long)local_68 * (long)local_78);
                            pvVar32 = top_blob->data;
                            sVar17 = top_blob->elemsize;
                            pMVar16 = (Mat *)0x0;
                            do {
                              if (0 < (int)uVar21) {
                                pMVar43 = (Mat *)0x0;
                                pvVar45 = pvVar32;
                                do {
                                  if (0 < (int)uVar25) {
                                    pMVar26 = (Mat *)0x0;
                                    do {
                                      fVar50 = expf(*(float *)((long)ppvVar42 + (long)pMVar26 * 4));
                                      auVar52._0_4_ =
                                           fVar50 + *(float *)((long)pvVar45 + (long)pMVar26 * 4);
                                      auVar52._4_12_ = extraout_var_07;
                                      *(float *)((long)pvVar45 + (long)pMVar26 * 4) = auVar52._0_4_;
                                      pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                                    } while (pMVar46 != pMVar26);
                                  }
                                  ppvVar42 = (void **)((long)ppvVar42 + (long)pMVar38 * 4);
                                  pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                                  pvVar45 = (void *)((long)pvVar45 + (long)iVar10 * sVar17);
                                } while (pMVar43 != pMVar15);
                              }
                              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                              pvVar32 = (void *)((long)pvVar32 + sVar18 * sVar17);
                            } while (pMVar16 != pMVar27);
                          }
                          local_78 = (Mat *)((long)&local_78->data + 1);
                        } while (local_78 != pMVar47);
                      }
                    }
                    else {
                      puVar30 = (uint *)(ulong)CONCAT31((int3)((uint)iVar10 >> 8),
                                                        bVar28 | reduce_d | reduce_c);
                      if (((bVar28 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                        if (iVar9 == 0) {
                          puVar30 = (uint *)pMVar46;
                          Mat::create(top_blob,uVar25,uVar11,uVar12,sVar18,opt->blob_allocator);
                          auVar52 = extraout_XMM0_71;
                        }
                        else {
                          Mat::create(top_blob,uVar25,1,uVar11,uVar12,sVar18,opt->blob_allocator);
                          puVar30 = (uint *)pMVar38;
                          auVar52 = extraout_XMM0_68;
                        }
                        if (0 < (int)uVar12) {
                          local_78 = (Mat *)bottom_blob->data;
                          local_70 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                          iVar9 = top_blob->w;
                          local_e0 = (Mat *)top_blob->data;
                          uVar31 = top_blob->elemsize;
                          lVar13 = top_blob->cstep * uVar31;
                          puVar30 = (uint *)((long)top_blob->h * (long)iVar9);
                          local_f0 = (Mat *)0x0;
                          iVar10 = (int)((uVar31 * (long)puVar30 + 0xf & 0xfffffffffffffff0) /
                                        uVar31);
                          if (top_blob->dims == 4) {
                            iVar10 = (int)puVar30;
                          }
                          uVar12 = iVar10 * top_blob->d;
                          local_60 = (Mat *)((ulong)uVar12 * 4);
                          local_68 = local_e0;
                          do {
                            if (0 < (int)uVar12) {
                              puVar30 = (uint *)0x0;
                              memset((void **)((long)&local_68->data + lVar13 * (long)local_f0),0,
                                     (size_t)local_60);
                              auVar52 = extraout_XMM0_72;
                            }
                            if (0 < (int)uVar11) {
                              ppvVar42 = (void **)((long)&local_78->data +
                                                  (long)local_70 * (long)local_f0);
                              pMVar38 = (Mat *)0x0;
                              pMVar15 = local_e0;
                              do {
                                if (0 < (int)uVar21) {
                                  uVar34 = 0;
                                  do {
                                    if (0 < (int)uVar25) {
                                      pMVar16 = (Mat *)0x0;
                                      do {
                                        fVar50 = expf(*(float *)((long)ppvVar42 + (long)pMVar16 * 4)
                                                     );
                                        auVar52._0_4_ =
                                             fVar50 + *(float *)((long)&pMVar15->data +
                                                                (long)pMVar16 * 4);
                                        auVar52._4_12_ = extraout_var_08;
                                        *(float *)((long)&pMVar15->data + (long)pMVar16 * 4) =
                                             auVar52._0_4_;
                                        pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                                      } while (pMVar46 != pMVar16);
                                    }
                                    ppvVar42 = (void **)((long)ppvVar42 + (long)(int)uVar25 * 4);
                                    uVar34 = uVar34 + 1;
                                  } while (uVar34 != uVar21);
                                }
                                pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                                pMVar15 = (Mat *)((long)&pMVar15->data + uVar31 * (long)iVar9);
                              } while (pMVar38 != pMVar27);
                            }
                            local_f0 = (Mat *)((long)&local_f0->data + 1);
                            local_e0 = (Mat *)((long)&local_e0->data + lVar13);
                          } while (local_f0 != pMVar47);
                        }
                      }
                      else if (reduce_c == false && (bVar24 == 0 && (bVar37 & 1) == 0)) {
                        if (iVar9 == 0) {
                          puVar30 = (uint *)pMVar46;
                          Mat::create(top_blob,uVar25,uVar21,uVar12,sVar18,opt->blob_allocator);
                          auVar52 = extraout_XMM0_73;
                        }
                        else {
                          puVar30 = (uint *)pMVar46;
                          Mat::create(top_blob,uVar25,uVar21,1,uVar12,sVar18,opt->blob_allocator);
                          auVar52 = extraout_XMM0_01;
                        }
                        if (0 < (int)uVar12) {
                          local_78 = (Mat *)bottom_blob->data;
                          local_70 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                          iVar9 = top_blob->w;
                          local_f0 = (Mat *)top_blob->data;
                          uVar31 = top_blob->elemsize;
                          lVar13 = top_blob->cstep * uVar31;
                          puVar30 = (uint *)((long)top_blob->h * (long)iVar9);
                          local_e0 = (Mat *)0x0;
                          iVar10 = (int)((uVar31 * (long)puVar30 + 0xf & 0xfffffffffffffff0) /
                                        uVar31);
                          if (top_blob->dims == 4) {
                            iVar10 = (int)puVar30;
                          }
                          uVar12 = iVar10 * top_blob->d;
                          local_60 = (Mat *)((ulong)uVar12 * 4);
                          local_68 = local_f0;
                          do {
                            if (0 < (int)uVar12) {
                              puVar30 = (uint *)0x0;
                              memset((void **)((long)&local_68->data + lVar13 * (long)local_e0),0,
                                     (size_t)local_60);
                              auVar52 = extraout_XMM0_74;
                            }
                            if (0 < (int)uVar11) {
                              ppvVar42 = (void **)((long)&local_78->data +
                                                  (long)local_70 * (long)local_e0);
                              uVar34 = 0;
                              do {
                                if (0 < (int)uVar21) {
                                  pMVar38 = (Mat *)0x0;
                                  pMVar27 = local_f0;
                                  do {
                                    if (0 < (int)uVar25) {
                                      pMVar16 = (Mat *)0x0;
                                      do {
                                        fVar50 = expf(*(float *)((long)ppvVar42 + (long)pMVar16 * 4)
                                                     );
                                        auVar52._0_4_ =
                                             fVar50 + *(float *)((long)&pMVar27->data +
                                                                (long)pMVar16 * 4);
                                        auVar52._4_12_ = extraout_var_09;
                                        *(float *)((long)&pMVar27->data + (long)pMVar16 * 4) =
                                             auVar52._0_4_;
                                        pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                                      } while (pMVar46 != pMVar16);
                                    }
                                    ppvVar42 = (void **)((long)ppvVar42 + (long)(int)uVar25 * 4);
                                    pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                                    pMVar27 = (Mat *)((long)&pMVar27->data + uVar31 * (long)iVar9);
                                  } while (pMVar38 != pMVar15);
                                }
                                uVar34 = uVar34 + 1;
                              } while (uVar34 != uVar11);
                            }
                            local_e0 = (Mat *)((long)&local_e0->data + 1);
                            local_f0 = (Mat *)((long)&local_f0->data + lVar13);
                          } while (local_e0 != pMVar47);
                        }
                      }
                    }
                  }
                  break;
                }
                if (iVar9 == 0) {
                  Mat::create(top_blob,uVar25,uVar21,sVar18,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,uVar25,uVar21,1,1,sVar18,opt->blob_allocator);
                }
                local_c8.cstep = 0;
                local_c8.data = (Mat *)0x0;
                local_c8.refcount._0_4_ = 0;
                local_c8.refcount._4_4_ = 0;
                local_c8.elemsize._0_4_ = 0;
                local_c8.elemsize._4_4_ = 0;
                local_c8.elempack = 0;
                local_c8.allocator = (Allocator *)0x0;
                local_c8.dims = 0;
                local_c8.w = 0;
                local_c8.h = 0;
                local_c8.d = 0;
                local_c8.c = 0;
                Mat::create(&local_c8,uVar25,uVar21,uVar12,sVar18,opt->workspace_allocator);
                iVar10 = -100;
                local_68 = (Mat *)local_c8.data;
                auVar52 = extraout_XMM0_51;
                if (((Mat *)local_c8.data != (Mat *)0x0) &&
                   (local_60 = (Mat *)local_c8.cstep, local_c8.cstep * (long)local_c8.c != 0)) {
                  uVar34 = (int)local_c8.cstep * local_c8.c;
                  if (0 < (int)uVar34) {
                    puVar30 = (uint *)0x0;
                    memset(local_c8.data,0,(ulong)uVar34 << 2);
                    auVar52 = extraout_XMM0_52;
                  }
                  if (0 < (int)uVar12) {
                    local_78 = (Mat *)bottom_blob->data;
                    local_70 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    lVar23 = (long)local_c8.w;
                    lVar13 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
                    lVar29 = lVar13 * (long)local_60;
                    local_e8 = (Mat *)0x0;
                    local_e0 = local_68;
                    do {
                      if (0 < (int)uVar11) {
                        ppvVar42 = (void **)((long)&local_78->data + (long)local_70 * (long)local_e8
                                            );
                        uVar34 = 0;
                        do {
                          if (0 < (int)uVar21) {
                            pMVar16 = (Mat *)0x0;
                            pMVar27 = local_e0;
                            do {
                              if (0 < (int)uVar25) {
                                pMVar43 = (Mat *)0x0;
                                do {
                                  fVar50 = expf(*(float *)((long)ppvVar42 + (long)pMVar43 * 4));
                                  auVar52._0_4_ =
                                       fVar50 + *(float *)((long)&pMVar27->data + (long)pMVar43 * 4)
                                  ;
                                  auVar52._4_12_ = extraout_var_04;
                                  *(float *)((long)&pMVar27->data + (long)pMVar43 * 4) =
                                       auVar52._0_4_;
                                  pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                                } while (pMVar46 != pMVar43);
                              }
                              ppvVar42 = (void **)((long)ppvVar42 + (long)pMVar38 * 4);
                              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                              pMVar27 = (Mat *)((long)&pMVar27->data + lVar23 * lVar13);
                            } while (pMVar16 != pMVar15);
                          }
                          uVar34 = uVar34 + 1;
                        } while (uVar34 != uVar11);
                      }
                      local_e8 = (Mat *)((long)&local_e8->data + 1);
                      local_e0 = (Mat *)((long)&local_e0->data + lVar29);
                    } while (local_e8 != pMVar47);
                  }
                  uVar11 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar11) {
                    puVar30 = (uint *)0x0;
                    memset(top_blob->data,0,(ulong)uVar11 << 2);
                    auVar52 = extraout_XMM0_53;
                  }
                  if (0 < (int)uVar12) {
                    pvVar32 = top_blob->data;
                    iVar9 = top_blob->w;
                    sVar18 = top_blob->elemsize;
                    puVar30 = (uint *)0x0;
                    pMVar27 = local_68;
                    do {
                      if (0 < (int)uVar21) {
                        pMVar16 = (Mat *)0x0;
                        pvVar45 = pvVar32;
                        pMVar38 = pMVar27;
                        do {
                          if (0 < (int)uVar25) {
                            pMVar43 = (Mat *)0x0;
                            do {
                              fVar50 = *(float *)((long)&pMVar38->data + (long)pMVar43 * 4) +
                                       *(float *)((long)pvVar45 + (long)pMVar43 * 4);
                              auVar52 = ZEXT416((uint)fVar50);
                              *(float *)((long)pvVar45 + (long)pMVar43 * 4) = fVar50;
                              pMVar43 = (Mat *)((long)&pMVar43->data + 1);
                            } while (pMVar46 != pMVar43);
                          }
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          pMVar38 = (Mat *)((long)&pMVar38->data +
                                           (long)local_c8.w *
                                           CONCAT44(local_c8.elemsize._4_4_,
                                                    (undefined4)local_c8.elemsize));
                          pvVar45 = (void *)((long)pvVar45 + (long)iVar9 * sVar18);
                        } while (pMVar16 != pMVar15);
                      }
                      puVar30 = (uint *)((long)&((Mat *)puVar30)->data + 1);
                      pMVar27 = (Mat *)((long)&pMVar27->data +
                                       (long)local_60 *
                                       CONCAT44(local_c8.elemsize._4_4_,
                                                (undefined4)local_c8.elemsize));
                    } while ((Mat *)puVar30 != pMVar47);
                  }
                  iVar10 = 0;
                }
                piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                if (piVar7 != (int *)0x0) {
                  LOCK();
                  *piVar7 = *piVar7 + -1;
                  UNLOCK();
                  if (*piVar7 == 0) {
                    if (local_c8.allocator == (Allocator *)0x0) goto LAB_00346f31;
                    puVar30 = (uint *)local_c8.data;
                    (*(local_c8.allocator)->_vptr_Allocator[3])();
                    auVar52 = extraout_XMM0_54;
                  }
                }
              }
            }
          }
        }
        else {
          if (iVar9 == 0) {
            Mat::create(top_blob,uVar11,sVar18,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,uVar11,1,sVar18,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar30 = (uint *)0x1;
          Mat::create(&local_c8,1,uVar11,uVar12,sVar18,opt->workspace_allocator);
          pMVar15 = (Mat *)local_c8.data;
          iVar10 = -100;
          auVar52 = extraout_XMM0_18;
          if (((Mat *)local_c8.data != (Mat *)0x0) && (local_c8.cstep * (long)local_c8.c != 0)) {
            local_78 = (Mat *)local_c8.cstep;
            uVar25 = (int)local_c8.cstep * local_c8.c;
            if (0 < (int)uVar25) {
              puVar30 = (uint *)0x0;
              memset(local_c8.data,0,(ulong)uVar25 << 2);
              auVar52 = extraout_XMM0_19;
            }
            if (0 < (int)uVar12) {
              local_100 = (Mat *)bottom_blob->data;
              sVar18 = bottom_blob->elemsize;
              lVar13 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                       (long)local_78;
              sVar17 = bottom_blob->cstep;
              local_f8 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  pMVar46 = (Mat *)0x0;
                  pMVar38 = local_100;
                  do {
                    if ((int)uVar34 < 1) {
                      auVar52 = ZEXT816(0);
                    }
                    else {
                      auVar52 = ZEXT816(0);
                      uVar31 = 0;
                      do {
                        fVar50 = expf(*(float *)((long)pMVar38 + uVar31 * 4));
                        auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar50));
                        uVar31 = uVar31 + 1;
                      } while (uVar34 != uVar31);
                    }
                    *(int *)((long)&pMVar15->data + (long)pMVar46 * 4 + lVar13 * (long)local_f8) =
                         auVar52._0_4_;
                    pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                    pMVar38 = (Mat *)((long)pMVar38 + (long)(int)uVar34 * 4);
                  } while (pMVar46 != pMVar27);
                }
                local_f8 = (Mat *)((long)&local_f8->data + 1);
                local_100 = (Mat *)((long)local_100 + sVar18 * sVar17);
              } while (local_f8 != pMVar47);
            }
            uVar25 = top_blob->c * (int)top_blob->cstep;
            if (0 < (int)uVar25) {
              puVar30 = (uint *)0x0;
              memset(top_blob->data,0,(ulong)uVar25 << 2);
              auVar52 = extraout_XMM0_20;
            }
            if (0 < (int)uVar12) {
              pvVar32 = top_blob->data;
              pMVar38 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  pMVar46 = (Mat *)0x0;
                  do {
                    fVar50 = *(float *)((long)&pMVar15->data + (long)pMVar46 * 4) +
                             *(float *)((long)pvVar32 + (long)pMVar46 * 4);
                    auVar52 = ZEXT416((uint)fVar50);
                    *(float *)((long)pvVar32 + (long)pMVar46 * 4) = fVar50;
                    pMVar46 = (Mat *)((long)&pMVar46->data + 1);
                  } while (pMVar27 != pMVar46);
                }
                pMVar38 = (Mat *)((long)&pMVar38->data + 1);
                pMVar15 = (Mat *)((long)&pMVar15->data +
                                 (long)local_78 *
                                 CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
                puVar30 = (uint *)pMVar27;
              } while (pMVar38 != pMVar47);
            }
            iVar10 = 0;
          }
          piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) goto LAB_00340907;
              puVar30 = (uint *)local_c8.data;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
              auVar52 = extraout_XMM0_21;
            }
          }
        }
      }
      else {
        if (iVar9 == 0) {
          Mat::create(top_blob,1,sVar18,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,1,sVar18,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        Mat::create(&local_c8,uVar12,sVar18,opt->workspace_allocator);
        pvVar32 = local_c8.data;
        iVar10 = -100;
        auVar52 = extraout_XMM0_06;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          if ((int)uVar12 < 1) {
            auVar52 = ZEXT816(0);
          }
          else {
            pvVar45 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar17 = bottom_blob->cstep;
            pMVar27 = (Mat *)0x0;
            do {
              if ((int)uVar35 < 1) {
                fVar50 = 0.0;
              }
              else {
                fVar50 = 0.0;
                uVar31 = 0;
                do {
                  fVar51 = expf(*(float *)((long)pvVar45 + uVar31 * 4));
                  fVar50 = fVar50 + fVar51;
                  uVar31 = uVar31 + 1;
                } while (uVar35 != uVar31);
              }
              *(float *)((long)(void **)pvVar32 + (long)pMVar27 * 4) = fVar50;
              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
              pvVar45 = (void *)((long)pvVar45 + sVar18 * sVar17);
            } while (pMVar27 != pMVar47);
            auVar52 = ZEXT816(0);
            pMVar27 = (Mat *)0x0;
            do {
              auVar52._0_4_ = auVar52._0_4_ + *(float *)((long)(void **)pvVar32 + (long)pMVar27 * 4)
              ;
              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
            } while (pMVar47 != pMVar27);
          }
          *(int *)top_blob->data = auVar52._0_4_;
          iVar10 = 0;
        }
        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) goto LAB_00340907;
            puVar30 = (uint *)local_c8.data;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
            auVar52 = extraout_XMM0_12;
          }
        }
      }
LAB_00346f40:
      if (iVar10 != 0) {
        return -100;
      }
    }
LAB_00346f49:
    fVar50 = auVar52._0_4_;
LAB_00346f4e:
    reduction_post_process<ncnn::post_process_log<float>>(top_blob,fVar50,(Option *)puVar30);
    return 0;
  }
LAB_00342112:
  if (1.1920929e-07 < ABS(fVar50 + -1.0)) {
LAB_0034213c:
    reduction_post_process<ncnn::post_process_identity<float>>(top_blob,fVar50,(Option *)puVar30);
  }
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[4] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_d = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_d = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i = 0; i < reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims;
            axes_flag[axis] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
        else if (dims == 4)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_d = true;
            if (axes_flag[2] == 1) reduce_h = true;
            if (axes_flag[3] == 1) reduce_w = true;
        }
    }

    if (operation == ReductionOp_SUM)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_ASUM)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MEAN)
    {
        int scale = 1;
        int dims = bottom_blob.dims;
        if (dims == 1)
        {
            scale = bottom_blob.w;
        }
        else if (dims == 2)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
        }
        else if (dims == 3)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_c) scale *= bottom_blob.c;
        }
        else if (dims == 4)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_d) scale *= bottom_blob.d;
            if (reduce_c) scale *= bottom_blob.c;
        }

        float coeff_mean = coeff / scale;
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, coeff_mean, keepdims, opt);
    }

    if (operation == ReductionOp_MAX)
        return reduction<reduction_op_max<float>, reduction_op_max<float>, post_process_identity<float> >(bottom_blob, top_blob, -FLT_MAX, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MIN)
        return reduction<reduction_op_min<float>, reduction_op_min<float>, post_process_identity<float> >(bottom_blob, top_blob, FLT_MAX, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_PROD)
        return reduction<reduction_op_mul<float>, reduction_op_mul<float>, post_process_identity<float> >(bottom_blob, top_blob, 1.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_L1)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, 1.f, keepdims, opt);

    if (operation == ReductionOp_L2)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_sqrt<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSum)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSumExp)
        return reduction<reduction_op_sumsexp<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, 1.f, keepdims, opt);

    return 0;
}